

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O1

void av1_dr_prediction_z3_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  unkbyte10 Var18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [12];
  unkbyte10 Var21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [12];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [14];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  unkbyte10 Var42;
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [14];
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  unkbyte10 Var55;
  undefined1 auVar56 [12];
  unkbyte10 Var57;
  undefined1 auVar58 [12];
  unkbyte10 Var59;
  undefined1 auVar60 [12];
  unkbyte10 Var61;
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [14];
  undefined1 auVar79 [12];
  undefined1 auVar80 [14];
  undefined1 auVar81 [12];
  undefined1 auVar82 [14];
  undefined1 auVar83 [12];
  undefined1 auVar84 [14];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [14];
  undefined1 auVar89 [12];
  undefined1 auVar90 [14];
  undefined1 auVar91 [12];
  undefined1 auVar92 [14];
  undefined1 auVar93 [12];
  undefined1 auVar94 [14];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [14];
  undefined1 auVar99 [12];
  undefined1 auVar100 [14];
  undefined1 auVar101 [12];
  undefined1 auVar102 [14];
  undefined1 auVar103 [12];
  undefined1 auVar104 [14];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [12];
  undefined1 auVar108 [14];
  undefined1 auVar109 [12];
  undefined1 auVar110 [14];
  undefined1 auVar111 [12];
  undefined1 auVar112 [14];
  undefined1 auVar113 [12];
  undefined1 auVar114 [14];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined1 auVar118 [14];
  undefined1 auVar119 [12];
  undefined1 auVar120 [14];
  undefined1 auVar121 [12];
  undefined1 auVar122 [14];
  undefined1 auVar123 [12];
  undefined1 auVar124 [14];
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined1 auVar127 [12];
  undefined1 auVar128 [14];
  undefined1 auVar129 [12];
  undefined1 auVar130 [14];
  undefined1 auVar131 [12];
  undefined1 auVar132 [14];
  undefined1 auVar133 [12];
  undefined1 auVar134 [14];
  undefined1 auVar135 [12];
  undefined1 auVar136 [12];
  undefined1 auVar137 [12];
  undefined1 auVar138 [14];
  undefined1 auVar139 [12];
  undefined1 auVar140 [14];
  undefined1 auVar141 [12];
  undefined1 auVar142 [12];
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined1 auVar145 [12];
  undefined1 auVar146 [12];
  undefined1 auVar147 [14];
  undefined1 auVar148 [12];
  undefined1 auVar149 [14];
  undefined1 auVar150 [12];
  undefined1 auVar151 [14];
  undefined1 auVar152 [12];
  undefined1 auVar153 [14];
  undefined1 auVar154 [12];
  undefined1 auVar155 [12];
  undefined1 auVar156 [12];
  undefined1 auVar157 [12];
  undefined1 auVar158 [12];
  undefined1 auVar159 [12];
  undefined1 auVar160 [12];
  undefined1 auVar161 [12];
  undefined1 auVar162 [12];
  undefined1 auVar163 [12];
  undefined1 auVar164 [12];
  undefined1 auVar165 [14];
  undefined1 auVar166 [12];
  undefined1 auVar167 [14];
  undefined1 auVar168 [12];
  undefined1 auVar169 [14];
  undefined1 auVar170 [12];
  undefined1 auVar171 [14];
  undefined1 auVar172 [12];
  undefined1 auVar173 [14];
  undefined1 auVar174 [12];
  undefined1 auVar175 [14];
  undefined1 auVar176 [12];
  undefined1 auVar177 [14];
  undefined1 auVar178 [12];
  undefined1 auVar179 [14];
  undefined1 auVar180 [12];
  undefined1 auVar181 [12];
  undefined1 auVar182 [12];
  undefined1 auVar183 [12];
  undefined1 auVar184 [12];
  undefined1 auVar185 [12];
  undefined1 auVar186 [12];
  undefined1 auVar187 [12];
  undefined1 auVar188 [12];
  undefined1 auVar189 [12];
  undefined1 auVar190 [12];
  undefined1 auVar191 [12];
  undefined1 auVar192 [12];
  undefined1 auVar193 [12];
  undefined1 auVar194 [12];
  undefined1 auVar195 [12];
  undefined1 auVar196 [12];
  undefined1 auVar197 [12];
  undefined1 auVar198 [12];
  undefined1 auVar199 [12];
  undefined1 auVar200 [12];
  undefined1 auVar201 [14];
  undefined1 auVar202 [12];
  undefined1 auVar203 [14];
  undefined1 auVar204 [12];
  undefined1 auVar205 [14];
  undefined1 auVar206 [12];
  undefined1 auVar207 [14];
  undefined1 auVar208 [12];
  undefined1 auVar209 [12];
  undefined1 auVar210 [12];
  undefined1 auVar211 [14];
  undefined1 auVar212 [12];
  undefined1 auVar213 [14];
  undefined1 auVar214 [12];
  undefined1 auVar215 [14];
  undefined1 auVar216 [12];
  undefined1 auVar217 [14];
  undefined1 auVar218 [12];
  undefined1 auVar219 [12];
  undefined1 auVar220 [12];
  undefined1 auVar221 [12];
  undefined1 auVar222 [12];
  undefined1 auVar223 [12];
  undefined1 auVar224 [12];
  undefined1 auVar225 [12];
  undefined1 auVar226 [12];
  undefined1 auVar227 [12];
  undefined1 auVar228 [12];
  undefined1 auVar229 [12];
  undefined1 auVar230 [12];
  undefined1 auVar231 [12];
  undefined1 auVar232 [12];
  undefined1 auVar233 [12];
  undefined1 auVar234 [12];
  undefined1 auVar235 [12];
  undefined1 auVar236 [12];
  undefined1 auVar237 [12];
  undefined1 auVar238 [12];
  undefined1 auVar239 [12];
  undefined1 auVar240 [12];
  undefined1 auVar241 [16];
  undefined1 auVar242 [12];
  undefined1 auVar243 [12];
  undefined1 auVar244 [12];
  undefined1 auVar245 [12];
  undefined1 auVar246 [12];
  undefined1 auVar247 [12];
  undefined1 auVar248 [12];
  undefined1 auVar249 [12];
  undefined1 auVar250 [12];
  undefined1 auVar251 [12];
  long lVar252;
  uint8_t *puVar253;
  byte bVar254;
  uint uVar255;
  long lVar256;
  ptrdiff_t pitchSrc;
  uint uVar257;
  int iVar258;
  uint uVar259;
  long lVar260;
  ulong uVar261;
  int iVar262;
  bool bVar263;
  undefined2 uVar2278;
  short sVar264;
  undefined2 uVar2279;
  undefined2 uVar265;
  undefined1 auVar268 [12];
  undefined1 auVar276 [12];
  short sVar457;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar287 [16];
  undefined1 auVar296 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar269 [12];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar270 [12];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar373 [16];
  undefined1 auVar377 [16];
  undefined1 auVar272 [12];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar273 [12];
  undefined1 auVar401 [16];
  undefined1 auVar274 [12];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar275 [12];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined2 uVar458;
  undefined1 auVar461 [12];
  undefined1 auVar489 [12];
  undefined1 auVar502 [16];
  undefined1 auVar509 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar462 [12];
  undefined1 auVar463 [12];
  undefined1 auVar526 [16];
  undefined1 auVar464 [12];
  undefined1 auVar535 [16];
  undefined1 auVar538 [16];
  undefined1 auVar541 [16];
  undefined1 auVar465 [12];
  undefined1 auVar543 [16];
  undefined1 auVar548 [16];
  undefined1 auVar466 [12];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar555 [16];
  undefined1 auVar558 [16];
  undefined1 auVar467 [12];
  undefined1 auVar560 [16];
  undefined1 auVar565 [16];
  undefined1 auVar468 [12];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar571 [16];
  undefined1 auVar575 [16];
  undefined1 auVar469 [12];
  undefined1 auVar577 [16];
  undefined1 auVar582 [16];
  undefined1 auVar470 [12];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar588 [16];
  undefined1 auVar592 [16];
  undefined1 auVar471 [12];
  undefined1 auVar594 [16];
  undefined1 auVar599 [16];
  undefined1 auVar472 [12];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar605 [16];
  undefined1 auVar609 [16];
  undefined1 auVar473 [12];
  undefined1 auVar611 [16];
  undefined1 auVar616 [16];
  undefined1 auVar474 [12];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar476 [12];
  undefined1 auVar632 [16];
  undefined1 auVar477 [12];
  undefined1 auVar638 [16];
  undefined1 auVar478 [12];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar479 [12];
  undefined1 auVar657 [16];
  undefined1 auVar660 [16];
  undefined1 auVar663 [16];
  undefined1 auVar480 [12];
  undefined1 auVar665 [16];
  undefined1 auVar670 [16];
  undefined1 auVar481 [12];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar676 [16];
  undefined1 auVar679 [16];
  undefined1 auVar482 [12];
  undefined1 auVar681 [16];
  undefined1 auVar686 [16];
  undefined1 auVar483 [12];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar692 [16];
  undefined1 auVar696 [16];
  undefined1 auVar484 [12];
  undefined1 auVar698 [16];
  undefined1 auVar703 [16];
  undefined1 auVar485 [12];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar709 [16];
  undefined1 auVar712 [16];
  undefined1 auVar486 [12];
  undefined1 auVar714 [16];
  undefined1 auVar719 [16];
  undefined1 auVar487 [12];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar488 [12];
  undefined1 auVar731 [16];
  undefined2 uVar2280;
  undefined2 uVar740;
  undefined4 uVar741;
  undefined1 auVar744 [12];
  undefined1 auVar760 [12];
  undefined1 auVar772 [16];
  undefined1 auVar783 [16];
  undefined1 auVar786 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar798 [16];
  undefined1 auVar807 [16];
  undefined1 auVar745 [12];
  undefined1 auVar809 [16];
  undefined1 auVar746 [12];
  undefined1 auVar816 [16];
  undefined1 auVar822 [16];
  undefined1 auVar747 [12];
  undefined1 auVar824 [16];
  undefined1 auVar830 [16];
  undefined1 auVar748 [12];
  undefined1 auVar832 [16];
  undefined1 auVar838 [16];
  undefined1 auVar749 [12];
  undefined1 auVar840 [16];
  undefined1 auVar751 [12];
  undefined1 auVar848 [16];
  undefined1 auVar752 [12];
  undefined1 auVar850 [16];
  undefined1 auVar753 [12];
  undefined1 auVar858 [16];
  undefined1 auVar755 [12];
  undefined1 auVar868 [16];
  undefined1 auVar756 [12];
  undefined1 auVar875 [16];
  undefined1 auVar881 [16];
  undefined1 auVar757 [12];
  undefined1 auVar883 [16];
  undefined1 auVar758 [12];
  undefined1 auVar890 [16];
  undefined1 auVar759 [12];
  undefined1 auVar897 [16];
  undefined1 auVar906 [16];
  undefined2 uVar907;
  undefined4 uVar908;
  undefined1 auVar912 [12];
  undefined1 in_XMM3 [16];
  undefined1 auVar946 [16];
  undefined1 auVar953 [16];
  undefined1 auVar911 [12];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar913 [12];
  undefined1 auVar979 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar914 [12];
  undefined1 auVar915 [12];
  undefined1 auVar995 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar916 [12];
  undefined1 auVar917 [12];
  undefined1 auVar1010 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar918 [12];
  undefined1 auVar919 [12];
  undefined1 auVar1025 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar920 [12];
  undefined1 auVar921 [12];
  undefined1 auVar1040 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar923 [12];
  undefined1 auVar924 [12];
  undefined1 auVar1056 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar926 [12];
  undefined1 auVar927 [12];
  undefined1 auVar1084 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar928 [12];
  undefined1 auVar929 [12];
  undefined1 auVar1099 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar930 [12];
  undefined1 auVar931 [12];
  undefined1 auVar1114 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar932 [12];
  undefined1 auVar933 [12];
  undefined1 auVar1129 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1142 [16];
  ushort uVar1143;
  undefined1 auVar1144 [12];
  undefined1 auVar1162 [12];
  ushort uVar1321;
  ushort uVar1322;
  ushort uVar1323;
  ushort uVar1324;
  ushort uVar1326;
  undefined1 auVar1172 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1145 [12];
  undefined1 auVar1197 [16];
  undefined1 auVar1198 [16];
  undefined1 auVar1199 [16];
  ushort uVar1325;
  ushort uVar1327;
  undefined1 auVar1200 [16];
  undefined1 auVar1201 [16];
  undefined1 auVar1146 [12];
  undefined1 auVar1147 [12];
  undefined1 auVar1209 [16];
  undefined1 auVar1210 [16];
  undefined1 auVar1148 [12];
  undefined1 auVar1149 [12];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1150 [12];
  undefined1 auVar1151 [12];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1152 [12];
  undefined1 auVar1153 [12];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1154 [12];
  undefined1 auVar1155 [12];
  undefined1 auVar1272 [16];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1156 [12];
  undefined1 auVar1157 [12];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1158 [12];
  undefined1 auVar1159 [12];
  undefined1 auVar1293 [16];
  undefined1 auVar1294 [16];
  undefined1 auVar1160 [12];
  undefined1 auVar1161 [12];
  undefined1 auVar1303 [16];
  undefined1 auVar1304 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1314 [16];
  ushort uVar1328;
  undefined1 auVar1329 [12];
  undefined1 auVar1331 [12];
  ushort uVar1419;
  ushort uVar1420;
  ushort uVar1421;
  ushort uVar1422;
  ushort uVar1424;
  undefined1 auVar1332 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1352 [16];
  undefined1 auVar1355 [16];
  ushort uVar1423;
  ushort uVar1425;
  undefined1 auVar1356 [16];
  undefined1 auVar1357 [16];
  undefined1 auVar1360 [16];
  undefined1 auVar1363 [16];
  undefined1 auVar1366 [16];
  undefined1 auVar1369 [16];
  undefined1 auVar1370 [16];
  undefined1 auVar1375 [16];
  undefined1 auVar1330 [12];
  undefined1 auVar1383 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1410 [16];
  undefined4 uVar1426;
  undefined1 auVar1430 [12];
  undefined1 auVar1431 [12];
  undefined1 auVar1432 [12];
  undefined1 auVar1433 [12];
  undefined1 auVar1434 [12];
  undefined1 auVar1435 [12];
  undefined1 auVar1436 [12];
  undefined1 auVar1437 [12];
  undefined1 auVar1438 [12];
  undefined1 auVar1439 [12];
  undefined1 auVar1440 [12];
  undefined1 auVar1441 [12];
  undefined1 auVar1442 [12];
  undefined1 auVar1443 [12];
  undefined1 auVar1444 [12];
  undefined1 auVar1445 [12];
  undefined1 auVar1446 [12];
  undefined1 auVar1447 [12];
  undefined1 auVar1448 [12];
  undefined1 in_XMM6 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  undefined1 auVar1477 [16];
  undefined1 auVar1480 [16];
  undefined1 auVar1487 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1509 [12];
  undefined1 in_XMM7 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1517 [16];
  undefined1 auVar1518 [16];
  undefined1 auVar1525 [16];
  undefined1 auVar1526 [16];
  undefined1 auVar1533 [16];
  undefined1 auVar1540 [16];
  undefined1 auVar1547 [16];
  undefined1 auVar1554 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1564 [16];
  undefined1 auVar1571 [16];
  undefined1 auVar1578 [16];
  undefined1 auVar1585 [16];
  undefined1 auVar1592 [16];
  undefined1 auVar1599 [16];
  undefined1 auVar1606 [16];
  undefined1 auVar1613 [16];
  undefined1 auVar1620 [12];
  undefined1 auVar1629 [16];
  undefined1 auVar1630 [16];
  undefined1 auVar1631 [16];
  undefined1 auVar1632 [16];
  undefined1 auVar1633 [16];
  undefined1 auVar1634 [16];
  undefined1 auVar1635 [16];
  undefined1 auVar1636 [16];
  undefined1 auVar1637 [16];
  undefined1 auVar1638 [16];
  undefined1 auVar1639 [16];
  undefined1 auVar1640 [16];
  undefined1 auVar1641 [16];
  undefined1 auVar1642 [16];
  undefined1 auVar1643 [16];
  undefined1 auVar1644 [16];
  undefined1 auVar1647 [16];
  undefined1 auVar1648 [16];
  undefined1 auVar1649 [16];
  undefined1 auVar1650 [16];
  undefined1 auVar1658 [16];
  undefined1 auVar1621 [12];
  undefined1 auVar1666 [16];
  undefined1 auVar1622 [12];
  undefined1 auVar1674 [16];
  undefined1 auVar1623 [12];
  undefined1 auVar1682 [16];
  undefined1 auVar1624 [12];
  undefined1 auVar1690 [16];
  undefined1 auVar1691 [16];
  undefined1 auVar1692 [16];
  undefined1 auVar1693 [16];
  undefined1 auVar1696 [16];
  undefined1 auVar1700 [16];
  undefined1 auVar1701 [16];
  undefined1 auVar1702 [16];
  undefined1 auVar1703 [16];
  undefined1 auVar1625 [12];
  undefined1 auVar1711 [16];
  undefined1 auVar1626 [12];
  undefined1 auVar1719 [16];
  undefined1 auVar1627 [12];
  undefined1 auVar1727 [16];
  undefined1 auVar1728 [16];
  undefined1 auVar1729 [16];
  undefined1 auVar1730 [16];
  undefined1 auVar1628 [12];
  undefined1 auVar1738 [16];
  undefined1 auVar1739 [16];
  undefined1 auVar1740 [16];
  undefined1 auVar1741 [16];
  undefined1 auVar1744 [16];
  undefined1 auVar1745 [16];
  undefined1 auVar1746 [16];
  undefined1 auVar1747 [16];
  undefined4 uVar1750;
  undefined1 auVar1754 [12];
  undefined1 auVar1755 [12];
  undefined1 auVar1756 [12];
  undefined1 auVar1757 [12];
  undefined1 auVar1758 [12];
  undefined1 auVar1759 [12];
  undefined1 auVar1760 [12];
  undefined1 auVar1761 [12];
  undefined1 auVar1762 [12];
  undefined1 auVar1763 [12];
  undefined1 auVar1764 [12];
  undefined1 auVar1765 [12];
  undefined1 auVar1766 [12];
  undefined1 auVar1767 [12];
  undefined1 auVar1768 [12];
  undefined1 auVar1769 [12];
  undefined1 auVar1770 [12];
  undefined1 in_XMM9 [16];
  undefined1 auVar1780 [16];
  undefined1 auVar1789 [16];
  undefined1 auVar1796 [16];
  undefined1 auVar1797 [16];
  undefined1 auVar1800 [16];
  undefined1 auVar1803 [16];
  undefined1 auVar1812 [16];
  undefined1 auVar1815 [16];
  undefined1 auVar1818 [12];
  undefined1 in_XMM10 [16];
  undefined1 auVar1819 [16];
  undefined1 auVar1822 [16];
  undefined1 auVar1829 [16];
  undefined1 auVar1836 [16];
  undefined1 auVar1843 [16];
  undefined1 auVar1850 [16];
  undefined1 auVar1857 [16];
  undefined1 auVar1858 [16];
  undefined1 auVar1867 [16];
  undefined1 auVar1870 [16];
  undefined1 auVar1874 [16];
  undefined1 auVar1881 [16];
  undefined1 auVar1888 [16];
  undefined1 auVar1895 [16];
  undefined1 auVar1902 [16];
  undefined4 uVar1905;
  undefined1 auVar1909 [12];
  undefined1 auVar1926 [16];
  undefined1 auVar1929 [16];
  undefined1 auVar1933 [16];
  undefined1 auVar1936 [16];
  undefined1 auVar1910 [12];
  undefined1 auVar1940 [16];
  undefined1 auVar1911 [12];
  undefined1 auVar1945 [16];
  undefined1 auVar1912 [12];
  undefined1 auVar1950 [16];
  undefined1 auVar1957 [16];
  undefined1 auVar1961 [16];
  undefined1 auVar1964 [16];
  undefined1 auVar1967 [16];
  undefined1 auVar1913 [12];
  undefined1 auVar1971 [16];
  undefined1 auVar1914 [12];
  undefined1 auVar1975 [16];
  undefined1 auVar1915 [12];
  undefined1 auVar1980 [16];
  undefined1 auVar1916 [12];
  undefined1 auVar1984 [16];
  undefined4 uVar1987;
  undefined1 auVar1991 [12];
  undefined1 auVar1992 [12];
  undefined1 auVar1993 [12];
  undefined1 auVar1994 [12];
  undefined1 auVar1995 [12];
  undefined1 auVar1996 [12];
  undefined1 auVar1997 [12];
  undefined1 auVar1998 [12];
  undefined1 auVar1999 [12];
  undefined1 auVar2000 [12];
  undefined1 auVar2001 [12];
  undefined1 auVar2002 [12];
  undefined1 auVar2003 [12];
  undefined1 auVar2004 [12];
  undefined1 auVar2005 [12];
  undefined1 auVar2006 [12];
  undefined1 auVar2007 [12];
  undefined1 auVar2023 [16];
  undefined1 auVar2026 [16];
  undefined1 auVar2035 [12];
  undefined1 auVar2044 [12];
  undefined1 auVar2045 [16];
  undefined1 auVar2054 [16];
  undefined1 auVar2036 [12];
  undefined1 auVar2063 [16];
  undefined1 auVar2037 [12];
  undefined1 auVar2072 [16];
  undefined1 auVar2038 [12];
  undefined1 auVar2081 [16];
  undefined1 auVar2039 [12];
  undefined1 auVar2090 [16];
  undefined1 auVar2093 [16];
  undefined1 auVar2040 [12];
  undefined1 auVar2102 [16];
  undefined1 auVar2041 [12];
  undefined1 auVar2111 [16];
  undefined1 auVar2042 [12];
  undefined1 auVar2120 [16];
  undefined1 auVar2043 [12];
  undefined1 auVar2129 [16];
  undefined1 auVar2138 [16];
  undefined1 auVar2145 [16];
  undefined1 auVar2152 [16];
  undefined1 auVar2159 [16];
  undefined1 auVar2166 [16];
  undefined1 auVar2173 [16];
  undefined1 auVar2180 [16];
  undefined1 auVar2187 [16];
  undefined1 auVar2194 [16];
  undefined1 auVar2201 [16];
  undefined1 auVar2208 [16];
  undefined1 auVar2215 [16];
  undefined1 auVar2222 [16];
  undefined1 auVar2229 [16];
  undefined1 auVar2236 [16];
  undefined1 auVar2243 [16];
  undefined1 auVar2250 [16];
  undefined1 auVar2257 [16];
  undefined1 auVar2264 [16];
  undefined1 auVar2271 [16];
  __m128i d [32];
  __m128i dstvec_h [32];
  uint8_t dstT [4096];
  undefined8 auStack_1738 [5];
  undefined8 uStack_1710;
  undefined1 uStack_16f0;
  undefined1 uStack_16ef;
  undefined1 uStack_16ee;
  undefined1 uStack_16ed;
  undefined1 uStack_16ec;
  undefined1 uStack_16eb;
  undefined1 uStack_16ea;
  undefined1 uStack_16e9;
  undefined1 uStack_16c0;
  undefined1 uStack_16bf;
  undefined1 uStack_16be;
  undefined1 uStack_16bd;
  undefined1 uStack_16bc;
  undefined1 uStack_16bb;
  undefined1 uStack_16ba;
  undefined1 uStack_16b9;
  undefined8 local_16b8 [5];
  undefined1 uStack_1690;
  undefined1 uStack_168f;
  undefined1 uStack_168e;
  undefined1 uStack_168d;
  undefined1 uStack_168c;
  undefined1 uStack_168b;
  undefined1 uStack_168a;
  undefined1 uStack_1689;
  undefined1 uStack_1670;
  undefined1 uStack_166f;
  undefined1 uStack_166e;
  undefined1 uStack_166d;
  undefined1 uStack_166c;
  undefined1 uStack_166b;
  undefined1 uStack_166a;
  undefined1 uStack_1669;
  undefined1 uStack_1640;
  undefined1 uStack_163f;
  undefined1 uStack_163e;
  undefined1 uStack_163d;
  undefined1 uStack_163c;
  undefined1 uStack_163b;
  undefined1 uStack_163a;
  undefined1 uStack_1639;
  undefined8 local_1638 [2];
  undefined1 local_1628;
  undefined1 uStack_1627;
  undefined1 uStack_1626;
  undefined1 uStack_1625;
  undefined1 uStack_1624;
  undefined1 uStack_1623;
  undefined1 uStack_1622;
  undefined1 uStack_1621;
  undefined1 uStack_1620;
  undefined1 uStack_161f;
  undefined1 uStack_161e;
  undefined1 uStack_161d;
  undefined1 uStack_161c;
  undefined1 uStack_161b;
  undefined1 uStack_161a;
  undefined1 uStack_1619;
  undefined4 local_1618;
  undefined4 uStack_1614;
  undefined4 uStack_1610;
  undefined4 uStack_160c;
  undefined1 local_1608 [16];
  undefined1 local_15f8 [16];
  undefined1 local_15e8 [16];
  undefined1 local_15d8 [16];
  undefined1 local_15c8 [16];
  undefined8 local_15b8;
  undefined8 auStack_15b0 [3];
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined1 local_1588 [16];
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined1 local_1548 [16];
  undefined8 local_1538;
  undefined8 auStack_1530 [3];
  undefined4 local_1518;
  undefined4 uStack_1514;
  undefined4 uStack_1510;
  undefined4 uStack_150c;
  undefined4 uStack_1500;
  undefined4 uStack_14fc;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined4 local_14d8;
  undefined4 uStack_14d4;
  undefined4 uStack_14d0;
  undefined4 uStack_14cc;
  undefined4 uStack_14c0;
  undefined4 uStack_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined4 local_1498;
  undefined4 uStack_1494;
  undefined4 uStack_1490;
  undefined4 uStack_148c;
  undefined4 uStack_1480;
  undefined4 uStack_147c;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined4 local_1458;
  undefined4 uStack_1454;
  undefined4 uStack_1450;
  undefined4 uStack_144c;
  undefined4 uStack_1440;
  undefined4 uStack_143c;
  undefined4 local_1438;
  undefined4 uStack_1434;
  undefined8 uStack_1430;
  undefined1 local_1428;
  undefined1 uStack_1427;
  undefined1 uStack_1426;
  undefined1 uStack_1425;
  undefined1 uStack_1424;
  undefined1 uStack_1423;
  undefined1 uStack_1422;
  undefined1 uStack_1421;
  undefined1 uStack_1420;
  undefined1 uStack_141f;
  undefined1 uStack_141e;
  undefined1 uStack_141d;
  undefined1 uStack_141c;
  undefined1 uStack_141b;
  undefined1 uStack_141a;
  undefined1 uStack_1419;
  undefined1 local_1418 [16];
  undefined1 local_1408;
  undefined1 uStack_1407;
  undefined1 uStack_1406;
  undefined1 uStack_1405;
  undefined1 uStack_1404;
  undefined1 uStack_1403;
  undefined1 uStack_1402;
  undefined1 uStack_1401;
  undefined1 uStack_1400;
  undefined1 uStack_13ff;
  undefined1 uStack_13fe;
  undefined1 uStack_13fd;
  undefined1 uStack_13fc;
  undefined1 uStack_13fb;
  undefined1 uStack_13fa;
  undefined1 uStack_13f9;
  undefined1 local_13f8 [16];
  undefined1 local_13e8;
  undefined1 uStack_13e7;
  undefined1 uStack_13e6;
  undefined1 uStack_13e5;
  undefined1 uStack_13e4;
  undefined1 uStack_13e3;
  undefined1 uStack_13e2;
  undefined1 uStack_13e1;
  undefined1 uStack_13e0;
  undefined1 uStack_13df;
  undefined1 uStack_13de;
  undefined1 uStack_13dd;
  undefined1 uStack_13dc;
  undefined1 uStack_13db;
  undefined1 uStack_13da;
  undefined1 uStack_13d9;
  undefined1 local_13d8 [16];
  undefined1 local_13c8;
  undefined1 uStack_13c7;
  undefined1 uStack_13c6;
  undefined1 uStack_13c5;
  undefined1 uStack_13c4;
  undefined1 uStack_13c3;
  undefined1 uStack_13c2;
  undefined1 uStack_13c1;
  undefined1 uStack_13c0;
  undefined1 uStack_13bf;
  undefined1 uStack_13be;
  undefined1 uStack_13bd;
  undefined1 uStack_13bc;
  undefined1 uStack_13bb;
  undefined1 uStack_13ba;
  undefined1 uStack_13b9;
  undefined1 local_13b8 [16];
  undefined1 local_13a8;
  undefined1 uStack_13a7;
  undefined1 uStack_13a6;
  undefined1 uStack_13a5;
  undefined1 uStack_13a4;
  undefined1 uStack_13a3;
  undefined1 uStack_13a2;
  undefined1 uStack_13a1;
  undefined1 uStack_13a0;
  undefined1 uStack_139f;
  undefined1 uStack_139e;
  undefined1 uStack_139d;
  undefined1 uStack_139c;
  undefined1 uStack_139b;
  undefined1 uStack_139a;
  undefined1 uStack_1399;
  undefined1 local_1398 [16];
  undefined1 local_1388;
  undefined1 uStack_1387;
  undefined1 uStack_1386;
  undefined1 uStack_1385;
  undefined1 uStack_1384;
  undefined1 uStack_1383;
  undefined1 uStack_1382;
  undefined1 uStack_1381;
  undefined1 uStack_1380;
  undefined1 uStack_137f;
  undefined1 uStack_137e;
  undefined1 uStack_137d;
  undefined1 uStack_137c;
  undefined1 uStack_137b;
  undefined1 uStack_137a;
  undefined1 uStack_1379;
  undefined1 local_1378 [16];
  undefined1 local_1368;
  undefined1 uStack_1367;
  undefined1 uStack_1366;
  undefined1 uStack_1365;
  undefined1 uStack_1364;
  undefined1 uStack_1363;
  undefined1 uStack_1362;
  undefined1 uStack_1361;
  undefined1 uStack_1360;
  undefined1 uStack_135f;
  undefined1 uStack_135e;
  undefined1 uStack_135d;
  undefined1 uStack_135c;
  undefined1 uStack_135b;
  undefined1 uStack_135a;
  undefined1 uStack_1359;
  undefined1 local_1358 [16];
  undefined1 local_1348;
  undefined1 uStack_1347;
  undefined1 uStack_1346;
  undefined1 uStack_1345;
  undefined1 uStack_1344;
  undefined1 uStack_1343;
  undefined1 uStack_1342;
  undefined1 uStack_1341;
  undefined1 uStack_1340;
  undefined1 uStack_133f;
  undefined1 uStack_133e;
  undefined1 uStack_133d;
  undefined1 uStack_133c;
  undefined1 uStack_133b;
  undefined1 uStack_133a;
  undefined1 uStack_1339;
  undefined8 local_1338 [2];
  undefined1 local_1328;
  undefined1 uStack_1327;
  undefined1 uStack_1326;
  undefined1 uStack_1325;
  undefined1 uStack_1324;
  undefined1 uStack_1323;
  undefined1 uStack_1322;
  undefined1 uStack_1321;
  undefined1 uStack_1320;
  undefined1 uStack_131f;
  undefined1 uStack_131e;
  undefined1 uStack_131d;
  undefined1 uStack_131c;
  undefined1 uStack_131b;
  undefined1 uStack_131a;
  undefined1 uStack_1319;
  undefined1 local_1318 [16];
  undefined1 local_1308;
  undefined1 uStack_1307;
  undefined1 uStack_1306;
  undefined1 uStack_1305;
  undefined1 uStack_1304;
  undefined1 uStack_1303;
  undefined1 uStack_1302;
  undefined1 uStack_1301;
  undefined1 uStack_1300;
  undefined1 uStack_12ff;
  undefined1 uStack_12fe;
  undefined1 uStack_12fd;
  undefined1 uStack_12fc;
  undefined1 uStack_12fb;
  undefined1 uStack_12fa;
  undefined1 uStack_12f9;
  undefined1 local_12f8 [16];
  undefined1 local_12e8;
  undefined1 uStack_12e7;
  undefined1 uStack_12e6;
  undefined1 uStack_12e5;
  undefined1 uStack_12e4;
  undefined1 uStack_12e3;
  undefined1 uStack_12e2;
  undefined1 uStack_12e1;
  undefined1 uStack_12e0;
  undefined1 uStack_12df;
  undefined1 uStack_12de;
  undefined1 uStack_12dd;
  undefined1 uStack_12dc;
  undefined1 uStack_12db;
  undefined1 uStack_12da;
  undefined1 uStack_12d9;
  undefined1 local_12d8 [16];
  undefined1 local_12c8;
  undefined1 uStack_12c7;
  undefined1 uStack_12c6;
  undefined1 uStack_12c5;
  undefined1 uStack_12c4;
  undefined1 uStack_12c3;
  undefined1 uStack_12c2;
  undefined1 uStack_12c1;
  undefined1 uStack_12c0;
  undefined1 uStack_12bf;
  undefined1 uStack_12be;
  undefined1 uStack_12bd;
  undefined1 uStack_12bc;
  undefined1 uStack_12bb;
  undefined1 uStack_12ba;
  undefined1 uStack_12b9;
  undefined1 local_12b8 [16];
  undefined1 local_12a8;
  undefined1 uStack_12a7;
  undefined1 uStack_12a6;
  undefined1 uStack_12a5;
  undefined1 uStack_12a4;
  undefined1 uStack_12a3;
  undefined1 uStack_12a2;
  undefined1 uStack_12a1;
  undefined1 uStack_12a0;
  undefined1 uStack_129f;
  undefined1 uStack_129e;
  undefined1 uStack_129d;
  undefined1 uStack_129c;
  undefined1 uStack_129b;
  undefined1 uStack_129a;
  undefined1 uStack_1299;
  undefined1 local_1298 [16];
  undefined1 local_1288;
  undefined1 uStack_1287;
  undefined1 uStack_1286;
  undefined1 uStack_1285;
  undefined1 uStack_1284;
  undefined1 uStack_1283;
  undefined1 uStack_1282;
  undefined1 uStack_1281;
  undefined1 uStack_1280;
  undefined1 uStack_127f;
  undefined1 uStack_127e;
  undefined1 uStack_127d;
  undefined1 uStack_127c;
  undefined1 uStack_127b;
  undefined1 uStack_127a;
  undefined1 uStack_1279;
  undefined1 local_1278 [16];
  undefined1 local_1268;
  undefined1 uStack_1267;
  undefined1 uStack_1266;
  undefined1 uStack_1265;
  undefined1 uStack_1264;
  undefined1 uStack_1263;
  undefined1 uStack_1262;
  undefined1 uStack_1261;
  undefined1 uStack_1260;
  undefined1 uStack_125f;
  undefined1 uStack_125e;
  undefined1 uStack_125d;
  undefined1 uStack_125c;
  undefined1 uStack_125b;
  undefined1 uStack_125a;
  undefined1 uStack_1259;
  undefined1 local_1258 [16];
  undefined1 local_1248;
  undefined1 uStack_1247;
  undefined1 uStack_1246;
  undefined1 uStack_1245;
  undefined1 uStack_1244;
  undefined1 uStack_1243;
  undefined1 uStack_1242;
  undefined1 uStack_1241;
  undefined1 uStack_1240;
  undefined1 uStack_123f;
  undefined1 uStack_123e;
  undefined1 uStack_123d;
  undefined1 uStack_123c;
  undefined1 uStack_123b;
  undefined1 uStack_123a;
  undefined1 uStack_1239;
  undefined8 local_1238 [4];
  undefined4 local_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1200;
  undefined4 uStack_11fc;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined4 local_11d8;
  undefined4 uStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c0;
  undefined4 uStack_11bc;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined4 local_1198;
  undefined4 uStack_1194;
  undefined4 uStack_1190;
  undefined4 uStack_118c;
  undefined4 uStack_1180;
  undefined4 uStack_117c;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined4 local_1158;
  undefined4 uStack_1154;
  undefined4 uStack_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined8 local_1138;
  undefined8 auStack_1130 [3];
  undefined4 local_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c0;
  undefined4 uStack_10bc;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  undefined1 local_f78 [16];
  undefined1 local_f68 [16];
  undefined1 local_f58 [16];
  undefined1 local_f48 [2] [16];
  undefined1 local_f28;
  undefined1 uStack_f27;
  undefined1 uStack_f26;
  undefined1 uStack_f25;
  undefined1 uStack_f24;
  undefined1 uStack_f23;
  undefined1 uStack_f22;
  undefined1 uStack_f21;
  undefined1 uStack_f20;
  undefined1 uStack_f1f;
  undefined1 uStack_f1e;
  undefined1 uStack_f1d;
  undefined1 uStack_f1c;
  undefined1 uStack_f1b;
  undefined1 uStack_f1a;
  undefined1 uStack_f19;
  undefined1 local_f18 [16];
  undefined1 local_f08;
  undefined1 uStack_f07;
  undefined1 uStack_f06;
  undefined1 uStack_f05;
  undefined1 uStack_f04;
  undefined1 uStack_f03;
  undefined1 uStack_f02;
  undefined1 uStack_f01;
  undefined1 uStack_f00;
  undefined1 uStack_eff;
  undefined1 uStack_efe;
  undefined1 uStack_efd;
  undefined1 uStack_efc;
  undefined1 uStack_efb;
  undefined1 uStack_efa;
  undefined1 uStack_ef9;
  undefined1 local_ef8 [16];
  undefined1 local_ee8;
  undefined1 uStack_ee7;
  undefined1 uStack_ee6;
  undefined1 uStack_ee5;
  undefined1 uStack_ee4;
  undefined1 uStack_ee3;
  undefined1 uStack_ee2;
  undefined1 uStack_ee1;
  undefined1 uStack_ee0;
  undefined1 uStack_edf;
  undefined1 uStack_ede;
  undefined1 uStack_edd;
  undefined1 uStack_edc;
  undefined1 uStack_edb;
  undefined1 uStack_eda;
  undefined1 uStack_ed9;
  undefined1 local_ed8 [16];
  undefined1 local_ec8;
  undefined1 uStack_ec7;
  undefined1 uStack_ec6;
  undefined1 uStack_ec5;
  undefined1 uStack_ec4;
  undefined1 uStack_ec3;
  undefined1 uStack_ec2;
  undefined1 uStack_ec1;
  undefined1 uStack_ec0;
  undefined1 uStack_ebf;
  undefined1 uStack_ebe;
  undefined1 uStack_ebd;
  undefined1 uStack_ebc;
  undefined1 uStack_ebb;
  undefined1 uStack_eba;
  undefined1 uStack_eb9;
  undefined1 local_eb8 [16];
  undefined1 local_ea8;
  undefined1 uStack_ea7;
  undefined1 uStack_ea6;
  undefined1 uStack_ea5;
  undefined1 uStack_ea4;
  undefined1 uStack_ea3;
  undefined1 uStack_ea2;
  undefined1 uStack_ea1;
  undefined1 uStack_ea0;
  undefined1 uStack_e9f;
  undefined1 uStack_e9e;
  undefined1 uStack_e9d;
  undefined1 uStack_e9c;
  undefined1 uStack_e9b;
  undefined1 uStack_e9a;
  undefined1 uStack_e99;
  undefined1 local_e98 [16];
  undefined1 local_e88;
  undefined1 uStack_e87;
  undefined1 uStack_e86;
  undefined1 uStack_e85;
  undefined1 uStack_e84;
  undefined1 uStack_e83;
  undefined1 uStack_e82;
  undefined1 uStack_e81;
  undefined1 uStack_e80;
  undefined1 uStack_e7f;
  undefined1 uStack_e7e;
  undefined1 uStack_e7d;
  undefined1 uStack_e7c;
  undefined1 uStack_e7b;
  undefined1 uStack_e7a;
  undefined1 uStack_e79;
  undefined1 local_e78 [16];
  undefined1 local_e68;
  undefined1 uStack_e67;
  undefined1 uStack_e66;
  undefined1 uStack_e65;
  undefined1 uStack_e64;
  undefined1 uStack_e63;
  undefined1 uStack_e62;
  undefined1 uStack_e61;
  undefined1 uStack_e60;
  undefined1 uStack_e5f;
  undefined1 uStack_e5e;
  undefined1 uStack_e5d;
  undefined1 uStack_e5c;
  undefined1 uStack_e5b;
  undefined1 uStack_e5a;
  undefined1 uStack_e59;
  undefined1 local_e58 [16];
  undefined1 local_e48;
  undefined1 uStack_e47;
  undefined1 uStack_e46;
  undefined1 uStack_e45;
  undefined1 uStack_e44;
  undefined1 uStack_e43;
  undefined1 uStack_e42;
  undefined1 uStack_e41;
  undefined1 uStack_e40;
  undefined1 uStack_e3f;
  undefined1 uStack_e3e;
  undefined1 uStack_e3d;
  undefined1 uStack_e3c;
  undefined1 uStack_e3b;
  undefined1 uStack_e3a;
  undefined1 uStack_e39;
  undefined1 auVar332 [16];
  undefined1 auVar341 [16];
  undefined1 auVar350 [16];
  undefined1 auVar359 [16];
  undefined1 auVar368 [16];
  undefined1 auVar385 [16];
  undefined1 auVar413 [16];
  undefined1 auVar421 [16];
  undefined1 auVar430 [16];
  undefined1 auVar439 [16];
  undefined1 auVar333 [16];
  undefined1 auVar342 [16];
  undefined1 auVar351 [16];
  undefined1 auVar360 [16];
  undefined1 auVar369 [16];
  undefined6 uVar266;
  undefined1 auVar386 [16];
  undefined1 auVar414 [16];
  undefined1 auVar422 [16];
  undefined1 auVar431 [16];
  undefined1 auVar440 [16];
  undefined1 auVar280 [16];
  undefined1 auVar289 [16];
  undefined1 auVar297 [16];
  undefined1 auVar302 [16];
  undefined1 auVar312 [16];
  undefined1 auVar321 [16];
  undefined1 auVar334 [16];
  undefined1 auVar343 [16];
  undefined1 auVar352 [16];
  undefined1 auVar361 [16];
  undefined1 auVar370 [16];
  undefined1 auVar375 [16];
  undefined8 uVar267;
  undefined1 auVar387 [16];
  undefined1 auVar393 [16];
  undefined1 auVar402 [16];
  undefined1 auVar415 [16];
  undefined1 auVar423 [16];
  undefined1 auVar432 [16];
  undefined1 auVar441 [16];
  undefined1 auVar449 [16];
  undefined1 auVar281 [16];
  undefined1 auVar290 [16];
  undefined1 auVar303 [16];
  undefined1 auVar313 [16];
  undefined1 auVar322 [16];
  undefined1 auVar376 [16];
  undefined1 auVar394 [16];
  undefined1 auVar403 [16];
  undefined1 auVar450 [16];
  undefined1 auVar282 [16];
  undefined1 auVar291 [16];
  undefined1 auVar298 [16];
  undefined1 auVar304 [16];
  undefined1 auVar314 [16];
  undefined1 auVar323 [16];
  undefined1 auVar335 [16];
  undefined1 auVar344 [16];
  undefined1 auVar353 [16];
  undefined1 auVar362 [16];
  undefined1 auVar371 [16];
  undefined1 auVar378 [16];
  undefined1 auVar271 [12];
  undefined1 auVar388 [16];
  undefined1 auVar395 [16];
  undefined1 auVar404 [16];
  undefined1 auVar416 [16];
  undefined1 auVar424 [16];
  undefined1 auVar433 [16];
  undefined1 auVar442 [16];
  undefined1 auVar451 [16];
  undefined1 auVar283 [16];
  undefined1 auVar292 [16];
  undefined1 auVar305 [16];
  undefined1 auVar315 [16];
  undefined1 auVar324 [16];
  undefined1 auVar396 [16];
  undefined1 auVar405 [16];
  undefined1 auVar452 [16];
  undefined1 auVar284 [16];
  undefined1 auVar293 [16];
  undefined1 auVar299 [16];
  undefined1 auVar306 [16];
  undefined1 auVar309 [16];
  undefined1 auVar316 [16];
  undefined1 auVar325 [16];
  undefined1 auVar328 [16];
  undefined1 auVar336 [16];
  undefined1 auVar345 [16];
  undefined1 auVar354 [16];
  undefined1 auVar363 [16];
  undefined1 auVar372 [16];
  undefined1 auVar379 [16];
  undefined1 auVar277 [14];
  undefined1 auVar381 [16];
  undefined1 auVar389 [16];
  undefined1 auVar397 [16];
  undefined1 auVar400 [16];
  undefined1 auVar406 [16];
  undefined1 auVar409 [16];
  undefined1 auVar417 [16];
  undefined1 auVar425 [16];
  undefined1 auVar434 [16];
  undefined1 auVar443 [16];
  undefined1 auVar446 [16];
  undefined1 auVar453 [16];
  undefined1 auVar456 [16];
  undefined1 auVar285 [16];
  undefined1 auVar294 [16];
  undefined1 auVar307 [16];
  undefined1 auVar317 [16];
  undefined1 auVar326 [16];
  undefined1 auVar398 [16];
  undefined1 auVar407 [16];
  undefined1 auVar454 [16];
  undefined1 auVar286 [16];
  undefined1 auVar295 [16];
  undefined1 auVar308 [16];
  undefined1 auVar318 [16];
  undefined1 auVar327 [16];
  undefined1 auVar380 [16];
  undefined1 auVar399 [16];
  undefined1 auVar408 [16];
  undefined1 auVar455 [16];
  undefined1 auVar288 [16];
  undefined1 auVar374 [16];
  undefined1 auVar544 [16];
  undefined1 auVar561 [16];
  undefined1 auVar578 [16];
  undefined1 auVar595 [16];
  undefined1 auVar612 [16];
  undefined6 uVar459;
  undefined1 auVar633 [16];
  undefined1 auVar666 [16];
  undefined1 auVar682 [16];
  undefined1 auVar699 [16];
  undefined1 auVar715 [16];
  undefined1 auVar518 [16];
  undefined1 auVar527 [16];
  undefined1 auVar545 [16];
  undefined1 auVar562 [16];
  undefined1 auVar572 [16];
  undefined1 auVar579 [16];
  undefined1 auVar589 [16];
  undefined1 auVar596 [16];
  undefined1 auVar606 [16];
  undefined1 auVar613 [16];
  undefined8 uVar460;
  undefined1 auVar634 [16];
  undefined1 auVar639 [16];
  undefined1 auVar649 [16];
  undefined1 auVar667 [16];
  undefined1 auVar683 [16];
  undefined1 auVar693 [16];
  undefined1 auVar700 [16];
  undefined1 auVar716 [16];
  undefined1 auVar723 [16];
  undefined1 auVar732 [16];
  undefined1 auVar503 [16];
  undefined1 auVar510 [16];
  undefined1 auVar519 [16];
  undefined1 auVar528 [16];
  undefined1 auVar620 [16];
  undefined1 auVar640 [16];
  undefined1 auVar650 [16];
  undefined1 auVar724 [16];
  undefined1 auVar733 [16];
  undefined1 auVar504 [16];
  undefined1 auVar511 [16];
  undefined1 auVar520 [16];
  undefined1 auVar529 [16];
  undefined1 auVar536 [16];
  undefined1 auVar539 [16];
  undefined1 auVar546 [16];
  undefined1 auVar553 [16];
  undefined1 auVar556 [16];
  undefined1 auVar563 [16];
  undefined1 auVar569 [16];
  undefined1 auVar573 [16];
  undefined1 auVar580 [16];
  undefined1 auVar586 [16];
  undefined1 auVar590 [16];
  undefined1 auVar597 [16];
  undefined1 auVar603 [16];
  undefined1 auVar607 [16];
  undefined1 auVar614 [16];
  undefined1 auVar621 [16];
  undefined1 auVar475 [12];
  undefined1 auVar629 [16];
  undefined1 auVar635 [16];
  undefined1 auVar641 [16];
  undefined1 auVar651 [16];
  undefined1 auVar658 [16];
  undefined1 auVar661 [16];
  undefined1 auVar668 [16];
  undefined1 auVar674 [16];
  undefined1 auVar677 [16];
  undefined1 auVar684 [16];
  undefined1 auVar690 [16];
  undefined1 auVar694 [16];
  undefined1 auVar701 [16];
  undefined1 auVar707 [16];
  undefined1 auVar710 [16];
  undefined1 auVar717 [16];
  undefined1 auVar725 [16];
  undefined1 auVar734 [16];
  undefined1 auVar505 [16];
  undefined1 auVar512 [16];
  undefined1 auVar521 [16];
  undefined1 auVar530 [16];
  undefined1 auVar622 [16];
  undefined1 auVar642 [16];
  undefined1 auVar652 [16];
  undefined1 auVar726 [16];
  undefined1 auVar735 [16];
  undefined1 auVar506 [16];
  undefined1 auVar513 [16];
  undefined1 auVar522 [16];
  undefined1 auVar525 [16];
  undefined1 auVar490 [14];
  undefined1 auVar531 [16];
  undefined1 auVar534 [16];
  undefined1 auVar537 [16];
  undefined1 auVar540 [16];
  undefined1 auVar491 [14];
  undefined1 auVar547 [16];
  undefined1 auVar549 [16];
  undefined1 auVar554 [16];
  undefined1 auVar557 [16];
  undefined1 auVar492 [14];
  undefined1 auVar564 [16];
  undefined1 auVar566 [16];
  undefined1 auVar570 [16];
  undefined1 auVar574 [16];
  undefined1 auVar493 [14];
  undefined1 auVar581 [16];
  undefined1 auVar583 [16];
  undefined1 auVar587 [16];
  undefined1 auVar591 [16];
  undefined1 auVar494 [14];
  undefined1 auVar598 [16];
  undefined1 auVar600 [16];
  undefined1 auVar604 [16];
  undefined1 auVar608 [16];
  undefined1 auVar495 [14];
  undefined1 auVar615 [16];
  undefined1 auVar617 [16];
  undefined1 auVar623 [16];
  undefined1 auVar496 [14];
  undefined1 auVar630 [16];
  undefined1 auVar497 [14];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar643 [16];
  undefined1 auVar646 [16];
  undefined1 auVar653 [16];
  undefined1 auVar656 [16];
  undefined1 auVar659 [16];
  undefined1 auVar662 [16];
  undefined1 auVar498 [14];
  undefined1 auVar669 [16];
  undefined1 auVar671 [16];
  undefined1 auVar675 [16];
  undefined1 auVar678 [16];
  undefined1 auVar499 [14];
  undefined1 auVar685 [16];
  undefined1 auVar687 [16];
  undefined1 auVar691 [16];
  undefined1 auVar695 [16];
  undefined1 auVar500 [14];
  undefined1 auVar702 [16];
  undefined1 auVar704 [16];
  undefined1 auVar708 [16];
  undefined1 auVar711 [16];
  undefined1 auVar501 [14];
  undefined1 auVar718 [16];
  undefined1 auVar720 [16];
  undefined1 auVar727 [16];
  undefined1 auVar730 [16];
  undefined1 auVar736 [16];
  undefined1 auVar739 [16];
  undefined1 auVar507 [16];
  undefined1 auVar514 [16];
  undefined1 auVar523 [16];
  undefined1 auVar532 [16];
  undefined1 auVar624 [16];
  undefined1 auVar644 [16];
  undefined1 auVar654 [16];
  undefined1 auVar728 [16];
  undefined1 auVar737 [16];
  undefined1 auVar508 [16];
  undefined1 auVar515 [16];
  undefined1 auVar524 [16];
  undefined1 auVar533 [16];
  undefined1 auVar542 [16];
  undefined1 auVar559 [16];
  undefined1 auVar576 [16];
  undefined1 auVar593 [16];
  undefined1 auVar610 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar631 [16];
  undefined1 auVar645 [16];
  undefined1 auVar655 [16];
  undefined1 auVar664 [16];
  undefined1 auVar680 [16];
  undefined1 auVar697 [16];
  undefined1 auVar713 [16];
  undefined1 auVar729 [16];
  undefined1 auVar738 [16];
  undefined1 auVar810 [16];
  undefined1 auVar817 [16];
  undefined1 auVar825 [16];
  undefined1 auVar833 [16];
  undefined1 auVar841 [16];
  undefined1 auVar869 [16];
  undefined1 auVar876 [16];
  undefined1 auVar884 [16];
  undefined1 auVar891 [16];
  undefined1 auVar811 [16];
  undefined1 auVar818 [16];
  undefined1 auVar826 [16];
  undefined1 auVar834 [16];
  undefined1 auVar842 [16];
  undefined6 uVar742;
  undefined1 auVar870 [16];
  undefined1 auVar877 [16];
  undefined1 auVar885 [16];
  undefined1 auVar892 [16];
  undefined1 auVar776 [16];
  undefined1 auVar795 [16];
  undefined1 auVar799 [16];
  undefined1 auVar812 [16];
  undefined1 auVar819 [16];
  undefined1 auVar827 [16];
  undefined1 auVar835 [16];
  undefined1 auVar843 [16];
  undefined8 uVar743;
  undefined1 auVar851 [16];
  undefined1 auVar859 [16];
  undefined1 auVar754 [12];
  undefined1 auVar871 [16];
  undefined1 auVar878 [16];
  undefined1 auVar886 [16];
  undefined1 auVar893 [16];
  undefined1 auVar898 [16];
  undefined1 auVar777 [16];
  undefined1 auVar787 [16];
  undefined1 auVar800 [16];
  undefined1 auVar852 [16];
  undefined1 auVar860 [16];
  undefined1 auVar899 [16];
  undefined1 auVar773 [16];
  undefined1 auVar778 [16];
  undefined1 auVar784 [16];
  undefined1 auVar788 [16];
  undefined1 auVar796 [16];
  undefined1 auVar801 [16];
  undefined1 auVar813 [16];
  undefined1 auVar820 [16];
  undefined1 auVar828 [16];
  undefined1 auVar836 [16];
  undefined1 auVar844 [16];
  undefined1 auVar750 [12];
  undefined1 auVar853 [16];
  undefined1 auVar861 [16];
  undefined1 auVar872 [16];
  undefined1 auVar879 [16];
  undefined1 auVar887 [16];
  undefined1 auVar894 [16];
  undefined1 auVar900 [16];
  undefined1 auVar779 [16];
  undefined1 auVar789 [16];
  undefined1 auVar802 [16];
  undefined1 auVar854 [16];
  undefined1 auVar862 [16];
  undefined1 auVar901 [16];
  undefined1 auVar774 [16];
  undefined1 auVar780 [16];
  undefined1 auVar785 [16];
  undefined1 auVar790 [16];
  undefined1 auVar797 [16];
  undefined1 auVar803 [16];
  undefined1 auVar806 [16];
  undefined1 auVar761 [14];
  undefined1 auVar814 [16];
  undefined1 auVar762 [14];
  undefined1 auVar821 [16];
  undefined1 auVar763 [14];
  undefined1 auVar829 [16];
  undefined1 auVar764 [14];
  undefined1 auVar837 [16];
  undefined1 auVar765 [14];
  undefined1 auVar845 [16];
  undefined1 auVar766 [14];
  undefined1 auVar847 [16];
  undefined1 auVar767 [14];
  undefined1 auVar855 [16];
  undefined1 auVar863 [16];
  undefined1 auVar866 [16];
  undefined1 auVar768 [14];
  undefined1 auVar873 [16];
  undefined1 auVar769 [14];
  undefined1 auVar880 [16];
  undefined1 auVar770 [14];
  undefined1 auVar888 [16];
  undefined1 auVar771 [14];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar902 [16];
  undefined1 auVar905 [16];
  undefined1 auVar781 [16];
  undefined1 auVar791 [16];
  undefined1 auVar804 [16];
  undefined1 auVar856 [16];
  undefined1 auVar864 [16];
  undefined1 auVar903 [16];
  undefined1 auVar782 [16];
  undefined1 auVar792 [16];
  undefined1 auVar805 [16];
  undefined1 auVar808 [16];
  undefined1 auVar815 [16];
  undefined1 auVar823 [16];
  undefined1 auVar831 [16];
  undefined1 auVar839 [16];
  undefined1 auVar846 [16];
  undefined1 auVar849 [16];
  undefined1 auVar857 [16];
  undefined1 auVar865 [16];
  undefined1 auVar867 [16];
  undefined1 auVar874 [16];
  undefined1 auVar882 [16];
  undefined1 auVar889 [16];
  undefined1 auVar904 [16];
  undefined1 auVar775 [16];
  undefined1 auVar980 [16];
  undefined1 auVar996 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1041 [16];
  undefined6 uVar909;
  undefined1 auVar1085 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar970 [16];
  undefined1 auVar981 [16];
  undefined1 auVar986 [16];
  undefined1 auVar997 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1042 [16];
  undefined8 uVar910;
  undefined1 auVar1047 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar925 [12];
  undefined1 auVar1075 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar947 [16];
  undefined1 auVar954 [16];
  undefined1 auVar962 [16];
  undefined1 auVar971 [16];
  undefined1 auVar987 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar948 [16];
  undefined1 auVar955 [16];
  undefined1 auVar963 [16];
  undefined1 auVar972 [16];
  undefined1 auVar982 [16];
  undefined1 auVar988 [16];
  undefined1 auVar998 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar922 [12];
  undefined1 auVar1049 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar949 [16];
  undefined1 auVar956 [16];
  undefined1 auVar964 [16];
  undefined1 auVar973 [16];
  undefined1 auVar989 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar950 [16];
  undefined1 auVar957 [16];
  undefined1 auVar934 [14];
  undefined1 auVar965 [16];
  undefined1 auVar974 [16];
  undefined1 auVar977 [16];
  undefined1 auVar935 [14];
  undefined1 auVar983 [16];
  undefined1 auVar990 [16];
  undefined1 auVar993 [16];
  undefined1 auVar936 [14];
  undefined1 auVar999 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar937 [14];
  undefined1 auVar1014 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar938 [14];
  undefined1 auVar1029 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar939 [14];
  undefined1 auVar1044 [16];
  undefined1 auVar940 [14];
  undefined1 auVar1051 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar941 [14];
  undefined1 auVar1060 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar942 [14];
  undefined1 auVar1088 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar943 [14];
  undefined1 auVar1103 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar944 [14];
  undefined1 auVar1118 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar945 [14];
  undefined1 auVar1133 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar951 [16];
  undefined1 auVar958 [16];
  undefined1 auVar966 [16];
  undefined1 auVar975 [16];
  undefined1 auVar991 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar952 [16];
  undefined1 auVar959 [16];
  undefined1 auVar967 [16];
  undefined1 auVar976 [16];
  undefined1 auVar978 [16];
  undefined1 auVar992 [16];
  undefined1 auVar994 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1202 [16];
  undefined1 auVar1211 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1264 [16];
  undefined1 auVar1275 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1295 [16];
  undefined1 auVar1305 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1265 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1296 [16];
  undefined1 auVar1306 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1266 [16];
  undefined1 auVar1277 [16];
  undefined1 auVar1287 [16];
  undefined1 auVar1297 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1192 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1278 [16];
  undefined1 auVar1288 [16];
  undefined1 auVar1298 [16];
  undefined1 auVar1308 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1193 [16];
  undefined1 auVar1163 [14];
  undefined1 auVar1206 [16];
  undefined1 auVar1164 [14];
  undefined1 auVar1215 [16];
  undefined1 auVar1165 [14];
  undefined1 auVar1224 [16];
  undefined1 auVar1166 [14];
  undefined1 auVar1234 [16];
  undefined1 auVar1167 [14];
  undefined1 auVar1245 [16];
  undefined1 auVar1252 [16];
  undefined1 auVar1259 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1168 [14];
  undefined1 auVar1279 [16];
  undefined1 auVar1169 [14];
  undefined1 auVar1289 [16];
  undefined1 auVar1170 [14];
  undefined1 auVar1299 [16];
  undefined1 auVar1171 [14];
  undefined1 auVar1309 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1318 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1194 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1280 [16];
  undefined1 auVar1290 [16];
  undefined1 auVar1300 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1195 [16];
  undefined1 auVar1196 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1282 [16];
  undefined1 auVar1291 [16];
  undefined1 auVar1292 [16];
  undefined1 auVar1301 [16];
  undefined1 auVar1302 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1371 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1372 [16];
  undefined1 auVar1376 [16];
  undefined1 auVar1411 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1377 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1412 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1353 [16];
  undefined1 auVar1358 [16];
  undefined1 auVar1361 [16];
  undefined1 auVar1364 [16];
  undefined1 auVar1367 [16];
  undefined1 auVar1373 [16];
  undefined1 auVar1378 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1413 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1347 [16];
  undefined1 auVar1379 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1414 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1348 [16];
  undefined1 auVar1351 [16];
  undefined1 auVar1354 [16];
  undefined1 auVar1359 [16];
  undefined1 auVar1362 [16];
  undefined1 auVar1365 [16];
  undefined1 auVar1368 [16];
  undefined1 auVar1374 [16];
  undefined1 auVar1380 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1415 [16];
  undefined1 auVar1418 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1349 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1408 [16];
  undefined1 auVar1416 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1350 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1409 [16];
  undefined1 auVar1417 [16];
  undefined6 uVar1427;
  undefined8 uVar1428;
  undefined1 auVar1461 [16];
  undefined1 auVar1481 [16];
  undefined1 auVar1488 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1462 [16];
  undefined1 auVar1429 [12];
  undefined1 auVar1482 [16];
  undefined1 auVar1489 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1463 [16];
  undefined1 auVar1483 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1449 [14];
  undefined1 auVar1468 [16];
  undefined1 auVar1450 [14];
  undefined1 auVar1470 [16];
  undefined1 auVar1451 [14];
  undefined1 auVar1472 [16];
  undefined1 auVar1452 [14];
  undefined1 auVar1474 [16];
  undefined1 auVar1453 [14];
  undefined1 auVar1476 [16];
  undefined1 auVar1454 [14];
  undefined1 auVar1479 [16];
  undefined1 auVar1484 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1455 [14];
  undefined1 auVar1495 [16];
  undefined1 auVar1456 [14];
  undefined1 auVar1497 [16];
  undefined1 auVar1457 [14];
  undefined1 auVar1499 [16];
  undefined1 auVar1458 [14];
  undefined1 auVar1501 [16];
  undefined1 auVar1506 [16];
  undefined1 auVar1465 [16];
  undefined1 auVar1485 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1507 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1467 [16];
  undefined1 auVar1469 [16];
  undefined1 auVar1471 [16];
  undefined1 auVar1473 [16];
  undefined1 auVar1475 [16];
  undefined1 auVar1478 [16];
  undefined1 auVar1486 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1508 [16];
  undefined1 auVar1555 [16];
  undefined1 auVar1511 [16];
  undefined1 auVar1519 [16];
  undefined1 auVar1527 [16];
  undefined1 auVar1534 [16];
  undefined1 auVar1541 [16];
  undefined1 auVar1548 [16];
  undefined1 auVar1556 [16];
  undefined1 auVar1565 [16];
  undefined1 auVar1572 [16];
  undefined1 auVar1579 [16];
  undefined1 auVar1586 [16];
  undefined1 auVar1593 [16];
  undefined1 auVar1600 [16];
  undefined1 auVar1607 [16];
  undefined1 auVar1614 [16];
  undefined1 auVar1512 [16];
  undefined1 auVar1520 [16];
  undefined1 auVar1528 [16];
  undefined1 auVar1535 [16];
  undefined1 auVar1542 [16];
  undefined1 auVar1549 [16];
  undefined1 auVar1557 [16];
  undefined1 auVar1566 [16];
  undefined1 auVar1573 [16];
  undefined1 auVar1580 [16];
  undefined1 auVar1587 [16];
  undefined1 auVar1594 [16];
  undefined1 auVar1601 [16];
  undefined1 auVar1608 [16];
  undefined1 auVar1615 [16];
  undefined1 auVar1513 [16];
  undefined1 auVar1521 [16];
  undefined1 auVar1529 [16];
  undefined1 auVar1536 [16];
  undefined1 auVar1543 [16];
  undefined1 auVar1550 [16];
  undefined1 auVar1558 [16];
  undefined1 auVar1567 [16];
  undefined1 auVar1574 [16];
  undefined1 auVar1581 [16];
  undefined1 auVar1588 [16];
  undefined1 auVar1595 [16];
  undefined1 auVar1602 [16];
  undefined1 auVar1609 [16];
  undefined1 auVar1616 [16];
  undefined1 auVar1514 [16];
  undefined1 auVar1522 [16];
  undefined1 auVar1530 [16];
  undefined1 auVar1537 [16];
  undefined1 auVar1544 [16];
  undefined1 auVar1551 [16];
  undefined1 auVar1559 [16];
  undefined1 auVar1562 [16];
  undefined1 auVar1568 [16];
  undefined1 auVar1575 [16];
  undefined1 auVar1582 [16];
  undefined1 auVar1589 [16];
  undefined1 auVar1596 [16];
  undefined1 auVar1603 [16];
  undefined1 auVar1610 [16];
  undefined1 auVar1617 [16];
  undefined1 auVar1515 [16];
  undefined1 auVar1523 [16];
  undefined1 auVar1531 [16];
  undefined1 auVar1538 [16];
  undefined1 auVar1545 [16];
  undefined1 auVar1552 [16];
  undefined1 auVar1560 [16];
  undefined1 auVar1569 [16];
  undefined1 auVar1576 [16];
  undefined1 auVar1583 [16];
  undefined1 auVar1590 [16];
  undefined1 auVar1597 [16];
  undefined1 auVar1604 [16];
  undefined1 auVar1611 [16];
  undefined1 auVar1618 [16];
  undefined1 auVar1516 [16];
  undefined1 auVar1524 [16];
  undefined1 auVar1532 [16];
  undefined1 auVar1539 [16];
  undefined1 auVar1546 [16];
  undefined1 auVar1553 [16];
  undefined1 auVar1561 [16];
  undefined1 auVar1570 [16];
  undefined1 auVar1577 [16];
  undefined1 auVar1584 [16];
  undefined1 auVar1591 [16];
  undefined1 auVar1598 [16];
  undefined1 auVar1605 [16];
  undefined1 auVar1612 [16];
  undefined1 auVar1619 [16];
  undefined1 auVar1651 [16];
  undefined1 auVar1659 [16];
  undefined1 auVar1667 [16];
  undefined1 auVar1675 [16];
  undefined1 auVar1683 [16];
  undefined1 auVar1697 [16];
  undefined1 auVar1704 [16];
  undefined1 auVar1712 [16];
  undefined1 auVar1720 [16];
  undefined1 auVar1731 [16];
  undefined1 auVar1652 [16];
  undefined1 auVar1660 [16];
  undefined1 auVar1668 [16];
  undefined1 auVar1676 [16];
  undefined1 auVar1684 [16];
  undefined1 auVar1705 [16];
  undefined1 auVar1713 [16];
  undefined1 auVar1721 [16];
  undefined1 auVar1732 [16];
  undefined1 auVar1645 [16];
  undefined1 auVar1653 [16];
  undefined1 auVar1661 [16];
  undefined1 auVar1669 [16];
  undefined1 auVar1677 [16];
  undefined1 auVar1685 [16];
  undefined1 auVar1694 [16];
  undefined1 auVar1698 [16];
  undefined1 auVar1706 [16];
  undefined1 auVar1714 [16];
  undefined1 auVar1722 [16];
  undefined1 auVar1733 [16];
  undefined1 auVar1742 [16];
  undefined1 auVar1748 [16];
  undefined1 auVar1654 [16];
  undefined1 auVar1662 [16];
  undefined1 auVar1670 [16];
  undefined1 auVar1678 [16];
  undefined1 auVar1686 [16];
  undefined1 auVar1707 [16];
  undefined1 auVar1715 [16];
  undefined1 auVar1723 [16];
  undefined1 auVar1734 [16];
  undefined1 auVar1646 [16];
  undefined1 auVar1655 [16];
  undefined1 auVar1663 [16];
  undefined1 auVar1671 [16];
  undefined1 auVar1679 [16];
  undefined1 auVar1687 [16];
  undefined1 auVar1695 [16];
  undefined1 auVar1699 [16];
  undefined1 auVar1708 [16];
  undefined1 auVar1716 [16];
  undefined1 auVar1724 [16];
  undefined1 auVar1735 [16];
  undefined1 auVar1743 [16];
  undefined1 auVar1749 [16];
  undefined1 auVar1656 [16];
  undefined1 auVar1664 [16];
  undefined1 auVar1672 [16];
  undefined1 auVar1680 [16];
  undefined1 auVar1688 [16];
  undefined1 auVar1709 [16];
  undefined1 auVar1717 [16];
  undefined1 auVar1725 [16];
  undefined1 auVar1736 [16];
  undefined1 auVar1657 [16];
  undefined1 auVar1665 [16];
  undefined1 auVar1673 [16];
  undefined1 auVar1681 [16];
  undefined1 auVar1689 [16];
  undefined1 auVar1710 [16];
  undefined1 auVar1718 [16];
  undefined1 auVar1726 [16];
  undefined1 auVar1737 [16];
  undefined6 uVar1751;
  undefined8 uVar1752;
  undefined1 auVar1790 [16];
  undefined1 auVar1781 [16];
  undefined1 auVar1753 [12];
  undefined1 auVar1791 [16];
  undefined1 auVar1798 [16];
  undefined1 auVar1801 [16];
  undefined1 auVar1813 [16];
  undefined1 auVar1816 [16];
  undefined1 auVar1792 [16];
  undefined1 auVar1782 [16];
  undefined1 auVar1771 [14];
  undefined1 auVar1784 [16];
  undefined1 auVar1772 [14];
  undefined1 auVar1773 [14];
  undefined1 auVar1774 [14];
  undefined1 auVar1786 [16];
  undefined1 auVar1775 [14];
  undefined1 auVar1788 [16];
  undefined1 auVar1793 [16];
  undefined1 auVar1799 [16];
  undefined1 auVar1802 [16];
  undefined1 auVar1776 [14];
  undefined1 auVar1805 [16];
  undefined1 auVar1777 [14];
  undefined1 auVar1807 [16];
  undefined1 auVar1778 [14];
  undefined1 auVar1809 [16];
  undefined1 auVar1779 [14];
  undefined1 auVar1811 [16];
  undefined1 auVar1814 [16];
  undefined1 auVar1817 [16];
  undefined1 auVar1794 [16];
  undefined1 auVar1783 [16];
  undefined1 auVar1785 [16];
  undefined1 auVar1787 [16];
  undefined1 auVar1795 [16];
  undefined1 auVar1804 [16];
  undefined1 auVar1806 [16];
  undefined1 auVar1808 [16];
  undefined1 auVar1810 [16];
  undefined1 auVar1859 [16];
  undefined1 auVar1871 [16];
  undefined1 auVar1823 [16];
  undefined1 auVar1830 [16];
  undefined1 auVar1837 [16];
  undefined1 auVar1844 [16];
  undefined1 auVar1851 [16];
  undefined1 auVar1860 [16];
  undefined1 auVar1875 [16];
  undefined1 auVar1882 [16];
  undefined1 auVar1889 [16];
  undefined1 auVar1896 [16];
  undefined1 auVar1820 [16];
  undefined1 auVar1824 [16];
  undefined1 auVar1831 [16];
  undefined1 auVar1838 [16];
  undefined1 auVar1845 [16];
  undefined1 auVar1852 [16];
  undefined1 auVar1861 [16];
  undefined1 auVar1868 [16];
  undefined1 auVar1872 [16];
  undefined1 auVar1876 [16];
  undefined1 auVar1883 [16];
  undefined1 auVar1890 [16];
  undefined1 auVar1897 [16];
  undefined1 auVar1903 [16];
  undefined1 auVar1825 [16];
  undefined1 auVar1832 [16];
  undefined1 auVar1839 [16];
  undefined1 auVar1846 [16];
  undefined1 auVar1853 [16];
  undefined1 auVar1862 [16];
  undefined1 auVar1877 [16];
  undefined1 auVar1884 [16];
  undefined1 auVar1891 [16];
  undefined1 auVar1898 [16];
  undefined1 auVar1821 [16];
  undefined1 auVar1826 [16];
  undefined1 auVar1833 [16];
  undefined1 auVar1840 [16];
  undefined1 auVar1847 [16];
  undefined1 auVar1854 [16];
  undefined1 auVar1863 [16];
  undefined1 auVar1866 [16];
  undefined1 auVar1869 [16];
  undefined1 auVar1873 [16];
  undefined1 auVar1878 [16];
  undefined1 auVar1885 [16];
  undefined1 auVar1892 [16];
  undefined1 auVar1899 [16];
  undefined1 auVar1904 [16];
  undefined1 auVar1827 [16];
  undefined1 auVar1834 [16];
  undefined1 auVar1841 [16];
  undefined1 auVar1848 [16];
  undefined1 auVar1855 [16];
  undefined1 auVar1864 [16];
  undefined1 auVar1879 [16];
  undefined1 auVar1886 [16];
  undefined1 auVar1893 [16];
  undefined1 auVar1900 [16];
  undefined1 auVar1828 [16];
  undefined1 auVar1835 [16];
  undefined1 auVar1842 [16];
  undefined1 auVar1849 [16];
  undefined1 auVar1856 [16];
  undefined1 auVar1865 [16];
  undefined1 auVar1880 [16];
  undefined1 auVar1887 [16];
  undefined1 auVar1894 [16];
  undefined1 auVar1901 [16];
  undefined6 uVar1906;
  undefined8 uVar1907;
  undefined1 auVar1937 [16];
  undefined1 auVar1941 [16];
  undefined1 auVar1946 [16];
  undefined1 auVar1958 [16];
  undefined1 auVar1976 [16];
  undefined1 auVar1951 [16];
  undefined1 auVar1927 [16];
  undefined1 auVar1930 [16];
  undefined1 auVar1908 [12];
  undefined1 auVar1934 [16];
  undefined1 auVar1938 [16];
  undefined1 auVar1942 [16];
  undefined1 auVar1947 [16];
  undefined1 auVar1952 [16];
  undefined1 auVar1959 [16];
  undefined1 auVar1962 [16];
  undefined1 auVar1965 [16];
  undefined1 auVar1968 [16];
  undefined1 auVar1972 [16];
  undefined1 auVar1977 [16];
  undefined1 auVar1981 [16];
  undefined1 auVar1985 [16];
  undefined1 auVar1953 [16];
  undefined1 auVar1928 [16];
  undefined1 auVar1931 [16];
  undefined1 auVar1917 [14];
  undefined1 auVar1935 [16];
  undefined1 auVar1918 [14];
  undefined1 auVar1939 [16];
  undefined1 auVar1919 [14];
  undefined1 auVar1943 [16];
  undefined1 auVar1920 [14];
  undefined1 auVar1948 [16];
  undefined1 auVar1921 [14];
  undefined1 auVar1954 [16];
  undefined1 auVar1960 [16];
  undefined1 auVar1963 [16];
  undefined1 auVar1966 [16];
  undefined1 auVar1969 [16];
  undefined1 auVar1922 [14];
  undefined1 auVar1973 [16];
  undefined1 auVar1923 [14];
  undefined1 auVar1978 [16];
  undefined1 auVar1924 [14];
  undefined1 auVar1982 [16];
  undefined1 auVar1925 [14];
  undefined1 auVar1986 [16];
  undefined1 auVar1955 [16];
  undefined1 auVar1932 [16];
  undefined1 auVar1944 [16];
  undefined1 auVar1949 [16];
  undefined1 auVar1956 [16];
  undefined1 auVar1970 [16];
  undefined1 auVar1974 [16];
  undefined1 auVar1979 [16];
  undefined1 auVar1983 [16];
  undefined6 uVar1988;
  undefined8 uVar1989;
  undefined1 auVar1990 [12];
  undefined1 auVar2024 [16];
  undefined1 auVar2008 [14];
  undefined1 auVar2018 [16];
  undefined1 auVar2009 [14];
  undefined1 auVar2010 [14];
  undefined1 auVar2011 [14];
  undefined1 auVar2020 [16];
  undefined1 auVar2012 [14];
  undefined1 auVar2022 [16];
  undefined1 auVar2025 [16];
  undefined1 auVar2013 [14];
  undefined1 auVar2028 [16];
  undefined1 auVar2014 [14];
  undefined1 auVar2030 [16];
  undefined1 auVar2015 [14];
  undefined1 auVar2032 [16];
  undefined1 auVar2016 [14];
  undefined1 auVar2034 [16];
  undefined1 auVar2017 [16];
  undefined1 auVar2019 [16];
  undefined1 auVar2021 [16];
  undefined1 auVar2027 [16];
  undefined1 auVar2029 [16];
  undefined1 auVar2031 [16];
  undefined1 auVar2033 [16];
  undefined1 auVar2046 [16];
  undefined1 auVar2055 [16];
  undefined1 auVar2064 [16];
  undefined1 auVar2073 [16];
  undefined1 auVar2082 [16];
  undefined1 auVar2094 [16];
  undefined1 auVar2103 [16];
  undefined1 auVar2112 [16];
  undefined1 auVar2121 [16];
  undefined1 auVar2130 [16];
  undefined1 auVar2047 [16];
  undefined1 auVar2056 [16];
  undefined1 auVar2065 [16];
  undefined1 auVar2074 [16];
  undefined1 auVar2083 [16];
  undefined1 auVar2095 [16];
  undefined1 auVar2104 [16];
  undefined1 auVar2113 [16];
  undefined1 auVar2122 [16];
  undefined1 auVar2131 [16];
  undefined1 auVar2048 [16];
  undefined1 auVar2057 [16];
  undefined1 auVar2066 [16];
  undefined1 auVar2075 [16];
  undefined1 auVar2084 [16];
  undefined1 auVar2091 [16];
  undefined1 auVar2096 [16];
  undefined1 auVar2105 [16];
  undefined1 auVar2114 [16];
  undefined1 auVar2123 [16];
  undefined1 auVar2132 [16];
  undefined1 auVar2049 [16];
  undefined1 auVar2058 [16];
  undefined1 auVar2067 [16];
  undefined1 auVar2076 [16];
  undefined1 auVar2085 [16];
  undefined1 auVar2097 [16];
  undefined1 auVar2106 [16];
  undefined1 auVar2115 [16];
  undefined1 auVar2124 [16];
  undefined1 auVar2133 [16];
  undefined1 auVar2050 [16];
  undefined1 auVar2053 [16];
  undefined1 auVar2059 [16];
  undefined1 auVar2062 [16];
  undefined1 auVar2068 [16];
  undefined1 auVar2071 [16];
  undefined1 auVar2077 [16];
  undefined1 auVar2080 [16];
  undefined1 auVar2086 [16];
  undefined1 auVar2089 [16];
  undefined1 auVar2092 [16];
  undefined1 auVar2098 [16];
  undefined1 auVar2101 [16];
  undefined1 auVar2107 [16];
  undefined1 auVar2110 [16];
  undefined1 auVar2116 [16];
  undefined1 auVar2119 [16];
  undefined1 auVar2125 [16];
  undefined1 auVar2128 [16];
  undefined1 auVar2134 [16];
  undefined1 auVar2137 [16];
  undefined1 auVar2051 [16];
  undefined1 auVar2060 [16];
  undefined1 auVar2069 [16];
  undefined1 auVar2078 [16];
  undefined1 auVar2087 [16];
  undefined1 auVar2099 [16];
  undefined1 auVar2108 [16];
  undefined1 auVar2117 [16];
  undefined1 auVar2126 [16];
  undefined1 auVar2135 [16];
  undefined1 auVar2052 [16];
  undefined1 auVar2061 [16];
  undefined1 auVar2070 [16];
  undefined1 auVar2079 [16];
  undefined1 auVar2088 [16];
  undefined1 auVar2100 [16];
  undefined1 auVar2109 [16];
  undefined1 auVar2118 [16];
  undefined1 auVar2127 [16];
  undefined1 auVar2136 [16];
  undefined1 auVar2139 [16];
  undefined1 auVar2146 [16];
  undefined1 auVar2153 [16];
  undefined1 auVar2160 [16];
  undefined1 auVar2167 [16];
  undefined1 auVar2174 [16];
  undefined1 auVar2181 [16];
  undefined1 auVar2188 [16];
  undefined1 auVar2195 [16];
  undefined1 auVar2202 [16];
  undefined1 auVar2140 [16];
  undefined1 auVar2147 [16];
  undefined1 auVar2154 [16];
  undefined1 auVar2161 [16];
  undefined1 auVar2168 [16];
  undefined1 auVar2175 [16];
  undefined1 auVar2182 [16];
  undefined1 auVar2189 [16];
  undefined1 auVar2196 [16];
  undefined1 auVar2203 [16];
  undefined1 auVar2141 [16];
  undefined1 auVar2148 [16];
  undefined1 auVar2155 [16];
  undefined1 auVar2162 [16];
  undefined1 auVar2169 [16];
  undefined1 auVar2176 [16];
  undefined1 auVar2183 [16];
  undefined1 auVar2190 [16];
  undefined1 auVar2197 [16];
  undefined1 auVar2204 [16];
  undefined1 auVar2142 [16];
  undefined1 auVar2149 [16];
  undefined1 auVar2156 [16];
  undefined1 auVar2163 [16];
  undefined1 auVar2170 [16];
  undefined1 auVar2177 [16];
  undefined1 auVar2184 [16];
  undefined1 auVar2191 [16];
  undefined1 auVar2198 [16];
  undefined1 auVar2205 [16];
  undefined1 auVar2143 [16];
  undefined1 auVar2150 [16];
  undefined1 auVar2157 [16];
  undefined1 auVar2164 [16];
  undefined1 auVar2171 [16];
  undefined1 auVar2178 [16];
  undefined1 auVar2185 [16];
  undefined1 auVar2192 [16];
  undefined1 auVar2199 [16];
  undefined1 auVar2206 [16];
  undefined1 auVar2144 [16];
  undefined1 auVar2151 [16];
  undefined1 auVar2158 [16];
  undefined1 auVar2165 [16];
  undefined1 auVar2172 [16];
  undefined1 auVar2179 [16];
  undefined1 auVar2186 [16];
  undefined1 auVar2193 [16];
  undefined1 auVar2200 [16];
  undefined1 auVar2207 [16];
  undefined1 auVar2209 [16];
  undefined1 auVar2216 [16];
  undefined1 auVar2223 [16];
  undefined1 auVar2230 [16];
  undefined1 auVar2237 [16];
  undefined1 auVar2244 [16];
  undefined1 auVar2251 [16];
  undefined1 auVar2258 [16];
  undefined1 auVar2265 [16];
  undefined1 auVar2272 [16];
  undefined1 auVar2210 [16];
  undefined1 auVar2217 [16];
  undefined1 auVar2224 [16];
  undefined1 auVar2231 [16];
  undefined1 auVar2238 [16];
  undefined1 auVar2245 [16];
  undefined1 auVar2252 [16];
  undefined1 auVar2259 [16];
  undefined1 auVar2266 [16];
  undefined1 auVar2273 [16];
  undefined1 auVar2211 [16];
  undefined1 auVar2218 [16];
  undefined1 auVar2225 [16];
  undefined1 auVar2232 [16];
  undefined1 auVar2239 [16];
  undefined1 auVar2246 [16];
  undefined1 auVar2253 [16];
  undefined1 auVar2260 [16];
  undefined1 auVar2267 [16];
  undefined1 auVar2274 [16];
  undefined1 auVar2212 [16];
  undefined1 auVar2219 [16];
  undefined1 auVar2226 [16];
  undefined1 auVar2233 [16];
  undefined1 auVar2240 [16];
  undefined1 auVar2247 [16];
  undefined1 auVar2254 [16];
  undefined1 auVar2261 [16];
  undefined1 auVar2268 [16];
  undefined1 auVar2275 [16];
  undefined1 auVar2213 [16];
  undefined1 auVar2220 [16];
  undefined1 auVar2227 [16];
  undefined1 auVar2234 [16];
  undefined1 auVar2241 [16];
  undefined1 auVar2248 [16];
  undefined1 auVar2255 [16];
  undefined1 auVar2262 [16];
  undefined1 auVar2269 [16];
  undefined1 auVar2276 [16];
  undefined1 auVar2214 [16];
  undefined1 auVar2221 [16];
  undefined1 auVar2228 [16];
  undefined1 auVar2235 [16];
  undefined1 auVar2242 [16];
  undefined1 auVar2249 [16];
  undefined1 auVar2256 [16];
  undefined1 auVar2263 [16];
  undefined1 auVar2270 [16];
  undefined1 auVar2277 [16];
  
  iVar258 = (int)left;
  bVar254 = (byte)upsample_left;
  if (bw == bh) {
    if (bw < 0x10) {
      if (bw == 4) {
        iVar258 = 7 << (bVar254 & 0x1f);
        auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
        lVar252 = 0;
        auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        lVar256 = 0;
        uVar257 = dy;
        do {
          iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
          uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
          lVar260 = lVar252;
          if ((int)uVar259 < 1) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
              lVar260 = lVar260 + 0x10;
            } while (lVar260 != 0x40);
          }
          else {
            uVar255 = 4;
            if ((int)uVar259 < 4) {
              uVar255 = uVar259;
            }
            auVar1356 = *(undefined1 (*) [16])(left + iVar262);
            if (upsample_left == 0) {
              auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
              auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
              auVar1198 = pshuflw(auVar1198,auVar1198,0);
              auVar1198._4_4_ = auVar1198._0_4_;
              auVar1198._8_4_ = auVar1198._0_4_;
              auVar1198._12_4_ = auVar1198._0_4_;
            }
            else {
              auVar1356 = pshufb(auVar1356,_DAT_004df790);
              auVar1517 = auVar1356 >> 0x40;
              auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
              auVar1199._0_4_ = auVar1198._0_4_;
              auVar1199._4_4_ = auVar1199._0_4_;
              auVar1199._8_4_ = auVar1199._0_4_;
              auVar1199._12_4_ = auVar1199._0_4_;
              auVar1198 = psllw(auVar1199,ZEXT416((uint)upsample_left));
              auVar1525._0_2_ = auVar1198._0_2_ >> 1;
              auVar1525._2_2_ = auVar1198._2_2_ >> 1;
              auVar1525._4_2_ = auVar1198._4_2_ >> 1;
              auVar1525._6_2_ = auVar1198._6_2_ >> 1;
              auVar1525._8_2_ = auVar1198._8_2_ >> 1;
              auVar1525._10_2_ = auVar1198._10_2_ >> 1;
              auVar1525._12_2_ = auVar1198._12_2_ >> 1;
              auVar1525._14_2_ = auVar1198._14_2_ >> 1;
              auVar1198 = auVar1525 & auVar338;
            }
            auVar1199 = pmovzxbw(in_XMM9,auVar1356);
            auVar1857 = pmovzxbw(in_XMM10,auVar1517);
            auVar1525 = psllw(auVar1199,5);
            in_XMM10._0_2_ = (auVar1857._0_2_ - auVar1199._0_2_) * auVar1198._0_2_;
            in_XMM10._2_2_ = (auVar1857._2_2_ - auVar1199._2_2_) * auVar1198._2_2_;
            in_XMM10._4_2_ = (auVar1857._4_2_ - auVar1199._4_2_) * auVar1198._4_2_;
            in_XMM10._6_2_ = (auVar1857._6_2_ - auVar1199._6_2_) * auVar1198._6_2_;
            in_XMM10._8_2_ = (auVar1857._8_2_ - auVar1199._8_2_) * auVar1198._8_2_;
            in_XMM10._10_2_ = (auVar1857._10_2_ - auVar1199._10_2_) * auVar1198._10_2_;
            in_XMM10._12_2_ = (auVar1857._12_2_ - auVar1199._12_2_) * auVar1198._12_2_;
            in_XMM10._14_2_ = (auVar1857._14_2_ - auVar1199._14_2_) * auVar1198._14_2_;
            uVar1328 = (ushort)(auVar1525._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
            uVar1419 = (ushort)(auVar1525._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
            uVar1420 = (ushort)(auVar1525._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
            uVar1421 = (ushort)(auVar1525._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
            uVar1422 = (ushort)(auVar1525._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
            uVar1423 = (ushort)(auVar1525._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
            uVar1424 = (ushort)(auVar1525._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
            uVar1425 = (ushort)(auVar1525._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
            auVar1857._0_2_ = CONCAT11(0,auVar1356[8]);
            auVar1857[2] = auVar1356[9];
            auVar1857[3] = 0;
            auVar1857[4] = auVar1356[10];
            auVar1857[5] = 0;
            auVar1857[6] = auVar1356[0xb];
            auVar1857[7] = 0;
            auVar1857[8] = auVar1356[0xc];
            auVar1857[9] = 0;
            auVar1857[10] = auVar1356[0xd];
            auVar1857[0xb] = 0;
            auVar1857[0xc] = auVar1356[0xe];
            auVar1857[0xd] = 0;
            auVar1857[0xe] = auVar1356[0xf];
            auVar1857[0xf] = 0;
            auVar1199 = psllw(auVar1857,5);
            uVar1143 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ +
                               (auVar1517[8] - auVar1857._0_2_) * auVar1198._0_2_) >> 5;
            uVar1321 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ +
                               ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1198._2_2_) >> 5
            ;
            uVar1322 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ +
                               ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1198._4_2_) >>
                       5;
            uVar1323 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ +
                               ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1198._6_2_)
                       >> 5;
            uVar1324 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ +
                               ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1198._8_2_)
                       >> 5;
            uVar1325 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ +
                               ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1198._10_2_)
                       >> 5;
            uVar1326 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ +
                               ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1198._12_2_)
                       >> 5;
            uVar1327 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ +
                               ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1198._14_2_)
                       >> 5;
            in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
            in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
            in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
            in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
            in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
            in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
            in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
            in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
            in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
            in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
            in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323)
            ;
            in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324)
            ;
            in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325)
            ;
            in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326)
            ;
            in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327)
            ;
            auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
            *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
            uVar257 = uVar257 + dy;
          }
          if ((int)uVar259 < 1) break;
          lVar256 = lVar256 + 1;
          lVar252 = lVar252 + 0x10;
        } while (lVar256 != 4);
        auVar551._0_14_ = local_1038._0_14_;
        auVar551[0xe] = local_1038[7];
        auVar551[0xf] = local_1028[7];
        auVar984._14_2_ = auVar551._14_2_;
        auVar984._0_13_ = local_1038._0_13_;
        auVar984[0xd] = local_1028[6];
        auVar338._13_3_ = auVar984._13_3_;
        auVar338._0_12_ = local_1038._0_12_;
        auVar338[0xc] = local_1038[6];
        auVar1356._12_4_ = auVar338._12_4_;
        auVar1356._0_11_ = local_1038._0_11_;
        auVar1356[0xb] = local_1028[5];
        auVar1517._11_5_ = auVar1356._11_5_;
        auVar1517._0_10_ = local_1038._0_10_;
        auVar1517[10] = local_1038[5];
        auVar376._10_6_ = auVar1517._10_6_;
        auVar376._0_9_ = local_1038._0_9_;
        auVar376[9] = local_1028[4];
        auVar375._9_7_ = auVar376._9_7_;
        auVar375._0_8_ = local_1038._0_8_;
        auVar375[8] = local_1038[4];
        Var18 = CONCAT91(CONCAT81(auVar375._8_8_,local_1028[3]),local_1038[3]);
        auVar139._2_10_ = Var18;
        auVar139[1] = local_1028[2];
        auVar139[0] = local_1038[2];
        auVar138._2_12_ = auVar139;
        auVar138[1] = local_1028[1];
        auVar138[0] = local_1038[1];
        uVar2279 = CONCAT11(local_1028[0],local_1038[0]);
        auVar374._2_14_ = auVar138;
        auVar625._0_14_ = local_1018._0_14_;
        auVar625[0xe] = local_1018[7];
        auVar625[0xf] = local_1008[7];
        auVar624._14_2_ = auVar625._14_2_;
        auVar624._0_13_ = local_1018._0_13_;
        auVar624[0xd] = local_1008[6];
        auVar623._13_3_ = auVar624._13_3_;
        auVar623._0_12_ = local_1018._0_12_;
        auVar623[0xc] = local_1018[6];
        auVar622._12_4_ = auVar623._12_4_;
        auVar622._0_11_ = local_1018._0_11_;
        auVar622[0xb] = local_1008[5];
        auVar621._11_5_ = auVar622._11_5_;
        auVar621._0_10_ = local_1018._0_10_;
        auVar621[10] = local_1018[5];
        auVar620._10_6_ = auVar621._10_6_;
        auVar620._0_9_ = local_1018._0_9_;
        auVar620[9] = local_1008[4];
        auVar619._9_7_ = auVar620._9_7_;
        auVar619._0_8_ = local_1018._0_8_;
        auVar619[8] = local_1018[4];
        Var21 = CONCAT91(CONCAT81(auVar619._8_8_,local_1008[3]),local_1018[3]);
        auVar141._2_10_ = Var21;
        auVar141[1] = local_1008[2];
        auVar141[0] = local_1018[2];
        auVar140._2_12_ = auVar141;
        auVar140[1] = local_1008[1];
        auVar140[0] = local_1018[1];
        auVar379._0_12_ = auVar374._0_12_;
        auVar379._12_2_ = (short)Var18;
        auVar379._14_2_ = (short)Var21;
        auVar378._12_4_ = auVar379._12_4_;
        auVar378._0_10_ = auVar374._0_10_;
        auVar378._10_2_ = auVar141._0_2_;
        auVar377._10_6_ = auVar378._10_6_;
        auVar377._0_8_ = auVar374._0_8_;
        auVar377._8_2_ = auVar139._0_2_;
        auVar142._4_8_ = auVar377._8_8_;
        auVar142._2_2_ = auVar140._0_2_;
        auVar142._0_2_ = auVar138._0_2_;
        *(uint *)dst = CONCAT22(CONCAT11(local_1008[0],local_1018[0]),uVar2279);
        *(int *)(dst + stride) = auVar142._0_4_;
        *(int *)(dst + stride * 2) = auVar377._8_4_;
        *(undefined4 *)(dst + stride * 3) = auVar378._12_4_;
        return;
      }
      if (bw != 8) {
        return;
      }
      iVar258 = 0xf << (bVar254 & 0x1f);
      auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
        uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
        lVar260 = lVar252;
        if ((int)uVar259 < 1) {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x80);
        }
        else {
          uVar255 = 8;
          if ((int)uVar259 < 8) {
            uVar255 = uVar259;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar262);
          if (upsample_left == 0) {
            auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
            auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1637._0_4_ = auVar1198._0_4_;
            auVar1637._4_4_ = auVar1637._0_4_;
            auVar1637._8_4_ = auVar1637._0_4_;
            auVar1637._12_4_ = auVar1637._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_004df790);
            auVar1517 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
            auVar1635._0_4_ = auVar1198._0_4_;
            auVar1635._4_4_ = auVar1635._0_4_;
            auVar1635._8_4_ = auVar1635._0_4_;
            auVar1635._12_4_ = auVar1635._0_4_;
            auVar1198 = psllw(auVar1635,ZEXT416((uint)upsample_left));
            auVar1636._0_2_ = auVar1198._0_2_ >> 1;
            auVar1636._2_2_ = auVar1198._2_2_ >> 1;
            auVar1636._4_2_ = auVar1198._4_2_ >> 1;
            auVar1636._6_2_ = auVar1198._6_2_ >> 1;
            auVar1636._8_2_ = auVar1198._8_2_ >> 1;
            auVar1636._10_2_ = auVar1198._10_2_ >> 1;
            auVar1636._12_2_ = auVar1198._12_2_ >> 1;
            auVar1636._14_2_ = auVar1198._14_2_ >> 1;
            auVar1637 = auVar1636 & auVar338;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1525 = pmovzxbw(in_XMM10,auVar1517);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1637._0_2_;
          in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1637._2_2_;
          in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1637._4_2_;
          in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1637._6_2_;
          in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1637._8_2_;
          in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1637._10_2_;
          in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1637._12_2_;
          in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1637._14_2_;
          uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
          auVar300._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar300[2] = auVar1356[9];
          auVar300[3] = 0;
          auVar300[4] = auVar1356[10];
          auVar300[5] = 0;
          auVar300[6] = auVar1356[0xb];
          auVar300[7] = 0;
          auVar300[8] = auVar1356[0xc];
          auVar300[9] = 0;
          auVar300[10] = auVar1356[0xd];
          auVar300[0xb] = 0;
          auVar300[0xc] = auVar1356[0xe];
          auVar300[0xd] = 0;
          auVar300[0xe] = auVar1356[0xf];
          auVar300[0xf] = 0;
          auVar1198 = psllw(auVar300,5);
          uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                             (auVar1517[8] - auVar300._0_2_) * auVar1637._0_2_) >> 5;
          uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                             ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1637._2_2_) >> 5;
          uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                             ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1637._4_2_) >> 5
          ;
          uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                             ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1637._6_2_) >>
                     5;
          uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                             ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1637._8_2_) >>
                     5;
          uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                             ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1637._10_2_)
                     >> 5;
          uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                             ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1637._12_2_)
                     >> 5;
          uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                             ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1637._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
          in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
          in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
          in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
          in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
          in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
          in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
          in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
          in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323);
          in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324);
          in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325);
          in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326);
          in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327);
          auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        if ((int)uVar259 < 1) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 8);
      auVar308._0_14_ = local_1038._0_14_;
      auVar308[0xe] = local_1038[7];
      auVar308[0xf] = local_1028[7];
      auVar307._14_2_ = auVar308._14_2_;
      auVar307._0_13_ = local_1038._0_13_;
      auVar307[0xd] = local_1028[6];
      auVar306._13_3_ = auVar307._13_3_;
      auVar306._0_12_ = local_1038._0_12_;
      auVar306[0xc] = local_1038[6];
      auVar305._12_4_ = auVar306._12_4_;
      auVar305._0_11_ = local_1038._0_11_;
      auVar305[0xb] = local_1028[5];
      auVar304._11_5_ = auVar305._11_5_;
      auVar304._0_10_ = local_1038._0_10_;
      auVar304[10] = local_1038[5];
      auVar303._10_6_ = auVar304._10_6_;
      auVar303._0_9_ = local_1038._0_9_;
      auVar303[9] = local_1028[4];
      auVar302._9_7_ = auVar303._9_7_;
      auVar302._0_8_ = local_1038._0_8_;
      auVar302[8] = local_1038[4];
      Var18 = CONCAT91(CONCAT81(auVar302._8_8_,local_1028[3]),local_1038[3]);
      auVar34._2_10_ = Var18;
      auVar34[1] = local_1028[2];
      auVar34[0] = local_1038[2];
      auVar33._2_12_ = auVar34;
      auVar33[1] = local_1028[1];
      auVar33[0] = local_1038[1];
      auVar301._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar301._2_14_ = auVar33;
      auVar792._0_14_ = local_1018._0_14_;
      auVar792[0xe] = local_1018[7];
      auVar792[0xf] = local_1008[7];
      auVar791._14_2_ = auVar792._14_2_;
      auVar791._0_13_ = local_1018._0_13_;
      auVar791[0xd] = local_1008[6];
      auVar790._13_3_ = auVar791._13_3_;
      auVar790._0_12_ = local_1018._0_12_;
      auVar790[0xc] = local_1018[6];
      auVar789._12_4_ = auVar790._12_4_;
      auVar789._0_11_ = local_1018._0_11_;
      auVar789[0xb] = local_1008[5];
      auVar788._11_5_ = auVar789._11_5_;
      auVar788._0_10_ = local_1018._0_10_;
      auVar788[10] = local_1018[5];
      auVar787._10_6_ = auVar788._10_6_;
      auVar787._0_9_ = local_1018._0_9_;
      auVar787[9] = local_1008[4];
      auVar786._9_7_ = auVar787._9_7_;
      auVar786._0_8_ = local_1018._0_8_;
      auVar786[8] = local_1018[4];
      Var21 = CONCAT91(CONCAT81(auVar786._8_8_,local_1008[3]),local_1018[3]);
      auVar36._2_10_ = Var21;
      auVar36[1] = local_1008[2];
      auVar36[0] = local_1018[2];
      auVar35._2_12_ = auVar36;
      auVar35[1] = local_1008[1];
      auVar35[0] = local_1018[1];
      auVar524._0_14_ = local_ff8._0_14_;
      auVar524[0xe] = local_ff8[7];
      auVar524[0xf] = local_fe8[7];
      auVar523._14_2_ = auVar524._14_2_;
      auVar523._0_13_ = local_ff8._0_13_;
      auVar523[0xd] = local_fe8[6];
      auVar522._13_3_ = auVar523._13_3_;
      auVar522._0_12_ = local_ff8._0_12_;
      auVar522[0xc] = local_ff8[6];
      auVar521._12_4_ = auVar522._12_4_;
      auVar521._0_11_ = local_ff8._0_11_;
      auVar521[0xb] = local_fe8[5];
      auVar520._11_5_ = auVar521._11_5_;
      auVar520._0_10_ = local_ff8._0_10_;
      auVar520[10] = local_ff8[5];
      auVar519._10_6_ = auVar520._10_6_;
      auVar519._0_9_ = local_ff8._0_9_;
      auVar519[9] = local_fe8[4];
      auVar518._9_7_ = auVar519._9_7_;
      auVar518._0_8_ = local_ff8._0_8_;
      auVar518[8] = local_ff8[4];
      Var39 = CONCAT91(CONCAT81(auVar518._8_8_,local_fe8[3]),local_ff8[3]);
      auVar38._2_10_ = Var39;
      auVar38[1] = local_fe8[2];
      auVar38[0] = local_ff8[2];
      auVar37._2_12_ = auVar38;
      auVar37[1] = local_fe8[1];
      auVar37[0] = local_ff8[1];
      auVar517._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
      auVar517._2_14_ = auVar37;
      auVar959._0_14_ = local_fd8._0_14_;
      auVar959[0xe] = local_fd8[7];
      auVar959[0xf] = local_fc8[7];
      auVar958._14_2_ = auVar959._14_2_;
      auVar958._0_13_ = local_fd8._0_13_;
      auVar958[0xd] = local_fc8[6];
      auVar957._13_3_ = auVar958._13_3_;
      auVar957._0_12_ = local_fd8._0_12_;
      auVar957[0xc] = local_fd8[6];
      auVar956._12_4_ = auVar957._12_4_;
      auVar956._0_11_ = local_fd8._0_11_;
      auVar956[0xb] = local_fc8[5];
      auVar955._11_5_ = auVar956._11_5_;
      auVar955._0_10_ = local_fd8._0_10_;
      auVar955[10] = local_fd8[5];
      auVar954._10_6_ = auVar955._10_6_;
      auVar954._0_9_ = local_fd8._0_9_;
      auVar954[9] = local_fc8[4];
      auVar953._9_7_ = auVar954._9_7_;
      auVar953._0_8_ = local_fd8._0_8_;
      auVar953[8] = local_fd8[4];
      Var42 = CONCAT91(CONCAT81(auVar953._8_8_,local_fc8[3]),local_fd8[3]);
      auVar41._2_10_ = Var42;
      auVar41[1] = local_fc8[2];
      auVar41[0] = local_fd8[2];
      auVar40._2_12_ = auVar41;
      auVar40[1] = local_fc8[1];
      auVar40[0] = local_fd8[1];
      auVar1175._0_12_ = auVar301._0_12_;
      auVar1175._12_2_ = (short)Var18;
      auVar1175._14_2_ = (short)Var21;
      auVar1174._12_4_ = auVar1175._12_4_;
      auVar1174._0_10_ = auVar301._0_10_;
      auVar1174._10_2_ = auVar36._0_2_;
      auVar1173._10_6_ = auVar1174._10_6_;
      auVar1173._0_8_ = auVar301._0_8_;
      auVar1173._8_2_ = auVar34._0_2_;
      auVar43._4_8_ = auVar1173._8_8_;
      auVar43._2_2_ = auVar35._0_2_;
      auVar43._0_2_ = auVar33._0_2_;
      auVar1172._0_4_ = CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar301._0_2_);
      auVar1172._4_12_ = auVar43;
      auVar1334._0_12_ = auVar517._0_12_;
      auVar1334._12_2_ = (short)Var39;
      auVar1334._14_2_ = (short)Var42;
      auVar1333._12_4_ = auVar1334._12_4_;
      auVar1333._0_10_ = auVar517._0_10_;
      auVar1333._10_2_ = auVar41._0_2_;
      auVar1332._10_6_ = auVar1333._10_6_;
      auVar1332._0_8_ = auVar517._0_8_;
      auVar1332._8_2_ = auVar38._0_2_;
      auVar44._4_8_ = auVar1332._8_8_;
      auVar44._2_2_ = auVar40._0_2_;
      auVar44._0_2_ = auVar37._0_2_;
      auVar1459._0_8_ = auVar1172._0_8_;
      auVar1459._8_4_ = auVar43._0_4_;
      auVar1459._12_4_ = auVar44._0_4_;
      *(ulong *)dst =
           CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar517._0_2_),auVar1172._0_4_);
      *(long *)(dst + stride) = auVar1459._8_8_;
      auVar298._12_4_ = CONCAT22(auVar786._8_2_,auVar302._8_2_);
      auVar268._0_8_ = CONCAT26(auVar788._10_2_,CONCAT24(auVar304._10_2_,auVar298._12_4_));
      auVar268._8_2_ = auVar306._12_2_;
      auVar268._10_2_ = auVar790._12_2_;
      auVar309._12_2_ = auVar307._14_2_;
      auVar309._0_12_ = auVar268;
      auVar309._14_2_ = auVar791._14_2_;
      auVar784._12_4_ = CONCAT22(auVar953._8_2_,auVar518._8_2_);
      auVar461._0_8_ = CONCAT26(auVar955._10_2_,CONCAT24(auVar520._10_2_,auVar784._12_4_));
      auVar461._8_2_ = auVar522._12_2_;
      auVar461._10_2_ = auVar957._12_2_;
      auVar525._12_2_ = auVar523._14_2_;
      auVar525._0_12_ = auVar461;
      auVar525._14_2_ = auVar958._14_2_;
      *(int *)(dst + stride * 2) = auVar1173._8_4_;
      *(int *)(dst + stride * 2 + 4) = auVar1332._8_4_;
      *(undefined4 *)(dst + stride * 3 + 8) = auVar1174._12_4_;
      *(undefined4 *)(dst + stride * 3 + 0xc) = auVar1333._12_4_;
      auVar793._8_4_ = (int)((ulong)auVar268._0_8_ >> 0x20);
      auVar793._0_8_ = auVar268._0_8_;
      auVar793._12_4_ = (int)((ulong)auVar461._0_8_ >> 0x20);
      *(ulong *)(dst + stride * 4) = CONCAT44(auVar784._12_4_,auVar298._12_4_);
      *(long *)(dst + stride * 5) = auVar793._8_8_;
      auVar298._12_4_ = auVar309._12_4_;
      auVar784._12_4_ = auVar525._12_4_;
      *(int *)(dst + stride * 6) = auVar268._8_4_;
      *(int *)(dst + stride * 6 + 4) = auVar461._8_4_;
      lVar252 = stride * 7;
LAB_002267ef:
      *(undefined4 *)(dst + lVar252 + 8) = auVar298._12_4_;
      *(undefined4 *)(dst + lVar252 + 0xc) = auVar784._12_4_;
      return;
    }
    if (bw == 0x10) {
      iVar258 = 0x1f << (bVar254 & 0x1f);
      auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
        uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
        lVar260 = lVar252;
        if ((int)uVar259 < 1) {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x100);
        }
        else {
          uVar255 = 0x10;
          if ((int)uVar259 < 0x10) {
            uVar255 = uVar259;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar262);
          if (upsample_left == 0) {
            auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
            auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1649._0_4_ = auVar1198._0_4_;
            auVar1649._4_4_ = auVar1649._0_4_;
            auVar1649._8_4_ = auVar1649._0_4_;
            auVar1649._12_4_ = auVar1649._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_004df790);
            auVar1517 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
            auVar1647._0_4_ = auVar1198._0_4_;
            auVar1647._4_4_ = auVar1647._0_4_;
            auVar1647._8_4_ = auVar1647._0_4_;
            auVar1647._12_4_ = auVar1647._0_4_;
            auVar1198 = psllw(auVar1647,ZEXT416((uint)upsample_left));
            auVar1648._0_2_ = auVar1198._0_2_ >> 1;
            auVar1648._2_2_ = auVar1198._2_2_ >> 1;
            auVar1648._4_2_ = auVar1198._4_2_ >> 1;
            auVar1648._6_2_ = auVar1198._6_2_ >> 1;
            auVar1648._8_2_ = auVar1198._8_2_ >> 1;
            auVar1648._10_2_ = auVar1198._10_2_ >> 1;
            auVar1648._12_2_ = auVar1198._12_2_ >> 1;
            auVar1648._14_2_ = auVar1198._14_2_ >> 1;
            auVar1649 = auVar1648 & auVar338;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1525 = pmovzxbw(in_XMM10,auVar1517);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1649._0_2_;
          in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1649._2_2_;
          in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1649._4_2_;
          in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1649._6_2_;
          in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1649._8_2_;
          in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1649._10_2_;
          in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1649._12_2_;
          in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1649._14_2_;
          uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
          auVar329._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar329[2] = auVar1356[9];
          auVar329[3] = 0;
          auVar329[4] = auVar1356[10];
          auVar329[5] = 0;
          auVar329[6] = auVar1356[0xb];
          auVar329[7] = 0;
          auVar329[8] = auVar1356[0xc];
          auVar329[9] = 0;
          auVar329[10] = auVar1356[0xd];
          auVar329[0xb] = 0;
          auVar329[0xc] = auVar1356[0xe];
          auVar329[0xd] = 0;
          auVar329[0xe] = auVar1356[0xf];
          auVar329[0xf] = 0;
          auVar1198 = psllw(auVar329,5);
          uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                             (auVar1517[8] - auVar329._0_2_) * auVar1649._0_2_) >> 5;
          uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                             ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1649._2_2_) >> 5;
          uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                             ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1649._4_2_) >> 5
          ;
          uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                             ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1649._6_2_) >>
                     5;
          uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                             ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1649._8_2_) >>
                     5;
          uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                             ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1649._10_2_)
                     >> 5;
          uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                             ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1649._12_2_)
                     >> 5;
          uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                             ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1649._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
          in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
          in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
          in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
          in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
          in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
          in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
          in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
          in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323);
          in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324);
          in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325);
          in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326);
          in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327);
          auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        if ((int)uVar259 < 1) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 0x10);
      auVar976._0_14_ = local_1038._0_14_;
      auVar976[0xe] = local_1038[7];
      auVar976[0xf] = local_1028[7];
      auVar975._14_2_ = auVar976._14_2_;
      auVar975._0_13_ = local_1038._0_13_;
      auVar975[0xd] = local_1028[6];
      auVar974._13_3_ = auVar975._13_3_;
      auVar974._0_12_ = local_1038._0_12_;
      auVar974[0xc] = local_1038[6];
      auVar973._12_4_ = auVar974._12_4_;
      auVar973._0_11_ = local_1038._0_11_;
      auVar973[0xb] = local_1028[5];
      auVar972._11_5_ = auVar973._11_5_;
      auVar972._0_10_ = local_1038._0_10_;
      auVar972[10] = local_1038[5];
      auVar971._10_6_ = auVar972._10_6_;
      auVar971._0_9_ = local_1038._0_9_;
      auVar971[9] = local_1028[4];
      auVar970._9_7_ = auVar971._9_7_;
      auVar970._0_8_ = local_1038._0_8_;
      auVar970[8] = local_1038[4];
      Var18 = CONCAT91(CONCAT81(auVar970._8_8_,local_1028[3]),local_1038[3]);
      auVar62._2_10_ = Var18;
      auVar62[1] = local_1028[2];
      auVar62[0] = local_1038[2];
      auVar969._4_12_ = auVar62;
      auVar969[3] = local_1028[1];
      auVar969[2] = local_1038[1];
      auVar969._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar2214._0_14_ = local_1018._0_14_;
      auVar2214[0xe] = local_1018[7];
      auVar2214[0xf] = local_1008[7];
      auVar2213._14_2_ = auVar2214._14_2_;
      auVar2213._0_13_ = local_1018._0_13_;
      auVar2213[0xd] = local_1008[6];
      auVar2212._13_3_ = auVar2213._13_3_;
      auVar2212._0_12_ = local_1018._0_12_;
      auVar2212[0xc] = local_1018[6];
      auVar2211._12_4_ = auVar2212._12_4_;
      auVar2211._0_11_ = local_1018._0_11_;
      auVar2211[0xb] = local_1008[5];
      auVar2210._11_5_ = auVar2211._11_5_;
      auVar2210._0_10_ = local_1018._0_10_;
      auVar2210[10] = local_1018[5];
      auVar2209._10_6_ = auVar2210._10_6_;
      auVar2209._0_9_ = local_1018._0_9_;
      auVar2209[9] = local_1008[4];
      auVar2208._9_7_ = auVar2209._9_7_;
      auVar2208._0_8_ = local_1018._0_8_;
      auVar2208[8] = local_1018[4];
      Var21 = CONCAT91(CONCAT81(auVar2208._8_8_,local_1008[3]),local_1018[3]);
      auVar63._2_10_ = Var21;
      auVar63[1] = local_1008[2];
      auVar63[0] = local_1018[2];
      auVar2052._0_14_ = local_ff8._0_14_;
      auVar2052[0xe] = local_ff8[7];
      auVar2052[0xf] = local_fe8[7];
      auVar2051._14_2_ = auVar2052._14_2_;
      auVar2051._0_13_ = local_ff8._0_13_;
      auVar2051[0xd] = local_fe8[6];
      auVar2050._13_3_ = auVar2051._13_3_;
      auVar2050._0_12_ = local_ff8._0_12_;
      auVar2050[0xc] = local_ff8[6];
      auVar2049._12_4_ = auVar2050._12_4_;
      auVar2049._0_11_ = local_ff8._0_11_;
      auVar2049[0xb] = local_fe8[5];
      auVar2048._11_5_ = auVar2049._11_5_;
      auVar2048._0_10_ = local_ff8._0_10_;
      auVar2048[10] = local_ff8[5];
      auVar2047._10_6_ = auVar2048._10_6_;
      auVar2047._0_9_ = local_ff8._0_9_;
      auVar2047[9] = local_fe8[4];
      auVar2046._9_7_ = auVar2047._9_7_;
      auVar2046._0_8_ = local_ff8._0_8_;
      auVar2046[8] = local_ff8[4];
      Var39 = CONCAT91(CONCAT81(auVar2046._8_8_,local_fe8[3]),local_ff8[3]);
      auVar64._2_10_ = Var39;
      auVar64[1] = local_fe8[2];
      auVar64[0] = local_ff8[2];
      auVar2045._4_12_ = auVar64;
      auVar2045[3] = local_fe8[1];
      auVar2045[2] = local_ff8[1];
      auVar2045._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
      auVar2144._0_14_ = local_fd8._0_14_;
      auVar2144[0xe] = local_fd8[7];
      auVar2144[0xf] = local_fc8[7];
      auVar2143._14_2_ = auVar2144._14_2_;
      auVar2143._0_13_ = local_fd8._0_13_;
      auVar2143[0xd] = local_fc8[6];
      auVar2142._13_3_ = auVar2143._13_3_;
      auVar2142._0_12_ = local_fd8._0_12_;
      auVar2142[0xc] = local_fd8[6];
      auVar2141._12_4_ = auVar2142._12_4_;
      auVar2141._0_11_ = local_fd8._0_11_;
      auVar2141[0xb] = local_fc8[5];
      auVar2140._11_5_ = auVar2141._11_5_;
      auVar2140._0_10_ = local_fd8._0_10_;
      auVar2140[10] = local_fd8[5];
      auVar2139._10_6_ = auVar2140._10_6_;
      auVar2139._0_9_ = local_fd8._0_9_;
      auVar2139[9] = local_fc8[4];
      auVar2138._9_7_ = auVar2139._9_7_;
      auVar2138._0_8_ = local_fd8._0_8_;
      auVar2138[8] = local_fd8[4];
      Var42 = CONCAT91(CONCAT81(auVar2138._8_8_,local_fc8[3]),local_fd8[3]);
      auVar65._2_10_ = Var42;
      auVar65[1] = local_fc8[2];
      auVar65[0] = local_fd8[2];
      auVar1931._0_12_ = auVar969._0_12_;
      auVar1931._12_2_ = (short)Var18;
      auVar1931._14_2_ = (short)Var21;
      auVar1930._12_4_ = auVar1931._12_4_;
      auVar1930._0_10_ = auVar969._0_10_;
      auVar1930._10_2_ = auVar63._0_2_;
      auVar1929._10_6_ = auVar1930._10_6_;
      auVar1929._0_8_ = auVar969._0_8_;
      auVar1929._8_2_ = auVar62._0_2_;
      auVar537._0_12_ = auVar2045._0_12_;
      auVar537._12_2_ = (short)Var39;
      auVar537._14_2_ = (short)Var42;
      auVar536._12_4_ = auVar537._12_4_;
      auVar536._0_10_ = auVar2045._0_10_;
      auVar536._10_2_ = auVar65._0_2_;
      auVar535._10_6_ = auVar536._10_6_;
      auVar535._0_8_ = auVar2045._0_8_;
      auVar535._8_2_ = auVar64._0_2_;
      auVar1195._0_14_ = local_fb8._0_14_;
      auVar1195[0xe] = local_fb8[7];
      auVar1195[0xf] = local_fa8[7];
      auVar1194._14_2_ = auVar1195._14_2_;
      auVar1194._0_13_ = local_fb8._0_13_;
      auVar1194[0xd] = local_fa8[6];
      auVar1193._13_3_ = auVar1194._13_3_;
      auVar1193._0_12_ = local_fb8._0_12_;
      auVar1193[0xc] = local_fb8[6];
      auVar1192._12_4_ = auVar1193._12_4_;
      auVar1192._0_11_ = local_fb8._0_11_;
      auVar1192[0xb] = local_fa8[5];
      auVar1191._11_5_ = auVar1192._11_5_;
      auVar1191._0_10_ = local_fb8._0_10_;
      auVar1191[10] = local_fb8[5];
      auVar1190._10_6_ = auVar1191._10_6_;
      auVar1190._0_9_ = local_fb8._0_9_;
      auVar1190[9] = local_fa8[4];
      auVar1189._9_7_ = auVar1190._9_7_;
      auVar1189._0_8_ = local_fb8._0_8_;
      auVar1189[8] = local_fb8[4];
      Var18 = CONCAT91(CONCAT81(auVar1189._8_8_,local_fa8[3]),local_fb8[3]);
      auVar66._2_10_ = Var18;
      auVar66[1] = local_fa8[2];
      auVar66[0] = local_fb8[2];
      auVar1188._4_12_ = auVar66;
      auVar1188[3] = local_fa8[1];
      auVar1188[2] = local_fb8[1];
      auVar1188._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1524._0_14_ = local_f98._0_14_;
      auVar1524[0xe] = local_f98[7];
      auVar1524[0xf] = local_f88[7];
      auVar1523._14_2_ = auVar1524._14_2_;
      auVar1523._0_13_ = local_f98._0_13_;
      auVar1523[0xd] = local_f88[6];
      auVar1522._13_3_ = auVar1523._13_3_;
      auVar1522._0_12_ = local_f98._0_12_;
      auVar1522[0xc] = local_f98[6];
      auVar1521._12_4_ = auVar1522._12_4_;
      auVar1521._0_11_ = local_f98._0_11_;
      auVar1521[0xb] = local_f88[5];
      auVar1520._11_5_ = auVar1521._11_5_;
      auVar1520._0_10_ = local_f98._0_10_;
      auVar1520[10] = local_f98[5];
      auVar1519._10_6_ = auVar1520._10_6_;
      auVar1519._0_9_ = local_f98._0_9_;
      auVar1519[9] = local_f88[4];
      auVar1518._9_7_ = auVar1519._9_7_;
      auVar1518._0_8_ = local_f98._0_8_;
      auVar1518[8] = local_f98[4];
      Var21 = CONCAT91(CONCAT81(auVar1518._8_8_,local_f88[3]),local_f98[3]);
      auVar67._2_10_ = Var21;
      auVar67[1] = local_f88[2];
      auVar67[0] = local_f98[2];
      auVar1657._0_14_ = local_f78._0_14_;
      auVar1657[0xe] = local_f78[7];
      auVar1657[0xf] = local_f68[7];
      auVar1656._14_2_ = auVar1657._14_2_;
      auVar1656._0_13_ = local_f78._0_13_;
      auVar1656[0xd] = local_f68[6];
      auVar1655._13_3_ = auVar1656._13_3_;
      auVar1655._0_12_ = local_f78._0_12_;
      auVar1655[0xc] = local_f78[6];
      auVar1654._12_4_ = auVar1655._12_4_;
      auVar1654._0_11_ = local_f78._0_11_;
      auVar1654[0xb] = local_f68[5];
      auVar1653._11_5_ = auVar1654._11_5_;
      auVar1653._0_10_ = local_f78._0_10_;
      auVar1653[10] = local_f78[5];
      auVar1652._10_6_ = auVar1653._10_6_;
      auVar1652._0_9_ = local_f78._0_9_;
      auVar1652[9] = local_f68[4];
      auVar1651._9_7_ = auVar1652._9_7_;
      auVar1651._0_8_ = local_f78._0_8_;
      auVar1651[8] = local_f78[4];
      Var39 = CONCAT91(CONCAT81(auVar1651._8_8_,local_f68[3]),local_f78[3]);
      auVar68._2_10_ = Var39;
      auVar68[1] = local_f68[2];
      auVar68[0] = local_f78[2];
      auVar1650._4_12_ = auVar68;
      auVar1650[3] = local_f68[1];
      auVar1650[2] = local_f78[1];
      auVar1650._0_2_ = CONCAT11(local_f68[0],local_f78[0]);
      auVar1828._0_14_ = local_f58._0_14_;
      auVar1828[0xe] = local_f58[7];
      auVar1828[0xf] = local_f48[0][7];
      auVar1827._14_2_ = auVar1828._14_2_;
      auVar1827._0_13_ = local_f58._0_13_;
      auVar1827[0xd] = local_f48[0][6];
      auVar1826._13_3_ = auVar1827._13_3_;
      auVar1826._0_12_ = local_f58._0_12_;
      auVar1826[0xc] = local_f58[6];
      auVar1825._12_4_ = auVar1826._12_4_;
      auVar1825._0_11_ = local_f58._0_11_;
      auVar1825[0xb] = local_f48[0][5];
      auVar1824._11_5_ = auVar1825._11_5_;
      auVar1824._0_10_ = local_f58._0_10_;
      auVar1824[10] = local_f58[5];
      auVar1823._10_6_ = auVar1824._10_6_;
      auVar1823._0_9_ = local_f58._0_9_;
      auVar1823[9] = local_f48[0][4];
      auVar1822._9_7_ = auVar1823._9_7_;
      auVar1822._0_8_ = local_f58._0_8_;
      auVar1822[8] = local_f58[4];
      Var42 = CONCAT91(CONCAT81(auVar1822._8_8_,local_f48[0][3]),local_f58[3]);
      auVar69._2_10_ = Var42;
      auVar69[1] = local_f48[0][2];
      auVar69[0] = local_f58[2];
      auVar540._0_12_ = auVar1188._0_12_;
      auVar540._12_2_ = (short)Var18;
      auVar540._14_2_ = (short)Var21;
      auVar539._12_4_ = auVar540._12_4_;
      auVar539._0_10_ = auVar1188._0_10_;
      auVar539._10_2_ = auVar67._0_2_;
      auVar538._10_6_ = auVar539._10_6_;
      auVar538._0_8_ = auVar1188._0_8_;
      auVar538._8_2_ = auVar66._0_2_;
      auVar1354._0_12_ = auVar1650._0_12_;
      auVar1354._12_2_ = (short)Var39;
      auVar1354._14_2_ = (short)Var42;
      auVar1353._12_4_ = auVar1354._12_4_;
      auVar1353._0_10_ = auVar1650._0_10_;
      auVar1353._10_2_ = auVar69._0_2_;
      auVar1352._10_6_ = auVar1353._10_6_;
      auVar1352._0_8_ = auVar1650._0_8_;
      auVar1352._8_2_ = auVar68._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar2045._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar969._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11(local_f48[0][0],local_f58[0]),auVar1650._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar1188._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1624 = local_ff8[1];
      uStack_1623 = local_fe8[1];
      uStack_1622 = local_fd8[1];
      uStack_1621 = local_fc8[1];
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68[1];
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48[0][1];
      local_1618 = auVar1929._8_4_;
      uStack_1614 = auVar535._8_4_;
      uStack_1610 = auVar538._8_4_;
      uStack_160c = auVar1352._8_4_;
      local_1608._8_4_ = auVar1930._12_4_;
      local_1608._12_4_ = auVar536._12_4_;
      local_15f8._0_4_ = CONCAT22(auVar2208._8_2_,auVar970._8_2_);
      auVar912._0_8_ = CONCAT26(auVar2210._10_2_,CONCAT24(auVar972._10_2_,local_15f8._0_4_));
      auVar912._8_2_ = auVar974._12_2_;
      auVar912._10_2_ = auVar2212._12_2_;
      auVar977._12_2_ = auVar975._14_2_;
      auVar977._0_12_ = auVar912;
      auVar977._14_2_ = auVar2213._14_2_;
      local_15f8._4_4_ = CONCAT22(auVar2138._8_2_,auVar2046._8_2_);
      auVar2035._0_8_ = CONCAT26(auVar2140._10_2_,CONCAT24(auVar2048._10_2_,local_15f8._4_4_));
      auVar2035._8_2_ = auVar2050._12_2_;
      auVar2035._10_2_ = auVar2142._12_2_;
      auVar2053._12_2_ = auVar2051._14_2_;
      auVar2053._0_12_ = auVar2035;
      auVar2053._14_2_ = auVar2143._14_2_;
      local_15f8._8_4_ = CONCAT22(auVar1518._8_2_,auVar1189._8_2_);
      auVar1144._0_8_ = CONCAT26(auVar1520._10_2_,CONCAT24(auVar1191._10_2_,local_15f8._8_4_));
      auVar1144._8_2_ = auVar1193._12_2_;
      auVar1144._10_2_ = auVar1522._12_2_;
      local_15f8._12_4_ = CONCAT22(auVar1822._8_2_,auVar1651._8_2_);
      auVar1620._0_8_ = CONCAT26(auVar1824._10_2_,CONCAT24(auVar1653._10_2_,local_15f8._12_4_));
      auVar1620._8_2_ = auVar1655._12_2_;
      auVar1620._10_2_ = auVar1826._12_2_;
      auVar330._8_4_ = (int)((ulong)auVar912._0_8_ >> 0x20);
      auVar330._0_8_ = auVar912._0_8_;
      auVar330._12_4_ = (int)((ulong)auVar2035._0_8_ >> 0x20);
      auVar541._8_4_ = (int)((ulong)auVar1144._0_8_ >> 0x20);
      auVar541._0_8_ = auVar1144._0_8_;
      auVar541._12_4_ = (int)((ulong)auVar1620._0_8_ >> 0x20);
      local_15e8._8_8_ = auVar541._8_8_;
      local_15e8._0_8_ = auVar330._8_8_;
      local_15d8._4_4_ = auVar2035._8_4_;
      local_15d8._0_4_ = auVar912._8_4_;
      local_15d8._8_4_ = auVar1144._8_4_;
      local_15d8._12_4_ = auVar1620._8_4_;
      local_15c8._8_4_ = auVar977._12_4_;
      local_15c8._12_4_ = auVar2053._12_4_;
      uVar265 = CONCAT11(local_1028[8],local_1038[8]);
      uVar1426 = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar265));
      uVar1427 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],uVar1426));
      uVar1428 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar1427));
      auVar1429._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar1428));
      auVar1429[10] = local_1038[0xd];
      auVar1429[0xb] = local_1028[0xd];
      auVar1449[0xc] = local_1038[0xe];
      auVar1449._0_12_ = auVar1429;
      auVar1449[0xd] = local_1028[0xe];
      auVar1467[0xe] = local_1038[0xf];
      auVar1467._0_14_ = auVar1449;
      auVar1467[0xf] = local_1028[0xf];
      uStack_1640 = local_1018[8];
      uStack_163f = local_1018[9];
      uStack_163e = local_1018[10];
      uStack_163d = local_1018[0xb];
      uStack_163c = local_1018[0xc];
      uStack_163b = local_1018[0xd];
      uStack_163a = local_1018[0xe];
      uStack_1639 = local_1018[0xf];
      auVar298._12_4_ =
           CONCAT13(local_1008[9],CONCAT12(uStack_163f,CONCAT11(local_1008[8],uStack_1640)));
      uVar266 = CONCAT15(local_1008[10],CONCAT14(uStack_163e,auVar298._12_4_));
      uVar267 = CONCAT17(local_1008[0xb],CONCAT16(uStack_163d,uVar266));
      auVar465._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(uStack_163c,uVar267));
      auVar465[10] = uStack_163b;
      auVar465[0xb] = local_1008[0xd];
      auVar491[0xc] = uStack_163a;
      auVar491._0_12_ = auVar465;
      auVar491[0xd] = local_1008[0xe];
      auVar542[0xe] = uStack_1639;
      auVar542._0_14_ = auVar491;
      auVar542[0xf] = local_1008[0xf];
      uStack_1670 = local_ff8[8];
      uStack_166f = local_ff8[9];
      uStack_166e = local_ff8[10];
      uStack_166d = local_ff8[0xb];
      uStack_166c = local_ff8[0xc];
      uStack_166b = local_ff8[0xd];
      uStack_166a = local_ff8[0xe];
      uStack_1669 = local_ff8[0xf];
      auVar784._12_4_ =
           CONCAT13(local_fe8[9],CONCAT12(uStack_166f,CONCAT11(local_fe8[8],uStack_1670)));
      uVar459 = CONCAT15(local_fe8[10],CONCAT14(uStack_166e,auVar784._12_4_));
      uVar460 = CONCAT17(local_fe8[0xb],CONCAT16(uStack_166d,uVar459));
      auVar745._0_10_ = CONCAT19(local_fe8[0xc],CONCAT18(uStack_166c,uVar460));
      auVar745[10] = uStack_166b;
      auVar745[0xb] = local_fe8[0xd];
      auVar761[0xc] = uStack_166a;
      auVar761._0_12_ = auVar745;
      auVar761[0xd] = local_fe8[0xe];
      auVar808[0xe] = uStack_1669;
      auVar808._0_14_ = auVar761;
      auVar808[0xf] = local_fe8[0xf];
      uStack_1690 = local_fd8[8];
      uStack_168f = local_fd8[9];
      uStack_168e = local_fd8[10];
      uStack_168d = local_fd8[0xb];
      uStack_168c = local_fd8[0xc];
      uStack_168b = local_fd8[0xd];
      uStack_168a = local_fd8[0xe];
      uStack_1689 = local_fd8[0xf];
      uVar741 = CONCAT13(local_fc8[9],CONCAT12(uStack_168f,CONCAT11(local_fc8[8],uStack_1690)));
      uVar742 = CONCAT15(local_fc8[10],CONCAT14(uStack_168e,uVar741));
      uVar743 = CONCAT17(local_fc8[0xb],CONCAT16(uStack_168d,uVar742));
      auVar913._0_10_ = CONCAT19(local_fc8[0xc],CONCAT18(uStack_168c,uVar743));
      auVar913[10] = uStack_168b;
      auVar913[0xb] = local_fc8[0xd];
      auVar935[0xc] = uStack_168a;
      auVar935._0_12_ = auVar913;
      auVar935[0xd] = local_fc8[0xe];
      auVar978[0xe] = uStack_1689;
      auVar978._0_14_ = auVar935;
      auVar978[0xf] = local_fc8[0xf];
      uVar458 = CONCAT11(local_fa8[8],local_fb8[8]);
      uVar1750 = CONCAT13(local_fa8[9],CONCAT12(local_fb8[9],uVar458));
      uVar1751 = CONCAT15(local_fa8[10],CONCAT14(local_fb8[10],uVar1750));
      uVar1752 = CONCAT17(local_fa8[0xb],CONCAT16(local_fb8[0xb],uVar1751));
      auVar1753._0_10_ = CONCAT19(local_fa8[0xc],CONCAT18(local_fb8[0xc],uVar1752));
      auVar1753[10] = local_fb8[0xd];
      auVar1753[0xb] = local_fa8[0xd];
      auVar1771[0xc] = local_fb8[0xe];
      auVar1771._0_12_ = auVar1753;
      auVar1771[0xd] = local_fa8[0xe];
      auVar1783[0xe] = local_fb8[0xf];
      auVar1783._0_14_ = auVar1771;
      auVar1783[0xf] = local_fa8[0xf];
      uStack_16c0 = local_f98[8];
      uStack_16bf = local_f98[9];
      uStack_16be = local_f98[10];
      uStack_16bd = local_f98[0xb];
      uStack_16bc = local_f98[0xc];
      uStack_16bb = local_f98[0xd];
      uStack_16ba = local_f98[0xe];
      uStack_16b9 = local_f98[0xf];
      uVar908 = CONCAT13(local_f88[9],CONCAT12(uStack_16bf,CONCAT11(local_f88[8],uStack_16c0)));
      uVar909 = CONCAT15(local_f88[10],CONCAT14(uStack_16be,uVar908));
      uVar910 = CONCAT17(local_f88[0xb],CONCAT16(uStack_16bd,uVar909));
      auVar1145._0_10_ = CONCAT19(local_f88[0xc],CONCAT18(uStack_16bc,uVar910));
      auVar1145[10] = uStack_16bb;
      auVar1145[0xb] = local_f88[0xd];
      auVar1163[0xc] = uStack_16ba;
      auVar1163._0_12_ = auVar1145;
      auVar1163[0xd] = local_f88[0xe];
      auVar1196[0xe] = uStack_16b9;
      auVar1196._0_14_ = auVar1163;
      auVar1196[0xf] = local_f88[0xf];
      uVar740 = CONCAT11(local_f68[8],local_f78[8]);
      uVar1987 = CONCAT13(local_f68[9],CONCAT12(local_f78[9],uVar740));
      uVar1988 = CONCAT15(local_f68[10],CONCAT14(local_f78[10],uVar1987));
      uVar1989 = CONCAT17(local_f68[0xb],CONCAT16(local_f78[0xb],uVar1988));
      auVar1990._0_10_ = CONCAT19(local_f68[0xc],CONCAT18(local_f78[0xc],uVar1989));
      auVar1990[10] = local_f78[0xd];
      auVar1990[0xb] = local_f68[0xd];
      auVar2008[0xc] = local_f78[0xe];
      auVar2008._0_12_ = auVar1990;
      auVar2008[0xd] = local_f68[0xe];
      auVar2017[0xe] = local_f78[0xf];
      auVar2017._0_14_ = auVar2008;
      auVar2017[0xf] = local_f68[0xf];
      uStack_16f0 = local_f58[8];
      uStack_16ef = local_f58[9];
      uStack_16ee = local_f58[10];
      uStack_16ed = local_f58[0xb];
      uStack_16ec = local_f58[0xc];
      uStack_16eb = local_f58[0xd];
      uStack_16ea = local_f58[0xe];
      uStack_16e9 = local_f58[0xf];
      uVar1905 = CONCAT13(local_f48[0][9],
                          CONCAT12(uStack_16ef,CONCAT11(local_f48[0][8],uStack_16f0)));
      uVar1906 = CONCAT15(local_f48[0][10],CONCAT14(uStack_16ee,uVar1905));
      uVar1907 = CONCAT17(local_f48[0][0xb],CONCAT16(uStack_16ed,uVar1906));
      auVar1908._0_10_ = CONCAT19(local_f48[0][0xc],CONCAT18(uStack_16ec,uVar1907));
      auVar1908[10] = uStack_16eb;
      auVar1908[0xb] = local_f48[0][0xd];
      auVar1917[0xc] = uStack_16ea;
      auVar1917._0_12_ = auVar1908;
      auVar1917[0xd] = local_f48[0][0xe];
      auVar1932[0xe] = uStack_16e9;
      auVar1932._0_14_ = auVar1917;
      auVar1932[0xf] = local_f48[0][0xf];
      auVar336._12_2_ = (short)((ulong)uVar1428 >> 0x30);
      auVar336._0_12_ = auVar1429;
      auVar336._14_2_ = (short)((ulong)uVar267 >> 0x30);
      auVar335._12_4_ = auVar336._12_4_;
      auVar335._10_2_ = (short)((uint6)uVar266 >> 0x20);
      auVar335._0_10_ = auVar1429._0_10_;
      auVar334._10_6_ = auVar335._10_6_;
      auVar334._8_2_ = (short)((uint6)uVar1427 >> 0x20);
      auVar334._0_8_ = uVar1428;
      auVar333._8_8_ = auVar334._8_8_;
      auVar333._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
      auVar333._0_6_ = uVar1427;
      auVar332._6_10_ = auVar333._6_10_;
      auVar332._4_2_ = (short)((uint)uVar1426 >> 0x10);
      auVar332._0_4_ = uVar1426;
      auVar331._4_12_ = auVar332._4_12_;
      auVar331._0_4_ = CONCAT22(CONCAT11(local_1008[8],uStack_1640),uVar265);
      auVar547._12_2_ = (short)((ulong)uVar460 >> 0x30);
      auVar547._0_12_ = auVar745;
      auVar547._14_2_ = (short)((ulong)uVar743 >> 0x30);
      auVar546._12_4_ = auVar547._12_4_;
      auVar546._10_2_ = (short)((uint6)uVar742 >> 0x20);
      auVar546._0_10_ = auVar745._0_10_;
      auVar545._10_6_ = auVar546._10_6_;
      auVar545._8_2_ = (short)((uint6)uVar459 >> 0x20);
      auVar545._0_8_ = uVar460;
      auVar544._8_8_ = auVar545._8_8_;
      auVar544._6_2_ = (short)((uint)uVar741 >> 0x10);
      auVar544._0_6_ = uVar459;
      auVar543._6_10_ = auVar544._6_10_;
      auVar543._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
      auVar543._0_4_ = auVar784._12_4_;
      auVar814._12_2_ = (short)((ulong)uVar1752 >> 0x30);
      auVar814._0_12_ = auVar1753;
      auVar814._14_2_ = (short)((ulong)uVar910 >> 0x30);
      auVar813._12_4_ = auVar814._12_4_;
      auVar813._10_2_ = (short)((uint6)uVar909 >> 0x20);
      auVar813._0_10_ = auVar1753._0_10_;
      auVar812._10_6_ = auVar813._10_6_;
      auVar812._8_2_ = (short)((uint6)uVar1751 >> 0x20);
      auVar812._0_8_ = uVar1752;
      auVar811._8_8_ = auVar812._8_8_;
      auVar811._6_2_ = (short)((uint)uVar908 >> 0x10);
      auVar811._0_6_ = uVar1751;
      auVar810._6_10_ = auVar811._6_10_;
      auVar810._4_2_ = (short)((uint)uVar1750 >> 0x10);
      auVar810._0_4_ = uVar1750;
      auVar809._4_12_ = auVar810._4_12_;
      auVar809._0_4_ = CONCAT22(CONCAT11(local_f88[8],uStack_16c0),uVar458);
      auVar983._12_2_ = (short)((ulong)uVar1989 >> 0x30);
      auVar983._0_12_ = auVar1990;
      auVar983._14_2_ = (short)((ulong)uVar1907 >> 0x30);
      auVar982._12_4_ = auVar983._12_4_;
      auVar982._10_2_ = (short)((uint6)uVar1906 >> 0x20);
      auVar982._0_10_ = auVar1990._0_10_;
      auVar981._10_6_ = auVar982._10_6_;
      auVar981._8_2_ = (short)((uint6)uVar1988 >> 0x20);
      auVar981._0_8_ = uVar1989;
      auVar980._8_8_ = auVar981._8_8_;
      auVar980._6_2_ = (short)((uint)uVar1905 >> 0x10);
      auVar980._0_6_ = uVar1988;
      auVar979._6_10_ = auVar980._6_10_;
      auVar979._4_2_ = (short)((uint)uVar1987 >> 0x10);
      auVar979._0_4_ = uVar1987;
      auVar1197._0_8_ = auVar331._0_8_;
      auVar1197._8_4_ = auVar332._4_4_;
      auVar1197._12_4_ = auVar543._4_4_;
      auVar548._0_8_ = auVar809._0_8_;
      auVar548._8_4_ = auVar810._4_4_;
      auVar548._12_4_ = auVar979._4_4_;
      local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_fc8[8],uStack_1690),
                                     CONCAT11(local_fe8[8],uStack_1670)),auVar331._0_4_);
      auStack_15b0[0] =
           CONCAT44(CONCAT22(CONCAT11(local_f48[0][8],uStack_16f0),uVar740),auVar809._0_4_);
      auStack_15b0[1] = auVar1197._8_8_;
      auStack_15b0[2] = auVar548._8_8_;
      local_1598 = CONCAT44(auVar545._8_4_,auVar334._8_4_);
      uStack_1590 = CONCAT44(auVar981._8_4_,auVar812._8_4_);
      local_1588._8_4_ = auVar335._12_4_;
      local_1588._12_4_ = auVar546._12_4_;
      auVar784._12_4_ =
           CONCAT22((short)((unkuint10)auVar465._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1429._0_10_ >> 0x40));
      auVar1430._0_8_ = CONCAT26(auVar465._10_2_,CONCAT24(auVar1429._10_2_,auVar784._12_4_));
      auVar1430._8_2_ = auVar1449._12_2_;
      auVar1430._10_2_ = auVar491._12_2_;
      auVar1468._12_2_ = auVar1467._14_2_;
      auVar1468._0_12_ = auVar1430;
      auVar1468._14_2_ = auVar542._14_2_;
      auVar298._12_4_ =
           CONCAT22((short)((unkuint10)auVar913._0_10_ >> 0x40),
                    (short)((unkuint10)auVar745._0_10_ >> 0x40));
      auVar466._0_8_ = CONCAT26(auVar913._10_2_,CONCAT24(auVar745._10_2_,auVar298._12_4_));
      auVar466._8_2_ = auVar761._12_2_;
      auVar466._10_2_ = auVar935._12_2_;
      auVar549._12_2_ = auVar808._14_2_;
      auVar549._0_12_ = auVar466;
      auVar549._14_2_ = auVar978._14_2_;
      uVar741 = CONCAT22((short)((unkuint10)auVar1145._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1753._0_10_ >> 0x40));
      auVar1754._0_8_ = CONCAT26(auVar1145._10_2_,CONCAT24(auVar1753._10_2_,uVar741));
      auVar1754._8_2_ = auVar1771._12_2_;
      auVar1754._10_2_ = auVar1163._12_2_;
      auVar1784._12_2_ = auVar1783._14_2_;
      auVar1784._0_12_ = auVar1754;
      auVar1784._14_2_ = auVar1196._14_2_;
      uVar908 = CONCAT22((short)((unkuint10)auVar1908._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1990._0_10_ >> 0x40));
      auVar1991._0_8_ = CONCAT26(auVar1908._10_2_,CONCAT24(auVar1990._10_2_,uVar908));
      auVar1991._8_2_ = auVar2008._12_2_;
      auVar1991._10_2_ = auVar1917._12_2_;
      auVar2018._12_2_ = auVar2017._14_2_;
      auVar2018._0_12_ = auVar1991;
      auVar2018._14_2_ = auVar1932._14_2_;
      auVar337._8_4_ = (int)((ulong)auVar1430._0_8_ >> 0x20);
      auVar337._0_8_ = auVar1430._0_8_;
      auVar337._12_4_ = (int)((ulong)auVar466._0_8_ >> 0x20);
      auVar550._8_4_ = (int)((ulong)auVar1754._0_8_ >> 0x20);
      auVar550._0_8_ = auVar1754._0_8_;
      auVar550._12_4_ = (int)((ulong)auVar1991._0_8_ >> 0x20);
      local_1578 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
      uStack_1570 = CONCAT44(uVar908,uVar741);
      local_1568 = auVar337._8_8_;
      uStack_1560 = auVar550._8_8_;
      local_1558 = CONCAT44(auVar466._8_4_,auVar1430._8_4_);
      uStack_1550 = CONCAT44(auVar1991._8_4_,auVar1754._8_4_);
      local_1548._8_4_ = auVar1468._12_4_;
      local_1548._12_4_ = auVar549._12_4_;
      local_1538 = CONCAT44(auVar2018._12_4_,auVar1784._12_4_);
      lVar252 = 0;
      do {
        uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar252);
        *(undefined8 *)(dst + 8) = uVar267;
        lVar252 = lVar252 + 0x10;
        dst = dst + stride;
      } while (lVar252 != 0x100);
      return;
    }
    if (bw == 0x20) {
      auVar551 = pshufb(ZEXT116(left[0x3f]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar258 = (int)uVar257 >> 6;
        lVar260 = lVar252;
        if (iVar258 < 0x3f) {
          uVar259 = -(iVar258 + -0x3f);
          auVar338 = ZEXT416(uVar257 >> 1 & 0x1f);
          auVar338 = pshuflw(auVar338,auVar338,0);
          lVar260 = 0;
          do {
            auVar1200 = auVar551;
            if (lVar260 < (int)uVar259) {
              auVar1356 = *(undefined1 (*) [16])(left + lVar260 + iVar258);
              auVar1517 = *(undefined1 (*) [16])(left + lVar260 + (long)iVar258 + 1);
              auVar1198 = pmovzxbw(auVar551,auVar1356);
              auVar1525 = pmovzxbw(in_XMM7,auVar1517);
              auVar1199 = psllw(auVar1198,5);
              sVar264 = auVar338._0_2_;
              in_XMM7._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * sVar264;
              sVar457 = auVar338._2_2_;
              in_XMM7._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * sVar457;
              in_XMM7._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * sVar264;
              in_XMM7._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * sVar457;
              in_XMM7._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * sVar264;
              in_XMM7._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * sVar457;
              in_XMM7._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * sVar264;
              in_XMM7._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * sVar457;
              uVar1143 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM7._0_2_) >> 5;
              uVar1321 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM7._2_2_) >> 5;
              uVar1322 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM7._4_2_) >> 5;
              uVar1323 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM7._6_2_) >> 5;
              uVar1324 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM7._8_2_) >> 5;
              uVar1325 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM7._10_2_) >> 5;
              uVar1326 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM7._12_2_) >> 5;
              uVar1327 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM7._14_2_) >> 5;
              auVar1355._0_2_ = CONCAT11(0,auVar1356[8]);
              auVar1355[2] = auVar1356[9];
              auVar1355[3] = 0;
              auVar1355[4] = auVar1356[10];
              auVar1355[5] = 0;
              auVar1355[6] = auVar1356[0xb];
              auVar1355[7] = 0;
              auVar1355[8] = auVar1356[0xc];
              auVar1355[9] = 0;
              auVar1355[10] = auVar1356[0xd];
              auVar1355[0xb] = 0;
              auVar1355[0xc] = auVar1356[0xe];
              auVar1355[0xd] = 0;
              auVar1355[0xe] = auVar1356[0xf];
              auVar1355[0xf] = 0;
              auVar1198 = psllw(auVar1355,5);
              uVar1328 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                                 (auVar1517[8] - auVar1355._0_2_) * sVar264) >> 5;
              uVar1419 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                                 ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * sVar457) >> 5;
              uVar1420 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                                 ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * sVar264) >> 5;
              uVar1421 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                                 ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * sVar457) >> 5;
              uVar1422 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                                 ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * sVar264) >> 5;
              uVar1423 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                                 ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * sVar457) >> 5;
              uVar1424 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                                 ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * sVar264) >> 5;
              uVar1425 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                                 ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * sVar457) >> 5;
              auVar1200[1] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 -
                             (0xff < uVar1321);
              auVar1200[0] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 -
                             (0xff < uVar1143);
              auVar1200[2] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 -
                             (0xff < uVar1322);
              auVar1200[3] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 -
                             (0xff < uVar1323);
              auVar1200[4] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 -
                             (0xff < uVar1324);
              auVar1200[5] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 -
                             (0xff < uVar1325);
              auVar1200[6] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 -
                             (0xff < uVar1326);
              auVar1200[7] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 -
                             (0xff < uVar1327);
              auVar1200[8] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 -
                             (0xff < uVar1328);
              auVar1200[9] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 -
                             (0xff < uVar1419);
              auVar1200[10] =
                   (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
              auVar1200[0xb] =
                   (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
              auVar1200[0xc] =
                   (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
              auVar1200[0xd] =
                   (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
              auVar1200[0xe] =
                   (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
              auVar1200[0xf] =
                   (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            }
            *(undefined1 (*) [16])((long)local_1638 + lVar260) = auVar1200;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 == 0x10);
          if (0x1f < (int)uVar259) {
            uVar259 = 0x20;
          }
          auVar3._8_8_ = local_1638[1];
          auVar3._0_8_ = local_1638[0];
          auVar338 = pblendvb(auVar551,auVar3,(undefined1  [16])Mask[0][uVar259]);
          auVar6[1] = uStack_1627;
          auVar6[0] = local_1628;
          auVar6[2] = uStack_1626;
          auVar6[3] = uStack_1625;
          auVar6[4] = uStack_1624;
          auVar6[5] = uStack_1623;
          auVar6[6] = uStack_1622;
          auVar6[7] = uStack_1621;
          auVar6[8] = uStack_1620;
          auVar6[9] = uStack_161f;
          auVar6[10] = uStack_161e;
          auVar6[0xb] = uStack_161d;
          auVar6[0xc] = uStack_161c;
          auVar6[0xd] = uStack_161b;
          auVar6[0xe] = uStack_161a;
          auVar6[0xf] = uStack_1619;
          auVar1356 = pblendvb(auVar551,auVar6,(undefined1  [16])Mask[1][uVar259]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar338;
          *(undefined1 (*) [16])(&local_1438 + lVar256 * 4) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        else {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            *(undefined1 (*) [16])((long)&local_1438 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x200);
        }
        if (0x3e < iVar258) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 0x20);
      auVar992._0_14_ = local_1038._0_14_;
      auVar992[0xe] = local_1038[7];
      auVar992[0xf] = local_1028[7];
      auVar991._14_2_ = auVar992._14_2_;
      auVar991._0_13_ = local_1038._0_13_;
      auVar991[0xd] = local_1028[6];
      auVar990._13_3_ = auVar991._13_3_;
      auVar990._0_12_ = local_1038._0_12_;
      auVar990[0xc] = local_1038[6];
      auVar989._12_4_ = auVar990._12_4_;
      auVar989._0_11_ = local_1038._0_11_;
      auVar989[0xb] = local_1028[5];
      auVar988._11_5_ = auVar989._11_5_;
      auVar988._0_10_ = local_1038._0_10_;
      auVar988[10] = local_1038[5];
      auVar987._10_6_ = auVar988._10_6_;
      auVar987._0_9_ = local_1038._0_9_;
      auVar987[9] = local_1028[4];
      auVar986._9_7_ = auVar987._9_7_;
      auVar986._0_8_ = local_1038._0_8_;
      auVar986[8] = local_1038[4];
      Var18 = CONCAT91(CONCAT81(auVar986._8_8_,local_1028[3]),local_1038[3]);
      auVar70._2_10_ = Var18;
      auVar70[1] = local_1028[2];
      auVar70[0] = local_1038[2];
      auVar985._4_12_ = auVar70;
      auVar985[3] = local_1028[1];
      auVar985[2] = local_1038[1];
      auVar985._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar2221._0_14_ = local_1018._0_14_;
      auVar2221[0xe] = local_1018[7];
      auVar2221[0xf] = local_1008[7];
      auVar2220._14_2_ = auVar2221._14_2_;
      auVar2220._0_13_ = local_1018._0_13_;
      auVar2220[0xd] = local_1008[6];
      auVar2219._13_3_ = auVar2220._13_3_;
      auVar2219._0_12_ = local_1018._0_12_;
      auVar2219[0xc] = local_1018[6];
      auVar2218._12_4_ = auVar2219._12_4_;
      auVar2218._0_11_ = local_1018._0_11_;
      auVar2218[0xb] = local_1008[5];
      auVar2217._11_5_ = auVar2218._11_5_;
      auVar2217._0_10_ = local_1018._0_10_;
      auVar2217[10] = local_1018[5];
      auVar2216._10_6_ = auVar2217._10_6_;
      auVar2216._0_9_ = local_1018._0_9_;
      auVar2216[9] = local_1008[4];
      auVar2215._9_7_ = auVar2216._9_7_;
      auVar2215._0_8_ = local_1018._0_8_;
      auVar2215[8] = local_1018[4];
      Var21 = CONCAT91(CONCAT81(auVar2215._8_8_,local_1008[3]),local_1018[3]);
      auVar71._2_10_ = Var21;
      auVar71[1] = local_1008[2];
      auVar71[0] = local_1018[2];
      auVar2061._0_14_ = local_ff8._0_14_;
      auVar2061[0xe] = local_ff8[7];
      auVar2061[0xf] = local_fe8[7];
      auVar2060._14_2_ = auVar2061._14_2_;
      auVar2060._0_13_ = local_ff8._0_13_;
      auVar2060[0xd] = local_fe8[6];
      auVar2059._13_3_ = auVar2060._13_3_;
      auVar2059._0_12_ = local_ff8._0_12_;
      auVar2059[0xc] = local_ff8[6];
      auVar2058._12_4_ = auVar2059._12_4_;
      auVar2058._0_11_ = local_ff8._0_11_;
      auVar2058[0xb] = local_fe8[5];
      auVar2057._11_5_ = auVar2058._11_5_;
      auVar2057._0_10_ = local_ff8._0_10_;
      auVar2057[10] = local_ff8[5];
      auVar2056._10_6_ = auVar2057._10_6_;
      auVar2056._0_9_ = local_ff8._0_9_;
      auVar2056[9] = local_fe8[4];
      auVar2055._9_7_ = auVar2056._9_7_;
      auVar2055._0_8_ = local_ff8._0_8_;
      auVar2055[8] = local_ff8[4];
      Var39 = CONCAT91(CONCAT81(auVar2055._8_8_,local_fe8[3]),local_ff8[3]);
      auVar72._2_10_ = Var39;
      auVar72[1] = local_fe8[2];
      auVar72[0] = local_ff8[2];
      auVar2054._4_12_ = auVar72;
      auVar2054[3] = local_fe8[1];
      auVar2054[2] = local_ff8[1];
      auVar2054._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
      auVar2151._0_14_ = local_fd8._0_14_;
      auVar2151[0xe] = local_fd8[7];
      auVar2151[0xf] = local_fc8[7];
      auVar2150._14_2_ = auVar2151._14_2_;
      auVar2150._0_13_ = local_fd8._0_13_;
      auVar2150[0xd] = local_fc8[6];
      auVar2149._13_3_ = auVar2150._13_3_;
      auVar2149._0_12_ = local_fd8._0_12_;
      auVar2149[0xc] = local_fd8[6];
      auVar2148._12_4_ = auVar2149._12_4_;
      auVar2148._0_11_ = local_fd8._0_11_;
      auVar2148[0xb] = local_fc8[5];
      auVar2147._11_5_ = auVar2148._11_5_;
      auVar2147._0_10_ = local_fd8._0_10_;
      auVar2147[10] = local_fd8[5];
      auVar2146._10_6_ = auVar2147._10_6_;
      auVar2146._0_9_ = local_fd8._0_9_;
      auVar2146[9] = local_fc8[4];
      auVar2145._9_7_ = auVar2146._9_7_;
      auVar2145._0_8_ = local_fd8._0_8_;
      auVar2145[8] = local_fd8[4];
      Var42 = CONCAT91(CONCAT81(auVar2145._8_8_,local_fc8[3]),local_fd8[3]);
      auVar73._2_10_ = Var42;
      auVar73[1] = local_fc8[2];
      auVar73[0] = local_fd8[2];
      auVar1935._0_12_ = auVar985._0_12_;
      auVar1935._12_2_ = (short)Var18;
      auVar1935._14_2_ = (short)Var21;
      auVar1934._12_4_ = auVar1935._12_4_;
      auVar1934._0_10_ = auVar985._0_10_;
      auVar1934._10_2_ = auVar71._0_2_;
      auVar1933._10_6_ = auVar1934._10_6_;
      auVar1933._0_8_ = auVar985._0_8_;
      auVar1933._8_2_ = auVar70._0_2_;
      auVar554._0_12_ = auVar2054._0_12_;
      auVar554._12_2_ = (short)Var39;
      auVar554._14_2_ = (short)Var42;
      auVar553._12_4_ = auVar554._12_4_;
      auVar553._0_10_ = auVar2054._0_10_;
      auVar553._10_2_ = auVar73._0_2_;
      auVar552._10_6_ = auVar553._10_6_;
      auVar552._0_8_ = auVar2054._0_8_;
      auVar552._8_2_ = auVar72._0_2_;
      auVar1208._0_14_ = local_fb8._0_14_;
      auVar1208[0xe] = local_fb8[7];
      auVar1208[0xf] = local_fa8[7];
      auVar1207._14_2_ = auVar1208._14_2_;
      auVar1207._0_13_ = local_fb8._0_13_;
      auVar1207[0xd] = local_fa8[6];
      auVar1206._13_3_ = auVar1207._13_3_;
      auVar1206._0_12_ = local_fb8._0_12_;
      auVar1206[0xc] = local_fb8[6];
      auVar1205._12_4_ = auVar1206._12_4_;
      auVar1205._0_11_ = local_fb8._0_11_;
      auVar1205[0xb] = local_fa8[5];
      auVar1204._11_5_ = auVar1205._11_5_;
      auVar1204._0_10_ = local_fb8._0_10_;
      auVar1204[10] = local_fb8[5];
      auVar1203._10_6_ = auVar1204._10_6_;
      auVar1203._0_9_ = local_fb8._0_9_;
      auVar1203[9] = local_fa8[4];
      auVar1202._9_7_ = auVar1203._9_7_;
      auVar1202._0_8_ = local_fb8._0_8_;
      auVar1202[8] = local_fb8[4];
      Var18 = CONCAT91(CONCAT81(auVar1202._8_8_,local_fa8[3]),local_fb8[3]);
      auVar74._2_10_ = Var18;
      auVar74[1] = local_fa8[2];
      auVar74[0] = local_fb8[2];
      auVar1201._4_12_ = auVar74;
      auVar1201[3] = local_fa8[1];
      auVar1201[2] = local_fb8[1];
      auVar1201._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1532._0_14_ = local_f98._0_14_;
      auVar1532[0xe] = local_f98[7];
      auVar1532[0xf] = local_f88[7];
      auVar1531._14_2_ = auVar1532._14_2_;
      auVar1531._0_13_ = local_f98._0_13_;
      auVar1531[0xd] = local_f88[6];
      auVar1530._13_3_ = auVar1531._13_3_;
      auVar1530._0_12_ = local_f98._0_12_;
      auVar1530[0xc] = local_f98[6];
      auVar1529._12_4_ = auVar1530._12_4_;
      auVar1529._0_11_ = local_f98._0_11_;
      auVar1529[0xb] = local_f88[5];
      auVar1528._11_5_ = auVar1529._11_5_;
      auVar1528._0_10_ = local_f98._0_10_;
      auVar1528[10] = local_f98[5];
      auVar1527._10_6_ = auVar1528._10_6_;
      auVar1527._0_9_ = local_f98._0_9_;
      auVar1527[9] = local_f88[4];
      auVar1526._9_7_ = auVar1527._9_7_;
      auVar1526._0_8_ = local_f98._0_8_;
      auVar1526[8] = local_f98[4];
      Var21 = CONCAT91(CONCAT81(auVar1526._8_8_,local_f88[3]),local_f98[3]);
      auVar75._2_10_ = Var21;
      auVar75[1] = local_f88[2];
      auVar75[0] = local_f98[2];
      auVar1665._0_14_ = local_f78._0_14_;
      auVar1665[0xe] = local_f78[7];
      auVar1665[0xf] = local_f68[7];
      auVar1664._14_2_ = auVar1665._14_2_;
      auVar1664._0_13_ = local_f78._0_13_;
      auVar1664[0xd] = local_f68[6];
      auVar1663._13_3_ = auVar1664._13_3_;
      auVar1663._0_12_ = local_f78._0_12_;
      auVar1663[0xc] = local_f78[6];
      auVar1662._12_4_ = auVar1663._12_4_;
      auVar1662._0_11_ = local_f78._0_11_;
      auVar1662[0xb] = local_f68[5];
      auVar1661._11_5_ = auVar1662._11_5_;
      auVar1661._0_10_ = local_f78._0_10_;
      auVar1661[10] = local_f78[5];
      auVar1660._10_6_ = auVar1661._10_6_;
      auVar1660._0_9_ = local_f78._0_9_;
      auVar1660[9] = local_f68[4];
      auVar1659._9_7_ = auVar1660._9_7_;
      auVar1659._0_8_ = local_f78._0_8_;
      auVar1659[8] = local_f78[4];
      Var39 = CONCAT91(CONCAT81(auVar1659._8_8_,local_f68[3]),local_f78[3]);
      auVar76._2_10_ = Var39;
      auVar76[1] = local_f68[2];
      auVar76[0] = local_f78[2];
      auVar1658._4_12_ = auVar76;
      auVar1658[3] = local_f68[1];
      auVar1658[2] = local_f78[1];
      auVar1658._0_2_ = CONCAT11(local_f68[0],local_f78[0]);
      auVar1835._0_14_ = local_f58._0_14_;
      auVar1835[0xe] = local_f58[7];
      auVar1835[0xf] = local_f48[0][7];
      auVar1834._14_2_ = auVar1835._14_2_;
      auVar1834._0_13_ = local_f58._0_13_;
      auVar1834[0xd] = local_f48[0][6];
      auVar1833._13_3_ = auVar1834._13_3_;
      auVar1833._0_12_ = local_f58._0_12_;
      auVar1833[0xc] = local_f58[6];
      auVar1832._12_4_ = auVar1833._12_4_;
      auVar1832._0_11_ = local_f58._0_11_;
      auVar1832[0xb] = local_f48[0][5];
      auVar1831._11_5_ = auVar1832._11_5_;
      auVar1831._0_10_ = local_f58._0_10_;
      auVar1831[10] = local_f58[5];
      auVar1830._10_6_ = auVar1831._10_6_;
      auVar1830._0_9_ = local_f58._0_9_;
      auVar1830[9] = local_f48[0][4];
      auVar1829._9_7_ = auVar1830._9_7_;
      auVar1829._0_8_ = local_f58._0_8_;
      auVar1829[8] = local_f58[4];
      Var42 = CONCAT91(CONCAT81(auVar1829._8_8_,local_f48[0][3]),local_f58[3]);
      auVar77._2_10_ = Var42;
      auVar77[1] = local_f48[0][2];
      auVar77[0] = local_f58[2];
      auVar557._0_12_ = auVar1201._0_12_;
      auVar557._12_2_ = (short)Var18;
      auVar557._14_2_ = (short)Var21;
      auVar556._12_4_ = auVar557._12_4_;
      auVar556._0_10_ = auVar1201._0_10_;
      auVar556._10_2_ = auVar75._0_2_;
      auVar555._10_6_ = auVar556._10_6_;
      auVar555._0_8_ = auVar1201._0_8_;
      auVar555._8_2_ = auVar74._0_2_;
      auVar1359._0_12_ = auVar1658._0_12_;
      auVar1359._12_2_ = (short)Var39;
      auVar1359._14_2_ = (short)Var42;
      auVar1358._12_4_ = auVar1359._12_4_;
      auVar1358._0_10_ = auVar1658._0_10_;
      auVar1358._10_2_ = auVar77._0_2_;
      auVar1357._10_6_ = auVar1358._10_6_;
      auVar1357._0_8_ = auVar1658._0_8_;
      auVar1357._8_2_ = auVar76._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar2054._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar985._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11(local_f48[0][0],local_f58[0]),auVar1658._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar1201._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1624 = local_ff8[1];
      uStack_1623 = local_fe8[1];
      uStack_1622 = local_fd8[1];
      uStack_1621 = local_fc8[1];
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68[1];
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48[0][1];
      local_1618 = auVar1933._8_4_;
      uStack_1614 = auVar552._8_4_;
      uStack_1610 = auVar555._8_4_;
      uStack_160c = auVar1357._8_4_;
      local_1608._8_4_ = auVar1934._12_4_;
      local_1608._12_4_ = auVar553._12_4_;
      local_15f8._0_4_ = CONCAT22(auVar2215._8_2_,auVar986._8_2_);
      auVar914._0_8_ = CONCAT26(auVar2217._10_2_,CONCAT24(auVar988._10_2_,local_15f8._0_4_));
      auVar914._8_2_ = auVar990._12_2_;
      auVar914._10_2_ = auVar2219._12_2_;
      auVar993._12_2_ = auVar991._14_2_;
      auVar993._0_12_ = auVar914;
      auVar993._14_2_ = auVar2220._14_2_;
      local_15f8._4_4_ = CONCAT22(auVar2145._8_2_,auVar2055._8_2_);
      auVar2036._0_8_ = CONCAT26(auVar2147._10_2_,CONCAT24(auVar2057._10_2_,local_15f8._4_4_));
      auVar2036._8_2_ = auVar2059._12_2_;
      auVar2036._10_2_ = auVar2149._12_2_;
      auVar2062._12_2_ = auVar2060._14_2_;
      auVar2062._0_12_ = auVar2036;
      auVar2062._14_2_ = auVar2150._14_2_;
      local_15f8._8_4_ = CONCAT22(auVar1526._8_2_,auVar1202._8_2_);
      auVar1146._0_8_ = CONCAT26(auVar1528._10_2_,CONCAT24(auVar1204._10_2_,local_15f8._8_4_));
      auVar1146._8_2_ = auVar1206._12_2_;
      auVar1146._10_2_ = auVar1530._12_2_;
      local_15f8._12_4_ = CONCAT22(auVar1829._8_2_,auVar1659._8_2_);
      auVar1621._0_8_ = CONCAT26(auVar1831._10_2_,CONCAT24(auVar1661._10_2_,local_15f8._12_4_));
      auVar1621._8_2_ = auVar1663._12_2_;
      auVar1621._10_2_ = auVar1833._12_2_;
      auVar339._8_4_ = (int)((ulong)auVar914._0_8_ >> 0x20);
      auVar339._0_8_ = auVar914._0_8_;
      auVar339._12_4_ = (int)((ulong)auVar2036._0_8_ >> 0x20);
      auVar558._8_4_ = (int)((ulong)auVar1146._0_8_ >> 0x20);
      auVar558._0_8_ = auVar1146._0_8_;
      auVar558._12_4_ = (int)((ulong)auVar1621._0_8_ >> 0x20);
      local_15e8._8_8_ = auVar558._8_8_;
      local_15e8._0_8_ = auVar339._8_8_;
      local_15d8._4_4_ = auVar2036._8_4_;
      local_15d8._0_4_ = auVar914._8_4_;
      local_15d8._8_4_ = auVar1146._8_4_;
      local_15d8._12_4_ = auVar1621._8_4_;
      local_15c8._8_4_ = auVar993._12_4_;
      local_15c8._12_4_ = auVar2062._12_4_;
      uVar265 = CONCAT11(local_1028[8],local_1038[8]);
      uVar1426 = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar265));
      uVar1427 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],uVar1426));
      uVar1428 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar1427));
      auVar1431._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar1428));
      auVar1431[10] = local_1038[0xd];
      auVar1431[0xb] = local_1028[0xd];
      auVar1450[0xc] = local_1038[0xe];
      auVar1450._0_12_ = auVar1431;
      auVar1450[0xd] = local_1028[0xe];
      auVar1469[0xe] = local_1038[0xf];
      auVar1469._0_14_ = auVar1450;
      auVar1469[0xf] = local_1028[0xf];
      uStack_1640 = local_1018[8];
      uStack_163f = local_1018[9];
      uStack_163e = local_1018[10];
      uStack_163d = local_1018[0xb];
      uStack_163c = local_1018[0xc];
      uStack_163b = local_1018[0xd];
      uStack_163a = local_1018[0xe];
      uStack_1639 = local_1018[0xf];
      auVar298._12_4_ =
           CONCAT13(local_1008[9],CONCAT12(uStack_163f,CONCAT11(local_1008[8],uStack_1640)));
      uVar266 = CONCAT15(local_1008[10],CONCAT14(uStack_163e,auVar298._12_4_));
      uVar267 = CONCAT17(local_1008[0xb],CONCAT16(uStack_163d,uVar266));
      auVar467._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(uStack_163c,uVar267));
      auVar467[10] = uStack_163b;
      auVar467[0xb] = local_1008[0xd];
      auVar492[0xc] = uStack_163a;
      auVar492._0_12_ = auVar467;
      auVar492[0xd] = local_1008[0xe];
      auVar559[0xe] = uStack_1639;
      auVar559._0_14_ = auVar492;
      auVar559[0xf] = local_1008[0xf];
      uStack_1670 = local_ff8[8];
      uStack_166f = local_ff8[9];
      uStack_166e = local_ff8[10];
      uStack_166d = local_ff8[0xb];
      uStack_166c = local_ff8[0xc];
      uStack_166b = local_ff8[0xd];
      uStack_166a = local_ff8[0xe];
      uStack_1669 = local_ff8[0xf];
      auVar784._12_4_ =
           CONCAT13(local_fe8[9],CONCAT12(uStack_166f,CONCAT11(local_fe8[8],uStack_1670)));
      uVar459 = CONCAT15(local_fe8[10],CONCAT14(uStack_166e,auVar784._12_4_));
      uVar460 = CONCAT17(local_fe8[0xb],CONCAT16(uStack_166d,uVar459));
      auVar746._0_10_ = CONCAT19(local_fe8[0xc],CONCAT18(uStack_166c,uVar460));
      auVar746[10] = uStack_166b;
      auVar746[0xb] = local_fe8[0xd];
      auVar762[0xc] = uStack_166a;
      auVar762._0_12_ = auVar746;
      auVar762[0xd] = local_fe8[0xe];
      auVar815[0xe] = uStack_1669;
      auVar815._0_14_ = auVar762;
      auVar815[0xf] = local_fe8[0xf];
      uStack_1690 = local_fd8[8];
      uStack_168f = local_fd8[9];
      uStack_168e = local_fd8[10];
      uStack_168d = local_fd8[0xb];
      uStack_168c = local_fd8[0xc];
      uStack_168b = local_fd8[0xd];
      uStack_168a = local_fd8[0xe];
      uStack_1689 = local_fd8[0xf];
      uVar741 = CONCAT13(local_fc8[9],CONCAT12(uStack_168f,CONCAT11(local_fc8[8],uStack_1690)));
      uVar742 = CONCAT15(local_fc8[10],CONCAT14(uStack_168e,uVar741));
      uVar743 = CONCAT17(local_fc8[0xb],CONCAT16(uStack_168d,uVar742));
      auVar915._0_10_ = CONCAT19(local_fc8[0xc],CONCAT18(uStack_168c,uVar743));
      auVar915[10] = uStack_168b;
      auVar915[0xb] = local_fc8[0xd];
      auVar936[0xc] = uStack_168a;
      auVar936._0_12_ = auVar915;
      auVar936[0xd] = local_fc8[0xe];
      auVar994[0xe] = uStack_1689;
      auVar994._0_14_ = auVar936;
      auVar994[0xf] = local_fc8[0xf];
      uVar458 = CONCAT11(local_fa8[8],local_fb8[8]);
      uVar1750 = CONCAT13(local_fa8[9],CONCAT12(local_fb8[9],uVar458));
      uVar1751 = CONCAT15(local_fa8[10],CONCAT14(local_fb8[10],uVar1750));
      uVar1752 = CONCAT17(local_fa8[0xb],CONCAT16(local_fb8[0xb],uVar1751));
      auVar1755._0_10_ = CONCAT19(local_fa8[0xc],CONCAT18(local_fb8[0xc],uVar1752));
      auVar1755[10] = local_fb8[0xd];
      auVar1755[0xb] = local_fa8[0xd];
      auVar1772[0xc] = local_fb8[0xe];
      auVar1772._0_12_ = auVar1755;
      auVar1772[0xd] = local_fa8[0xe];
      uStack_16c0 = local_f98[8];
      uStack_16bf = local_f98[9];
      uStack_16be = local_f98[10];
      uStack_16bd = local_f98[0xb];
      uStack_16bc = local_f98[0xc];
      uStack_16bb = local_f98[0xd];
      uStack_16ba = local_f98[0xe];
      uVar908 = CONCAT13(local_f88[9],CONCAT12(uStack_16bf,CONCAT11(local_f88[8],uStack_16c0)));
      uVar909 = CONCAT15(local_f88[10],CONCAT14(uStack_16be,uVar908));
      uVar910 = CONCAT17(local_f88[0xb],CONCAT16(uStack_16bd,uVar909));
      auVar1147._0_10_ = CONCAT19(local_f88[0xc],CONCAT18(uStack_16bc,uVar910));
      auVar1147[10] = uStack_16bb;
      auVar1147[0xb] = local_f88[0xd];
      auVar1164[0xc] = uStack_16ba;
      auVar1164._0_12_ = auVar1147;
      auVar1164[0xd] = local_f88[0xe];
      uVar740 = CONCAT11(local_f68[8],local_f78[8]);
      uVar1987 = CONCAT13(local_f68[9],CONCAT12(local_f78[9],uVar740));
      uVar1988 = CONCAT15(local_f68[10],CONCAT14(local_f78[10],uVar1987));
      uVar1989 = CONCAT17(local_f68[0xb],CONCAT16(local_f78[0xb],uVar1988));
      auVar1992._0_10_ = CONCAT19(local_f68[0xc],CONCAT18(local_f78[0xc],uVar1989));
      auVar1992[10] = local_f78[0xd];
      auVar1992[0xb] = local_f68[0xd];
      auVar2009[0xc] = local_f78[0xe];
      auVar2009._0_12_ = auVar1992;
      auVar2009[0xd] = local_f68[0xe];
      uStack_16f0 = local_f58[8];
      uStack_16ef = local_f58[9];
      uStack_16ee = local_f58[10];
      uStack_16ed = local_f58[0xb];
      uStack_16ec = local_f58[0xc];
      uStack_16eb = local_f58[0xd];
      uStack_16ea = local_f58[0xe];
      uVar1905 = CONCAT13(local_f48[0][9],
                          CONCAT12(uStack_16ef,CONCAT11(local_f48[0][8],uStack_16f0)));
      uVar1906 = CONCAT15(local_f48[0][10],CONCAT14(uStack_16ee,uVar1905));
      uVar1907 = CONCAT17(local_f48[0][0xb],CONCAT16(uStack_16ed,uVar1906));
      auVar1909._0_10_ = CONCAT19(local_f48[0][0xc],CONCAT18(uStack_16ec,uVar1907));
      auVar1909[10] = uStack_16eb;
      auVar1909[0xb] = local_f48[0][0xd];
      auVar1918[0xc] = uStack_16ea;
      auVar1918._0_12_ = auVar1909;
      auVar1918[0xd] = local_f48[0][0xe];
      auVar345._12_2_ = (short)((ulong)uVar1428 >> 0x30);
      auVar345._0_12_ = auVar1431;
      auVar345._14_2_ = (short)((ulong)uVar267 >> 0x30);
      auVar344._12_4_ = auVar345._12_4_;
      auVar344._10_2_ = (short)((uint6)uVar266 >> 0x20);
      auVar344._0_10_ = auVar1431._0_10_;
      auVar343._10_6_ = auVar344._10_6_;
      auVar343._8_2_ = (short)((uint6)uVar1427 >> 0x20);
      auVar343._0_8_ = uVar1428;
      auVar342._8_8_ = auVar343._8_8_;
      auVar342._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
      auVar342._0_6_ = uVar1427;
      auVar341._6_10_ = auVar342._6_10_;
      auVar341._4_2_ = (short)((uint)uVar1426 >> 0x10);
      auVar341._0_4_ = uVar1426;
      auVar340._4_12_ = auVar341._4_12_;
      auVar340._0_4_ = CONCAT22(CONCAT11(local_1008[8],uStack_1640),uVar265);
      auVar564._12_2_ = (short)((ulong)uVar460 >> 0x30);
      auVar564._0_12_ = auVar746;
      auVar564._14_2_ = (short)((ulong)uVar743 >> 0x30);
      auVar563._12_4_ = auVar564._12_4_;
      auVar563._10_2_ = (short)((uint6)uVar742 >> 0x20);
      auVar563._0_10_ = auVar746._0_10_;
      auVar562._10_6_ = auVar563._10_6_;
      auVar562._8_2_ = (short)((uint6)uVar459 >> 0x20);
      auVar562._0_8_ = uVar460;
      auVar561._8_8_ = auVar562._8_8_;
      auVar561._6_2_ = (short)((uint)uVar741 >> 0x10);
      auVar561._0_6_ = uVar459;
      auVar560._6_10_ = auVar561._6_10_;
      auVar560._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
      auVar560._0_4_ = auVar784._12_4_;
      auVar821._12_2_ = (short)((ulong)uVar1752 >> 0x30);
      auVar821._0_12_ = auVar1755;
      auVar821._14_2_ = (short)((ulong)uVar910 >> 0x30);
      auVar820._12_4_ = auVar821._12_4_;
      auVar820._10_2_ = (short)((uint6)uVar909 >> 0x20);
      auVar820._0_10_ = auVar1755._0_10_;
      auVar819._10_6_ = auVar820._10_6_;
      auVar819._8_2_ = (short)((uint6)uVar1751 >> 0x20);
      auVar819._0_8_ = uVar1752;
      auVar818._8_8_ = auVar819._8_8_;
      auVar818._6_2_ = (short)((uint)uVar908 >> 0x10);
      auVar818._0_6_ = uVar1751;
      auVar817._6_10_ = auVar818._6_10_;
      auVar817._4_2_ = (short)((uint)uVar1750 >> 0x10);
      auVar817._0_4_ = uVar1750;
      auVar816._4_12_ = auVar817._4_12_;
      auVar816._0_4_ = CONCAT22(CONCAT11(local_f88[8],uStack_16c0),uVar458);
      auVar999._12_2_ = (short)((ulong)uVar1989 >> 0x30);
      auVar999._0_12_ = auVar1992;
      auVar999._14_2_ = (short)((ulong)uVar1907 >> 0x30);
      auVar998._12_4_ = auVar999._12_4_;
      auVar998._10_2_ = (short)((uint6)uVar1906 >> 0x20);
      auVar998._0_10_ = auVar1992._0_10_;
      auVar997._10_6_ = auVar998._10_6_;
      auVar997._8_2_ = (short)((uint6)uVar1988 >> 0x20);
      auVar997._0_8_ = uVar1989;
      auVar996._8_8_ = auVar997._8_8_;
      auVar996._6_2_ = (short)((uint)uVar1905 >> 0x10);
      auVar996._0_6_ = uVar1988;
      auVar995._6_10_ = auVar996._6_10_;
      auVar995._4_2_ = (short)((uint)uVar1987 >> 0x10);
      auVar995._0_4_ = uVar1987;
      auVar1209._0_8_ = auVar340._0_8_;
      auVar1209._8_4_ = auVar341._4_4_;
      auVar1209._12_4_ = auVar560._4_4_;
      auVar565._0_8_ = auVar816._0_8_;
      auVar565._8_4_ = auVar817._4_4_;
      auVar565._12_4_ = auVar995._4_4_;
      local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_fc8[8],uStack_1690),
                                     CONCAT11(local_fe8[8],uStack_1670)),auVar340._0_4_);
      auStack_15b0[0] =
           CONCAT44(CONCAT22(CONCAT11(local_f48[0][8],uStack_16f0),uVar740),auVar816._0_4_);
      auStack_15b0[1] = auVar1209._8_8_;
      auStack_15b0[2] = auVar565._8_8_;
      local_1598 = CONCAT44(auVar562._8_4_,auVar343._8_4_);
      uStack_1590 = CONCAT44(auVar997._8_4_,auVar819._8_4_);
      local_1588._8_4_ = auVar344._12_4_;
      local_1588._12_4_ = auVar563._12_4_;
      auVar784._12_4_ =
           CONCAT22((short)((unkuint10)auVar467._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1431._0_10_ >> 0x40));
      auVar1432._0_8_ = CONCAT26(auVar467._10_2_,CONCAT24(auVar1431._10_2_,auVar784._12_4_));
      auVar1432._8_2_ = auVar1450._12_2_;
      auVar1432._10_2_ = auVar492._12_2_;
      auVar1470._12_2_ = auVar1469._14_2_;
      auVar1470._0_12_ = auVar1432;
      auVar1470._14_2_ = auVar559._14_2_;
      auVar298._12_4_ =
           CONCAT22((short)((unkuint10)auVar915._0_10_ >> 0x40),
                    (short)((unkuint10)auVar746._0_10_ >> 0x40));
      auVar468._0_8_ = CONCAT26(auVar915._10_2_,CONCAT24(auVar746._10_2_,auVar298._12_4_));
      auVar468._8_2_ = auVar762._12_2_;
      auVar468._10_2_ = auVar936._12_2_;
      auVar566._12_2_ = auVar815._14_2_;
      auVar566._0_12_ = auVar468;
      auVar566._14_2_ = auVar994._14_2_;
      uVar741 = CONCAT22((short)((unkuint10)auVar1147._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1755._0_10_ >> 0x40));
      auVar1756._0_8_ = CONCAT26(auVar1147._10_2_,CONCAT24(auVar1755._10_2_,uVar741));
      auVar1756._8_2_ = auVar1772._12_2_;
      auVar1756._10_2_ = auVar1164._12_2_;
      uVar908 = CONCAT22((short)((unkuint10)auVar1909._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1992._0_10_ >> 0x40));
      auVar1993._0_8_ = CONCAT26(auVar1909._10_2_,CONCAT24(auVar1992._10_2_,uVar908));
      auVar1993._8_2_ = auVar2009._12_2_;
      auVar1993._10_2_ = auVar1918._12_2_;
      auVar346._8_4_ = (int)((ulong)auVar1432._0_8_ >> 0x20);
      auVar346._0_8_ = auVar1432._0_8_;
      auVar346._12_4_ = (int)((ulong)auVar468._0_8_ >> 0x20);
      auVar567._8_4_ = (int)((ulong)auVar1756._0_8_ >> 0x20);
      auVar567._0_8_ = auVar1756._0_8_;
      auVar567._12_4_ = (int)((ulong)auVar1993._0_8_ >> 0x20);
      local_1578 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
      uStack_1570 = CONCAT44(uVar908,uVar741);
      local_1568 = auVar346._8_8_;
      uStack_1560 = auVar567._8_8_;
      local_1558 = CONCAT44(auVar468._8_4_,auVar1432._8_4_);
      uStack_1550 = CONCAT44(auVar1993._8_4_,auVar1756._8_4_);
      local_1548._8_4_ = auVar1470._12_4_;
      local_1548._12_4_ = auVar566._12_4_;
      auVar13._8_8_ = uStack_1430;
      auVar13._0_8_ = CONCAT44(uStack_1434,local_1438);
      auVar1007._0_14_ = auVar13._0_14_;
      auVar1007[0xe] = (char)((uint)uStack_1434 >> 0x18);
      auVar1007[0xf] = uStack_1421;
      auVar1006._14_2_ = auVar1007._14_2_;
      auVar1006._0_13_ = auVar13._0_13_;
      auVar1006[0xd] = uStack_1422;
      auVar1005._13_3_ = auVar1006._13_3_;
      auVar1005._0_12_ = auVar13._0_12_;
      auVar1005[0xc] = (char)((uint)uStack_1434 >> 0x10);
      auVar1004._12_4_ = auVar1005._12_4_;
      auVar1004._0_11_ = auVar13._0_11_;
      auVar1004[0xb] = uStack_1423;
      auVar1003._11_5_ = auVar1004._11_5_;
      auVar1003._0_10_ = auVar13._0_10_;
      auVar1003[10] = (char)((uint)uStack_1434 >> 8);
      auVar1002._10_6_ = auVar1003._10_6_;
      auVar1002._0_9_ = auVar13._0_9_;
      auVar1002[9] = uStack_1424;
      auVar1001._9_7_ = auVar1002._9_7_;
      auVar1001[8] = (char)uStack_1434;
      auVar1001._0_8_ = CONCAT44(uStack_1434,local_1438);
      Var18 = CONCAT91(CONCAT81(auVar1001._8_8_,uStack_1425),(char)((uint)local_1438 >> 0x18));
      auVar79._2_10_ = Var18;
      auVar79[1] = uStack_1426;
      auVar79[0] = (char)((uint)local_1438 >> 0x10);
      auVar78._2_12_ = auVar79;
      auVar78[1] = uStack_1427;
      auVar78[0] = (char)((uint)local_1438 >> 8);
      auVar1000._0_2_ = CONCAT11(local_1428,(char)local_1438);
      auVar1000._2_14_ = auVar78;
      auVar2228._0_14_ = local_1418._0_14_;
      auVar2228[0xe] = local_1418[7];
      auVar2228[0xf] = uStack_1401;
      auVar2227._14_2_ = auVar2228._14_2_;
      auVar2227._0_13_ = local_1418._0_13_;
      auVar2227[0xd] = uStack_1402;
      auVar2226._13_3_ = auVar2227._13_3_;
      auVar2226._0_12_ = local_1418._0_12_;
      auVar2226[0xc] = local_1418[6];
      auVar2225._12_4_ = auVar2226._12_4_;
      auVar2225._0_11_ = local_1418._0_11_;
      auVar2225[0xb] = uStack_1403;
      auVar2224._11_5_ = auVar2225._11_5_;
      auVar2224._0_10_ = local_1418._0_10_;
      auVar2224[10] = local_1418[5];
      auVar2223._10_6_ = auVar2224._10_6_;
      auVar2223._0_9_ = local_1418._0_9_;
      auVar2223[9] = uStack_1404;
      auVar2222._9_7_ = auVar2223._9_7_;
      auVar2222._0_8_ = local_1418._0_8_;
      auVar2222[8] = local_1418[4];
      Var21 = CONCAT91(CONCAT81(auVar2222._8_8_,uStack_1405),local_1418[3]);
      auVar81._2_10_ = Var21;
      auVar81[1] = uStack_1406;
      auVar81[0] = local_1418[2];
      auVar80._2_12_ = auVar81;
      auVar80[1] = uStack_1407;
      auVar80[0] = local_1418[1];
      auVar2070._0_14_ = local_13f8._0_14_;
      auVar2070[0xe] = local_13f8[7];
      auVar2070[0xf] = uStack_13e1;
      auVar2069._14_2_ = auVar2070._14_2_;
      auVar2069._0_13_ = local_13f8._0_13_;
      auVar2069[0xd] = uStack_13e2;
      auVar2068._13_3_ = auVar2069._13_3_;
      auVar2068._0_12_ = local_13f8._0_12_;
      auVar2068[0xc] = local_13f8[6];
      auVar2067._12_4_ = auVar2068._12_4_;
      auVar2067._0_11_ = local_13f8._0_11_;
      auVar2067[0xb] = uStack_13e3;
      auVar2066._11_5_ = auVar2067._11_5_;
      auVar2066._0_10_ = local_13f8._0_10_;
      auVar2066[10] = local_13f8[5];
      auVar2065._10_6_ = auVar2066._10_6_;
      auVar2065._0_9_ = local_13f8._0_9_;
      auVar2065[9] = uStack_13e4;
      auVar2064._9_7_ = auVar2065._9_7_;
      auVar2064._0_8_ = local_13f8._0_8_;
      auVar2064[8] = local_13f8[4];
      Var39 = CONCAT91(CONCAT81(auVar2064._8_8_,uStack_13e5),local_13f8[3]);
      auVar83._2_10_ = Var39;
      auVar83[1] = uStack_13e6;
      auVar83[0] = local_13f8[2];
      auVar82._2_12_ = auVar83;
      auVar82[1] = uStack_13e7;
      auVar82[0] = local_13f8[1];
      auVar2063._0_2_ = CONCAT11(local_13e8,local_13f8[0]);
      auVar2063._2_14_ = auVar82;
      auVar2158._0_14_ = local_13d8._0_14_;
      auVar2158[0xe] = local_13d8[7];
      auVar2158[0xf] = uStack_13c1;
      auVar2157._14_2_ = auVar2158._14_2_;
      auVar2157._0_13_ = local_13d8._0_13_;
      auVar2157[0xd] = uStack_13c2;
      auVar2156._13_3_ = auVar2157._13_3_;
      auVar2156._0_12_ = local_13d8._0_12_;
      auVar2156[0xc] = local_13d8[6];
      auVar2155._12_4_ = auVar2156._12_4_;
      auVar2155._0_11_ = local_13d8._0_11_;
      auVar2155[0xb] = uStack_13c3;
      auVar2154._11_5_ = auVar2155._11_5_;
      auVar2154._0_10_ = local_13d8._0_10_;
      auVar2154[10] = local_13d8[5];
      auVar2153._10_6_ = auVar2154._10_6_;
      auVar2153._0_9_ = local_13d8._0_9_;
      auVar2153[9] = uStack_13c4;
      auVar2152._9_7_ = auVar2153._9_7_;
      auVar2152._0_8_ = local_13d8._0_8_;
      auVar2152[8] = local_13d8[4];
      Var42 = CONCAT91(CONCAT81(auVar2152._8_8_,uStack_13c5),local_13d8[3]);
      auVar85._2_10_ = Var42;
      auVar85[1] = uStack_13c6;
      auVar85[0] = local_13d8[2];
      auVar84._2_12_ = auVar85;
      auVar84[1] = uStack_13c7;
      auVar84[0] = local_13d8[1];
      auVar1939._0_12_ = auVar1000._0_12_;
      auVar1939._12_2_ = (short)Var18;
      auVar1939._14_2_ = (short)Var21;
      auVar1938._12_4_ = auVar1939._12_4_;
      auVar1938._0_10_ = auVar1000._0_10_;
      auVar1938._10_2_ = auVar81._0_2_;
      auVar1937._10_6_ = auVar1938._10_6_;
      auVar1937._0_8_ = auVar1000._0_8_;
      auVar1937._8_2_ = auVar79._0_2_;
      auVar86._4_8_ = auVar1937._8_8_;
      auVar86._2_2_ = auVar80._0_2_;
      auVar86._0_2_ = auVar78._0_2_;
      auVar1936._0_4_ = CONCAT22(CONCAT11(local_1408,local_1418[0]),auVar1000._0_2_);
      auVar1936._4_12_ = auVar86;
      auVar570._0_12_ = auVar2063._0_12_;
      auVar570._12_2_ = (short)Var39;
      auVar570._14_2_ = (short)Var42;
      auVar569._12_4_ = auVar570._12_4_;
      auVar569._0_10_ = auVar2063._0_10_;
      auVar569._10_2_ = auVar85._0_2_;
      auVar568._10_6_ = auVar569._10_6_;
      auVar568._0_8_ = auVar2063._0_8_;
      auVar568._8_2_ = auVar83._0_2_;
      auVar87._4_8_ = auVar568._8_8_;
      auVar87._2_2_ = auVar84._0_2_;
      auVar87._0_2_ = auVar82._0_2_;
      auVar822._0_8_ = auVar1936._0_8_;
      auVar822._8_4_ = auVar86._0_4_;
      auVar822._12_4_ = auVar87._0_4_;
      auVar1217._0_14_ = local_13b8._0_14_;
      auVar1217[0xe] = local_13b8[7];
      auVar1217[0xf] = uStack_13a1;
      auVar1216._14_2_ = auVar1217._14_2_;
      auVar1216._0_13_ = local_13b8._0_13_;
      auVar1216[0xd] = uStack_13a2;
      auVar1215._13_3_ = auVar1216._13_3_;
      auVar1215._0_12_ = local_13b8._0_12_;
      auVar1215[0xc] = local_13b8[6];
      auVar1214._12_4_ = auVar1215._12_4_;
      auVar1214._0_11_ = local_13b8._0_11_;
      auVar1214[0xb] = uStack_13a3;
      auVar1213._11_5_ = auVar1214._11_5_;
      auVar1213._0_10_ = local_13b8._0_10_;
      auVar1213[10] = local_13b8[5];
      auVar1212._10_6_ = auVar1213._10_6_;
      auVar1212._0_9_ = local_13b8._0_9_;
      auVar1212[9] = uStack_13a4;
      auVar1211._9_7_ = auVar1212._9_7_;
      auVar1211._0_8_ = local_13b8._0_8_;
      auVar1211[8] = local_13b8[4];
      Var18 = CONCAT91(CONCAT81(auVar1211._8_8_,uStack_13a5),local_13b8[3]);
      auVar89._2_10_ = Var18;
      auVar89[1] = uStack_13a6;
      auVar89[0] = local_13b8[2];
      auVar88._2_12_ = auVar89;
      auVar88[1] = uStack_13a7;
      auVar88[0] = local_13b8[1];
      auVar1210._0_2_ = CONCAT11(local_13a8,local_13b8[0]);
      auVar1210._2_14_ = auVar88;
      auVar1539._0_14_ = local_1398._0_14_;
      auVar1539[0xe] = local_1398[7];
      auVar1539[0xf] = uStack_1381;
      auVar1538._14_2_ = auVar1539._14_2_;
      auVar1538._0_13_ = local_1398._0_13_;
      auVar1538[0xd] = uStack_1382;
      auVar1537._13_3_ = auVar1538._13_3_;
      auVar1537._0_12_ = local_1398._0_12_;
      auVar1537[0xc] = local_1398[6];
      auVar1536._12_4_ = auVar1537._12_4_;
      auVar1536._0_11_ = local_1398._0_11_;
      auVar1536[0xb] = uStack_1383;
      auVar1535._11_5_ = auVar1536._11_5_;
      auVar1535._0_10_ = local_1398._0_10_;
      auVar1535[10] = local_1398[5];
      auVar1534._10_6_ = auVar1535._10_6_;
      auVar1534._0_9_ = local_1398._0_9_;
      auVar1534[9] = uStack_1384;
      auVar1533._9_7_ = auVar1534._9_7_;
      auVar1533._0_8_ = local_1398._0_8_;
      auVar1533[8] = local_1398[4];
      Var21 = CONCAT91(CONCAT81(auVar1533._8_8_,uStack_1385),local_1398[3]);
      auVar91._2_10_ = Var21;
      auVar91[1] = uStack_1386;
      auVar91[0] = local_1398[2];
      auVar90._2_12_ = auVar91;
      auVar90[1] = uStack_1387;
      auVar90[0] = local_1398[1];
      auVar1673._0_14_ = local_1378._0_14_;
      auVar1673[0xe] = local_1378[7];
      auVar1673[0xf] = uStack_1361;
      auVar1672._14_2_ = auVar1673._14_2_;
      auVar1672._0_13_ = local_1378._0_13_;
      auVar1672[0xd] = uStack_1362;
      auVar1671._13_3_ = auVar1672._13_3_;
      auVar1671._0_12_ = local_1378._0_12_;
      auVar1671[0xc] = local_1378[6];
      auVar1670._12_4_ = auVar1671._12_4_;
      auVar1670._0_11_ = local_1378._0_11_;
      auVar1670[0xb] = uStack_1363;
      auVar1669._11_5_ = auVar1670._11_5_;
      auVar1669._0_10_ = local_1378._0_10_;
      auVar1669[10] = local_1378[5];
      auVar1668._10_6_ = auVar1669._10_6_;
      auVar1668._0_9_ = local_1378._0_9_;
      auVar1668[9] = uStack_1364;
      auVar1667._9_7_ = auVar1668._9_7_;
      auVar1667._0_8_ = local_1378._0_8_;
      auVar1667[8] = local_1378[4];
      Var39 = CONCAT91(CONCAT81(auVar1667._8_8_,uStack_1365),local_1378[3]);
      auVar93._2_10_ = Var39;
      auVar93[1] = uStack_1366;
      auVar93[0] = local_1378[2];
      auVar92._2_12_ = auVar93;
      auVar92[1] = uStack_1367;
      auVar92[0] = local_1378[1];
      auVar1666._0_2_ = CONCAT11(local_1368,local_1378[0]);
      auVar1666._2_14_ = auVar92;
      auVar1842._0_14_ = local_1358._0_14_;
      auVar1842[0xe] = local_1358[7];
      auVar1842[0xf] = uStack_1341;
      auVar1841._14_2_ = auVar1842._14_2_;
      auVar1841._0_13_ = local_1358._0_13_;
      auVar1841[0xd] = uStack_1342;
      auVar1840._13_3_ = auVar1841._13_3_;
      auVar1840._0_12_ = local_1358._0_12_;
      auVar1840[0xc] = local_1358[6];
      auVar1839._12_4_ = auVar1840._12_4_;
      auVar1839._0_11_ = local_1358._0_11_;
      auVar1839[0xb] = uStack_1343;
      auVar1838._11_5_ = auVar1839._11_5_;
      auVar1838._0_10_ = local_1358._0_10_;
      auVar1838[10] = local_1358[5];
      auVar1837._10_6_ = auVar1838._10_6_;
      auVar1837._0_9_ = local_1358._0_9_;
      auVar1837[9] = uStack_1344;
      auVar1836._9_7_ = auVar1837._9_7_;
      auVar1836._0_8_ = local_1358._0_8_;
      auVar1836[8] = local_1358[4];
      Var42 = CONCAT91(CONCAT81(auVar1836._8_8_,uStack_1345),local_1358[3]);
      auVar95._2_10_ = Var42;
      auVar95[1] = uStack_1346;
      auVar95[0] = local_1358[2];
      auVar94._2_12_ = auVar95;
      auVar94[1] = uStack_1347;
      auVar94[0] = local_1358[1];
      auVar574._0_12_ = auVar1210._0_12_;
      auVar574._12_2_ = (short)Var18;
      auVar574._14_2_ = (short)Var21;
      auVar573._12_4_ = auVar574._12_4_;
      auVar573._0_10_ = auVar1210._0_10_;
      auVar573._10_2_ = auVar91._0_2_;
      auVar572._10_6_ = auVar573._10_6_;
      auVar572._0_8_ = auVar1210._0_8_;
      auVar572._8_2_ = auVar89._0_2_;
      auVar96._4_8_ = auVar572._8_8_;
      auVar96._2_2_ = auVar90._0_2_;
      auVar96._0_2_ = auVar88._0_2_;
      auVar571._0_4_ = CONCAT22(CONCAT11(local_1388,local_1398[0]),auVar1210._0_2_);
      auVar571._4_12_ = auVar96;
      auVar1362._0_12_ = auVar1666._0_12_;
      auVar1362._12_2_ = (short)Var39;
      auVar1362._14_2_ = (short)Var42;
      auVar1361._12_4_ = auVar1362._12_4_;
      auVar1361._0_10_ = auVar1666._0_10_;
      auVar1361._10_2_ = auVar95._0_2_;
      auVar1360._10_6_ = auVar1361._10_6_;
      auVar1360._0_8_ = auVar1666._0_8_;
      auVar1360._8_2_ = auVar93._0_2_;
      auVar97._4_8_ = auVar1360._8_8_;
      auVar97._2_2_ = auVar94._0_2_;
      auVar97._0_2_ = auVar92._0_2_;
      auVar347._0_8_ = auVar571._0_8_;
      auVar347._8_4_ = auVar96._0_4_;
      auVar347._12_4_ = auVar97._0_4_;
      local_1238[0] =
           CONCAT44(CONCAT22(CONCAT11(local_13c8,local_13d8[0]),auVar2063._0_2_),auVar1936._0_4_);
      local_1238[1] =
           CONCAT44(CONCAT22(CONCAT11(local_1348,local_1358[0]),auVar1666._0_2_),auVar571._0_4_);
      local_1238[2] = auVar822._8_8_;
      local_1238[3] = auVar347._8_8_;
      local_1218 = auVar1937._8_4_;
      uStack_1214 = auVar568._8_4_;
      uStack_1210 = auVar572._8_4_;
      uStack_120c = auVar1360._8_4_;
      uStack_1200 = auVar1938._12_4_;
      uStack_11fc = auVar569._12_4_;
      auVar298._12_4_ = CONCAT22(auVar2222._8_2_,auVar1001._8_2_);
      auVar916._0_8_ = CONCAT26(auVar2224._10_2_,CONCAT24(auVar1003._10_2_,auVar298._12_4_));
      auVar916._8_2_ = auVar1005._12_2_;
      auVar916._10_2_ = auVar2226._12_2_;
      auVar1008._12_2_ = auVar1006._14_2_;
      auVar1008._0_12_ = auVar916;
      auVar1008._14_2_ = auVar2227._14_2_;
      uVar908 = CONCAT22(auVar2152._8_2_,auVar2064._8_2_);
      auVar2037._0_8_ = CONCAT26(auVar2154._10_2_,CONCAT24(auVar2066._10_2_,uVar908));
      auVar2037._8_2_ = auVar2068._12_2_;
      auVar2037._10_2_ = auVar2156._12_2_;
      auVar2071._12_2_ = auVar2069._14_2_;
      auVar2071._0_12_ = auVar2037;
      auVar2071._14_2_ = auVar2157._14_2_;
      auVar784._12_4_ = CONCAT22(auVar1533._8_2_,auVar1211._8_2_);
      auVar1148._0_8_ = CONCAT26(auVar1535._10_2_,CONCAT24(auVar1213._10_2_,auVar784._12_4_));
      auVar1148._8_2_ = auVar1215._12_2_;
      auVar1148._10_2_ = auVar1537._12_2_;
      uVar741 = CONCAT22(auVar1836._8_2_,auVar1667._8_2_);
      auVar1622._0_8_ = CONCAT26(auVar1838._10_2_,CONCAT24(auVar1669._10_2_,uVar741));
      auVar1622._8_2_ = auVar1671._12_2_;
      auVar1622._10_2_ = auVar1840._12_2_;
      auVar348._8_4_ = (int)((ulong)auVar916._0_8_ >> 0x20);
      auVar348._0_8_ = auVar916._0_8_;
      auVar348._12_4_ = (int)((ulong)auVar2037._0_8_ >> 0x20);
      auVar575._8_4_ = (int)((ulong)auVar1148._0_8_ >> 0x20);
      auVar575._0_8_ = auVar1148._0_8_;
      auVar575._12_4_ = (int)((ulong)auVar1622._0_8_ >> 0x20);
      local_11f8 = CONCAT44(uVar908,auVar298._12_4_);
      uStack_11f0 = CONCAT44(uVar741,auVar784._12_4_);
      local_11e8 = auVar348._8_8_;
      uStack_11e0 = auVar575._8_8_;
      local_11d8 = auVar916._8_4_;
      uStack_11d4 = auVar2037._8_4_;
      uStack_11d0 = auVar1148._8_4_;
      uStack_11cc = auVar1622._8_4_;
      uStack_11c0 = auVar1008._12_4_;
      uStack_11bc = auVar2071._12_4_;
      uVar265 = CONCAT11(uStack_1420,(char)uStack_1430);
      uVar1426 = CONCAT13(uStack_141f,CONCAT12((char)((ulong)uStack_1430 >> 8),uVar265));
      uVar1427 = CONCAT15(uStack_141e,CONCAT14((char)((ulong)uStack_1430 >> 0x10),uVar1426));
      uVar1428 = CONCAT17(uStack_141d,CONCAT16((char)((ulong)uStack_1430 >> 0x18),uVar1427));
      auVar1433._0_10_ = CONCAT19(uStack_141c,CONCAT18((char)((ulong)uStack_1430 >> 0x20),uVar1428))
      ;
      auVar1433[10] = (char)((ulong)uStack_1430 >> 0x28);
      auVar1433[0xb] = uStack_141b;
      auVar1451[0xc] = (char)((ulong)uStack_1430 >> 0x30);
      auVar1451._0_12_ = auVar1433;
      auVar1451[0xd] = uStack_141a;
      auVar1471[0xe] = (char)((ulong)uStack_1430 >> 0x38);
      auVar1471._0_14_ = auVar1451;
      auVar1471[0xf] = uStack_1419;
      uStack_1640 = local_1418[8];
      uStack_163f = local_1418[9];
      uStack_163e = local_1418[10];
      uStack_163d = local_1418[0xb];
      uStack_163c = local_1418[0xc];
      uStack_163b = local_1418[0xd];
      uStack_163a = local_1418[0xe];
      uStack_1639 = local_1418[0xf];
      auVar298._12_4_ =
           CONCAT13(uStack_13ff,CONCAT12(uStack_163f,CONCAT11(uStack_1400,uStack_1640)));
      uVar266 = CONCAT15(uStack_13fe,CONCAT14(uStack_163e,auVar298._12_4_));
      uVar267 = CONCAT17(uStack_13fd,CONCAT16(uStack_163d,uVar266));
      auVar469._0_10_ = CONCAT19(uStack_13fc,CONCAT18(uStack_163c,uVar267));
      auVar469[10] = uStack_163b;
      auVar469[0xb] = uStack_13fb;
      auVar493[0xc] = uStack_163a;
      auVar493._0_12_ = auVar469;
      auVar493[0xd] = uStack_13fa;
      auVar576[0xe] = uStack_1639;
      auVar576._0_14_ = auVar493;
      auVar576[0xf] = uStack_13f9;
      uStack_1670 = local_13f8[8];
      uStack_166f = local_13f8[9];
      uStack_166e = local_13f8[10];
      uStack_166d = local_13f8[0xb];
      uStack_166c = local_13f8[0xc];
      uStack_166b = local_13f8[0xd];
      uStack_166a = local_13f8[0xe];
      uStack_1669 = local_13f8[0xf];
      auVar784._12_4_ =
           CONCAT13(uStack_13df,CONCAT12(uStack_166f,CONCAT11(uStack_13e0,uStack_1670)));
      uVar459 = CONCAT15(uStack_13de,CONCAT14(uStack_166e,auVar784._12_4_));
      uVar460 = CONCAT17(uStack_13dd,CONCAT16(uStack_166d,uVar459));
      auVar747._0_10_ = CONCAT19(uStack_13dc,CONCAT18(uStack_166c,uVar460));
      auVar747[10] = uStack_166b;
      auVar747[0xb] = uStack_13db;
      auVar763[0xc] = uStack_166a;
      auVar763._0_12_ = auVar747;
      auVar763[0xd] = uStack_13da;
      auVar823[0xe] = uStack_1669;
      auVar823._0_14_ = auVar763;
      auVar823[0xf] = uStack_13d9;
      uStack_1690 = local_13d8[8];
      uStack_168f = local_13d8[9];
      uStack_168e = local_13d8[10];
      uStack_168d = local_13d8[0xb];
      uStack_168c = local_13d8[0xc];
      uStack_168b = local_13d8[0xd];
      uStack_168a = local_13d8[0xe];
      uStack_1689 = local_13d8[0xf];
      uVar741 = CONCAT13(uStack_13bf,CONCAT12(uStack_168f,CONCAT11(uStack_13c0,uStack_1690)));
      uVar742 = CONCAT15(uStack_13be,CONCAT14(uStack_168e,uVar741));
      uVar743 = CONCAT17(uStack_13bd,CONCAT16(uStack_168d,uVar742));
      auVar917._0_10_ = CONCAT19(uStack_13bc,CONCAT18(uStack_168c,uVar743));
      auVar917[10] = uStack_168b;
      auVar917[0xb] = uStack_13bb;
      auVar937[0xc] = uStack_168a;
      auVar937._0_12_ = auVar917;
      auVar937[0xd] = uStack_13ba;
      auVar1009[0xe] = uStack_1689;
      auVar1009._0_14_ = auVar937;
      auVar1009[0xf] = uStack_13b9;
      uVar458 = CONCAT11(uStack_13a0,local_13b8[8]);
      uVar1750 = CONCAT13(uStack_139f,CONCAT12(local_13b8[9],uVar458));
      uVar1751 = CONCAT15(uStack_139e,CONCAT14(local_13b8[10],uVar1750));
      uVar1752 = CONCAT17(uStack_139d,CONCAT16(local_13b8[0xb],uVar1751));
      auVar1757._0_10_ = CONCAT19(uStack_139c,CONCAT18(local_13b8[0xc],uVar1752));
      auVar1757[10] = local_13b8[0xd];
      auVar1757[0xb] = uStack_139b;
      auVar1773[0xc] = local_13b8[0xe];
      auVar1773._0_12_ = auVar1757;
      auVar1773[0xd] = uStack_139a;
      uStack_16c0 = local_1398[8];
      uStack_16bf = local_1398[9];
      uStack_16be = local_1398[10];
      uStack_16bd = local_1398[0xb];
      uStack_16bc = local_1398[0xc];
      uStack_16bb = local_1398[0xd];
      uStack_16ba = local_1398[0xe];
      uVar908 = CONCAT13(uStack_137f,CONCAT12(uStack_16bf,CONCAT11(uStack_1380,uStack_16c0)));
      uVar909 = CONCAT15(uStack_137e,CONCAT14(uStack_16be,uVar908));
      uVar910 = CONCAT17(uStack_137d,CONCAT16(uStack_16bd,uVar909));
      auVar1149._0_10_ = CONCAT19(uStack_137c,CONCAT18(uStack_16bc,uVar910));
      auVar1149[10] = uStack_16bb;
      auVar1149[0xb] = uStack_137b;
      auVar1165[0xc] = uStack_16ba;
      auVar1165._0_12_ = auVar1149;
      auVar1165[0xd] = uStack_137a;
      uVar740 = CONCAT11(uStack_1360,local_1378[8]);
      uVar1987 = CONCAT13(uStack_135f,CONCAT12(local_1378[9],uVar740));
      uVar1988 = CONCAT15(uStack_135e,CONCAT14(local_1378[10],uVar1987));
      uVar1989 = CONCAT17(uStack_135d,CONCAT16(local_1378[0xb],uVar1988));
      auVar1994._0_10_ = CONCAT19(uStack_135c,CONCAT18(local_1378[0xc],uVar1989));
      auVar1994[10] = local_1378[0xd];
      auVar1994[0xb] = uStack_135b;
      auVar2010[0xc] = local_1378[0xe];
      auVar2010._0_12_ = auVar1994;
      auVar2010[0xd] = uStack_135a;
      uStack_16f0 = local_1358[8];
      uStack_16ef = local_1358[9];
      uStack_16ee = local_1358[10];
      uStack_16ed = local_1358[0xb];
      uStack_16ec = local_1358[0xc];
      uStack_16eb = local_1358[0xd];
      uStack_16ea = local_1358[0xe];
      uVar1905 = CONCAT13(uStack_133f,CONCAT12(uStack_16ef,CONCAT11(uStack_1340,uStack_16f0)));
      uVar1906 = CONCAT15(uStack_133e,CONCAT14(uStack_16ee,uVar1905));
      uVar1907 = CONCAT17(uStack_133d,CONCAT16(uStack_16ed,uVar1906));
      auVar1910._0_10_ = CONCAT19(uStack_133c,CONCAT18(uStack_16ec,uVar1907));
      auVar1910[10] = uStack_16eb;
      auVar1910[0xb] = uStack_133b;
      auVar1919[0xc] = uStack_16ea;
      auVar1919._0_12_ = auVar1910;
      auVar1919[0xd] = uStack_133a;
      auVar354._12_2_ = (short)((ulong)uVar1428 >> 0x30);
      auVar354._0_12_ = auVar1433;
      auVar354._14_2_ = (short)((ulong)uVar267 >> 0x30);
      auVar353._12_4_ = auVar354._12_4_;
      auVar353._10_2_ = (short)((uint6)uVar266 >> 0x20);
      auVar353._0_10_ = auVar1433._0_10_;
      auVar352._10_6_ = auVar353._10_6_;
      auVar352._8_2_ = (short)((uint6)uVar1427 >> 0x20);
      auVar352._0_8_ = uVar1428;
      auVar351._8_8_ = auVar352._8_8_;
      auVar351._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
      auVar351._0_6_ = uVar1427;
      auVar350._6_10_ = auVar351._6_10_;
      auVar350._4_2_ = (short)((uint)uVar1426 >> 0x10);
      auVar350._0_4_ = uVar1426;
      auVar349._4_12_ = auVar350._4_12_;
      auVar349._0_4_ = CONCAT22(CONCAT11(uStack_1400,uStack_1640),uVar265);
      auVar581._12_2_ = (short)((ulong)uVar460 >> 0x30);
      auVar581._0_12_ = auVar747;
      auVar581._14_2_ = (short)((ulong)uVar743 >> 0x30);
      auVar580._12_4_ = auVar581._12_4_;
      auVar580._10_2_ = (short)((uint6)uVar742 >> 0x20);
      auVar580._0_10_ = auVar747._0_10_;
      auVar579._10_6_ = auVar580._10_6_;
      auVar579._8_2_ = (short)((uint6)uVar459 >> 0x20);
      auVar579._0_8_ = uVar460;
      auVar578._8_8_ = auVar579._8_8_;
      auVar578._6_2_ = (short)((uint)uVar741 >> 0x10);
      auVar578._0_6_ = uVar459;
      auVar577._6_10_ = auVar578._6_10_;
      auVar577._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
      auVar577._0_4_ = auVar784._12_4_;
      auVar829._12_2_ = (short)((ulong)uVar1752 >> 0x30);
      auVar829._0_12_ = auVar1757;
      auVar829._14_2_ = (short)((ulong)uVar910 >> 0x30);
      auVar828._12_4_ = auVar829._12_4_;
      auVar828._10_2_ = (short)((uint6)uVar909 >> 0x20);
      auVar828._0_10_ = auVar1757._0_10_;
      auVar827._10_6_ = auVar828._10_6_;
      auVar827._8_2_ = (short)((uint6)uVar1751 >> 0x20);
      auVar827._0_8_ = uVar1752;
      auVar826._8_8_ = auVar827._8_8_;
      auVar826._6_2_ = (short)((uint)uVar908 >> 0x10);
      auVar826._0_6_ = uVar1751;
      auVar825._6_10_ = auVar826._6_10_;
      auVar825._4_2_ = (short)((uint)uVar1750 >> 0x10);
      auVar825._0_4_ = uVar1750;
      auVar824._4_12_ = auVar825._4_12_;
      auVar824._0_4_ = CONCAT22(CONCAT11(uStack_1380,uStack_16c0),uVar458);
      auVar1014._12_2_ = (short)((ulong)uVar1989 >> 0x30);
      auVar1014._0_12_ = auVar1994;
      auVar1014._14_2_ = (short)((ulong)uVar1907 >> 0x30);
      auVar1013._12_4_ = auVar1014._12_4_;
      auVar1013._10_2_ = (short)((uint6)uVar1906 >> 0x20);
      auVar1013._0_10_ = auVar1994._0_10_;
      auVar1012._10_6_ = auVar1013._10_6_;
      auVar1012._8_2_ = (short)((uint6)uVar1988 >> 0x20);
      auVar1012._0_8_ = uVar1989;
      auVar1011._8_8_ = auVar1012._8_8_;
      auVar1011._6_2_ = (short)((uint)uVar1905 >> 0x10);
      auVar1011._0_6_ = uVar1988;
      auVar1010._6_10_ = auVar1011._6_10_;
      auVar1010._4_2_ = (short)((uint)uVar1987 >> 0x10);
      auVar1010._0_4_ = uVar1987;
      auVar1218._0_8_ = auVar349._0_8_;
      auVar1218._8_4_ = auVar350._4_4_;
      auVar1218._12_4_ = auVar577._4_4_;
      auVar582._0_8_ = auVar824._0_8_;
      auVar582._8_4_ = auVar825._4_4_;
      auVar582._12_4_ = auVar1010._4_4_;
      local_11b8 = CONCAT44(CONCAT22(CONCAT11(uStack_13c0,uStack_1690),
                                     CONCAT11(uStack_13e0,uStack_1670)),auVar349._0_4_);
      uStack_11b0 = CONCAT44(CONCAT22(CONCAT11(uStack_1340,uStack_16f0),uVar740),auVar824._0_4_);
      local_11a8 = auVar1218._8_8_;
      uStack_11a0 = auVar582._8_8_;
      local_1198 = auVar352._8_4_;
      uStack_1194 = auVar579._8_4_;
      uStack_1190 = auVar827._8_4_;
      uStack_118c = auVar1012._8_4_;
      uStack_1180 = auVar353._12_4_;
      uStack_117c = auVar580._12_4_;
      auVar784._12_4_ =
           CONCAT22((short)((unkuint10)auVar469._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1433._0_10_ >> 0x40));
      auVar1434._0_8_ = CONCAT26(auVar469._10_2_,CONCAT24(auVar1433._10_2_,auVar784._12_4_));
      auVar1434._8_2_ = auVar1451._12_2_;
      auVar1434._10_2_ = auVar493._12_2_;
      auVar1472._12_2_ = auVar1471._14_2_;
      auVar1472._0_12_ = auVar1434;
      auVar1472._14_2_ = auVar576._14_2_;
      auVar298._12_4_ =
           CONCAT22((short)((unkuint10)auVar917._0_10_ >> 0x40),
                    (short)((unkuint10)auVar747._0_10_ >> 0x40));
      auVar470._0_8_ = CONCAT26(auVar917._10_2_,CONCAT24(auVar747._10_2_,auVar298._12_4_));
      auVar470._8_2_ = auVar763._12_2_;
      auVar470._10_2_ = auVar937._12_2_;
      auVar583._12_2_ = auVar823._14_2_;
      auVar583._0_12_ = auVar470;
      auVar583._14_2_ = auVar1009._14_2_;
      uVar741 = CONCAT22((short)((unkuint10)auVar1149._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1757._0_10_ >> 0x40));
      auVar1758._0_8_ = CONCAT26(auVar1149._10_2_,CONCAT24(auVar1757._10_2_,uVar741));
      auVar1758._8_2_ = auVar1773._12_2_;
      auVar1758._10_2_ = auVar1165._12_2_;
      uVar908 = CONCAT22((short)((unkuint10)auVar1910._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1994._0_10_ >> 0x40));
      auVar1995._0_8_ = CONCAT26(auVar1910._10_2_,CONCAT24(auVar1994._10_2_,uVar908));
      auVar1995._8_2_ = auVar2010._12_2_;
      auVar1995._10_2_ = auVar1919._12_2_;
      auVar355._8_4_ = (int)((ulong)auVar1434._0_8_ >> 0x20);
      auVar355._0_8_ = auVar1434._0_8_;
      auVar355._12_4_ = (int)((ulong)auVar470._0_8_ >> 0x20);
      auVar584._8_4_ = (int)((ulong)auVar1758._0_8_ >> 0x20);
      auVar584._0_8_ = auVar1758._0_8_;
      auVar584._12_4_ = (int)((ulong)auVar1995._0_8_ >> 0x20);
      local_1178 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
      uStack_1170 = CONCAT44(uVar908,uVar741);
      local_1168 = auVar355._8_8_;
      uStack_1160 = auVar584._8_8_;
      local_1158 = auVar1434._8_4_;
      uStack_1154 = auVar470._8_4_;
      uStack_1150 = auVar1758._8_4_;
      uStack_114c = auVar1995._8_4_;
      uStack_1140 = auVar1472._12_4_;
      uStack_113c = auVar583._12_4_;
      auVar1022._0_14_ = local_f48[1]._0_14_;
      auVar1022[0xe] = local_f48[1][7];
      auVar1022[0xf] = uStack_f21;
      auVar1021._14_2_ = auVar1022._14_2_;
      auVar1021._0_13_ = local_f48[1]._0_13_;
      auVar1021[0xd] = uStack_f22;
      auVar1020._13_3_ = auVar1021._13_3_;
      auVar1020._0_12_ = local_f48[1]._0_12_;
      auVar1020[0xc] = local_f48[1][6];
      auVar1019._12_4_ = auVar1020._12_4_;
      auVar1019._0_11_ = local_f48[1]._0_11_;
      auVar1019[0xb] = uStack_f23;
      auVar1018._11_5_ = auVar1019._11_5_;
      auVar1018._0_10_ = local_f48[1]._0_10_;
      auVar1018[10] = local_f48[1][5];
      auVar1017._10_6_ = auVar1018._10_6_;
      auVar1017._0_9_ = local_f48[1]._0_9_;
      auVar1017[9] = uStack_f24;
      auVar1016._9_7_ = auVar1017._9_7_;
      auVar1016._0_8_ = local_f48[1]._0_8_;
      auVar1016[8] = local_f48[1][4];
      Var18 = CONCAT91(CONCAT81(auVar1016._8_8_,uStack_f25),local_f48[1][3]);
      auVar99._2_10_ = Var18;
      auVar99[1] = uStack_f26;
      auVar99[0] = local_f48[1][2];
      auVar98._2_12_ = auVar99;
      auVar98[1] = uStack_f27;
      auVar98[0] = local_f48[1][1];
      auVar1015._0_2_ = CONCAT11(local_f28,local_f48[1][0]);
      auVar1015._2_14_ = auVar98;
      auVar2235._0_14_ = local_f18._0_14_;
      auVar2235[0xe] = local_f18[7];
      auVar2235[0xf] = uStack_f01;
      auVar2234._14_2_ = auVar2235._14_2_;
      auVar2234._0_13_ = local_f18._0_13_;
      auVar2234[0xd] = uStack_f02;
      auVar2233._13_3_ = auVar2234._13_3_;
      auVar2233._0_12_ = local_f18._0_12_;
      auVar2233[0xc] = local_f18[6];
      auVar2232._12_4_ = auVar2233._12_4_;
      auVar2232._0_11_ = local_f18._0_11_;
      auVar2232[0xb] = uStack_f03;
      auVar2231._11_5_ = auVar2232._11_5_;
      auVar2231._0_10_ = local_f18._0_10_;
      auVar2231[10] = local_f18[5];
      auVar2230._10_6_ = auVar2231._10_6_;
      auVar2230._0_9_ = local_f18._0_9_;
      auVar2230[9] = uStack_f04;
      auVar2229._9_7_ = auVar2230._9_7_;
      auVar2229._0_8_ = local_f18._0_8_;
      auVar2229[8] = local_f18[4];
      Var21 = CONCAT91(CONCAT81(auVar2229._8_8_,uStack_f05),local_f18[3]);
      auVar101._2_10_ = Var21;
      auVar101[1] = uStack_f06;
      auVar101[0] = local_f18[2];
      auVar100._2_12_ = auVar101;
      auVar100[1] = uStack_f07;
      auVar100[0] = local_f18[1];
      auVar2079._0_14_ = local_ef8._0_14_;
      auVar2079[0xe] = local_ef8[7];
      auVar2079[0xf] = uStack_ee1;
      auVar2078._14_2_ = auVar2079._14_2_;
      auVar2078._0_13_ = local_ef8._0_13_;
      auVar2078[0xd] = uStack_ee2;
      auVar2077._13_3_ = auVar2078._13_3_;
      auVar2077._0_12_ = local_ef8._0_12_;
      auVar2077[0xc] = local_ef8[6];
      auVar2076._12_4_ = auVar2077._12_4_;
      auVar2076._0_11_ = local_ef8._0_11_;
      auVar2076[0xb] = uStack_ee3;
      auVar2075._11_5_ = auVar2076._11_5_;
      auVar2075._0_10_ = local_ef8._0_10_;
      auVar2075[10] = local_ef8[5];
      auVar2074._10_6_ = auVar2075._10_6_;
      auVar2074._0_9_ = local_ef8._0_9_;
      auVar2074[9] = uStack_ee4;
      auVar2073._9_7_ = auVar2074._9_7_;
      auVar2073._0_8_ = local_ef8._0_8_;
      auVar2073[8] = local_ef8[4];
      Var39 = CONCAT91(CONCAT81(auVar2073._8_8_,uStack_ee5),local_ef8[3]);
      auVar103._2_10_ = Var39;
      auVar103[1] = uStack_ee6;
      auVar103[0] = local_ef8[2];
      auVar102._2_12_ = auVar103;
      auVar102[1] = uStack_ee7;
      auVar102[0] = local_ef8[1];
      auVar2072._0_2_ = CONCAT11(local_ee8,local_ef8[0]);
      auVar2072._2_14_ = auVar102;
      auVar2165._0_14_ = local_ed8._0_14_;
      auVar2165[0xe] = local_ed8[7];
      auVar2165[0xf] = uStack_ec1;
      auVar2164._14_2_ = auVar2165._14_2_;
      auVar2164._0_13_ = local_ed8._0_13_;
      auVar2164[0xd] = uStack_ec2;
      auVar2163._13_3_ = auVar2164._13_3_;
      auVar2163._0_12_ = local_ed8._0_12_;
      auVar2163[0xc] = local_ed8[6];
      auVar2162._12_4_ = auVar2163._12_4_;
      auVar2162._0_11_ = local_ed8._0_11_;
      auVar2162[0xb] = uStack_ec3;
      auVar2161._11_5_ = auVar2162._11_5_;
      auVar2161._0_10_ = local_ed8._0_10_;
      auVar2161[10] = local_ed8[5];
      auVar2160._10_6_ = auVar2161._10_6_;
      auVar2160._0_9_ = local_ed8._0_9_;
      auVar2160[9] = uStack_ec4;
      auVar2159._9_7_ = auVar2160._9_7_;
      auVar2159._0_8_ = local_ed8._0_8_;
      auVar2159[8] = local_ed8[4];
      Var42 = CONCAT91(CONCAT81(auVar2159._8_8_,uStack_ec5),local_ed8[3]);
      auVar105._2_10_ = Var42;
      auVar105[1] = uStack_ec6;
      auVar105[0] = local_ed8[2];
      auVar104._2_12_ = auVar105;
      auVar104[1] = uStack_ec7;
      auVar104[0] = local_ed8[1];
      auVar1943._0_12_ = auVar1015._0_12_;
      auVar1943._12_2_ = (short)Var18;
      auVar1943._14_2_ = (short)Var21;
      auVar1942._12_4_ = auVar1943._12_4_;
      auVar1942._0_10_ = auVar1015._0_10_;
      auVar1942._10_2_ = auVar101._0_2_;
      auVar1941._10_6_ = auVar1942._10_6_;
      auVar1941._0_8_ = auVar1015._0_8_;
      auVar1941._8_2_ = auVar99._0_2_;
      auVar106._4_8_ = auVar1941._8_8_;
      auVar106._2_2_ = auVar100._0_2_;
      auVar106._0_2_ = auVar98._0_2_;
      auVar1940._0_4_ = CONCAT22(CONCAT11(local_f08,local_f18[0]),auVar1015._0_2_);
      auVar1940._4_12_ = auVar106;
      auVar587._0_12_ = auVar2072._0_12_;
      auVar587._12_2_ = (short)Var39;
      auVar587._14_2_ = (short)Var42;
      auVar586._12_4_ = auVar587._12_4_;
      auVar586._0_10_ = auVar2072._0_10_;
      auVar586._10_2_ = auVar105._0_2_;
      auVar585._10_6_ = auVar586._10_6_;
      auVar585._0_8_ = auVar2072._0_8_;
      auVar585._8_2_ = auVar103._0_2_;
      auVar107._4_8_ = auVar585._8_8_;
      auVar107._2_2_ = auVar104._0_2_;
      auVar107._0_2_ = auVar102._0_2_;
      auVar830._0_8_ = auVar1940._0_8_;
      auVar830._8_4_ = auVar106._0_4_;
      auVar830._12_4_ = auVar107._0_4_;
      auVar1226._0_14_ = local_eb8._0_14_;
      auVar1226[0xe] = local_eb8[7];
      auVar1226[0xf] = uStack_ea1;
      auVar1225._14_2_ = auVar1226._14_2_;
      auVar1225._0_13_ = local_eb8._0_13_;
      auVar1225[0xd] = uStack_ea2;
      auVar1224._13_3_ = auVar1225._13_3_;
      auVar1224._0_12_ = local_eb8._0_12_;
      auVar1224[0xc] = local_eb8[6];
      auVar1223._12_4_ = auVar1224._12_4_;
      auVar1223._0_11_ = local_eb8._0_11_;
      auVar1223[0xb] = uStack_ea3;
      auVar1222._11_5_ = auVar1223._11_5_;
      auVar1222._0_10_ = local_eb8._0_10_;
      auVar1222[10] = local_eb8[5];
      auVar1221._10_6_ = auVar1222._10_6_;
      auVar1221._0_9_ = local_eb8._0_9_;
      auVar1221[9] = uStack_ea4;
      auVar1220._9_7_ = auVar1221._9_7_;
      auVar1220._0_8_ = local_eb8._0_8_;
      auVar1220[8] = local_eb8[4];
      Var18 = CONCAT91(CONCAT81(auVar1220._8_8_,uStack_ea5),local_eb8[3]);
      auVar109._2_10_ = Var18;
      auVar109[1] = uStack_ea6;
      auVar109[0] = local_eb8[2];
      auVar108._2_12_ = auVar109;
      auVar108[1] = uStack_ea7;
      auVar108[0] = local_eb8[1];
      auVar1219._0_2_ = CONCAT11(local_ea8,local_eb8[0]);
      auVar1219._2_14_ = auVar108;
      auVar1546._0_14_ = local_e98._0_14_;
      auVar1546[0xe] = local_e98[7];
      auVar1546[0xf] = uStack_e81;
      auVar1545._14_2_ = auVar1546._14_2_;
      auVar1545._0_13_ = local_e98._0_13_;
      auVar1545[0xd] = uStack_e82;
      auVar1544._13_3_ = auVar1545._13_3_;
      auVar1544._0_12_ = local_e98._0_12_;
      auVar1544[0xc] = local_e98[6];
      auVar1543._12_4_ = auVar1544._12_4_;
      auVar1543._0_11_ = local_e98._0_11_;
      auVar1543[0xb] = uStack_e83;
      auVar1542._11_5_ = auVar1543._11_5_;
      auVar1542._0_10_ = local_e98._0_10_;
      auVar1542[10] = local_e98[5];
      auVar1541._10_6_ = auVar1542._10_6_;
      auVar1541._0_9_ = local_e98._0_9_;
      auVar1541[9] = uStack_e84;
      auVar1540._9_7_ = auVar1541._9_7_;
      auVar1540._0_8_ = local_e98._0_8_;
      auVar1540[8] = local_e98[4];
      Var21 = CONCAT91(CONCAT81(auVar1540._8_8_,uStack_e85),local_e98[3]);
      auVar111._2_10_ = Var21;
      auVar111[1] = uStack_e86;
      auVar111[0] = local_e98[2];
      auVar110._2_12_ = auVar111;
      auVar110[1] = uStack_e87;
      auVar110[0] = local_e98[1];
      auVar1681._0_14_ = local_e78._0_14_;
      auVar1681[0xe] = local_e78[7];
      auVar1681[0xf] = uStack_e61;
      auVar1680._14_2_ = auVar1681._14_2_;
      auVar1680._0_13_ = local_e78._0_13_;
      auVar1680[0xd] = uStack_e62;
      auVar1679._13_3_ = auVar1680._13_3_;
      auVar1679._0_12_ = local_e78._0_12_;
      auVar1679[0xc] = local_e78[6];
      auVar1678._12_4_ = auVar1679._12_4_;
      auVar1678._0_11_ = local_e78._0_11_;
      auVar1678[0xb] = uStack_e63;
      auVar1677._11_5_ = auVar1678._11_5_;
      auVar1677._0_10_ = local_e78._0_10_;
      auVar1677[10] = local_e78[5];
      auVar1676._10_6_ = auVar1677._10_6_;
      auVar1676._0_9_ = local_e78._0_9_;
      auVar1676[9] = uStack_e64;
      auVar1675._9_7_ = auVar1676._9_7_;
      auVar1675._0_8_ = local_e78._0_8_;
      auVar1675[8] = local_e78[4];
      Var39 = CONCAT91(CONCAT81(auVar1675._8_8_,uStack_e65),local_e78[3]);
      auVar113._2_10_ = Var39;
      auVar113[1] = uStack_e66;
      auVar113[0] = local_e78[2];
      auVar112._2_12_ = auVar113;
      auVar112[1] = uStack_e67;
      auVar112[0] = local_e78[1];
      auVar1674._0_2_ = CONCAT11(local_e68,local_e78[0]);
      auVar1674._2_14_ = auVar112;
      auVar1849._0_14_ = local_e58._0_14_;
      auVar1849[0xe] = local_e58[7];
      auVar1849[0xf] = uStack_e41;
      auVar1848._14_2_ = auVar1849._14_2_;
      auVar1848._0_13_ = local_e58._0_13_;
      auVar1848[0xd] = uStack_e42;
      auVar1847._13_3_ = auVar1848._13_3_;
      auVar1847._0_12_ = local_e58._0_12_;
      auVar1847[0xc] = local_e58[6];
      auVar1846._12_4_ = auVar1847._12_4_;
      auVar1846._0_11_ = local_e58._0_11_;
      auVar1846[0xb] = uStack_e43;
      auVar1845._11_5_ = auVar1846._11_5_;
      auVar1845._0_10_ = local_e58._0_10_;
      auVar1845[10] = local_e58[5];
      auVar1844._10_6_ = auVar1845._10_6_;
      auVar1844._0_9_ = local_e58._0_9_;
      auVar1844[9] = uStack_e44;
      auVar1843._9_7_ = auVar1844._9_7_;
      auVar1843._0_8_ = local_e58._0_8_;
      auVar1843[8] = local_e58[4];
      Var42 = CONCAT91(CONCAT81(auVar1843._8_8_,uStack_e45),local_e58[3]);
      auVar115._2_10_ = Var42;
      auVar115[1] = uStack_e46;
      auVar115[0] = local_e58[2];
      auVar114._2_12_ = auVar115;
      auVar114[1] = uStack_e47;
      auVar114[0] = local_e58[1];
      auVar591._0_12_ = auVar1219._0_12_;
      auVar591._12_2_ = (short)Var18;
      auVar591._14_2_ = (short)Var21;
      auVar590._12_4_ = auVar591._12_4_;
      auVar590._0_10_ = auVar1219._0_10_;
      auVar590._10_2_ = auVar111._0_2_;
      auVar589._10_6_ = auVar590._10_6_;
      auVar589._0_8_ = auVar1219._0_8_;
      auVar589._8_2_ = auVar109._0_2_;
      auVar116._4_8_ = auVar589._8_8_;
      auVar116._2_2_ = auVar110._0_2_;
      auVar116._0_2_ = auVar108._0_2_;
      auVar588._0_4_ = CONCAT22(CONCAT11(local_e88,local_e98[0]),auVar1219._0_2_);
      auVar588._4_12_ = auVar116;
      auVar1365._0_12_ = auVar1674._0_12_;
      auVar1365._12_2_ = (short)Var39;
      auVar1365._14_2_ = (short)Var42;
      auVar1364._12_4_ = auVar1365._12_4_;
      auVar1364._0_10_ = auVar1674._0_10_;
      auVar1364._10_2_ = auVar115._0_2_;
      auVar1363._10_6_ = auVar1364._10_6_;
      auVar1363._0_8_ = auVar1674._0_8_;
      auVar1363._8_2_ = auVar113._0_2_;
      auVar117._4_8_ = auVar1363._8_8_;
      auVar117._2_2_ = auVar114._0_2_;
      auVar117._0_2_ = auVar112._0_2_;
      auVar356._0_8_ = auVar588._0_8_;
      auVar356._8_4_ = auVar116._0_4_;
      auVar356._12_4_ = auVar117._0_4_;
      local_1538 = CONCAT44(CONCAT22(CONCAT11(local_ec8,local_ed8[0]),auVar2072._0_2_),
                            auVar1940._0_4_);
      auStack_1530[0] =
           CONCAT44(CONCAT22(CONCAT11(local_e48,local_e58[0]),auVar1674._0_2_),auVar588._0_4_);
      auStack_1530[1] = auVar830._8_8_;
      auStack_1530[2] = auVar356._8_8_;
      local_1518 = auVar1941._8_4_;
      uStack_1514 = auVar585._8_4_;
      uStack_1510 = auVar589._8_4_;
      uStack_150c = auVar1363._8_4_;
      uStack_1500 = auVar1942._12_4_;
      uStack_14fc = auVar586._12_4_;
      auVar298._12_4_ = CONCAT22(auVar2229._8_2_,auVar1016._8_2_);
      auVar918._0_8_ = CONCAT26(auVar2231._10_2_,CONCAT24(auVar1018._10_2_,auVar298._12_4_));
      auVar918._8_2_ = auVar1020._12_2_;
      auVar918._10_2_ = auVar2233._12_2_;
      auVar1023._12_2_ = auVar1021._14_2_;
      auVar1023._0_12_ = auVar918;
      auVar1023._14_2_ = auVar2234._14_2_;
      uVar908 = CONCAT22(auVar2159._8_2_,auVar2073._8_2_);
      auVar2038._0_8_ = CONCAT26(auVar2161._10_2_,CONCAT24(auVar2075._10_2_,uVar908));
      auVar2038._8_2_ = auVar2077._12_2_;
      auVar2038._10_2_ = auVar2163._12_2_;
      auVar2080._12_2_ = auVar2078._14_2_;
      auVar2080._0_12_ = auVar2038;
      auVar2080._14_2_ = auVar2164._14_2_;
      auVar784._12_4_ = CONCAT22(auVar1540._8_2_,auVar1220._8_2_);
      auVar1150._0_8_ = CONCAT26(auVar1542._10_2_,CONCAT24(auVar1222._10_2_,auVar784._12_4_));
      auVar1150._8_2_ = auVar1224._12_2_;
      auVar1150._10_2_ = auVar1544._12_2_;
      uVar741 = CONCAT22(auVar1843._8_2_,auVar1675._8_2_);
      auVar1623._0_8_ = CONCAT26(auVar1845._10_2_,CONCAT24(auVar1677._10_2_,uVar741));
      auVar1623._8_2_ = auVar1679._12_2_;
      auVar1623._10_2_ = auVar1847._12_2_;
      auVar357._8_4_ = (int)((ulong)auVar918._0_8_ >> 0x20);
      auVar357._0_8_ = auVar918._0_8_;
      auVar357._12_4_ = (int)((ulong)auVar2038._0_8_ >> 0x20);
      auVar592._8_4_ = (int)((ulong)auVar1150._0_8_ >> 0x20);
      auVar592._0_8_ = auVar1150._0_8_;
      auVar592._12_4_ = (int)((ulong)auVar1623._0_8_ >> 0x20);
      local_14f8 = CONCAT44(uVar908,auVar298._12_4_);
      uStack_14f0 = CONCAT44(uVar741,auVar784._12_4_);
      local_14e8 = auVar357._8_8_;
      uStack_14e0 = auVar592._8_8_;
      local_14d8 = auVar918._8_4_;
      uStack_14d4 = auVar2038._8_4_;
      uStack_14d0 = auVar1150._8_4_;
      uStack_14cc = auVar1623._8_4_;
      uStack_14c0 = auVar1023._12_4_;
      uStack_14bc = auVar2080._12_4_;
      uVar265 = CONCAT11(uStack_f20,local_f48[1][8]);
      uVar1426 = CONCAT13(uStack_f1f,CONCAT12(local_f48[1][9],uVar265));
      uVar1427 = CONCAT15(uStack_f1e,CONCAT14(local_f48[1][10],uVar1426));
      uVar1428 = CONCAT17(uStack_f1d,CONCAT16(local_f48[1][0xb],uVar1427));
      auVar1435._0_10_ = CONCAT19(uStack_f1c,CONCAT18(local_f48[1][0xc],uVar1428));
      auVar1435[10] = local_f48[1][0xd];
      auVar1435[0xb] = uStack_f1b;
      auVar1452[0xc] = local_f48[1][0xe];
      auVar1452._0_12_ = auVar1435;
      auVar1452[0xd] = uStack_f1a;
      auVar1473[0xe] = local_f48[1][0xf];
      auVar1473._0_14_ = auVar1452;
      auVar1473[0xf] = uStack_f19;
      uStack_1640 = local_f18[8];
      uStack_163f = local_f18[9];
      uStack_163e = local_f18[10];
      uStack_163d = local_f18[0xb];
      uStack_163c = local_f18[0xc];
      uStack_163b = local_f18[0xd];
      uStack_163a = local_f18[0xe];
      uStack_1639 = local_f18[0xf];
      auVar298._12_4_ = CONCAT13(uStack_eff,CONCAT12(uStack_163f,CONCAT11(uStack_f00,uStack_1640)));
      uVar266 = CONCAT15(uStack_efe,CONCAT14(uStack_163e,auVar298._12_4_));
      uVar267 = CONCAT17(uStack_efd,CONCAT16(uStack_163d,uVar266));
      auVar471._0_10_ = CONCAT19(uStack_efc,CONCAT18(uStack_163c,uVar267));
      auVar471[10] = uStack_163b;
      auVar471[0xb] = uStack_efb;
      auVar494[0xc] = uStack_163a;
      auVar494._0_12_ = auVar471;
      auVar494[0xd] = uStack_efa;
      auVar593[0xe] = uStack_1639;
      auVar593._0_14_ = auVar494;
      auVar593[0xf] = uStack_ef9;
      uStack_1670 = local_ef8[8];
      uStack_166f = local_ef8[9];
      uStack_166e = local_ef8[10];
      uStack_166d = local_ef8[0xb];
      uStack_166c = local_ef8[0xc];
      uStack_166b = local_ef8[0xd];
      uStack_166a = local_ef8[0xe];
      uStack_1669 = local_ef8[0xf];
      auVar784._12_4_ = CONCAT13(uStack_edf,CONCAT12(uStack_166f,CONCAT11(uStack_ee0,uStack_1670)));
      uVar459 = CONCAT15(uStack_ede,CONCAT14(uStack_166e,auVar784._12_4_));
      uVar460 = CONCAT17(uStack_edd,CONCAT16(uStack_166d,uVar459));
      auVar748._0_10_ = CONCAT19(uStack_edc,CONCAT18(uStack_166c,uVar460));
      auVar748[10] = uStack_166b;
      auVar748[0xb] = uStack_edb;
      auVar764[0xc] = uStack_166a;
      auVar764._0_12_ = auVar748;
      auVar764[0xd] = uStack_eda;
      auVar831[0xe] = uStack_1669;
      auVar831._0_14_ = auVar764;
      auVar831[0xf] = uStack_ed9;
      uStack_1690 = local_ed8[8];
      uStack_168f = local_ed8[9];
      uStack_168e = local_ed8[10];
      uStack_168d = local_ed8[0xb];
      uStack_168c = local_ed8[0xc];
      uStack_168b = local_ed8[0xd];
      uStack_168a = local_ed8[0xe];
      uStack_1689 = local_ed8[0xf];
      uVar741 = CONCAT13(uStack_ebf,CONCAT12(uStack_168f,CONCAT11(uStack_ec0,uStack_1690)));
      uVar742 = CONCAT15(uStack_ebe,CONCAT14(uStack_168e,uVar741));
      uVar743 = CONCAT17(uStack_ebd,CONCAT16(uStack_168d,uVar742));
      auVar919._0_10_ = CONCAT19(uStack_ebc,CONCAT18(uStack_168c,uVar743));
      auVar919[10] = uStack_168b;
      auVar919[0xb] = uStack_ebb;
      auVar938[0xc] = uStack_168a;
      auVar938._0_12_ = auVar919;
      auVar938[0xd] = uStack_eba;
      auVar1024[0xe] = uStack_1689;
      auVar1024._0_14_ = auVar938;
      auVar1024[0xf] = uStack_eb9;
      uVar458 = CONCAT11(uStack_ea0,local_eb8[8]);
      uVar1750 = CONCAT13(uStack_e9f,CONCAT12(local_eb8[9],uVar458));
      uVar1751 = CONCAT15(uStack_e9e,CONCAT14(local_eb8[10],uVar1750));
      uVar1752 = CONCAT17(uStack_e9d,CONCAT16(local_eb8[0xb],uVar1751));
      auVar1759._0_10_ = CONCAT19(uStack_e9c,CONCAT18(local_eb8[0xc],uVar1752));
      auVar1759[10] = local_eb8[0xd];
      auVar1759[0xb] = uStack_e9b;
      auVar1774[0xc] = local_eb8[0xe];
      auVar1774._0_12_ = auVar1759;
      auVar1774[0xd] = uStack_e9a;
      auVar1785[0xe] = local_eb8[0xf];
      auVar1785._0_14_ = auVar1774;
      auVar1785[0xf] = uStack_e99;
      uStack_16c0 = local_e98[8];
      uStack_16bf = local_e98[9];
      uStack_16be = local_e98[10];
      uStack_16bd = local_e98[0xb];
      uStack_16bc = local_e98[0xc];
      uStack_16bb = local_e98[0xd];
      uStack_16ba = local_e98[0xe];
      uStack_16b9 = local_e98[0xf];
      uVar908 = CONCAT13(uStack_e7f,CONCAT12(uStack_16bf,CONCAT11(uStack_e80,uStack_16c0)));
      uVar909 = CONCAT15(uStack_e7e,CONCAT14(uStack_16be,uVar908));
      uVar910 = CONCAT17(uStack_e7d,CONCAT16(uStack_16bd,uVar909));
      auVar1151._0_10_ = CONCAT19(uStack_e7c,CONCAT18(uStack_16bc,uVar910));
      auVar1151[10] = uStack_16bb;
      auVar1151[0xb] = uStack_e7b;
      auVar1166[0xc] = uStack_16ba;
      auVar1166._0_12_ = auVar1151;
      auVar1166[0xd] = uStack_e7a;
      auVar1227[0xe] = uStack_16b9;
      auVar1227._0_14_ = auVar1166;
      auVar1227[0xf] = uStack_e79;
      uVar740 = CONCAT11(uStack_e60,local_e78[8]);
      uVar1987 = CONCAT13(uStack_e5f,CONCAT12(local_e78[9],uVar740));
      uVar1988 = CONCAT15(uStack_e5e,CONCAT14(local_e78[10],uVar1987));
      uVar1989 = CONCAT17(uStack_e5d,CONCAT16(local_e78[0xb],uVar1988));
      auVar1996._0_10_ = CONCAT19(uStack_e5c,CONCAT18(local_e78[0xc],uVar1989));
      auVar1996[10] = local_e78[0xd];
      auVar1996[0xb] = uStack_e5b;
      auVar2011[0xc] = local_e78[0xe];
      auVar2011._0_12_ = auVar1996;
      auVar2011[0xd] = uStack_e5a;
      auVar2019[0xe] = local_e78[0xf];
      auVar2019._0_14_ = auVar2011;
      auVar2019[0xf] = uStack_e59;
      uStack_16f0 = local_e58[8];
      uStack_16ef = local_e58[9];
      uStack_16ee = local_e58[10];
      uStack_16ed = local_e58[0xb];
      uStack_16ec = local_e58[0xc];
      uStack_16eb = local_e58[0xd];
      uStack_16ea = local_e58[0xe];
      uStack_16e9 = local_e58[0xf];
      uVar1905 = CONCAT13(uStack_e3f,CONCAT12(uStack_16ef,CONCAT11(uStack_e40,uStack_16f0)));
      uVar1906 = CONCAT15(uStack_e3e,CONCAT14(uStack_16ee,uVar1905));
      uVar1907 = CONCAT17(uStack_e3d,CONCAT16(uStack_16ed,uVar1906));
      auVar1911._0_10_ = CONCAT19(uStack_e3c,CONCAT18(uStack_16ec,uVar1907));
      auVar1911[10] = uStack_16eb;
      auVar1911[0xb] = uStack_e3b;
      auVar1920[0xc] = uStack_16ea;
      auVar1920._0_12_ = auVar1911;
      auVar1920[0xd] = uStack_e3a;
      auVar1944[0xe] = uStack_16e9;
      auVar1944._0_14_ = auVar1920;
      auVar1944[0xf] = uStack_e39;
      auVar363._12_2_ = (short)((ulong)uVar1428 >> 0x30);
      auVar363._0_12_ = auVar1435;
      auVar363._14_2_ = (short)((ulong)uVar267 >> 0x30);
      auVar362._12_4_ = auVar363._12_4_;
      auVar362._10_2_ = (short)((uint6)uVar266 >> 0x20);
      auVar362._0_10_ = auVar1435._0_10_;
      auVar361._10_6_ = auVar362._10_6_;
      auVar361._8_2_ = (short)((uint6)uVar1427 >> 0x20);
      auVar361._0_8_ = uVar1428;
      auVar360._8_8_ = auVar361._8_8_;
      auVar360._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
      auVar360._0_6_ = uVar1427;
      auVar359._6_10_ = auVar360._6_10_;
      auVar359._4_2_ = (short)((uint)uVar1426 >> 0x10);
      auVar359._0_4_ = uVar1426;
      auVar358._4_12_ = auVar359._4_12_;
      auVar358._0_4_ = CONCAT22(CONCAT11(uStack_f00,uStack_1640),uVar265);
      auVar598._12_2_ = (short)((ulong)uVar460 >> 0x30);
      auVar598._0_12_ = auVar748;
      auVar598._14_2_ = (short)((ulong)uVar743 >> 0x30);
      auVar597._12_4_ = auVar598._12_4_;
      auVar597._10_2_ = (short)((uint6)uVar742 >> 0x20);
      auVar597._0_10_ = auVar748._0_10_;
      auVar596._10_6_ = auVar597._10_6_;
      auVar596._8_2_ = (short)((uint6)uVar459 >> 0x20);
      auVar596._0_8_ = uVar460;
      auVar595._8_8_ = auVar596._8_8_;
      auVar595._6_2_ = (short)((uint)uVar741 >> 0x10);
      auVar595._0_6_ = uVar459;
      auVar594._6_10_ = auVar595._6_10_;
      auVar594._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
      auVar594._0_4_ = auVar784._12_4_;
      auVar837._12_2_ = (short)((ulong)uVar1752 >> 0x30);
      auVar837._0_12_ = auVar1759;
      auVar837._14_2_ = (short)((ulong)uVar910 >> 0x30);
      auVar836._12_4_ = auVar837._12_4_;
      auVar836._10_2_ = (short)((uint6)uVar909 >> 0x20);
      auVar836._0_10_ = auVar1759._0_10_;
      auVar835._10_6_ = auVar836._10_6_;
      auVar835._8_2_ = (short)((uint6)uVar1751 >> 0x20);
      auVar835._0_8_ = uVar1752;
      auVar834._8_8_ = auVar835._8_8_;
      auVar834._6_2_ = (short)((uint)uVar908 >> 0x10);
      auVar834._0_6_ = uVar1751;
      auVar833._6_10_ = auVar834._6_10_;
      auVar833._4_2_ = (short)((uint)uVar1750 >> 0x10);
      auVar833._0_4_ = uVar1750;
      auVar832._4_12_ = auVar833._4_12_;
      auVar832._0_4_ = CONCAT22(CONCAT11(uStack_e80,uStack_16c0),uVar458);
      auVar1029._12_2_ = (short)((ulong)uVar1989 >> 0x30);
      auVar1029._0_12_ = auVar1996;
      auVar1029._14_2_ = (short)((ulong)uVar1907 >> 0x30);
      auVar1028._12_4_ = auVar1029._12_4_;
      auVar1028._10_2_ = (short)((uint6)uVar1906 >> 0x20);
      auVar1028._0_10_ = auVar1996._0_10_;
      auVar1027._10_6_ = auVar1028._10_6_;
      auVar1027._8_2_ = (short)((uint6)uVar1988 >> 0x20);
      auVar1027._0_8_ = uVar1989;
      auVar1026._8_8_ = auVar1027._8_8_;
      auVar1026._6_2_ = (short)((uint)uVar1905 >> 0x10);
      auVar1026._0_6_ = uVar1988;
      auVar1025._6_10_ = auVar1026._6_10_;
      auVar1025._4_2_ = (short)((uint)uVar1987 >> 0x10);
      auVar1025._0_4_ = uVar1987;
      auVar1228._0_8_ = auVar358._0_8_;
      auVar1228._8_4_ = auVar359._4_4_;
      auVar1228._12_4_ = auVar594._4_4_;
      auVar599._0_8_ = auVar832._0_8_;
      auVar599._8_4_ = auVar833._4_4_;
      auVar599._12_4_ = auVar1025._4_4_;
      local_14b8 = CONCAT44(CONCAT22(CONCAT11(uStack_ec0,uStack_1690),
                                     CONCAT11(uStack_ee0,uStack_1670)),auVar358._0_4_);
      uStack_14b0 = CONCAT44(CONCAT22(CONCAT11(uStack_e40,uStack_16f0),uVar740),auVar832._0_4_);
      local_14a8 = auVar1228._8_8_;
      uStack_14a0 = auVar599._8_8_;
      local_1498 = auVar361._8_4_;
      uStack_1494 = auVar596._8_4_;
      uStack_1490 = auVar835._8_4_;
      uStack_148c = auVar1027._8_4_;
      uStack_1480 = auVar362._12_4_;
      uStack_147c = auVar597._12_4_;
      auVar784._12_4_ =
           CONCAT22((short)((unkuint10)auVar471._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1435._0_10_ >> 0x40));
      auVar1436._0_8_ = CONCAT26(auVar471._10_2_,CONCAT24(auVar1435._10_2_,auVar784._12_4_));
      auVar1436._8_2_ = auVar1452._12_2_;
      auVar1436._10_2_ = auVar494._12_2_;
      auVar1474._12_2_ = auVar1473._14_2_;
      auVar1474._0_12_ = auVar1436;
      auVar1474._14_2_ = auVar593._14_2_;
      auVar298._12_4_ =
           CONCAT22((short)((unkuint10)auVar919._0_10_ >> 0x40),
                    (short)((unkuint10)auVar748._0_10_ >> 0x40));
      auVar472._0_8_ = CONCAT26(auVar919._10_2_,CONCAT24(auVar748._10_2_,auVar298._12_4_));
      auVar472._8_2_ = auVar764._12_2_;
      auVar472._10_2_ = auVar938._12_2_;
      auVar600._12_2_ = auVar831._14_2_;
      auVar600._0_12_ = auVar472;
      auVar600._14_2_ = auVar1024._14_2_;
      uVar741 = CONCAT22((short)((unkuint10)auVar1151._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1759._0_10_ >> 0x40));
      auVar1760._0_8_ = CONCAT26(auVar1151._10_2_,CONCAT24(auVar1759._10_2_,uVar741));
      auVar1760._8_2_ = auVar1774._12_2_;
      auVar1760._10_2_ = auVar1166._12_2_;
      auVar1786._12_2_ = auVar1785._14_2_;
      auVar1786._0_12_ = auVar1760;
      auVar1786._14_2_ = auVar1227._14_2_;
      uVar908 = CONCAT22((short)((unkuint10)auVar1911._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1996._0_10_ >> 0x40));
      auVar1997._0_8_ = CONCAT26(auVar1911._10_2_,CONCAT24(auVar1996._10_2_,uVar908));
      auVar1997._8_2_ = auVar2011._12_2_;
      auVar1997._10_2_ = auVar1920._12_2_;
      auVar2020._12_2_ = auVar2019._14_2_;
      auVar2020._0_12_ = auVar1997;
      auVar2020._14_2_ = auVar1944._14_2_;
      auVar364._8_4_ = (int)((ulong)auVar1436._0_8_ >> 0x20);
      auVar364._0_8_ = auVar1436._0_8_;
      auVar364._12_4_ = (int)((ulong)auVar472._0_8_ >> 0x20);
      auVar601._8_4_ = (int)((ulong)auVar1760._0_8_ >> 0x20);
      auVar601._0_8_ = auVar1760._0_8_;
      auVar601._12_4_ = (int)((ulong)auVar1997._0_8_ >> 0x20);
      local_1478 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
      uStack_1470 = CONCAT44(uVar908,uVar741);
      local_1468 = auVar364._8_8_;
      uStack_1460 = auVar601._8_8_;
      local_1458 = auVar1436._8_4_;
      uStack_1454 = auVar472._8_4_;
      uStack_1450 = auVar1760._8_4_;
      uStack_144c = auVar1997._8_4_;
      uStack_1440 = auVar1474._12_4_;
      uStack_143c = auVar600._12_4_;
      local_1438 = auVar1786._12_4_;
      uStack_1434 = auVar2020._12_4_;
      auVar1037._0_14_ = local_1338._0_14_;
      auVar1037[0xe] = local_1338[0]._7_1_;
      auVar1037[0xf] = uStack_1321;
      auVar1036._14_2_ = auVar1037._14_2_;
      auVar1036._0_13_ = local_1338._0_13_;
      auVar1036[0xd] = uStack_1322;
      auVar1035._13_3_ = auVar1036._13_3_;
      auVar1035._0_12_ = local_1338._0_12_;
      auVar1035[0xc] = local_1338[0]._6_1_;
      auVar1034._12_4_ = auVar1035._12_4_;
      auVar1034._0_11_ = local_1338._0_11_;
      auVar1034[0xb] = uStack_1323;
      auVar1033._11_5_ = auVar1034._11_5_;
      auVar1033._0_10_ = local_1338._0_10_;
      auVar1033[10] = local_1338[0]._5_1_;
      auVar1032._10_6_ = auVar1033._10_6_;
      auVar1032._0_9_ = local_1338._0_9_;
      auVar1032[9] = uStack_1324;
      auVar1031._9_7_ = auVar1032._9_7_;
      auVar1031._0_8_ = local_1338[0];
      auVar1031[8] = local_1338[0]._4_1_;
      Var18 = CONCAT91(CONCAT81(auVar1031._8_8_,uStack_1325),local_1338[0]._3_1_);
      auVar119._2_10_ = Var18;
      auVar119[1] = uStack_1326;
      auVar119[0] = local_1338[0]._2_1_;
      auVar118._2_12_ = auVar119;
      auVar118[1] = uStack_1327;
      auVar118[0] = local_1338[0]._1_1_;
      auVar1030._0_2_ = CONCAT11(local_1328,(char)local_1338[0]);
      auVar1030._2_14_ = auVar118;
      auVar2242._0_14_ = local_1318._0_14_;
      auVar2242[0xe] = local_1318[7];
      auVar2242[0xf] = uStack_1301;
      auVar2241._14_2_ = auVar2242._14_2_;
      auVar2241._0_13_ = local_1318._0_13_;
      auVar2241[0xd] = uStack_1302;
      auVar2240._13_3_ = auVar2241._13_3_;
      auVar2240._0_12_ = local_1318._0_12_;
      auVar2240[0xc] = local_1318[6];
      auVar2239._12_4_ = auVar2240._12_4_;
      auVar2239._0_11_ = local_1318._0_11_;
      auVar2239[0xb] = uStack_1303;
      auVar2238._11_5_ = auVar2239._11_5_;
      auVar2238._0_10_ = local_1318._0_10_;
      auVar2238[10] = local_1318[5];
      auVar2237._10_6_ = auVar2238._10_6_;
      auVar2237._0_9_ = local_1318._0_9_;
      auVar2237[9] = uStack_1304;
      auVar2236._9_7_ = auVar2237._9_7_;
      auVar2236._0_8_ = local_1318._0_8_;
      auVar2236[8] = local_1318[4];
      Var21 = CONCAT91(CONCAT81(auVar2236._8_8_,uStack_1305),local_1318[3]);
      auVar121._2_10_ = Var21;
      auVar121[1] = uStack_1306;
      auVar121[0] = local_1318[2];
      auVar120._2_12_ = auVar121;
      auVar120[1] = uStack_1307;
      auVar120[0] = local_1318[1];
      auVar2088._0_14_ = local_12f8._0_14_;
      auVar2088[0xe] = local_12f8[7];
      auVar2088[0xf] = uStack_12e1;
      auVar2087._14_2_ = auVar2088._14_2_;
      auVar2087._0_13_ = local_12f8._0_13_;
      auVar2087[0xd] = uStack_12e2;
      auVar2086._13_3_ = auVar2087._13_3_;
      auVar2086._0_12_ = local_12f8._0_12_;
      auVar2086[0xc] = local_12f8[6];
      auVar2085._12_4_ = auVar2086._12_4_;
      auVar2085._0_11_ = local_12f8._0_11_;
      auVar2085[0xb] = uStack_12e3;
      auVar2084._11_5_ = auVar2085._11_5_;
      auVar2084._0_10_ = local_12f8._0_10_;
      auVar2084[10] = local_12f8[5];
      auVar2083._10_6_ = auVar2084._10_6_;
      auVar2083._0_9_ = local_12f8._0_9_;
      auVar2083[9] = uStack_12e4;
      auVar2082._9_7_ = auVar2083._9_7_;
      auVar2082._0_8_ = local_12f8._0_8_;
      auVar2082[8] = local_12f8[4];
      Var39 = CONCAT91(CONCAT81(auVar2082._8_8_,uStack_12e5),local_12f8[3]);
      auVar123._2_10_ = Var39;
      auVar123[1] = uStack_12e6;
      auVar123[0] = local_12f8[2];
      auVar122._2_12_ = auVar123;
      auVar122[1] = uStack_12e7;
      auVar122[0] = local_12f8[1];
      auVar2081._0_2_ = CONCAT11(local_12e8,local_12f8[0]);
      auVar2081._2_14_ = auVar122;
      auVar2172._0_14_ = local_12d8._0_14_;
      auVar2172[0xe] = local_12d8[7];
      auVar2172[0xf] = uStack_12c1;
      auVar2171._14_2_ = auVar2172._14_2_;
      auVar2171._0_13_ = local_12d8._0_13_;
      auVar2171[0xd] = uStack_12c2;
      auVar2170._13_3_ = auVar2171._13_3_;
      auVar2170._0_12_ = local_12d8._0_12_;
      auVar2170[0xc] = local_12d8[6];
      auVar2169._12_4_ = auVar2170._12_4_;
      auVar2169._0_11_ = local_12d8._0_11_;
      auVar2169[0xb] = uStack_12c3;
      auVar2168._11_5_ = auVar2169._11_5_;
      auVar2168._0_10_ = local_12d8._0_10_;
      auVar2168[10] = local_12d8[5];
      auVar2167._10_6_ = auVar2168._10_6_;
      auVar2167._0_9_ = local_12d8._0_9_;
      auVar2167[9] = uStack_12c4;
      auVar2166._9_7_ = auVar2167._9_7_;
      auVar2166._0_8_ = local_12d8._0_8_;
      auVar2166[8] = local_12d8[4];
      Var42 = CONCAT91(CONCAT81(auVar2166._8_8_,uStack_12c5),local_12d8[3]);
      auVar125._2_10_ = Var42;
      auVar125[1] = uStack_12c6;
      auVar125[0] = local_12d8[2];
      auVar124._2_12_ = auVar125;
      auVar124[1] = uStack_12c7;
      auVar124[0] = local_12d8[1];
      auVar1948._0_12_ = auVar1030._0_12_;
      auVar1948._12_2_ = (short)Var18;
      auVar1948._14_2_ = (short)Var21;
      auVar1947._12_4_ = auVar1948._12_4_;
      auVar1947._0_10_ = auVar1030._0_10_;
      auVar1947._10_2_ = auVar121._0_2_;
      auVar1946._10_6_ = auVar1947._10_6_;
      auVar1946._0_8_ = auVar1030._0_8_;
      auVar1946._8_2_ = auVar119._0_2_;
      auVar126._4_8_ = auVar1946._8_8_;
      auVar126._2_2_ = auVar120._0_2_;
      auVar126._0_2_ = auVar118._0_2_;
      auVar1945._0_4_ = CONCAT22(CONCAT11(local_1308,local_1318[0]),auVar1030._0_2_);
      auVar1945._4_12_ = auVar126;
      auVar604._0_12_ = auVar2081._0_12_;
      auVar604._12_2_ = (short)Var39;
      auVar604._14_2_ = (short)Var42;
      auVar603._12_4_ = auVar604._12_4_;
      auVar603._0_10_ = auVar2081._0_10_;
      auVar603._10_2_ = auVar125._0_2_;
      auVar602._10_6_ = auVar603._10_6_;
      auVar602._0_8_ = auVar2081._0_8_;
      auVar602._8_2_ = auVar123._0_2_;
      auVar127._4_8_ = auVar602._8_8_;
      auVar127._2_2_ = auVar124._0_2_;
      auVar127._0_2_ = auVar122._0_2_;
      auVar838._0_8_ = auVar1945._0_8_;
      auVar838._8_4_ = auVar126._0_4_;
      auVar838._12_4_ = auVar127._0_4_;
      auVar1236._0_14_ = local_12b8._0_14_;
      auVar1236[0xe] = local_12b8[7];
      auVar1236[0xf] = uStack_12a1;
      auVar1235._14_2_ = auVar1236._14_2_;
      auVar1235._0_13_ = local_12b8._0_13_;
      auVar1235[0xd] = uStack_12a2;
      auVar1234._13_3_ = auVar1235._13_3_;
      auVar1234._0_12_ = local_12b8._0_12_;
      auVar1234[0xc] = local_12b8[6];
      auVar1233._12_4_ = auVar1234._12_4_;
      auVar1233._0_11_ = local_12b8._0_11_;
      auVar1233[0xb] = uStack_12a3;
      auVar1232._11_5_ = auVar1233._11_5_;
      auVar1232._0_10_ = local_12b8._0_10_;
      auVar1232[10] = local_12b8[5];
      auVar1231._10_6_ = auVar1232._10_6_;
      auVar1231._0_9_ = local_12b8._0_9_;
      auVar1231[9] = uStack_12a4;
      auVar1230._9_7_ = auVar1231._9_7_;
      auVar1230._0_8_ = local_12b8._0_8_;
      auVar1230[8] = local_12b8[4];
      Var18 = CONCAT91(CONCAT81(auVar1230._8_8_,uStack_12a5),local_12b8[3]);
      auVar129._2_10_ = Var18;
      auVar129[1] = uStack_12a6;
      auVar129[0] = local_12b8[2];
      auVar128._2_12_ = auVar129;
      auVar128[1] = uStack_12a7;
      auVar128[0] = local_12b8[1];
      auVar1229._0_2_ = CONCAT11(local_12a8,local_12b8[0]);
      auVar1229._2_14_ = auVar128;
      auVar1553._0_14_ = local_1298._0_14_;
      auVar1553[0xe] = local_1298[7];
      auVar1553[0xf] = uStack_1281;
      auVar1552._14_2_ = auVar1553._14_2_;
      auVar1552._0_13_ = local_1298._0_13_;
      auVar1552[0xd] = uStack_1282;
      auVar1551._13_3_ = auVar1552._13_3_;
      auVar1551._0_12_ = local_1298._0_12_;
      auVar1551[0xc] = local_1298[6];
      auVar1550._12_4_ = auVar1551._12_4_;
      auVar1550._0_11_ = local_1298._0_11_;
      auVar1550[0xb] = uStack_1283;
      auVar1549._11_5_ = auVar1550._11_5_;
      auVar1549._0_10_ = local_1298._0_10_;
      auVar1549[10] = local_1298[5];
      auVar1548._10_6_ = auVar1549._10_6_;
      auVar1548._0_9_ = local_1298._0_9_;
      auVar1548[9] = uStack_1284;
      auVar1547._9_7_ = auVar1548._9_7_;
      auVar1547._0_8_ = local_1298._0_8_;
      auVar1547[8] = local_1298[4];
      Var21 = CONCAT91(CONCAT81(auVar1547._8_8_,uStack_1285),local_1298[3]);
      auVar131._2_10_ = Var21;
      auVar131[1] = uStack_1286;
      auVar131[0] = local_1298[2];
      auVar130._2_12_ = auVar131;
      auVar130[1] = uStack_1287;
      auVar130[0] = local_1298[1];
      auVar1689._0_14_ = local_1278._0_14_;
      auVar1689[0xe] = local_1278[7];
      auVar1689[0xf] = uStack_1261;
      auVar1688._14_2_ = auVar1689._14_2_;
      auVar1688._0_13_ = local_1278._0_13_;
      auVar1688[0xd] = uStack_1262;
      auVar1687._13_3_ = auVar1688._13_3_;
      auVar1687._0_12_ = local_1278._0_12_;
      auVar1687[0xc] = local_1278[6];
      auVar1686._12_4_ = auVar1687._12_4_;
      auVar1686._0_11_ = local_1278._0_11_;
      auVar1686[0xb] = uStack_1263;
      auVar1685._11_5_ = auVar1686._11_5_;
      auVar1685._0_10_ = local_1278._0_10_;
      auVar1685[10] = local_1278[5];
      auVar1684._10_6_ = auVar1685._10_6_;
      auVar1684._0_9_ = local_1278._0_9_;
      auVar1684[9] = uStack_1264;
      auVar1683._9_7_ = auVar1684._9_7_;
      auVar1683._0_8_ = local_1278._0_8_;
      auVar1683[8] = local_1278[4];
      Var39 = CONCAT91(CONCAT81(auVar1683._8_8_,uStack_1265),local_1278[3]);
      auVar133._2_10_ = Var39;
      auVar133[1] = uStack_1266;
      auVar133[0] = local_1278[2];
      auVar132._2_12_ = auVar133;
      auVar132[1] = uStack_1267;
      auVar132[0] = local_1278[1];
      auVar1682._0_2_ = CONCAT11(local_1268,local_1278[0]);
      auVar1682._2_14_ = auVar132;
      auVar1856._0_14_ = local_1258._0_14_;
      auVar1856[0xe] = local_1258[7];
      auVar1856[0xf] = uStack_1241;
      auVar1855._14_2_ = auVar1856._14_2_;
      auVar1855._0_13_ = local_1258._0_13_;
      auVar1855[0xd] = uStack_1242;
      auVar1854._13_3_ = auVar1855._13_3_;
      auVar1854._0_12_ = local_1258._0_12_;
      auVar1854[0xc] = local_1258[6];
      auVar1853._12_4_ = auVar1854._12_4_;
      auVar1853._0_11_ = local_1258._0_11_;
      auVar1853[0xb] = uStack_1243;
      auVar1852._11_5_ = auVar1853._11_5_;
      auVar1852._0_10_ = local_1258._0_10_;
      auVar1852[10] = local_1258[5];
      auVar1851._10_6_ = auVar1852._10_6_;
      auVar1851._0_9_ = local_1258._0_9_;
      auVar1851[9] = uStack_1244;
      auVar1850._9_7_ = auVar1851._9_7_;
      auVar1850._0_8_ = local_1258._0_8_;
      auVar1850[8] = local_1258[4];
      Var42 = CONCAT91(CONCAT81(auVar1850._8_8_,uStack_1245),local_1258[3]);
      auVar135._2_10_ = Var42;
      auVar135[1] = uStack_1246;
      auVar135[0] = local_1258[2];
      auVar134._2_12_ = auVar135;
      auVar134[1] = uStack_1247;
      auVar134[0] = local_1258[1];
      auVar608._0_12_ = auVar1229._0_12_;
      auVar608._12_2_ = (short)Var18;
      auVar608._14_2_ = (short)Var21;
      auVar607._12_4_ = auVar608._12_4_;
      auVar607._0_10_ = auVar1229._0_10_;
      auVar607._10_2_ = auVar131._0_2_;
      auVar606._10_6_ = auVar607._10_6_;
      auVar606._0_8_ = auVar1229._0_8_;
      auVar606._8_2_ = auVar129._0_2_;
      auVar136._4_8_ = auVar606._8_8_;
      auVar136._2_2_ = auVar130._0_2_;
      auVar136._0_2_ = auVar128._0_2_;
      auVar605._0_4_ = CONCAT22(CONCAT11(local_1288,local_1298[0]),auVar1229._0_2_);
      auVar605._4_12_ = auVar136;
      auVar1368._0_12_ = auVar1682._0_12_;
      auVar1368._12_2_ = (short)Var39;
      auVar1368._14_2_ = (short)Var42;
      auVar1367._12_4_ = auVar1368._12_4_;
      auVar1367._0_10_ = auVar1682._0_10_;
      auVar1367._10_2_ = auVar135._0_2_;
      auVar1366._10_6_ = auVar1367._10_6_;
      auVar1366._0_8_ = auVar1682._0_8_;
      auVar1366._8_2_ = auVar133._0_2_;
      auVar137._4_8_ = auVar1366._8_8_;
      auVar137._2_2_ = auVar134._0_2_;
      auVar137._0_2_ = auVar132._0_2_;
      auVar365._0_8_ = auVar605._0_8_;
      auVar365._8_4_ = auVar136._0_4_;
      auVar365._12_4_ = auVar137._0_4_;
      local_1138 = CONCAT44(CONCAT22(CONCAT11(local_12c8,local_12d8[0]),auVar2081._0_2_),
                            auVar1945._0_4_);
      auStack_1130[0] =
           CONCAT44(CONCAT22(CONCAT11(local_1248,local_1258[0]),auVar1682._0_2_),auVar605._0_4_);
      auStack_1130[1] = auVar838._8_8_;
      auStack_1130[2] = auVar365._8_8_;
      local_1118 = auVar1946._8_4_;
      uStack_1114 = auVar602._8_4_;
      uStack_1110 = auVar606._8_4_;
      uStack_110c = auVar1366._8_4_;
      uStack_1100 = auVar1947._12_4_;
      uStack_10fc = auVar603._12_4_;
      auVar298._12_4_ = CONCAT22(auVar2236._8_2_,auVar1031._8_2_);
      auVar920._0_8_ = CONCAT26(auVar2238._10_2_,CONCAT24(auVar1033._10_2_,auVar298._12_4_));
      auVar920._8_2_ = auVar1035._12_2_;
      auVar920._10_2_ = auVar2240._12_2_;
      auVar1038._12_2_ = auVar1036._14_2_;
      auVar1038._0_12_ = auVar920;
      auVar1038._14_2_ = auVar2241._14_2_;
      uVar908 = CONCAT22(auVar2166._8_2_,auVar2082._8_2_);
      auVar2039._0_8_ = CONCAT26(auVar2168._10_2_,CONCAT24(auVar2084._10_2_,uVar908));
      auVar2039._8_2_ = auVar2086._12_2_;
      auVar2039._10_2_ = auVar2170._12_2_;
      auVar2089._12_2_ = auVar2087._14_2_;
      auVar2089._0_12_ = auVar2039;
      auVar2089._14_2_ = auVar2171._14_2_;
      auVar784._12_4_ = CONCAT22(auVar1547._8_2_,auVar1230._8_2_);
      auVar1152._0_8_ = CONCAT26(auVar1549._10_2_,CONCAT24(auVar1232._10_2_,auVar784._12_4_));
      auVar1152._8_2_ = auVar1234._12_2_;
      auVar1152._10_2_ = auVar1551._12_2_;
      uVar741 = CONCAT22(auVar1850._8_2_,auVar1683._8_2_);
      auVar1624._0_8_ = CONCAT26(auVar1852._10_2_,CONCAT24(auVar1685._10_2_,uVar741));
      auVar1624._8_2_ = auVar1687._12_2_;
      auVar1624._10_2_ = auVar1854._12_2_;
      auVar366._8_4_ = (int)((ulong)auVar920._0_8_ >> 0x20);
      auVar366._0_8_ = auVar920._0_8_;
      auVar366._12_4_ = (int)((ulong)auVar2039._0_8_ >> 0x20);
      auVar609._8_4_ = (int)((ulong)auVar1152._0_8_ >> 0x20);
      auVar609._0_8_ = auVar1152._0_8_;
      auVar609._12_4_ = (int)((ulong)auVar1624._0_8_ >> 0x20);
      local_10f8 = CONCAT44(uVar908,auVar298._12_4_);
      uStack_10f0 = CONCAT44(uVar741,auVar784._12_4_);
      local_10e8 = auVar366._8_8_;
      uStack_10e0 = auVar609._8_8_;
      local_10d8 = auVar920._8_4_;
      uStack_10d4 = auVar2039._8_4_;
      uStack_10d0 = auVar1152._8_4_;
      uStack_10cc = auVar1624._8_4_;
      uStack_10c0 = auVar1038._12_4_;
      uStack_10bc = auVar2089._12_4_;
      uVar265 = CONCAT11(uStack_1320,(char)local_1338[1]);
      uVar1426 = CONCAT13(uStack_131f,CONCAT12(local_1338[1]._1_1_,uVar265));
      uVar1427 = CONCAT15(uStack_131e,CONCAT14(local_1338[1]._2_1_,uVar1426));
      uVar1428 = CONCAT17(uStack_131d,CONCAT16(local_1338[1]._3_1_,uVar1427));
      auVar1437._0_10_ = CONCAT19(uStack_131c,CONCAT18(local_1338[1]._4_1_,uVar1428));
      auVar1437[10] = local_1338[1]._5_1_;
      auVar1437[0xb] = uStack_131b;
      auVar1453[0xc] = local_1338[1]._6_1_;
      auVar1453._0_12_ = auVar1437;
      auVar1453[0xd] = uStack_131a;
      auVar1475[0xe] = local_1338[1]._7_1_;
      auVar1475._0_14_ = auVar1453;
      auVar1475[0xf] = uStack_1319;
      uStack_1640 = local_1318[8];
      uStack_163f = local_1318[9];
      uStack_163e = local_1318[10];
      uStack_163d = local_1318[0xb];
      uStack_163c = local_1318[0xc];
      uStack_163b = local_1318[0xd];
      uStack_163a = local_1318[0xe];
      uStack_1639 = local_1318[0xf];
      auVar298._12_4_ =
           CONCAT13(uStack_12ff,CONCAT12(uStack_163f,CONCAT11(uStack_1300,uStack_1640)));
      uVar266 = CONCAT15(uStack_12fe,CONCAT14(uStack_163e,auVar298._12_4_));
      uVar267 = CONCAT17(uStack_12fd,CONCAT16(uStack_163d,uVar266));
      auVar473._0_10_ = CONCAT19(uStack_12fc,CONCAT18(uStack_163c,uVar267));
      auVar473[10] = uStack_163b;
      auVar473[0xb] = uStack_12fb;
      auVar495[0xc] = uStack_163a;
      auVar495._0_12_ = auVar473;
      auVar495[0xd] = uStack_12fa;
      auVar610[0xe] = uStack_1639;
      auVar610._0_14_ = auVar495;
      auVar610[0xf] = uStack_12f9;
      uStack_1670 = local_12f8[8];
      uStack_166f = local_12f8[9];
      uStack_166e = local_12f8[10];
      uStack_166d = local_12f8[0xb];
      uStack_166c = local_12f8[0xc];
      uStack_166b = local_12f8[0xd];
      uStack_166a = local_12f8[0xe];
      uStack_1669 = local_12f8[0xf];
      auVar784._12_4_ =
           CONCAT13(uStack_12df,CONCAT12(uStack_166f,CONCAT11(uStack_12e0,uStack_1670)));
      uVar459 = CONCAT15(uStack_12de,CONCAT14(uStack_166e,auVar784._12_4_));
      uVar460 = CONCAT17(uStack_12dd,CONCAT16(uStack_166d,uVar459));
      auVar749._0_10_ = CONCAT19(uStack_12dc,CONCAT18(uStack_166c,uVar460));
      auVar749[10] = uStack_166b;
      auVar749[0xb] = uStack_12db;
      auVar765[0xc] = uStack_166a;
      auVar765._0_12_ = auVar749;
      auVar765[0xd] = uStack_12da;
      auVar839[0xe] = uStack_1669;
      auVar839._0_14_ = auVar765;
      auVar839[0xf] = uStack_12d9;
      uStack_1690 = local_12d8[8];
      uStack_168f = local_12d8[9];
      uStack_168e = local_12d8[10];
      uStack_168d = local_12d8[0xb];
      uStack_168c = local_12d8[0xc];
      uStack_168b = local_12d8[0xd];
      uStack_168a = local_12d8[0xe];
      uStack_1689 = local_12d8[0xf];
      uVar741 = CONCAT13(uStack_12bf,CONCAT12(uStack_168f,CONCAT11(uStack_12c0,uStack_1690)));
      uVar742 = CONCAT15(uStack_12be,CONCAT14(uStack_168e,uVar741));
      uVar743 = CONCAT17(uStack_12bd,CONCAT16(uStack_168d,uVar742));
      auVar921._0_10_ = CONCAT19(uStack_12bc,CONCAT18(uStack_168c,uVar743));
      auVar921[10] = uStack_168b;
      auVar921[0xb] = uStack_12bb;
      auVar939[0xc] = uStack_168a;
      auVar939._0_12_ = auVar921;
      auVar939[0xd] = uStack_12ba;
      auVar1039[0xe] = uStack_1689;
      auVar1039._0_14_ = auVar939;
      auVar1039[0xf] = uStack_12b9;
      uVar458 = CONCAT11(uStack_12a0,local_12b8[8]);
      uVar1750 = CONCAT13(uStack_129f,CONCAT12(local_12b8[9],uVar458));
      uVar1751 = CONCAT15(uStack_129e,CONCAT14(local_12b8[10],uVar1750));
      uVar1752 = CONCAT17(uStack_129d,CONCAT16(local_12b8[0xb],uVar1751));
      auVar1761._0_10_ = CONCAT19(uStack_129c,CONCAT18(local_12b8[0xc],uVar1752));
      auVar1761[10] = local_12b8[0xd];
      auVar1761[0xb] = uStack_129b;
      auVar1775[0xc] = local_12b8[0xe];
      auVar1775._0_12_ = auVar1761;
      auVar1775[0xd] = uStack_129a;
      auVar1787[0xe] = local_12b8[0xf];
      auVar1787._0_14_ = auVar1775;
      auVar1787[0xf] = uStack_1299;
      uStack_16c0 = local_1298[8];
      uStack_16bf = local_1298[9];
      uStack_16be = local_1298[10];
      uStack_16bd = local_1298[0xb];
      uStack_16bc = local_1298[0xc];
      uStack_16bb = local_1298[0xd];
      uStack_16ba = local_1298[0xe];
      uStack_16b9 = local_1298[0xf];
      uVar908 = CONCAT13(uStack_127f,CONCAT12(uStack_16bf,CONCAT11(uStack_1280,uStack_16c0)));
      uVar909 = CONCAT15(uStack_127e,CONCAT14(uStack_16be,uVar908));
      uVar910 = CONCAT17(uStack_127d,CONCAT16(uStack_16bd,uVar909));
      auVar1153._0_10_ = CONCAT19(uStack_127c,CONCAT18(uStack_16bc,uVar910));
      auVar1153[10] = uStack_16bb;
      auVar1153[0xb] = uStack_127b;
      auVar1167[0xc] = uStack_16ba;
      auVar1167._0_12_ = auVar1153;
      auVar1167[0xd] = uStack_127a;
      auVar1237[0xe] = uStack_16b9;
      auVar1237._0_14_ = auVar1167;
      auVar1237[0xf] = uStack_1279;
      uVar740 = CONCAT11(uStack_1260,local_1278[8]);
      uVar1987 = CONCAT13(uStack_125f,CONCAT12(local_1278[9],uVar740));
      uVar1988 = CONCAT15(uStack_125e,CONCAT14(local_1278[10],uVar1987));
      uVar1989 = CONCAT17(uStack_125d,CONCAT16(local_1278[0xb],uVar1988));
      auVar1998._0_10_ = CONCAT19(uStack_125c,CONCAT18(local_1278[0xc],uVar1989));
      auVar1998[10] = local_1278[0xd];
      auVar1998[0xb] = uStack_125b;
      auVar2012[0xc] = local_1278[0xe];
      auVar2012._0_12_ = auVar1998;
      auVar2012[0xd] = uStack_125a;
      auVar2021[0xe] = local_1278[0xf];
      auVar2021._0_14_ = auVar2012;
      auVar2021[0xf] = uStack_1259;
      uStack_16f0 = local_1258[8];
      uStack_16ef = local_1258[9];
      uStack_16ee = local_1258[10];
      uStack_16ed = local_1258[0xb];
      uStack_16ec = local_1258[0xc];
      uStack_16eb = local_1258[0xd];
      uStack_16ea = local_1258[0xe];
      uStack_16e9 = local_1258[0xf];
      uVar1905 = CONCAT13(uStack_123f,CONCAT12(uStack_16ef,CONCAT11(uStack_1240,uStack_16f0)));
      uVar1906 = CONCAT15(uStack_123e,CONCAT14(uStack_16ee,uVar1905));
      uVar1907 = CONCAT17(uStack_123d,CONCAT16(uStack_16ed,uVar1906));
      auVar1912._0_10_ = CONCAT19(uStack_123c,CONCAT18(uStack_16ec,uVar1907));
      auVar1912[10] = uStack_16eb;
      auVar1912[0xb] = uStack_123b;
      auVar1921[0xc] = uStack_16ea;
      auVar1921._0_12_ = auVar1912;
      auVar1921[0xd] = uStack_123a;
      auVar1949[0xe] = uStack_16e9;
      auVar1949._0_14_ = auVar1921;
      auVar1949[0xf] = uStack_1239;
      auVar372._12_2_ = (short)((ulong)uVar1428 >> 0x30);
      auVar372._0_12_ = auVar1437;
      auVar372._14_2_ = (short)((ulong)uVar267 >> 0x30);
      auVar371._12_4_ = auVar372._12_4_;
      auVar371._10_2_ = (short)((uint6)uVar266 >> 0x20);
      auVar371._0_10_ = auVar1437._0_10_;
      auVar370._10_6_ = auVar371._10_6_;
      auVar370._8_2_ = (short)((uint6)uVar1427 >> 0x20);
      auVar370._0_8_ = uVar1428;
      auVar369._8_8_ = auVar370._8_8_;
      auVar369._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
      auVar369._0_6_ = uVar1427;
      auVar368._6_10_ = auVar369._6_10_;
      auVar368._4_2_ = (short)((uint)uVar1426 >> 0x10);
      auVar368._0_4_ = uVar1426;
      auVar367._4_12_ = auVar368._4_12_;
      auVar367._0_4_ = CONCAT22(CONCAT11(uStack_1300,uStack_1640),uVar265);
      auVar615._12_2_ = (short)((ulong)uVar460 >> 0x30);
      auVar615._0_12_ = auVar749;
      auVar615._14_2_ = (short)((ulong)uVar743 >> 0x30);
      auVar614._12_4_ = auVar615._12_4_;
      auVar614._10_2_ = (short)((uint6)uVar742 >> 0x20);
      auVar614._0_10_ = auVar749._0_10_;
      auVar613._10_6_ = auVar614._10_6_;
      auVar613._8_2_ = (short)((uint6)uVar459 >> 0x20);
      auVar613._0_8_ = uVar460;
      auVar612._8_8_ = auVar613._8_8_;
      auVar612._6_2_ = (short)((uint)uVar741 >> 0x10);
      auVar612._0_6_ = uVar459;
      auVar611._6_10_ = auVar612._6_10_;
      auVar611._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
      auVar611._0_4_ = auVar784._12_4_;
      auVar845._12_2_ = (short)((ulong)uVar1752 >> 0x30);
      auVar845._0_12_ = auVar1761;
      auVar845._14_2_ = (short)((ulong)uVar910 >> 0x30);
      auVar844._12_4_ = auVar845._12_4_;
      auVar844._10_2_ = (short)((uint6)uVar909 >> 0x20);
      auVar844._0_10_ = auVar1761._0_10_;
      auVar843._10_6_ = auVar844._10_6_;
      auVar843._8_2_ = (short)((uint6)uVar1751 >> 0x20);
      auVar843._0_8_ = uVar1752;
      auVar842._8_8_ = auVar843._8_8_;
      auVar842._6_2_ = (short)((uint)uVar908 >> 0x10);
      auVar842._0_6_ = uVar1751;
      auVar841._6_10_ = auVar842._6_10_;
      auVar841._4_2_ = (short)((uint)uVar1750 >> 0x10);
      auVar841._0_4_ = uVar1750;
      auVar840._4_12_ = auVar841._4_12_;
      auVar840._0_4_ = CONCAT22(CONCAT11(uStack_1280,uStack_16c0),uVar458);
      auVar1044._12_2_ = (short)((ulong)uVar1989 >> 0x30);
      auVar1044._0_12_ = auVar1998;
      auVar1044._14_2_ = (short)((ulong)uVar1907 >> 0x30);
      auVar1043._12_4_ = auVar1044._12_4_;
      auVar1043._10_2_ = (short)((uint6)uVar1906 >> 0x20);
      auVar1043._0_10_ = auVar1998._0_10_;
      auVar1042._10_6_ = auVar1043._10_6_;
      auVar1042._8_2_ = (short)((uint6)uVar1988 >> 0x20);
      auVar1042._0_8_ = uVar1989;
      auVar1041._8_8_ = auVar1042._8_8_;
      auVar1041._6_2_ = (short)((uint)uVar1905 >> 0x10);
      auVar1041._0_6_ = uVar1988;
      auVar1040._6_10_ = auVar1041._6_10_;
      auVar1040._4_2_ = (short)((uint)uVar1987 >> 0x10);
      auVar1040._0_4_ = uVar1987;
      auVar1238._0_8_ = auVar367._0_8_;
      auVar1238._8_4_ = auVar368._4_4_;
      auVar1238._12_4_ = auVar611._4_4_;
      auVar616._0_8_ = auVar840._0_8_;
      auVar616._8_4_ = auVar841._4_4_;
      auVar616._12_4_ = auVar1040._4_4_;
      local_10b8 = CONCAT44(CONCAT22(CONCAT11(uStack_12c0,uStack_1690),
                                     CONCAT11(uStack_12e0,uStack_1670)),auVar367._0_4_);
      uStack_10b0 = CONCAT44(CONCAT22(CONCAT11(uStack_1240,uStack_16f0),uVar740),auVar840._0_4_);
      local_10a8 = auVar1238._8_8_;
      uStack_10a0 = auVar616._8_8_;
      local_1098 = auVar370._8_4_;
      uStack_1094 = auVar613._8_4_;
      uStack_1090 = auVar843._8_4_;
      uStack_108c = auVar1042._8_4_;
      uStack_1080 = auVar371._12_4_;
      uStack_107c = auVar614._12_4_;
      auVar784._12_4_ =
           CONCAT22((short)((unkuint10)auVar473._0_10_ >> 0x40),
                    (short)((unkuint10)auVar1437._0_10_ >> 0x40));
      auVar1438._0_8_ = CONCAT26(auVar473._10_2_,CONCAT24(auVar1437._10_2_,auVar784._12_4_));
      auVar1438._8_2_ = auVar1453._12_2_;
      auVar1438._10_2_ = auVar495._12_2_;
      auVar1476._12_2_ = auVar1475._14_2_;
      auVar1476._0_12_ = auVar1438;
      auVar1476._14_2_ = auVar610._14_2_;
      auVar298._12_4_ =
           CONCAT22((short)((unkuint10)auVar921._0_10_ >> 0x40),
                    (short)((unkuint10)auVar749._0_10_ >> 0x40));
      auVar474._0_8_ = CONCAT26(auVar921._10_2_,CONCAT24(auVar749._10_2_,auVar298._12_4_));
      auVar474._8_2_ = auVar765._12_2_;
      auVar474._10_2_ = auVar939._12_2_;
      auVar617._12_2_ = auVar839._14_2_;
      auVar617._0_12_ = auVar474;
      auVar617._14_2_ = auVar1039._14_2_;
      uVar741 = CONCAT22((short)((unkuint10)auVar1153._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1761._0_10_ >> 0x40));
      auVar1762._0_8_ = CONCAT26(auVar1153._10_2_,CONCAT24(auVar1761._10_2_,uVar741));
      auVar1762._8_2_ = auVar1775._12_2_;
      auVar1762._10_2_ = auVar1167._12_2_;
      auVar1788._12_2_ = auVar1787._14_2_;
      auVar1788._0_12_ = auVar1762;
      auVar1788._14_2_ = auVar1237._14_2_;
      uVar908 = CONCAT22((short)((unkuint10)auVar1912._0_10_ >> 0x40),
                         (short)((unkuint10)auVar1998._0_10_ >> 0x40));
      auVar1999._0_8_ = CONCAT26(auVar1912._10_2_,CONCAT24(auVar1998._10_2_,uVar908));
      auVar1999._8_2_ = auVar2012._12_2_;
      auVar1999._10_2_ = auVar1921._12_2_;
      auVar2022._12_2_ = auVar2021._14_2_;
      auVar2022._0_12_ = auVar1999;
      auVar2022._14_2_ = auVar1949._14_2_;
      auVar373._8_4_ = (int)((ulong)auVar1438._0_8_ >> 0x20);
      auVar373._0_8_ = auVar1438._0_8_;
      auVar373._12_4_ = (int)((ulong)auVar474._0_8_ >> 0x20);
      auVar618._8_4_ = (int)((ulong)auVar1762._0_8_ >> 0x20);
      auVar618._0_8_ = auVar1762._0_8_;
      auVar618._12_4_ = (int)((ulong)auVar1999._0_8_ >> 0x20);
      local_1078 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
      uStack_1070 = CONCAT44(uVar908,uVar741);
      local_1068 = auVar373._8_8_;
      uStack_1060 = auVar618._8_8_;
      local_1058 = auVar1438._8_4_;
      uStack_1054 = auVar474._8_4_;
      uStack_1050 = auVar1762._8_4_;
      uStack_104c = auVar1999._8_4_;
      uStack_1040 = auVar1476._12_4_;
      uStack_103c = auVar617._12_4_;
      local_1038._4_4_ = auVar2022._12_4_;
      local_1038._0_4_ = auVar1788._12_4_;
      puVar253 = dst + 0x10;
      lVar252 = 0x100;
      do {
        uVar267 = *(undefined8 *)((long)auStack_1738 + lVar252 + 8);
        *(undefined8 *)(puVar253 + -0x10) = *(undefined8 *)((long)auStack_1738 + lVar252);
        *(undefined8 *)(puVar253 + -8) = uVar267;
        uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
        *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1638 + lVar252);
        *(undefined8 *)(puVar253 + 8) = uVar267;
        lVar252 = lVar252 + 0x10;
        puVar253 = puVar253 + stride;
      } while (lVar252 != 0x200);
      puVar253 = dst + stride * 0x10 + 0x10;
      lVar252 = 0x100;
      do {
        uVar267 = *(undefined8 *)((long)local_1338 + lVar252 + 8);
        *(undefined8 *)(puVar253 + -0x10) = *(undefined8 *)((long)local_1338 + lVar252);
        *(undefined8 *)(puVar253 + -8) = uVar267;
        uVar267 = *(undefined8 *)((long)local_1238 + lVar252 + 8);
        *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1238 + lVar252);
        *(undefined8 *)(puVar253 + 8) = uVar267;
        lVar252 = lVar252 + 0x10;
        puVar253 = puVar253 + stride;
      } while (lVar252 != 0x200);
      return;
    }
    if (bw != 0x40) {
      return;
    }
    uStack_1710 = 0x2260e0;
    dr_prediction_z1_64xN_sse4_1(0x40,local_1038,0x40,left,dy,iVar258);
    iVar258 = 0x40;
LAB_0022ab1e:
    pitchSrc = 0x40;
    iVar262 = 0x40;
LAB_0022ab24:
    uStack_1710 = 0x22ab29;
    transpose(local_1038,pitchSrc,dst,stride,iVar258,iVar262);
  }
  else {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar258 = 0xb << (bVar254 & 0x1f);
          auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
          lVar252 = 0;
          auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          lVar256 = 0;
          uVar257 = dy;
          do {
            iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
            uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
            lVar260 = lVar252;
            if ((int)uVar259 < 1) {
              do {
                *(undefined1 (*) [16])((long)local_1638 + lVar260) = auVar551;
                lVar260 = lVar260 + 0x10;
              } while (lVar260 != 0x40);
            }
            else {
              uVar255 = 8;
              if ((int)uVar259 < 8) {
                uVar255 = uVar259;
              }
              auVar1356 = *(undefined1 (*) [16])(left + iVar262);
              if (upsample_left == 0) {
                auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
                auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
                auVar1198 = pshuflw(auVar1198,auVar1198,0);
                auVar1631._0_4_ = auVar1198._0_4_;
                auVar1631._4_4_ = auVar1631._0_4_;
                auVar1631._8_4_ = auVar1631._0_4_;
                auVar1631._12_4_ = auVar1631._0_4_;
              }
              else {
                auVar1356 = pshufb(auVar1356,_DAT_004df790);
                auVar1517 = auVar1356 >> 0x40;
                auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
                auVar1629._0_4_ = auVar1198._0_4_;
                auVar1629._4_4_ = auVar1629._0_4_;
                auVar1629._8_4_ = auVar1629._0_4_;
                auVar1629._12_4_ = auVar1629._0_4_;
                auVar1198 = psllw(auVar1629,ZEXT416((uint)upsample_left));
                auVar1630._0_2_ = auVar1198._0_2_ >> 1;
                auVar1630._2_2_ = auVar1198._2_2_ >> 1;
                auVar1630._4_2_ = auVar1198._4_2_ >> 1;
                auVar1630._6_2_ = auVar1198._6_2_ >> 1;
                auVar1630._8_2_ = auVar1198._8_2_ >> 1;
                auVar1630._10_2_ = auVar1198._10_2_ >> 1;
                auVar1630._12_2_ = auVar1198._12_2_ >> 1;
                auVar1630._14_2_ = auVar1198._14_2_ >> 1;
                auVar1631 = auVar1630 & auVar338;
              }
              auVar1198 = pmovzxbw(in_XMM9,auVar1356);
              auVar1525 = pmovzxbw(in_XMM10,auVar1517);
              auVar1199 = psllw(auVar1198,5);
              in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1631._0_2_;
              in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1631._2_2_;
              in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1631._4_2_;
              in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1631._6_2_;
              in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1631._8_2_;
              in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1631._10_2_;
              in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1631._12_2_;
              in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1631._14_2_;
              uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
              uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
              uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
              uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
              uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
              uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
              uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
              uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
              auVar278._0_2_ = CONCAT11(0,auVar1356[8]);
              auVar278[2] = auVar1356[9];
              auVar278[3] = 0;
              auVar278[4] = auVar1356[10];
              auVar278[5] = 0;
              auVar278[6] = auVar1356[0xb];
              auVar278[7] = 0;
              auVar278[8] = auVar1356[0xc];
              auVar278[9] = 0;
              auVar278[10] = auVar1356[0xd];
              auVar278[0xb] = 0;
              auVar278[0xc] = auVar1356[0xe];
              auVar278[0xd] = 0;
              auVar278[0xe] = auVar1356[0xf];
              auVar278[0xf] = 0;
              auVar1198 = psllw(auVar278,5);
              uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                                 (auVar1517[8] - auVar278._0_2_) * auVar1631._0_2_) >> 5;
              uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                                 ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1631._2_2_) >>
                         5;
              uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                                 ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1631._4_2_)
                         >> 5;
              uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                                 ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1631._6_2_
                                 ) >> 5;
              uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                                 ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1631._8_2_
                                 ) >> 5;
              uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                                 ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) *
                                 auVar1631._10_2_) >> 5;
              uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                                 ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) *
                                 auVar1631._12_2_) >> 5;
              uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                                 ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) *
                                 auVar1631._14_2_) >> 5;
              in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419)
              ;
              in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328)
              ;
              in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420)
              ;
              in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421)
              ;
              in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422)
              ;
              in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423)
              ;
              in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424)
              ;
              in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425)
              ;
              in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143)
              ;
              in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321)
              ;
              in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 -
                            (0xff < uVar1322);
              in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 -
                             (0xff < uVar1323);
              in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 -
                             (0xff < uVar1324);
              in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 -
                             (0xff < uVar1325);
              in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 -
                             (0xff < uVar1326);
              in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 -
                             (0xff < uVar1327);
              auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
              *(undefined1 (*) [16])(local_1638 + lVar256 * 2) = auVar1356;
              uVar257 = uVar257 + dy;
            }
            if ((int)uVar259 < 1) break;
            lVar256 = lVar256 + 1;
            lVar252 = lVar252 + 0x10;
          } while (lVar256 != 4);
          auVar1._8_8_ = local_1638[1];
          auVar1._0_8_ = local_1638[0];
          auVar10._8_4_ = uStack_1610;
          auVar10._0_8_ = CONCAT44(uStack_1614,local_1618);
          auVar9._12_4_ = uStack_160c;
          auVar9._0_12_ = auVar10;
          auVar286._0_14_ = auVar1._0_14_;
          auVar286[0xe] = (char)((ulong)local_1638[0] >> 0x38);
          auVar286[0xf] = uStack_1621;
          auVar285._14_2_ = auVar286._14_2_;
          auVar285._0_13_ = auVar1._0_13_;
          auVar285[0xd] = uStack_1622;
          auVar284._13_3_ = auVar285._13_3_;
          auVar284._0_12_ = auVar1._0_12_;
          auVar284[0xc] = (char)((ulong)local_1638[0] >> 0x30);
          auVar283._12_4_ = auVar284._12_4_;
          auVar283._0_11_ = auVar1._0_11_;
          auVar283[0xb] = uStack_1623;
          auVar282._11_5_ = auVar283._11_5_;
          auVar282._0_10_ = auVar1._0_10_;
          auVar282[10] = (char)((ulong)local_1638[0] >> 0x28);
          auVar281._10_6_ = auVar282._10_6_;
          auVar281._0_9_ = auVar1._0_9_;
          auVar281[9] = uStack_1624;
          auVar280._9_7_ = auVar281._9_7_;
          auVar280[8] = (char)((ulong)local_1638[0] >> 0x20);
          auVar280._0_8_ = local_1638[0];
          Var18 = CONCAT91(CONCAT81(auVar280._8_8_,uStack_1625),(char)((ulong)local_1638[0] >> 0x18)
                          );
          auVar17._2_10_ = Var18;
          auVar17[1] = uStack_1626;
          auVar17[0] = (char)((ulong)local_1638[0] >> 0x10);
          auVar16._2_12_ = auVar17;
          auVar16[1] = uStack_1627;
          auVar16[0] = (char)((ulong)local_1638[0] >> 8);
          auVar279._0_2_ = CONCAT11(local_1628,(char)local_1638[0]);
          auVar279._2_14_ = auVar16;
          auVar508._0_14_ = auVar9._0_14_;
          auVar508[0xe] = (char)((uint)uStack_1614 >> 0x18);
          auVar508[0xf] = local_1608[7];
          auVar507._14_2_ = auVar508._14_2_;
          auVar507._0_13_ = auVar9._0_13_;
          auVar507[0xd] = local_1608[6];
          auVar506._13_3_ = auVar507._13_3_;
          auVar506[0xc] = (char)((uint)uStack_1614 >> 0x10);
          auVar506._0_12_ = auVar10;
          auVar505._12_4_ = auVar506._12_4_;
          auVar505._0_11_ = auVar10._0_11_;
          auVar505[0xb] = local_1608[5];
          auVar504._11_5_ = auVar505._11_5_;
          auVar504._0_10_ = auVar10._0_10_;
          auVar504[10] = (char)((uint)uStack_1614 >> 8);
          auVar503._10_6_ = auVar504._10_6_;
          auVar503._0_9_ = auVar10._0_9_;
          auVar503[9] = local_1608[4];
          auVar502._9_7_ = auVar503._9_7_;
          auVar502[8] = (char)uStack_1614;
          auVar502._0_8_ = CONCAT44(uStack_1614,local_1618);
          Var21 = CONCAT91(CONCAT81(auVar502._8_8_,local_1608[3]),(char)((uint)local_1618 >> 0x18));
          auVar20._2_10_ = Var21;
          auVar20[1] = local_1608[2];
          auVar20[0] = (char)((uint)local_1618 >> 0x10);
          auVar19._2_12_ = auVar20;
          auVar19[1] = local_1608[1];
          auVar19[0] = (char)((uint)local_1618 >> 8);
          local_1038[3] = local_1608[0];
          local_1038[2] = (char)local_1618;
          auVar774._0_12_ = auVar279._0_12_;
          auVar774._12_2_ = (short)Var18;
          auVar774._14_2_ = (short)Var21;
          auVar773._12_4_ = auVar774._12_4_;
          auVar773._0_10_ = auVar279._0_10_;
          auVar773._10_2_ = auVar20._0_2_;
          auVar772._10_6_ = auVar773._10_6_;
          auVar772._0_8_ = auVar279._0_8_;
          auVar772._8_2_ = auVar17._0_2_;
          uVar261 = auVar772._8_8_;
          auVar22._4_8_ = uVar261;
          auVar22._2_2_ = auVar19._0_2_;
          auVar22._0_2_ = auVar16._0_2_;
          local_1038._0_2_ = auVar279._0_2_;
          local_1038._4_12_ = auVar22;
          local_ff8._8_2_ = auVar284._12_2_;
          local_ff8._10_2_ = auVar506._12_2_;
          local_1028._12_4_ = 0;
          local_1028._0_12_ = auVar22;
          local_1018._8_8_ = 0;
          local_1018._0_8_ = uVar261;
          local_1008._8_8_ = 0;
          local_1008._0_8_ = uVar261 >> 0x20;
          local_ff8._2_2_ = auVar502._8_2_;
          local_ff8._0_2_ = auVar280._8_2_;
          local_ff8._4_2_ = auVar282._10_2_;
          local_ff8._6_2_ = auVar504._10_2_;
          local_ff8._12_2_ = auVar285._14_2_;
          local_ff8._14_2_ = auVar507._14_2_;
          local_fe8._2_2_ = auVar504._10_2_;
          local_fe8._0_2_ = auVar282._10_2_;
          local_fe8._4_2_ = local_ff8._8_2_;
          local_fe8._6_2_ = local_ff8._10_2_;
          local_fe8._8_2_ = auVar285._14_2_;
          local_fe8._10_2_ = auVar507._14_2_;
          local_fe8._12_4_ = 0;
          local_fd8._2_2_ = local_ff8._10_2_;
          local_fd8._0_2_ = local_ff8._8_2_;
          local_fd8._4_2_ = auVar285._14_2_;
          local_fd8._6_2_ = auVar507._14_2_;
          local_fd8._8_8_ = 0;
          local_fc8 = ZEXT416(CONCAT22(auVar507._14_2_,auVar285._14_2_));
          lVar252 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1038 + lVar252);
            lVar252 = lVar252 + 0x10;
            dst = dst + stride;
          } while (lVar252 != 0x80);
          return;
        case 1:
          iVar258 = 0x17 << (bVar254 & 0x1f);
          auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
          lVar252 = 0;
          auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          lVar256 = 0;
          uVar257 = dy;
          do {
            iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
            uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
            lVar260 = lVar252;
            if ((int)uVar259 < 1) {
              do {
                *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
                lVar260 = lVar260 + 0x10;
              } while (lVar260 != 0x80);
            }
            else {
              uVar255 = 0x10;
              if ((int)uVar259 < 0x10) {
                uVar255 = uVar259;
              }
              auVar1356 = *(undefined1 (*) [16])(left + iVar262);
              if (upsample_left == 0) {
                auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
                auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
                auVar1198 = pshuflw(auVar1198,auVar1198,0);
                auVar1740._0_4_ = auVar1198._0_4_;
                auVar1740._4_4_ = auVar1740._0_4_;
                auVar1740._8_4_ = auVar1740._0_4_;
                auVar1740._12_4_ = auVar1740._0_4_;
              }
              else {
                auVar1356 = pshufb(auVar1356,_DAT_004df790);
                auVar1517 = auVar1356 >> 0x40;
                auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
                auVar1738._0_4_ = auVar1198._0_4_;
                auVar1738._4_4_ = auVar1738._0_4_;
                auVar1738._8_4_ = auVar1738._0_4_;
                auVar1738._12_4_ = auVar1738._0_4_;
                auVar1198 = psllw(auVar1738,ZEXT416((uint)upsample_left));
                auVar1739._0_2_ = auVar1198._0_2_ >> 1;
                auVar1739._2_2_ = auVar1198._2_2_ >> 1;
                auVar1739._4_2_ = auVar1198._4_2_ >> 1;
                auVar1739._6_2_ = auVar1198._6_2_ >> 1;
                auVar1739._8_2_ = auVar1198._8_2_ >> 1;
                auVar1739._10_2_ = auVar1198._10_2_ >> 1;
                auVar1739._12_2_ = auVar1198._12_2_ >> 1;
                auVar1739._14_2_ = auVar1198._14_2_ >> 1;
                auVar1740 = auVar1739 & auVar338;
              }
              auVar1198 = pmovzxbw(in_XMM9,auVar1356);
              auVar1525 = pmovzxbw(in_XMM10,auVar1517);
              auVar1199 = psllw(auVar1198,5);
              in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1740._0_2_;
              in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1740._2_2_;
              in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1740._4_2_;
              in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1740._6_2_;
              in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1740._8_2_;
              in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1740._10_2_;
              in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1740._12_2_;
              in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1740._14_2_;
              uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
              uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
              uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
              uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
              uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
              uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
              uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
              uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
              auVar445._0_2_ = CONCAT11(0,auVar1356[8]);
              auVar445[2] = auVar1356[9];
              auVar445[3] = 0;
              auVar445[4] = auVar1356[10];
              auVar445[5] = 0;
              auVar445[6] = auVar1356[0xb];
              auVar445[7] = 0;
              auVar445[8] = auVar1356[0xc];
              auVar445[9] = 0;
              auVar445[10] = auVar1356[0xd];
              auVar445[0xb] = 0;
              auVar445[0xc] = auVar1356[0xe];
              auVar445[0xd] = 0;
              auVar445[0xe] = auVar1356[0xf];
              auVar445[0xf] = 0;
              auVar1198 = psllw(auVar445,5);
              uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                                 (auVar1517[8] - auVar445._0_2_) * auVar1740._0_2_) >> 5;
              uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                                 ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1740._2_2_) >>
                         5;
              uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                                 ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1740._4_2_)
                         >> 5;
              uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                                 ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1740._6_2_
                                 ) >> 5;
              uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                                 ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1740._8_2_
                                 ) >> 5;
              uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                                 ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) *
                                 auVar1740._10_2_) >> 5;
              uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                                 ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) *
                                 auVar1740._12_2_) >> 5;
              uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                                 ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) *
                                 auVar1740._14_2_) >> 5;
              in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419)
              ;
              in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328)
              ;
              in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420)
              ;
              in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421)
              ;
              in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422)
              ;
              in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423)
              ;
              in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424)
              ;
              in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425)
              ;
              in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143)
              ;
              in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321)
              ;
              in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 -
                            (0xff < uVar1322);
              in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 -
                             (0xff < uVar1323);
              in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 -
                             (0xff < uVar1324);
              in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 -
                             (0xff < uVar1325);
              in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 -
                             (0xff < uVar1326);
              in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 -
                             (0xff < uVar1327);
              auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
              *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
              uVar257 = uVar257 + dy;
            }
            if ((int)uVar259 < 1) break;
            lVar256 = lVar256 + 1;
            lVar252 = lVar252 + 0x10;
          } while (lVar256 != 8);
          auVar729._0_14_ = local_1038._0_14_;
          auVar729[0xe] = local_1038[7];
          auVar729[0xf] = local_1028[7];
          auVar728._14_2_ = auVar729._14_2_;
          auVar728._0_13_ = local_1038._0_13_;
          auVar728[0xd] = local_1028[6];
          auVar727._13_3_ = auVar728._13_3_;
          auVar727._0_12_ = local_1038._0_12_;
          auVar727[0xc] = local_1038[6];
          auVar726._12_4_ = auVar727._12_4_;
          auVar726._0_11_ = local_1038._0_11_;
          auVar726[0xb] = local_1028[5];
          auVar725._11_5_ = auVar726._11_5_;
          auVar725._0_10_ = local_1038._0_10_;
          auVar725[10] = local_1038[5];
          auVar724._10_6_ = auVar725._10_6_;
          auVar724._0_9_ = local_1038._0_9_;
          auVar724[9] = local_1028[4];
          auVar723._9_7_ = auVar724._9_7_;
          auVar723._0_8_ = local_1038._0_8_;
          auVar723[8] = local_1038[4];
          Var18 = CONCAT91(CONCAT81(auVar723._8_8_,local_1028[3]),local_1038[3]);
          auVar229._2_10_ = Var18;
          auVar229[1] = local_1028[2];
          auVar229[0] = local_1038[2];
          auVar722._4_12_ = auVar229;
          auVar722[3] = local_1028[1];
          auVar722[2] = local_1038[1];
          auVar722._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
          auVar1409._0_14_ = local_1018._0_14_;
          auVar1409[0xe] = local_1018[7];
          auVar1409[0xf] = local_1008[7];
          auVar1408._14_2_ = auVar1409._14_2_;
          auVar1408._0_13_ = local_1018._0_13_;
          auVar1408[0xd] = local_1008[6];
          auVar1407._13_3_ = auVar1408._13_3_;
          auVar1407._0_12_ = local_1018._0_12_;
          auVar1407[0xc] = local_1018[6];
          auVar1406._12_4_ = auVar1407._12_4_;
          auVar1406._0_11_ = local_1018._0_11_;
          auVar1406[0xb] = local_1008[5];
          auVar1405._11_5_ = auVar1406._11_5_;
          auVar1405._0_10_ = local_1018._0_10_;
          auVar1405[10] = local_1018[5];
          auVar1404._10_6_ = auVar1405._10_6_;
          auVar1404._0_9_ = local_1018._0_9_;
          auVar1404[9] = local_1008[4];
          auVar1403._9_7_ = auVar1404._9_7_;
          auVar1403._0_8_ = local_1018._0_8_;
          auVar1403[8] = local_1018[4];
          Var21 = CONCAT91(CONCAT81(auVar1403._8_8_,local_1008[3]),local_1018[3]);
          auVar230._2_10_ = Var21;
          auVar230[1] = local_1008[2];
          auVar230[0] = local_1018[2];
          auVar1311._0_14_ = local_ff8._0_14_;
          auVar1311[0xe] = local_ff8[7];
          auVar1311[0xf] = local_fe8[7];
          auVar1310._14_2_ = auVar1311._14_2_;
          auVar1310._0_13_ = local_ff8._0_13_;
          auVar1310[0xd] = local_fe8[6];
          auVar1309._13_3_ = auVar1310._13_3_;
          auVar1309._0_12_ = local_ff8._0_12_;
          auVar1309[0xc] = local_ff8[6];
          auVar1308._12_4_ = auVar1309._12_4_;
          auVar1308._0_11_ = local_ff8._0_11_;
          auVar1308[0xb] = local_fe8[5];
          auVar1307._11_5_ = auVar1308._11_5_;
          auVar1307._0_10_ = local_ff8._0_10_;
          auVar1307[10] = local_ff8[5];
          auVar1306._10_6_ = auVar1307._10_6_;
          auVar1306._0_9_ = local_ff8._0_9_;
          auVar1306[9] = local_fe8[4];
          auVar1305._9_7_ = auVar1306._9_7_;
          auVar1305._0_8_ = local_ff8._0_8_;
          auVar1305[8] = local_ff8[4];
          Var39 = CONCAT91(CONCAT81(auVar1305._8_8_,local_fe8[3]),local_ff8[3]);
          auVar231._2_10_ = Var39;
          auVar231[1] = local_fe8[2];
          auVar231[0] = local_ff8[2];
          auVar1304._4_12_ = auVar231;
          auVar1304[3] = local_fe8[1];
          auVar1304[2] = local_ff8[1];
          auVar1304._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
          auVar1612._0_14_ = local_fd8._0_14_;
          auVar1612[0xe] = local_fd8[7];
          auVar1612[0xf] = local_fc8[7];
          auVar1611._14_2_ = auVar1612._14_2_;
          auVar1611._0_13_ = local_fd8._0_13_;
          auVar1611[0xd] = local_fc8[6];
          auVar1610._13_3_ = auVar1611._13_3_;
          auVar1610._0_12_ = local_fd8._0_12_;
          auVar1610[0xc] = local_fd8[6];
          auVar1609._12_4_ = auVar1610._12_4_;
          auVar1609._0_11_ = local_fd8._0_11_;
          auVar1609[0xb] = local_fc8[5];
          auVar1608._11_5_ = auVar1609._11_5_;
          auVar1608._0_10_ = local_fd8._0_10_;
          auVar1608[10] = local_fd8[5];
          auVar1607._10_6_ = auVar1608._10_6_;
          auVar1607._0_9_ = local_fd8._0_9_;
          auVar1607[9] = local_fc8[4];
          auVar1606._9_7_ = auVar1607._9_7_;
          auVar1606._0_8_ = local_fd8._0_8_;
          auVar1606[8] = local_fd8[4];
          Var42 = CONCAT91(CONCAT81(auVar1606._8_8_,local_fc8[3]),local_fd8[3]);
          auVar232._2_10_ = Var42;
          auVar232[1] = local_fc8[2];
          auVar232[0] = local_fd8[2];
          uVar265 = CONCAT11(local_1028[10],local_1038[10]);
          auVar298._12_4_ = CONCAT13(local_1028[0xb],CONCAT12(local_1038[0xb],uVar265));
          uVar266 = CONCAT15(local_1028[0xc],CONCAT14(local_1038[0xc],auVar298._12_4_));
          uVar267 = CONCAT17(local_1028[0xd],CONCAT16(local_1038[0xd],uVar266));
          Var55 = CONCAT19(local_1028[0xe],CONCAT18(local_1038[0xe],uVar267));
          auVar248[10] = local_1038[0xf];
          auVar248._0_10_ = Var55;
          auVar248[0xb] = local_1028[0xf];
          uVar458 = CONCAT11(local_1008[10],local_1018[10]);
          auVar784._12_4_ = CONCAT13(local_1008[0xb],CONCAT12(local_1018[0xb],uVar458));
          uVar459 = CONCAT15(local_1008[0xc],CONCAT14(local_1018[0xc],auVar784._12_4_));
          uVar460 = CONCAT17(local_1008[0xd],CONCAT16(local_1018[0xd],uVar459));
          Var57 = CONCAT19(local_1008[0xe],CONCAT18(local_1018[0xe],uVar460));
          auVar249[10] = local_1018[0xf];
          auVar249._0_10_ = Var57;
          auVar249[0xb] = local_1008[0xf];
          uVar740 = CONCAT11(local_fe8[10],local_ff8[10]);
          uVar741 = CONCAT13(local_fe8[0xb],CONCAT12(local_ff8[0xb],uVar740));
          uVar742 = CONCAT15(local_fe8[0xc],CONCAT14(local_ff8[0xc],uVar741));
          uVar743 = CONCAT17(local_fe8[0xd],CONCAT16(local_ff8[0xd],uVar742));
          Var59 = CONCAT19(local_fe8[0xe],CONCAT18(local_ff8[0xe],uVar743));
          auVar250[10] = local_ff8[0xf];
          auVar250._0_10_ = Var59;
          auVar250[0xb] = local_fe8[0xf];
          uVar907 = CONCAT11(local_fc8[10],local_fd8[10]);
          uVar908 = CONCAT13(local_fc8[0xb],CONCAT12(local_fd8[0xb],uVar907));
          uVar909 = CONCAT15(local_fc8[0xc],CONCAT14(local_fd8[0xc],uVar908));
          uVar910 = CONCAT17(local_fc8[0xd],CONCAT16(local_fd8[0xd],uVar909));
          Var61 = CONCAT19(local_fc8[0xe],CONCAT18(local_fd8[0xe],uVar910));
          auVar251[10] = local_fd8[0xf];
          auVar251._0_10_ = Var61;
          auVar251[0xb] = local_fc8[0xf];
          auVar1743._0_12_ = auVar722._0_12_;
          auVar1743._12_2_ = (short)Var18;
          auVar1743._14_2_ = (short)Var21;
          auVar1742._12_4_ = auVar1743._12_4_;
          auVar1742._0_10_ = auVar722._0_10_;
          auVar1742._10_2_ = auVar230._0_2_;
          auVar1741._10_6_ = auVar1742._10_6_;
          auVar1741._0_8_ = auVar722._0_8_;
          auVar1741._8_2_ = auVar229._0_2_;
          auVar1814._0_12_ = auVar1304._0_12_;
          auVar1814._12_2_ = (short)Var39;
          auVar1814._14_2_ = (short)Var42;
          auVar1813._12_4_ = auVar1814._12_4_;
          auVar1813._0_10_ = auVar1304._0_10_;
          auVar1813._10_2_ = auVar232._0_2_;
          auVar1812._10_6_ = auVar1813._10_6_;
          auVar1812._0_8_ = auVar1304._0_8_;
          auVar1812._8_2_ = auVar231._0_2_;
          auVar246._8_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
          auVar246._0_8_ = uVar267;
          auVar246._10_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
          auVar244._6_2_ = uVar458;
          auVar244._0_6_ = uVar266;
          auVar244._8_4_ = auVar246._8_4_;
          auVar242._4_2_ = uVar265;
          auVar242._0_4_ = auVar298._12_4_;
          auVar242._6_6_ = auVar244._6_6_;
          auVar247._8_2_ = (short)((uint)uVar741 >> 0x10);
          auVar247._0_8_ = uVar743;
          auVar247._10_2_ = (short)((uint)uVar908 >> 0x10);
          auVar245._6_2_ = uVar907;
          auVar245._0_6_ = uVar742;
          auVar245._8_4_ = auVar247._8_4_;
          auVar243._4_2_ = uVar740;
          auVar243._0_4_ = uVar741;
          auVar243._6_6_ = auVar245._6_6_;
          local_1638[0] =
               CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar1304._0_2_),
                        CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar722._0_2_));
          local_1638[1] =
               CONCAT44(CONCAT22(CONCAT11(local_fc8[8],local_fd8[8]),
                                 CONCAT11(local_fe8[8],local_ff8[8])),
                        CONCAT22(CONCAT11(local_1008[8],local_1018[8]),
                                 CONCAT11(local_1028[8],local_1038[8])));
          local_1628 = local_1038[1];
          uStack_1627 = local_1028[1];
          uStack_1626 = local_1018[1];
          uStack_1625 = local_1008[1];
          uStack_1624 = local_ff8[1];
          uStack_1623 = local_fe8[1];
          uStack_1622 = local_fd8[1];
          uStack_1621 = local_fc8[1];
          uStack_1620 = local_1038[9];
          uStack_161f = local_1028[9];
          uStack_161e = local_1018[9];
          uStack_161d = local_1008[9];
          uStack_161c = local_ff8[9];
          uStack_161b = local_fe8[9];
          uStack_161a = local_fd8[9];
          uStack_1619 = local_fc8[9];
          local_1618 = auVar1741._8_4_;
          uStack_1614 = auVar1812._8_4_;
          uStack_1610 = auVar242._4_4_;
          uStack_160c = auVar243._4_4_;
          local_1608._8_4_ = auVar1742._12_4_;
          local_1608._12_4_ = auVar1813._12_4_;
          local_15f8._0_4_ = CONCAT22(auVar1403._8_2_,auVar723._8_2_);
          auVar488._0_8_ = CONCAT26(auVar1405._10_2_,CONCAT24(auVar725._10_2_,local_15f8._0_4_));
          auVar488._8_2_ = auVar727._12_2_;
          auVar488._10_2_ = auVar1407._12_2_;
          auVar730._12_2_ = auVar728._14_2_;
          auVar730._0_12_ = auVar488;
          auVar730._14_2_ = auVar1408._14_2_;
          local_15f8._4_4_ = CONCAT22(auVar1606._8_2_,auVar1305._8_2_);
          auVar1162._0_8_ = CONCAT26(auVar1608._10_2_,CONCAT24(auVar1307._10_2_,local_15f8._4_4_));
          auVar1162._8_2_ = auVar1309._12_2_;
          auVar1162._10_2_ = auVar1610._12_2_;
          auVar1312._12_2_ = auVar1310._14_2_;
          auVar1312._0_12_ = auVar1162;
          auVar1312._14_2_ = auVar1611._14_2_;
          local_15f8._8_4_ =
               CONCAT22((short)((uint6)uVar459 >> 0x20),(short)((uint6)uVar266 >> 0x20));
          auVar275._0_8_ =
               CONCAT26((short)((ulong)uVar460 >> 0x30),
                        CONCAT24((short)((ulong)uVar267 >> 0x30),local_15f8._8_4_));
          auVar275._8_2_ = (short)((unkuint10)Var55 >> 0x40);
          auVar275._10_2_ = (short)((unkuint10)Var57 >> 0x40);
          auVar446._12_2_ = auVar248._10_2_;
          auVar446._0_12_ = auVar275;
          auVar446._14_2_ = auVar249._10_2_;
          local_15f8._12_4_ =
               CONCAT22((short)((uint6)uVar909 >> 0x20),(short)((uint6)uVar742 >> 0x20));
          auVar759._0_8_ =
               CONCAT26((short)((ulong)uVar910 >> 0x30),
                        CONCAT24((short)((ulong)uVar743 >> 0x30),local_15f8._12_4_));
          auVar759._8_2_ = (short)((unkuint10)Var59 >> 0x40);
          auVar759._10_2_ = (short)((unkuint10)Var61 >> 0x40);
          auVar896._12_2_ = auVar250._10_2_;
          auVar896._0_12_ = auVar759;
          auVar896._14_2_ = auVar251._10_2_;
          auVar1134._8_4_ = (int)((ulong)auVar488._0_8_ >> 0x20);
          auVar1134._0_8_ = auVar488._0_8_;
          auVar1134._12_4_ = (int)((ulong)auVar1162._0_8_ >> 0x20);
          auVar1313._8_4_ = (int)((ulong)auVar275._0_8_ >> 0x20);
          auVar1313._0_8_ = auVar275._0_8_;
          auVar1313._12_4_ = (int)((ulong)auVar759._0_8_ >> 0x20);
          local_15e8._8_8_ = auVar1313._8_8_;
          local_15e8._0_8_ = auVar1134._8_8_;
          local_15d8._4_4_ = auVar1162._8_4_;
          local_15d8._0_4_ = auVar488._8_4_;
          local_15d8._8_4_ = auVar275._8_4_;
          local_15d8._12_4_ = auVar759._8_4_;
          local_15c8._8_4_ = auVar730._12_4_;
          local_15c8._12_4_ = auVar1312._12_4_;
          local_15b8 = CONCAT44(auVar896._12_4_,auVar446._12_4_);
          lVar252 = 0;
          do {
            uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
            *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar252);
            *(undefined8 *)(dst + stride * 8) = uVar267;
            dst = dst + stride;
            lVar252 = lVar252 + 0x10;
          } while (lVar252 != 0x80);
          return;
        default:
          return;
        case 3:
          auVar551 = pshufb(ZEXT116(left[0x2f]),(undefined1  [16])0x0);
          lVar252 = 0;
          auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
          lVar256 = 0;
          uVar257 = dy;
          do {
            iVar258 = (int)uVar257 >> 6;
            lVar260 = lVar252;
            if (iVar258 < 0x2f) {
              uVar259 = -(iVar258 + -0x2f);
              auVar338 = ZEXT416(uVar257 >> 1 & 0x1f);
              auVar338 = pshuflw(auVar338,auVar338,0);
              lVar260 = 0;
              do {
                auVar1273 = auVar551;
                if (lVar260 < (int)uVar259) {
                  auVar1356 = *(undefined1 (*) [16])(left + lVar260 + iVar258);
                  auVar1517 = *(undefined1 (*) [16])(left + lVar260 + (long)iVar258 + 1);
                  auVar1198 = pmovzxbw(auVar551,auVar1356);
                  auVar1525 = pmovzxbw(in_XMM7,auVar1517);
                  auVar1199 = psllw(auVar1198,5);
                  sVar264 = auVar338._0_2_;
                  in_XMM7._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * sVar264;
                  sVar457 = auVar338._2_2_;
                  in_XMM7._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * sVar457;
                  in_XMM7._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * sVar264;
                  in_XMM7._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * sVar457;
                  in_XMM7._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * sVar264;
                  in_XMM7._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * sVar457;
                  in_XMM7._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * sVar264;
                  in_XMM7._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * sVar457;
                  uVar1143 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM7._0_2_) >> 5;
                  uVar1321 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM7._2_2_) >> 5;
                  uVar1322 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM7._4_2_) >> 5;
                  uVar1323 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM7._6_2_) >> 5;
                  uVar1324 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM7._8_2_) >> 5;
                  uVar1325 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM7._10_2_) >> 5;
                  uVar1326 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM7._12_2_) >> 5;
                  uVar1327 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM7._14_2_) >> 5;
                  auVar1393._0_2_ = CONCAT11(0,auVar1356[8]);
                  auVar1393[2] = auVar1356[9];
                  auVar1393[3] = 0;
                  auVar1393[4] = auVar1356[10];
                  auVar1393[5] = 0;
                  auVar1393[6] = auVar1356[0xb];
                  auVar1393[7] = 0;
                  auVar1393[8] = auVar1356[0xc];
                  auVar1393[9] = 0;
                  auVar1393[10] = auVar1356[0xd];
                  auVar1393[0xb] = 0;
                  auVar1393[0xc] = auVar1356[0xe];
                  auVar1393[0xd] = 0;
                  auVar1393[0xe] = auVar1356[0xf];
                  auVar1393[0xf] = 0;
                  auVar1198 = psllw(auVar1393,5);
                  uVar1328 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                                     (auVar1517[8] - auVar1393._0_2_) * sVar264) >> 5;
                  uVar1419 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                                     ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * sVar457) >> 5;
                  uVar1420 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                                     ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * sVar264) >> 5
                  ;
                  uVar1421 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                                     ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * sVar457) >>
                             5;
                  uVar1422 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                                     ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * sVar264) >>
                             5;
                  uVar1423 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                                     ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * sVar457) >>
                             5;
                  uVar1424 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                                     ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * sVar264) >>
                             5;
                  uVar1425 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                                     ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * sVar457) >>
                             5;
                  auVar1273[1] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 -
                                 (0xff < uVar1321);
                  auVar1273[0] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 -
                                 (0xff < uVar1143);
                  auVar1273[2] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 -
                                 (0xff < uVar1322);
                  auVar1273[3] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 -
                                 (0xff < uVar1323);
                  auVar1273[4] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 -
                                 (0xff < uVar1324);
                  auVar1273[5] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 -
                                 (0xff < uVar1325);
                  auVar1273[6] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 -
                                 (0xff < uVar1326);
                  auVar1273[7] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 -
                                 (0xff < uVar1327);
                  auVar1273[8] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 -
                                 (0xff < uVar1328);
                  auVar1273[9] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 -
                                 (0xff < uVar1419);
                  auVar1273[10] =
                       (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
                  auVar1273[0xb] =
                       (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
                  auVar1273[0xc] =
                       (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
                  auVar1273[0xd] =
                       (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
                  auVar1273[0xe] =
                       (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
                  auVar1273[0xf] =
                       (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
                }
                *(undefined1 (*) [16])((long)local_1638 + lVar260) = auVar1273;
                lVar260 = lVar260 + 0x10;
              } while (lVar260 == 0x10);
              uVar261 = (ulong)uVar259;
              if (0x1f < (int)uVar259) {
                uVar261 = 0x20;
              }
              auVar5._8_8_ = local_1638[1];
              auVar5._0_8_ = local_1638[0];
              auVar338 = pblendvb(auVar551,auVar5,(undefined1  [16])Mask[0][uVar261]);
              auVar8[1] = uStack_1627;
              auVar8[0] = local_1628;
              auVar8[2] = uStack_1626;
              auVar8[3] = uStack_1625;
              auVar8[4] = uStack_1624;
              auVar8[5] = uStack_1623;
              auVar8[6] = uStack_1622;
              auVar8[7] = uStack_1621;
              auVar8[8] = uStack_1620;
              auVar8[9] = uStack_161f;
              auVar8[10] = uStack_161e;
              auVar8[0xb] = uStack_161d;
              auVar8[0xc] = uStack_161c;
              auVar8[0xd] = uStack_161b;
              auVar8[0xe] = uStack_161a;
              auVar8[0xf] = uStack_1619;
              auVar1356 = pblendvb(auVar551,auVar8,(undefined1  [16])Mask[1][uVar261]);
              *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar338;
              *(undefined1 (*) [16])(&local_1438 + lVar256 * 4) = auVar1356;
              uVar257 = uVar257 + dy;
            }
            else {
              do {
                *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
                *(undefined1 (*) [16])((long)&local_1438 + lVar260) = auVar551;
                lVar260 = lVar260 + 0x10;
              } while (lVar260 != 0x100);
            }
            if (0x2e < iVar258) break;
            lVar256 = lVar256 + 1;
            lVar252 = lVar252 + 0x10;
          } while (lVar256 != 0x10);
          auVar1096._0_14_ = local_1038._0_14_;
          auVar1096[0xe] = local_1038[7];
          auVar1096[0xf] = local_1028[7];
          auVar1095._14_2_ = auVar1096._14_2_;
          auVar1095._0_13_ = local_1038._0_13_;
          auVar1095[0xd] = local_1028[6];
          auVar1094._13_3_ = auVar1095._13_3_;
          auVar1094._0_12_ = local_1038._0_12_;
          auVar1094[0xc] = local_1038[6];
          auVar1093._12_4_ = auVar1094._12_4_;
          auVar1093._0_11_ = local_1038._0_11_;
          auVar1093[0xb] = local_1028[5];
          auVar1092._11_5_ = auVar1093._11_5_;
          auVar1092._0_10_ = local_1038._0_10_;
          auVar1092[10] = local_1038[5];
          auVar1091._10_6_ = auVar1092._10_6_;
          auVar1091._0_9_ = local_1038._0_9_;
          auVar1091[9] = local_1028[4];
          auVar1090._9_7_ = auVar1091._9_7_;
          auVar1090._0_8_ = local_1038._0_8_;
          auVar1090[8] = local_1038[4];
          Var18 = CONCAT91(CONCAT81(auVar1090._8_8_,local_1028[3]),local_1038[3]);
          auVar193._2_10_ = Var18;
          auVar193[1] = local_1028[2];
          auVar193[0] = local_1038[2];
          auVar1089._4_12_ = auVar193;
          auVar1089[3] = local_1028[1];
          auVar1089[2] = local_1038[1];
          auVar1089._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
          auVar2263._0_14_ = local_1018._0_14_;
          auVar2263[0xe] = local_1018[7];
          auVar2263[0xf] = local_1008[7];
          auVar2262._14_2_ = auVar2263._14_2_;
          auVar2262._0_13_ = local_1018._0_13_;
          auVar2262[0xd] = local_1008[6];
          auVar2261._13_3_ = auVar2262._13_3_;
          auVar2261._0_12_ = local_1018._0_12_;
          auVar2261[0xc] = local_1018[6];
          auVar2260._12_4_ = auVar2261._12_4_;
          auVar2260._0_11_ = local_1018._0_11_;
          auVar2260[0xb] = local_1008[5];
          auVar2259._11_5_ = auVar2260._11_5_;
          auVar2259._0_10_ = local_1018._0_10_;
          auVar2259[10] = local_1018[5];
          auVar2258._10_6_ = auVar2259._10_6_;
          auVar2258._0_9_ = local_1018._0_9_;
          auVar2258[9] = local_1008[4];
          auVar2257._9_7_ = auVar2258._9_7_;
          auVar2257._0_8_ = local_1018._0_8_;
          auVar2257[8] = local_1018[4];
          Var21 = CONCAT91(CONCAT81(auVar2257._8_8_,local_1008[3]),local_1018[3]);
          auVar194._2_10_ = Var21;
          auVar194[1] = local_1008[2];
          auVar194[0] = local_1018[2];
          auVar2118._0_14_ = local_ff8._0_14_;
          auVar2118[0xe] = local_ff8[7];
          auVar2118[0xf] = local_fe8[7];
          auVar2117._14_2_ = auVar2118._14_2_;
          auVar2117._0_13_ = local_ff8._0_13_;
          auVar2117[0xd] = local_fe8[6];
          auVar2116._13_3_ = auVar2117._13_3_;
          auVar2116._0_12_ = local_ff8._0_12_;
          auVar2116[0xc] = local_ff8[6];
          auVar2115._12_4_ = auVar2116._12_4_;
          auVar2115._0_11_ = local_ff8._0_11_;
          auVar2115[0xb] = local_fe8[5];
          auVar2114._11_5_ = auVar2115._11_5_;
          auVar2114._0_10_ = local_ff8._0_10_;
          auVar2114[10] = local_ff8[5];
          auVar2113._10_6_ = auVar2114._10_6_;
          auVar2113._0_9_ = local_ff8._0_9_;
          auVar2113[9] = local_fe8[4];
          auVar2112._9_7_ = auVar2113._9_7_;
          auVar2112._0_8_ = local_ff8._0_8_;
          auVar2112[8] = local_ff8[4];
          Var39 = CONCAT91(CONCAT81(auVar2112._8_8_,local_fe8[3]),local_ff8[3]);
          auVar195._2_10_ = Var39;
          auVar195[1] = local_fe8[2];
          auVar195[0] = local_ff8[2];
          auVar2111._4_12_ = auVar195;
          auVar2111[3] = local_fe8[1];
          auVar2111[2] = local_ff8[1];
          auVar2111._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
          auVar2193._0_14_ = local_fd8._0_14_;
          auVar2193[0xe] = local_fd8[7];
          auVar2193[0xf] = local_fc8[7];
          auVar2192._14_2_ = auVar2193._14_2_;
          auVar2192._0_13_ = local_fd8._0_13_;
          auVar2192[0xd] = local_fc8[6];
          auVar2191._13_3_ = auVar2192._13_3_;
          auVar2191._0_12_ = local_fd8._0_12_;
          auVar2191[0xc] = local_fd8[6];
          auVar2190._12_4_ = auVar2191._12_4_;
          auVar2190._0_11_ = local_fd8._0_11_;
          auVar2190[0xb] = local_fc8[5];
          auVar2189._11_5_ = auVar2190._11_5_;
          auVar2189._0_10_ = local_fd8._0_10_;
          auVar2189[10] = local_fd8[5];
          auVar2188._10_6_ = auVar2189._10_6_;
          auVar2188._0_9_ = local_fd8._0_9_;
          auVar2188[9] = local_fc8[4];
          auVar2187._9_7_ = auVar2188._9_7_;
          auVar2187._0_8_ = local_fd8._0_8_;
          auVar2187[8] = local_fd8[4];
          Var42 = CONCAT91(CONCAT81(auVar2187._8_8_,local_fc8[3]),local_fd8[3]);
          auVar196._2_10_ = Var42;
          auVar196[1] = local_fc8[2];
          auVar196[0] = local_fd8[2];
          auVar1973._0_12_ = auVar1089._0_12_;
          auVar1973._12_2_ = (short)Var18;
          auVar1973._14_2_ = (short)Var21;
          auVar1972._12_4_ = auVar1973._12_4_;
          auVar1972._0_10_ = auVar1089._0_10_;
          auVar1972._10_2_ = auVar194._0_2_;
          auVar1971._10_6_ = auVar1972._10_6_;
          auVar1971._0_8_ = auVar1089._0_8_;
          auVar1971._8_2_ = auVar193._0_2_;
          auVar675._0_12_ = auVar2111._0_12_;
          auVar675._12_2_ = (short)Var39;
          auVar675._14_2_ = (short)Var42;
          auVar674._12_4_ = auVar675._12_4_;
          auVar674._0_10_ = auVar2111._0_10_;
          auVar674._10_2_ = auVar196._0_2_;
          auVar673._10_6_ = auVar674._10_6_;
          auVar673._0_8_ = auVar2111._0_8_;
          auVar673._8_2_ = auVar195._0_2_;
          auVar1281._0_14_ = local_fb8._0_14_;
          auVar1281[0xe] = local_fb8[7];
          auVar1281[0xf] = local_fa8[7];
          auVar1280._14_2_ = auVar1281._14_2_;
          auVar1280._0_13_ = local_fb8._0_13_;
          auVar1280[0xd] = local_fa8[6];
          auVar1279._13_3_ = auVar1280._13_3_;
          auVar1279._0_12_ = local_fb8._0_12_;
          auVar1279[0xc] = local_fb8[6];
          auVar1278._12_4_ = auVar1279._12_4_;
          auVar1278._0_11_ = local_fb8._0_11_;
          auVar1278[0xb] = local_fa8[5];
          auVar1277._11_5_ = auVar1278._11_5_;
          auVar1277._0_10_ = local_fb8._0_10_;
          auVar1277[10] = local_fb8[5];
          auVar1276._10_6_ = auVar1277._10_6_;
          auVar1276._0_9_ = local_fb8._0_9_;
          auVar1276[9] = local_fa8[4];
          auVar1275._9_7_ = auVar1276._9_7_;
          auVar1275._0_8_ = local_fb8._0_8_;
          auVar1275[8] = local_fb8[4];
          Var18 = CONCAT91(CONCAT81(auVar1275._8_8_,local_fa8[3]),local_fb8[3]);
          auVar197._2_10_ = Var18;
          auVar197[1] = local_fa8[2];
          auVar197[0] = local_fb8[2];
          auVar1274._4_12_ = auVar197;
          auVar1274[3] = local_fa8[1];
          auVar1274[2] = local_fb8[1];
          auVar1274._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
          auVar1591._0_14_ = local_f98._0_14_;
          auVar1591[0xe] = local_f98[7];
          auVar1591[0xf] = local_f88[7];
          auVar1590._14_2_ = auVar1591._14_2_;
          auVar1590._0_13_ = local_f98._0_13_;
          auVar1590[0xd] = local_f88[6];
          auVar1589._13_3_ = auVar1590._13_3_;
          auVar1589._0_12_ = local_f98._0_12_;
          auVar1589[0xc] = local_f98[6];
          auVar1588._12_4_ = auVar1589._12_4_;
          auVar1588._0_11_ = local_f98._0_11_;
          auVar1588[0xb] = local_f88[5];
          auVar1587._11_5_ = auVar1588._11_5_;
          auVar1587._0_10_ = local_f98._0_10_;
          auVar1587[10] = local_f98[5];
          auVar1586._10_6_ = auVar1587._10_6_;
          auVar1586._0_9_ = local_f98._0_9_;
          auVar1586[9] = local_f88[4];
          auVar1585._9_7_ = auVar1586._9_7_;
          auVar1585._0_8_ = local_f98._0_8_;
          auVar1585[8] = local_f98[4];
          Var21 = CONCAT91(CONCAT81(auVar1585._8_8_,local_f88[3]),local_f98[3]);
          auVar198._2_10_ = Var21;
          auVar198[1] = local_f88[2];
          auVar198[0] = local_f98[2];
          auVar1718._0_14_ = local_f78._0_14_;
          auVar1718[0xe] = local_f78[7];
          auVar1718[0xf] = local_f68[7];
          auVar1717._14_2_ = auVar1718._14_2_;
          auVar1717._0_13_ = local_f78._0_13_;
          auVar1717[0xd] = local_f68[6];
          auVar1716._13_3_ = auVar1717._13_3_;
          auVar1716._0_12_ = local_f78._0_12_;
          auVar1716[0xc] = local_f78[6];
          auVar1715._12_4_ = auVar1716._12_4_;
          auVar1715._0_11_ = local_f78._0_11_;
          auVar1715[0xb] = local_f68[5];
          auVar1714._11_5_ = auVar1715._11_5_;
          auVar1714._0_10_ = local_f78._0_10_;
          auVar1714[10] = local_f78[5];
          auVar1713._10_6_ = auVar1714._10_6_;
          auVar1713._0_9_ = local_f78._0_9_;
          auVar1713[9] = local_f68[4];
          auVar1712._9_7_ = auVar1713._9_7_;
          auVar1712._0_8_ = local_f78._0_8_;
          auVar1712[8] = local_f78[4];
          Var39 = CONCAT91(CONCAT81(auVar1712._8_8_,local_f68[3]),local_f78[3]);
          auVar199._2_10_ = Var39;
          auVar199[1] = local_f68[2];
          auVar199[0] = local_f78[2];
          auVar1711._4_12_ = auVar199;
          auVar1711[3] = local_f68[1];
          auVar1711[2] = local_f78[1];
          auVar1711._0_2_ = CONCAT11(local_f68[0],local_f78[0]);
          auVar1887._0_14_ = local_f58._0_14_;
          auVar1887[0xe] = local_f58[7];
          auVar1887[0xf] = local_f48[0][7];
          auVar1886._14_2_ = auVar1887._14_2_;
          auVar1886._0_13_ = local_f58._0_13_;
          auVar1886[0xd] = local_f48[0][6];
          auVar1885._13_3_ = auVar1886._13_3_;
          auVar1885._0_12_ = local_f58._0_12_;
          auVar1885[0xc] = local_f58[6];
          auVar1884._12_4_ = auVar1885._12_4_;
          auVar1884._0_11_ = local_f58._0_11_;
          auVar1884[0xb] = local_f48[0][5];
          auVar1883._11_5_ = auVar1884._11_5_;
          auVar1883._0_10_ = local_f58._0_10_;
          auVar1883[10] = local_f58[5];
          auVar1882._10_6_ = auVar1883._10_6_;
          auVar1882._0_9_ = local_f58._0_9_;
          auVar1882[9] = local_f48[0][4];
          auVar1881._9_7_ = auVar1882._9_7_;
          auVar1881._0_8_ = local_f58._0_8_;
          auVar1881[8] = local_f58[4];
          Var42 = CONCAT91(CONCAT81(auVar1881._8_8_,local_f48[0][3]),local_f58[3]);
          auVar200._2_10_ = Var42;
          auVar200[1] = local_f48[0][2];
          auVar200[0] = local_f58[2];
          auVar678._0_12_ = auVar1274._0_12_;
          auVar678._12_2_ = (short)Var18;
          auVar678._14_2_ = (short)Var21;
          auVar677._12_4_ = auVar678._12_4_;
          auVar677._0_10_ = auVar1274._0_10_;
          auVar677._10_2_ = auVar198._0_2_;
          auVar676._10_6_ = auVar677._10_6_;
          auVar676._0_8_ = auVar1274._0_8_;
          auVar676._8_2_ = auVar197._0_2_;
          auVar1396._0_12_ = auVar1711._0_12_;
          auVar1396._12_2_ = (short)Var39;
          auVar1396._14_2_ = (short)Var42;
          auVar1395._12_4_ = auVar1396._12_4_;
          auVar1395._0_10_ = auVar1711._0_10_;
          auVar1395._10_2_ = auVar200._0_2_;
          auVar1394._10_6_ = auVar1395._10_6_;
          auVar1394._0_8_ = auVar1711._0_8_;
          auVar1394._8_2_ = auVar199._0_2_;
          local_1638[0] =
               CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar2111._0_2_),
                        CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar1089._0_2_));
          local_1638[1] =
               CONCAT44(CONCAT22(CONCAT11(local_f48[0][0],local_f58[0]),auVar1711._0_2_),
                        CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar1274._0_2_));
          local_1628 = local_1038[1];
          uStack_1627 = local_1028[1];
          uStack_1626 = local_1018[1];
          uStack_1625 = local_1008[1];
          uStack_1624 = local_ff8[1];
          uStack_1623 = local_fe8[1];
          uStack_1622 = local_fd8[1];
          uStack_1621 = local_fc8[1];
          uStack_1620 = local_fb8[1];
          uStack_161f = local_fa8[1];
          uStack_161e = local_f98[1];
          uStack_161d = local_f88[1];
          uStack_161c = local_f78[1];
          uStack_161b = local_f68[1];
          uStack_161a = local_f58[1];
          uStack_1619 = local_f48[0][1];
          local_1618 = auVar1971._8_4_;
          uStack_1614 = auVar673._8_4_;
          uStack_1610 = auVar676._8_4_;
          uStack_160c = auVar1394._8_4_;
          local_1608._8_4_ = auVar1972._12_4_;
          local_1608._12_4_ = auVar674._12_4_;
          local_15f8._0_4_ = CONCAT22(auVar2257._8_2_,auVar1090._8_2_);
          auVar928._0_8_ = CONCAT26(auVar2259._10_2_,CONCAT24(auVar1092._10_2_,local_15f8._0_4_));
          auVar928._8_2_ = auVar1094._12_2_;
          auVar928._10_2_ = auVar2261._12_2_;
          auVar1097._12_2_ = auVar1095._14_2_;
          auVar1097._0_12_ = auVar928;
          auVar1097._14_2_ = auVar2262._14_2_;
          local_15f8._4_4_ = CONCAT22(auVar2187._8_2_,auVar2112._8_2_);
          auVar2042._0_8_ = CONCAT26(auVar2189._10_2_,CONCAT24(auVar2114._10_2_,local_15f8._4_4_));
          auVar2042._8_2_ = auVar2116._12_2_;
          auVar2042._10_2_ = auVar2191._12_2_;
          auVar2119._12_2_ = auVar2117._14_2_;
          auVar2119._0_12_ = auVar2042;
          auVar2119._14_2_ = auVar2192._14_2_;
          local_15f8._8_4_ = CONCAT22(auVar1585._8_2_,auVar1275._8_2_);
          auVar1156._0_8_ = CONCAT26(auVar1587._10_2_,CONCAT24(auVar1277._10_2_,local_15f8._8_4_));
          auVar1156._8_2_ = auVar1279._12_2_;
          auVar1156._10_2_ = auVar1589._12_2_;
          local_15f8._12_4_ = CONCAT22(auVar1881._8_2_,auVar1712._8_2_);
          auVar1626._0_8_ = CONCAT26(auVar1883._10_2_,CONCAT24(auVar1714._10_2_,local_15f8._12_4_));
          auVar1626._8_2_ = auVar1716._12_2_;
          auVar1626._10_2_ = auVar1885._12_2_;
          auVar419._8_4_ = (int)((ulong)auVar928._0_8_ >> 0x20);
          auVar419._0_8_ = auVar928._0_8_;
          auVar419._12_4_ = (int)((ulong)auVar2042._0_8_ >> 0x20);
          auVar679._8_4_ = (int)((ulong)auVar1156._0_8_ >> 0x20);
          auVar679._0_8_ = auVar1156._0_8_;
          auVar679._12_4_ = (int)((ulong)auVar1626._0_8_ >> 0x20);
          local_15e8._8_8_ = auVar679._8_8_;
          local_15e8._0_8_ = auVar419._8_8_;
          local_15d8._4_4_ = auVar2042._8_4_;
          local_15d8._0_4_ = auVar928._8_4_;
          local_15d8._8_4_ = auVar1156._8_4_;
          local_15d8._12_4_ = auVar1626._8_4_;
          local_15c8._8_4_ = auVar1097._12_4_;
          local_15c8._12_4_ = auVar2119._12_4_;
          uVar265 = CONCAT11(local_1028[8],local_1038[8]);
          uVar1426 = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar265));
          uVar1427 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],uVar1426));
          uVar1428 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar1427));
          auVar1443._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar1428));
          auVar1443[10] = local_1038[0xd];
          auVar1443[0xb] = local_1028[0xd];
          auVar1456[0xc] = local_1038[0xe];
          auVar1456._0_12_ = auVar1443;
          auVar1456[0xd] = local_1028[0xe];
          auVar1496[0xe] = local_1038[0xf];
          auVar1496._0_14_ = auVar1456;
          auVar1496[0xf] = local_1028[0xf];
          uStack_1640 = local_1018[8];
          uStack_163f = local_1018[9];
          uStack_163e = local_1018[10];
          uStack_163d = local_1018[0xb];
          uStack_163c = local_1018[0xc];
          uStack_163b = local_1018[0xd];
          uStack_163a = local_1018[0xe];
          uStack_1639 = local_1018[0xf];
          auVar298._12_4_ =
               CONCAT13(local_1008[9],CONCAT12(uStack_163f,CONCAT11(local_1008[8],uStack_1640)));
          uVar266 = CONCAT15(local_1008[10],CONCAT14(uStack_163e,auVar298._12_4_));
          uVar267 = CONCAT17(local_1008[0xb],CONCAT16(uStack_163d,uVar266));
          auVar482._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(uStack_163c,uVar267));
          auVar482[10] = uStack_163b;
          auVar482[0xb] = local_1008[0xd];
          auVar499[0xc] = uStack_163a;
          auVar499._0_12_ = auVar482;
          auVar499[0xd] = local_1008[0xe];
          auVar680[0xe] = uStack_1639;
          auVar680._0_14_ = auVar499;
          auVar680[0xf] = local_1008[0xf];
          uStack_1670 = local_ff8[8];
          uStack_166f = local_ff8[9];
          uStack_166e = local_ff8[10];
          uStack_166d = local_ff8[0xb];
          uStack_166c = local_ff8[0xc];
          uStack_166b = local_ff8[0xd];
          uStack_166a = local_ff8[0xe];
          uStack_1669 = local_ff8[0xf];
          auVar784._12_4_ =
               CONCAT13(local_fe8[9],CONCAT12(uStack_166f,CONCAT11(local_fe8[8],uStack_1670)));
          uVar459 = CONCAT15(local_fe8[10],CONCAT14(uStack_166e,auVar784._12_4_));
          uVar460 = CONCAT17(local_fe8[0xb],CONCAT16(uStack_166d,uVar459));
          auVar756._0_10_ = CONCAT19(local_fe8[0xc],CONCAT18(uStack_166c,uVar460));
          auVar756[10] = uStack_166b;
          auVar756[0xb] = local_fe8[0xd];
          auVar769[0xc] = uStack_166a;
          auVar769._0_12_ = auVar756;
          auVar769[0xd] = local_fe8[0xe];
          auVar874[0xe] = uStack_1669;
          auVar874._0_14_ = auVar769;
          auVar874[0xf] = local_fe8[0xf];
          uStack_1690 = local_fd8[8];
          uStack_168f = local_fd8[9];
          uStack_168e = local_fd8[10];
          uStack_168d = local_fd8[0xb];
          uStack_168c = local_fd8[0xc];
          uStack_168b = local_fd8[0xd];
          uStack_168a = local_fd8[0xe];
          uStack_1689 = local_fd8[0xf];
          uVar741 = CONCAT13(local_fc8[9],CONCAT12(uStack_168f,CONCAT11(local_fc8[8],uStack_1690)));
          uVar742 = CONCAT15(local_fc8[10],CONCAT14(uStack_168e,uVar741));
          uVar743 = CONCAT17(local_fc8[0xb],CONCAT16(uStack_168d,uVar742));
          auVar929._0_10_ = CONCAT19(local_fc8[0xc],CONCAT18(uStack_168c,uVar743));
          auVar929[10] = uStack_168b;
          auVar929[0xb] = local_fc8[0xd];
          auVar943[0xc] = uStack_168a;
          auVar943._0_12_ = auVar929;
          auVar943[0xd] = local_fc8[0xe];
          auVar1098[0xe] = uStack_1689;
          auVar1098._0_14_ = auVar943;
          auVar1098[0xf] = local_fc8[0xf];
          uVar458 = CONCAT11(local_fa8[8],local_fb8[8]);
          uVar1750 = CONCAT13(local_fa8[9],CONCAT12(local_fb8[9],uVar458));
          uVar1751 = CONCAT15(local_fa8[10],CONCAT14(local_fb8[10],uVar1750));
          uVar1752 = CONCAT17(local_fa8[0xb],CONCAT16(local_fb8[0xb],uVar1751));
          auVar1765._0_10_ = CONCAT19(local_fa8[0xc],CONCAT18(local_fb8[0xc],uVar1752));
          auVar1765[10] = local_fb8[0xd];
          auVar1765[0xb] = local_fa8[0xd];
          auVar1777[0xc] = local_fb8[0xe];
          auVar1777._0_12_ = auVar1765;
          auVar1777[0xd] = local_fa8[0xe];
          auVar1806[0xe] = local_fb8[0xf];
          auVar1806._0_14_ = auVar1777;
          auVar1806[0xf] = local_fa8[0xf];
          uStack_16c0 = local_f98[8];
          uStack_16bf = local_f98[9];
          uStack_16be = local_f98[10];
          uStack_16bd = local_f98[0xb];
          uStack_16bc = local_f98[0xc];
          uStack_16bb = local_f98[0xd];
          uStack_16ba = local_f98[0xe];
          uStack_16b9 = local_f98[0xf];
          uVar908 = CONCAT13(local_f88[9],CONCAT12(uStack_16bf,CONCAT11(local_f88[8],uStack_16c0)));
          uVar909 = CONCAT15(local_f88[10],CONCAT14(uStack_16be,uVar908));
          uVar910 = CONCAT17(local_f88[0xb],CONCAT16(uStack_16bd,uVar909));
          auVar1157._0_10_ = CONCAT19(local_f88[0xc],CONCAT18(uStack_16bc,uVar910));
          auVar1157[10] = uStack_16bb;
          auVar1157[0xb] = local_f88[0xd];
          auVar1169[0xc] = uStack_16ba;
          auVar1169._0_12_ = auVar1157;
          auVar1169[0xd] = local_f88[0xe];
          auVar1282[0xe] = uStack_16b9;
          auVar1282._0_14_ = auVar1169;
          auVar1282[0xf] = local_f88[0xf];
          uVar740 = CONCAT11(local_f68[8],local_f78[8]);
          uVar1987 = CONCAT13(local_f68[9],CONCAT12(local_f78[9],uVar740));
          uVar1988 = CONCAT15(local_f68[10],CONCAT14(local_f78[10],uVar1987));
          uVar1989 = CONCAT17(local_f68[0xb],CONCAT16(local_f78[0xb],uVar1988));
          auVar2002._0_10_ = CONCAT19(local_f68[0xc],CONCAT18(local_f78[0xc],uVar1989));
          auVar2002[10] = local_f78[0xd];
          auVar2002[0xb] = local_f68[0xd];
          auVar2014[0xc] = local_f78[0xe];
          auVar2014._0_12_ = auVar2002;
          auVar2014[0xd] = local_f68[0xe];
          auVar2029[0xe] = local_f78[0xf];
          auVar2029._0_14_ = auVar2014;
          auVar2029[0xf] = local_f68[0xf];
          uStack_16f0 = local_f58[8];
          uStack_16ef = local_f58[9];
          uStack_16ee = local_f58[10];
          uStack_16ed = local_f58[0xb];
          uStack_16ec = local_f58[0xc];
          uStack_16eb = local_f58[0xd];
          uStack_16ea = local_f58[0xe];
          uStack_16e9 = local_f58[0xf];
          uVar1905 = CONCAT13(local_f48[0][9],
                              CONCAT12(uStack_16ef,CONCAT11(local_f48[0][8],uStack_16f0)));
          uVar1906 = CONCAT15(local_f48[0][10],CONCAT14(uStack_16ee,uVar1905));
          uVar1907 = CONCAT17(local_f48[0][0xb],CONCAT16(uStack_16ed,uVar1906));
          auVar1914._0_10_ = CONCAT19(local_f48[0][0xc],CONCAT18(uStack_16ec,uVar1907));
          auVar1914[10] = uStack_16eb;
          auVar1914[0xb] = local_f48[0][0xd];
          auVar1923[0xc] = uStack_16ea;
          auVar1923._0_12_ = auVar1914;
          auVar1923[0xd] = local_f48[0][0xe];
          auVar1974[0xe] = uStack_16e9;
          auVar1974._0_14_ = auVar1923;
          auVar1974[0xf] = local_f48[0][0xf];
          auVar425._12_2_ = (short)((ulong)uVar1428 >> 0x30);
          auVar425._0_12_ = auVar1443;
          auVar425._14_2_ = (short)((ulong)uVar267 >> 0x30);
          auVar424._12_4_ = auVar425._12_4_;
          auVar424._10_2_ = (short)((uint6)uVar266 >> 0x20);
          auVar424._0_10_ = auVar1443._0_10_;
          auVar423._10_6_ = auVar424._10_6_;
          auVar423._8_2_ = (short)((uint6)uVar1427 >> 0x20);
          auVar423._0_8_ = uVar1428;
          auVar422._8_8_ = auVar423._8_8_;
          auVar422._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
          auVar422._0_6_ = uVar1427;
          auVar421._6_10_ = auVar422._6_10_;
          auVar421._4_2_ = (short)((uint)uVar1426 >> 0x10);
          auVar421._0_4_ = uVar1426;
          auVar420._4_12_ = auVar421._4_12_;
          auVar420._0_4_ = CONCAT22(CONCAT11(local_1008[8],uStack_1640),uVar265);
          auVar685._12_2_ = (short)((ulong)uVar460 >> 0x30);
          auVar685._0_12_ = auVar756;
          auVar685._14_2_ = (short)((ulong)uVar743 >> 0x30);
          auVar684._12_4_ = auVar685._12_4_;
          auVar684._10_2_ = (short)((uint6)uVar742 >> 0x20);
          auVar684._0_10_ = auVar756._0_10_;
          auVar683._10_6_ = auVar684._10_6_;
          auVar683._8_2_ = (short)((uint6)uVar459 >> 0x20);
          auVar683._0_8_ = uVar460;
          auVar682._8_8_ = auVar683._8_8_;
          auVar682._6_2_ = (short)((uint)uVar741 >> 0x10);
          auVar682._0_6_ = uVar459;
          auVar681._6_10_ = auVar682._6_10_;
          auVar681._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
          auVar681._0_4_ = auVar784._12_4_;
          auVar880._12_2_ = (short)((ulong)uVar1752 >> 0x30);
          auVar880._0_12_ = auVar1765;
          auVar880._14_2_ = (short)((ulong)uVar910 >> 0x30);
          auVar879._12_4_ = auVar880._12_4_;
          auVar879._10_2_ = (short)((uint6)uVar909 >> 0x20);
          auVar879._0_10_ = auVar1765._0_10_;
          auVar878._10_6_ = auVar879._10_6_;
          auVar878._8_2_ = (short)((uint6)uVar1751 >> 0x20);
          auVar878._0_8_ = uVar1752;
          auVar877._8_8_ = auVar878._8_8_;
          auVar877._6_2_ = (short)((uint)uVar908 >> 0x10);
          auVar877._0_6_ = uVar1751;
          auVar876._6_10_ = auVar877._6_10_;
          auVar876._4_2_ = (short)((uint)uVar1750 >> 0x10);
          auVar876._0_4_ = uVar1750;
          auVar875._4_12_ = auVar876._4_12_;
          auVar875._0_4_ = CONCAT22(CONCAT11(local_f88[8],uStack_16c0),uVar458);
          auVar1103._12_2_ = (short)((ulong)uVar1989 >> 0x30);
          auVar1103._0_12_ = auVar2002;
          auVar1103._14_2_ = (short)((ulong)uVar1907 >> 0x30);
          auVar1102._12_4_ = auVar1103._12_4_;
          auVar1102._10_2_ = (short)((uint6)uVar1906 >> 0x20);
          auVar1102._0_10_ = auVar2002._0_10_;
          auVar1101._10_6_ = auVar1102._10_6_;
          auVar1101._8_2_ = (short)((uint6)uVar1988 >> 0x20);
          auVar1101._0_8_ = uVar1989;
          auVar1100._8_8_ = auVar1101._8_8_;
          auVar1100._6_2_ = (short)((uint)uVar1905 >> 0x10);
          auVar1100._0_6_ = uVar1988;
          auVar1099._6_10_ = auVar1100._6_10_;
          auVar1099._4_2_ = (short)((uint)uVar1987 >> 0x10);
          auVar1099._0_4_ = uVar1987;
          auVar1283._0_8_ = auVar420._0_8_;
          auVar1283._8_4_ = auVar421._4_4_;
          auVar1283._12_4_ = auVar681._4_4_;
          auVar686._0_8_ = auVar875._0_8_;
          auVar686._8_4_ = auVar876._4_4_;
          auVar686._12_4_ = auVar1099._4_4_;
          local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_fc8[8],uStack_1690),
                                         CONCAT11(local_fe8[8],uStack_1670)),auVar420._0_4_);
          auStack_15b0[0] =
               CONCAT44(CONCAT22(CONCAT11(local_f48[0][8],uStack_16f0),uVar740),auVar875._0_4_);
          auStack_15b0[1] = auVar1283._8_8_;
          auStack_15b0[2] = auVar686._8_8_;
          local_1598 = CONCAT44(auVar683._8_4_,auVar423._8_4_);
          uStack_1590 = CONCAT44(auVar1101._8_4_,auVar878._8_4_);
          local_1588._8_4_ = auVar424._12_4_;
          local_1588._12_4_ = auVar684._12_4_;
          auVar784._12_4_ =
               CONCAT22((short)((unkuint10)auVar482._0_10_ >> 0x40),
                        (short)((unkuint10)auVar1443._0_10_ >> 0x40));
          auVar1444._0_8_ = CONCAT26(auVar482._10_2_,CONCAT24(auVar1443._10_2_,auVar784._12_4_));
          auVar1444._8_2_ = auVar1456._12_2_;
          auVar1444._10_2_ = auVar499._12_2_;
          auVar1497._12_2_ = auVar1496._14_2_;
          auVar1497._0_12_ = auVar1444;
          auVar1497._14_2_ = auVar680._14_2_;
          auVar298._12_4_ =
               CONCAT22((short)((unkuint10)auVar929._0_10_ >> 0x40),
                        (short)((unkuint10)auVar756._0_10_ >> 0x40));
          auVar483._0_8_ = CONCAT26(auVar929._10_2_,CONCAT24(auVar756._10_2_,auVar298._12_4_));
          auVar483._8_2_ = auVar769._12_2_;
          auVar483._10_2_ = auVar943._12_2_;
          auVar687._12_2_ = auVar874._14_2_;
          auVar687._0_12_ = auVar483;
          auVar687._14_2_ = auVar1098._14_2_;
          uVar741 = CONCAT22((short)((unkuint10)auVar1157._0_10_ >> 0x40),
                             (short)((unkuint10)auVar1765._0_10_ >> 0x40));
          auVar1766._0_8_ = CONCAT26(auVar1157._10_2_,CONCAT24(auVar1765._10_2_,uVar741));
          auVar1766._8_2_ = auVar1777._12_2_;
          auVar1766._10_2_ = auVar1169._12_2_;
          auVar1807._12_2_ = auVar1806._14_2_;
          auVar1807._0_12_ = auVar1766;
          auVar1807._14_2_ = auVar1282._14_2_;
          uVar908 = CONCAT22((short)((unkuint10)auVar1914._0_10_ >> 0x40),
                             (short)((unkuint10)auVar2002._0_10_ >> 0x40));
          auVar2003._0_8_ = CONCAT26(auVar1914._10_2_,CONCAT24(auVar2002._10_2_,uVar908));
          auVar2003._8_2_ = auVar2014._12_2_;
          auVar2003._10_2_ = auVar1923._12_2_;
          auVar2030._12_2_ = auVar2029._14_2_;
          auVar2030._0_12_ = auVar2003;
          auVar2030._14_2_ = auVar1974._14_2_;
          auVar426._8_4_ = (int)((ulong)auVar1444._0_8_ >> 0x20);
          auVar426._0_8_ = auVar1444._0_8_;
          auVar426._12_4_ = (int)((ulong)auVar483._0_8_ >> 0x20);
          auVar688._8_4_ = (int)((ulong)auVar1766._0_8_ >> 0x20);
          auVar688._0_8_ = auVar1766._0_8_;
          auVar688._12_4_ = (int)((ulong)auVar2003._0_8_ >> 0x20);
          local_1578 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
          uStack_1570 = CONCAT44(uVar908,uVar741);
          local_1568 = auVar426._8_8_;
          uStack_1560 = auVar688._8_8_;
          local_1558 = CONCAT44(auVar483._8_4_,auVar1444._8_4_);
          uStack_1550 = CONCAT44(auVar2003._8_4_,auVar1766._8_4_);
          local_1548._8_4_ = auVar1497._12_4_;
          local_1548._12_4_ = auVar687._12_4_;
          local_1538 = CONCAT44(auVar2030._12_4_,auVar1807._12_4_);
          auVar15._8_8_ = uStack_1430;
          auVar15._0_8_ = CONCAT44(uStack_1434,local_1438);
          auVar1111._0_14_ = auVar15._0_14_;
          auVar1111[0xe] = (char)((uint)uStack_1434 >> 0x18);
          auVar1111[0xf] = uStack_1421;
          auVar1110._14_2_ = auVar1111._14_2_;
          auVar1110._0_13_ = auVar15._0_13_;
          auVar1110[0xd] = uStack_1422;
          auVar1109._13_3_ = auVar1110._13_3_;
          auVar1109._0_12_ = auVar15._0_12_;
          auVar1109[0xc] = (char)((uint)uStack_1434 >> 0x10);
          auVar1108._12_4_ = auVar1109._12_4_;
          auVar1108._0_11_ = auVar15._0_11_;
          auVar1108[0xb] = uStack_1423;
          auVar1107._11_5_ = auVar1108._11_5_;
          auVar1107._0_10_ = auVar15._0_10_;
          auVar1107[10] = (char)((uint)uStack_1434 >> 8);
          auVar1106._10_6_ = auVar1107._10_6_;
          auVar1106._0_9_ = auVar15._0_9_;
          auVar1106[9] = uStack_1424;
          auVar1105._9_7_ = auVar1106._9_7_;
          auVar1105[8] = (char)uStack_1434;
          auVar1105._0_8_ = CONCAT44(uStack_1434,local_1438);
          Var18 = CONCAT91(CONCAT81(auVar1105._8_8_,uStack_1425),(char)((uint)local_1438 >> 0x18));
          auVar202._2_10_ = Var18;
          auVar202[1] = uStack_1426;
          auVar202[0] = (char)((uint)local_1438 >> 0x10);
          auVar201._2_12_ = auVar202;
          auVar201[1] = uStack_1427;
          auVar201[0] = (char)((uint)local_1438 >> 8);
          auVar1104._0_2_ = CONCAT11(local_1428,(char)local_1438);
          auVar1104._2_14_ = auVar201;
          auVar2270._0_14_ = local_1418._0_14_;
          auVar2270[0xe] = local_1418[7];
          auVar2270[0xf] = uStack_1401;
          auVar2269._14_2_ = auVar2270._14_2_;
          auVar2269._0_13_ = local_1418._0_13_;
          auVar2269[0xd] = uStack_1402;
          auVar2268._13_3_ = auVar2269._13_3_;
          auVar2268._0_12_ = local_1418._0_12_;
          auVar2268[0xc] = local_1418[6];
          auVar2267._12_4_ = auVar2268._12_4_;
          auVar2267._0_11_ = local_1418._0_11_;
          auVar2267[0xb] = uStack_1403;
          auVar2266._11_5_ = auVar2267._11_5_;
          auVar2266._0_10_ = local_1418._0_10_;
          auVar2266[10] = local_1418[5];
          auVar2265._10_6_ = auVar2266._10_6_;
          auVar2265._0_9_ = local_1418._0_9_;
          auVar2265[9] = uStack_1404;
          auVar2264._9_7_ = auVar2265._9_7_;
          auVar2264._0_8_ = local_1418._0_8_;
          auVar2264[8] = local_1418[4];
          Var21 = CONCAT91(CONCAT81(auVar2264._8_8_,uStack_1405),local_1418[3]);
          auVar204._2_10_ = Var21;
          auVar204[1] = uStack_1406;
          auVar204[0] = local_1418[2];
          auVar203._2_12_ = auVar204;
          auVar203[1] = uStack_1407;
          auVar203[0] = local_1418[1];
          auVar2127._0_14_ = local_13f8._0_14_;
          auVar2127[0xe] = local_13f8[7];
          auVar2127[0xf] = uStack_13e1;
          auVar2126._14_2_ = auVar2127._14_2_;
          auVar2126._0_13_ = local_13f8._0_13_;
          auVar2126[0xd] = uStack_13e2;
          auVar2125._13_3_ = auVar2126._13_3_;
          auVar2125._0_12_ = local_13f8._0_12_;
          auVar2125[0xc] = local_13f8[6];
          auVar2124._12_4_ = auVar2125._12_4_;
          auVar2124._0_11_ = local_13f8._0_11_;
          auVar2124[0xb] = uStack_13e3;
          auVar2123._11_5_ = auVar2124._11_5_;
          auVar2123._0_10_ = local_13f8._0_10_;
          auVar2123[10] = local_13f8[5];
          auVar2122._10_6_ = auVar2123._10_6_;
          auVar2122._0_9_ = local_13f8._0_9_;
          auVar2122[9] = uStack_13e4;
          auVar2121._9_7_ = auVar2122._9_7_;
          auVar2121._0_8_ = local_13f8._0_8_;
          auVar2121[8] = local_13f8[4];
          Var39 = CONCAT91(CONCAT81(auVar2121._8_8_,uStack_13e5),local_13f8[3]);
          auVar206._2_10_ = Var39;
          auVar206[1] = uStack_13e6;
          auVar206[0] = local_13f8[2];
          auVar205._2_12_ = auVar206;
          auVar205[1] = uStack_13e7;
          auVar205[0] = local_13f8[1];
          auVar2120._0_2_ = CONCAT11(local_13e8,local_13f8[0]);
          auVar2120._2_14_ = auVar205;
          auVar2200._0_14_ = local_13d8._0_14_;
          auVar2200[0xe] = local_13d8[7];
          auVar2200[0xf] = uStack_13c1;
          auVar2199._14_2_ = auVar2200._14_2_;
          auVar2199._0_13_ = local_13d8._0_13_;
          auVar2199[0xd] = uStack_13c2;
          auVar2198._13_3_ = auVar2199._13_3_;
          auVar2198._0_12_ = local_13d8._0_12_;
          auVar2198[0xc] = local_13d8[6];
          auVar2197._12_4_ = auVar2198._12_4_;
          auVar2197._0_11_ = local_13d8._0_11_;
          auVar2197[0xb] = uStack_13c3;
          auVar2196._11_5_ = auVar2197._11_5_;
          auVar2196._0_10_ = local_13d8._0_10_;
          auVar2196[10] = local_13d8[5];
          auVar2195._10_6_ = auVar2196._10_6_;
          auVar2195._0_9_ = local_13d8._0_9_;
          auVar2195[9] = uStack_13c4;
          auVar2194._9_7_ = auVar2195._9_7_;
          auVar2194._0_8_ = local_13d8._0_8_;
          auVar2194[8] = local_13d8[4];
          Var42 = CONCAT91(CONCAT81(auVar2194._8_8_,uStack_13c5),local_13d8[3]);
          auVar208._2_10_ = Var42;
          auVar208[1] = uStack_13c6;
          auVar208[0] = local_13d8[2];
          auVar207._2_12_ = auVar208;
          auVar207[1] = uStack_13c7;
          auVar207[0] = local_13d8[1];
          auVar1978._0_12_ = auVar1104._0_12_;
          auVar1978._12_2_ = (short)Var18;
          auVar1978._14_2_ = (short)Var21;
          auVar1977._12_4_ = auVar1978._12_4_;
          auVar1977._0_10_ = auVar1104._0_10_;
          auVar1977._10_2_ = auVar204._0_2_;
          auVar1976._10_6_ = auVar1977._10_6_;
          auVar1976._0_8_ = auVar1104._0_8_;
          auVar1976._8_2_ = auVar202._0_2_;
          auVar209._4_8_ = auVar1976._8_8_;
          auVar209._2_2_ = auVar203._0_2_;
          auVar209._0_2_ = auVar201._0_2_;
          auVar1975._0_4_ = CONCAT22(CONCAT11(local_1408,local_1418[0]),auVar1104._0_2_);
          auVar1975._4_12_ = auVar209;
          auVar691._0_12_ = auVar2120._0_12_;
          auVar691._12_2_ = (short)Var39;
          auVar691._14_2_ = (short)Var42;
          auVar690._12_4_ = auVar691._12_4_;
          auVar690._0_10_ = auVar2120._0_10_;
          auVar690._10_2_ = auVar208._0_2_;
          auVar689._10_6_ = auVar690._10_6_;
          auVar689._0_8_ = auVar2120._0_8_;
          auVar689._8_2_ = auVar206._0_2_;
          auVar210._4_8_ = auVar689._8_8_;
          auVar210._2_2_ = auVar207._0_2_;
          auVar210._0_2_ = auVar205._0_2_;
          auVar881._0_8_ = auVar1975._0_8_;
          auVar881._8_4_ = auVar209._0_4_;
          auVar881._12_4_ = auVar210._0_4_;
          auVar1291._0_14_ = local_13b8._0_14_;
          auVar1291[0xe] = local_13b8[7];
          auVar1291[0xf] = uStack_13a1;
          auVar1290._14_2_ = auVar1291._14_2_;
          auVar1290._0_13_ = local_13b8._0_13_;
          auVar1290[0xd] = uStack_13a2;
          auVar1289._13_3_ = auVar1290._13_3_;
          auVar1289._0_12_ = local_13b8._0_12_;
          auVar1289[0xc] = local_13b8[6];
          auVar1288._12_4_ = auVar1289._12_4_;
          auVar1288._0_11_ = local_13b8._0_11_;
          auVar1288[0xb] = uStack_13a3;
          auVar1287._11_5_ = auVar1288._11_5_;
          auVar1287._0_10_ = local_13b8._0_10_;
          auVar1287[10] = local_13b8[5];
          auVar1286._10_6_ = auVar1287._10_6_;
          auVar1286._0_9_ = local_13b8._0_9_;
          auVar1286[9] = uStack_13a4;
          auVar1285._9_7_ = auVar1286._9_7_;
          auVar1285._0_8_ = local_13b8._0_8_;
          auVar1285[8] = local_13b8[4];
          Var18 = CONCAT91(CONCAT81(auVar1285._8_8_,uStack_13a5),local_13b8[3]);
          auVar212._2_10_ = Var18;
          auVar212[1] = uStack_13a6;
          auVar212[0] = local_13b8[2];
          auVar211._2_12_ = auVar212;
          auVar211[1] = uStack_13a7;
          auVar211[0] = local_13b8[1];
          auVar1284._0_2_ = CONCAT11(local_13a8,local_13b8[0]);
          auVar1284._2_14_ = auVar211;
          auVar1598._0_14_ = local_1398._0_14_;
          auVar1598[0xe] = local_1398[7];
          auVar1598[0xf] = uStack_1381;
          auVar1597._14_2_ = auVar1598._14_2_;
          auVar1597._0_13_ = local_1398._0_13_;
          auVar1597[0xd] = uStack_1382;
          auVar1596._13_3_ = auVar1597._13_3_;
          auVar1596._0_12_ = local_1398._0_12_;
          auVar1596[0xc] = local_1398[6];
          auVar1595._12_4_ = auVar1596._12_4_;
          auVar1595._0_11_ = local_1398._0_11_;
          auVar1595[0xb] = uStack_1383;
          auVar1594._11_5_ = auVar1595._11_5_;
          auVar1594._0_10_ = local_1398._0_10_;
          auVar1594[10] = local_1398[5];
          auVar1593._10_6_ = auVar1594._10_6_;
          auVar1593._0_9_ = local_1398._0_9_;
          auVar1593[9] = uStack_1384;
          auVar1592._9_7_ = auVar1593._9_7_;
          auVar1592._0_8_ = local_1398._0_8_;
          auVar1592[8] = local_1398[4];
          Var21 = CONCAT91(CONCAT81(auVar1592._8_8_,uStack_1385),local_1398[3]);
          auVar214._2_10_ = Var21;
          auVar214[1] = uStack_1386;
          auVar214[0] = local_1398[2];
          auVar213._2_12_ = auVar214;
          auVar213[1] = uStack_1387;
          auVar213[0] = local_1398[1];
          auVar1726._0_14_ = local_1378._0_14_;
          auVar1726[0xe] = local_1378[7];
          auVar1726[0xf] = uStack_1361;
          auVar1725._14_2_ = auVar1726._14_2_;
          auVar1725._0_13_ = local_1378._0_13_;
          auVar1725[0xd] = uStack_1362;
          auVar1724._13_3_ = auVar1725._13_3_;
          auVar1724._0_12_ = local_1378._0_12_;
          auVar1724[0xc] = local_1378[6];
          auVar1723._12_4_ = auVar1724._12_4_;
          auVar1723._0_11_ = local_1378._0_11_;
          auVar1723[0xb] = uStack_1363;
          auVar1722._11_5_ = auVar1723._11_5_;
          auVar1722._0_10_ = local_1378._0_10_;
          auVar1722[10] = local_1378[5];
          auVar1721._10_6_ = auVar1722._10_6_;
          auVar1721._0_9_ = local_1378._0_9_;
          auVar1721[9] = uStack_1364;
          auVar1720._9_7_ = auVar1721._9_7_;
          auVar1720._0_8_ = local_1378._0_8_;
          auVar1720[8] = local_1378[4];
          Var39 = CONCAT91(CONCAT81(auVar1720._8_8_,uStack_1365),local_1378[3]);
          auVar216._2_10_ = Var39;
          auVar216[1] = uStack_1366;
          auVar216[0] = local_1378[2];
          auVar215._2_12_ = auVar216;
          auVar215[1] = uStack_1367;
          auVar215[0] = local_1378[1];
          auVar1719._0_2_ = CONCAT11(local_1368,local_1378[0]);
          auVar1719._2_14_ = auVar215;
          auVar1894._0_14_ = local_1358._0_14_;
          auVar1894[0xe] = local_1358[7];
          auVar1894[0xf] = uStack_1341;
          auVar1893._14_2_ = auVar1894._14_2_;
          auVar1893._0_13_ = local_1358._0_13_;
          auVar1893[0xd] = uStack_1342;
          auVar1892._13_3_ = auVar1893._13_3_;
          auVar1892._0_12_ = local_1358._0_12_;
          auVar1892[0xc] = local_1358[6];
          auVar1891._12_4_ = auVar1892._12_4_;
          auVar1891._0_11_ = local_1358._0_11_;
          auVar1891[0xb] = uStack_1343;
          auVar1890._11_5_ = auVar1891._11_5_;
          auVar1890._0_10_ = local_1358._0_10_;
          auVar1890[10] = local_1358[5];
          auVar1889._10_6_ = auVar1890._10_6_;
          auVar1889._0_9_ = local_1358._0_9_;
          auVar1889[9] = uStack_1344;
          auVar1888._9_7_ = auVar1889._9_7_;
          auVar1888._0_8_ = local_1358._0_8_;
          auVar1888[8] = local_1358[4];
          Var42 = CONCAT91(CONCAT81(auVar1888._8_8_,uStack_1345),local_1358[3]);
          auVar218._2_10_ = Var42;
          auVar218[1] = uStack_1346;
          auVar218[0] = local_1358[2];
          auVar217._2_12_ = auVar218;
          auVar217[1] = uStack_1347;
          auVar217[0] = local_1358[1];
          auVar695._0_12_ = auVar1284._0_12_;
          auVar695._12_2_ = (short)Var18;
          auVar695._14_2_ = (short)Var21;
          auVar694._12_4_ = auVar695._12_4_;
          auVar694._0_10_ = auVar1284._0_10_;
          auVar694._10_2_ = auVar214._0_2_;
          auVar693._10_6_ = auVar694._10_6_;
          auVar693._0_8_ = auVar1284._0_8_;
          auVar693._8_2_ = auVar212._0_2_;
          auVar219._4_8_ = auVar693._8_8_;
          auVar219._2_2_ = auVar213._0_2_;
          auVar219._0_2_ = auVar211._0_2_;
          auVar692._0_4_ = CONCAT22(CONCAT11(local_1388,local_1398[0]),auVar1284._0_2_);
          auVar692._4_12_ = auVar219;
          auVar1399._0_12_ = auVar1719._0_12_;
          auVar1399._12_2_ = (short)Var39;
          auVar1399._14_2_ = (short)Var42;
          auVar1398._12_4_ = auVar1399._12_4_;
          auVar1398._0_10_ = auVar1719._0_10_;
          auVar1398._10_2_ = auVar218._0_2_;
          auVar1397._10_6_ = auVar1398._10_6_;
          auVar1397._0_8_ = auVar1719._0_8_;
          auVar1397._8_2_ = auVar216._0_2_;
          auVar220._4_8_ = auVar1397._8_8_;
          auVar220._2_2_ = auVar217._0_2_;
          auVar220._0_2_ = auVar215._0_2_;
          auVar427._0_8_ = auVar692._0_8_;
          auVar427._8_4_ = auVar219._0_4_;
          auVar427._12_4_ = auVar220._0_4_;
          local_1238[0] =
               CONCAT44(CONCAT22(CONCAT11(local_13c8,local_13d8[0]),auVar2120._0_2_),auVar1975._0_4_
                       );
          local_1238[1] =
               CONCAT44(CONCAT22(CONCAT11(local_1348,local_1358[0]),auVar1719._0_2_),auVar692._0_4_)
          ;
          local_1238[2] = auVar881._8_8_;
          local_1238[3] = auVar427._8_8_;
          local_1218 = auVar1976._8_4_;
          uStack_1214 = auVar689._8_4_;
          uStack_1210 = auVar693._8_4_;
          uStack_120c = auVar1397._8_4_;
          uStack_1200 = auVar1977._12_4_;
          uStack_11fc = auVar690._12_4_;
          auVar298._12_4_ = CONCAT22(auVar2264._8_2_,auVar1105._8_2_);
          auVar930._0_8_ = CONCAT26(auVar2266._10_2_,CONCAT24(auVar1107._10_2_,auVar298._12_4_));
          auVar930._8_2_ = auVar1109._12_2_;
          auVar930._10_2_ = auVar2268._12_2_;
          auVar1112._12_2_ = auVar1110._14_2_;
          auVar1112._0_12_ = auVar930;
          auVar1112._14_2_ = auVar2269._14_2_;
          uVar908 = CONCAT22(auVar2194._8_2_,auVar2121._8_2_);
          auVar2043._0_8_ = CONCAT26(auVar2196._10_2_,CONCAT24(auVar2123._10_2_,uVar908));
          auVar2043._8_2_ = auVar2125._12_2_;
          auVar2043._10_2_ = auVar2198._12_2_;
          auVar2128._12_2_ = auVar2126._14_2_;
          auVar2128._0_12_ = auVar2043;
          auVar2128._14_2_ = auVar2199._14_2_;
          auVar784._12_4_ = CONCAT22(auVar1592._8_2_,auVar1285._8_2_);
          auVar1158._0_8_ = CONCAT26(auVar1594._10_2_,CONCAT24(auVar1287._10_2_,auVar784._12_4_));
          auVar1158._8_2_ = auVar1289._12_2_;
          auVar1158._10_2_ = auVar1596._12_2_;
          uVar741 = CONCAT22(auVar1888._8_2_,auVar1720._8_2_);
          auVar1627._0_8_ = CONCAT26(auVar1890._10_2_,CONCAT24(auVar1722._10_2_,uVar741));
          auVar1627._8_2_ = auVar1724._12_2_;
          auVar1627._10_2_ = auVar1892._12_2_;
          auVar428._8_4_ = (int)((ulong)auVar930._0_8_ >> 0x20);
          auVar428._0_8_ = auVar930._0_8_;
          auVar428._12_4_ = (int)((ulong)auVar2043._0_8_ >> 0x20);
          auVar696._8_4_ = (int)((ulong)auVar1158._0_8_ >> 0x20);
          auVar696._0_8_ = auVar1158._0_8_;
          auVar696._12_4_ = (int)((ulong)auVar1627._0_8_ >> 0x20);
          local_11f8 = CONCAT44(uVar908,auVar298._12_4_);
          uStack_11f0 = CONCAT44(uVar741,auVar784._12_4_);
          local_11e8 = auVar428._8_8_;
          uStack_11e0 = auVar696._8_8_;
          local_11d8 = auVar930._8_4_;
          uStack_11d4 = auVar2043._8_4_;
          uStack_11d0 = auVar1158._8_4_;
          uStack_11cc = auVar1627._8_4_;
          uStack_11c0 = auVar1112._12_4_;
          uStack_11bc = auVar2128._12_4_;
          uVar265 = CONCAT11(uStack_1420,(char)uStack_1430);
          uVar1426 = CONCAT13(uStack_141f,CONCAT12((char)((ulong)uStack_1430 >> 8),uVar265));
          uVar1427 = CONCAT15(uStack_141e,CONCAT14((char)((ulong)uStack_1430 >> 0x10),uVar1426));
          uVar1428 = CONCAT17(uStack_141d,CONCAT16((char)((ulong)uStack_1430 >> 0x18),uVar1427));
          auVar1445._0_10_ =
               CONCAT19(uStack_141c,CONCAT18((char)((ulong)uStack_1430 >> 0x20),uVar1428));
          auVar1445[10] = (char)((ulong)uStack_1430 >> 0x28);
          auVar1445[0xb] = uStack_141b;
          auVar1457[0xc] = (char)((ulong)uStack_1430 >> 0x30);
          auVar1457._0_12_ = auVar1445;
          auVar1457[0xd] = uStack_141a;
          auVar1498[0xe] = (char)((ulong)uStack_1430 >> 0x38);
          auVar1498._0_14_ = auVar1457;
          auVar1498[0xf] = uStack_1419;
          uStack_1640 = local_1418[8];
          uStack_163f = local_1418[9];
          uStack_163e = local_1418[10];
          uStack_163d = local_1418[0xb];
          uStack_163c = local_1418[0xc];
          uStack_163b = local_1418[0xd];
          uStack_163a = local_1418[0xe];
          uStack_1639 = local_1418[0xf];
          auVar298._12_4_ =
               CONCAT13(uStack_13ff,CONCAT12(uStack_163f,CONCAT11(uStack_1400,uStack_1640)));
          uVar266 = CONCAT15(uStack_13fe,CONCAT14(uStack_163e,auVar298._12_4_));
          uVar267 = CONCAT17(uStack_13fd,CONCAT16(uStack_163d,uVar266));
          auVar484._0_10_ = CONCAT19(uStack_13fc,CONCAT18(uStack_163c,uVar267));
          auVar484[10] = uStack_163b;
          auVar484[0xb] = uStack_13fb;
          auVar500[0xc] = uStack_163a;
          auVar500._0_12_ = auVar484;
          auVar500[0xd] = uStack_13fa;
          auVar697[0xe] = uStack_1639;
          auVar697._0_14_ = auVar500;
          auVar697[0xf] = uStack_13f9;
          uStack_1670 = local_13f8[8];
          uStack_166f = local_13f8[9];
          uStack_166e = local_13f8[10];
          uStack_166d = local_13f8[0xb];
          uStack_166c = local_13f8[0xc];
          uStack_166b = local_13f8[0xd];
          uStack_166a = local_13f8[0xe];
          uStack_1669 = local_13f8[0xf];
          auVar784._12_4_ =
               CONCAT13(uStack_13df,CONCAT12(uStack_166f,CONCAT11(uStack_13e0,uStack_1670)));
          uVar459 = CONCAT15(uStack_13de,CONCAT14(uStack_166e,auVar784._12_4_));
          uVar460 = CONCAT17(uStack_13dd,CONCAT16(uStack_166d,uVar459));
          auVar757._0_10_ = CONCAT19(uStack_13dc,CONCAT18(uStack_166c,uVar460));
          auVar757[10] = uStack_166b;
          auVar757[0xb] = uStack_13db;
          auVar770[0xc] = uStack_166a;
          auVar770._0_12_ = auVar757;
          auVar770[0xd] = uStack_13da;
          auVar882[0xe] = uStack_1669;
          auVar882._0_14_ = auVar770;
          auVar882[0xf] = uStack_13d9;
          uStack_1690 = local_13d8[8];
          uStack_168f = local_13d8[9];
          uStack_168e = local_13d8[10];
          uStack_168d = local_13d8[0xb];
          uStack_168c = local_13d8[0xc];
          uStack_168b = local_13d8[0xd];
          uStack_168a = local_13d8[0xe];
          uStack_1689 = local_13d8[0xf];
          uVar741 = CONCAT13(uStack_13bf,CONCAT12(uStack_168f,CONCAT11(uStack_13c0,uStack_1690)));
          uVar742 = CONCAT15(uStack_13be,CONCAT14(uStack_168e,uVar741));
          uVar743 = CONCAT17(uStack_13bd,CONCAT16(uStack_168d,uVar742));
          auVar931._0_10_ = CONCAT19(uStack_13bc,CONCAT18(uStack_168c,uVar743));
          auVar931[10] = uStack_168b;
          auVar931[0xb] = uStack_13bb;
          auVar944[0xc] = uStack_168a;
          auVar944._0_12_ = auVar931;
          auVar944[0xd] = uStack_13ba;
          auVar1113[0xe] = uStack_1689;
          auVar1113._0_14_ = auVar944;
          auVar1113[0xf] = uStack_13b9;
          uVar458 = CONCAT11(uStack_13a0,local_13b8[8]);
          uVar1750 = CONCAT13(uStack_139f,CONCAT12(local_13b8[9],uVar458));
          uVar1751 = CONCAT15(uStack_139e,CONCAT14(local_13b8[10],uVar1750));
          uVar1752 = CONCAT17(uStack_139d,CONCAT16(local_13b8[0xb],uVar1751));
          auVar1767._0_10_ = CONCAT19(uStack_139c,CONCAT18(local_13b8[0xc],uVar1752));
          auVar1767[10] = local_13b8[0xd];
          auVar1767[0xb] = uStack_139b;
          auVar1778[0xc] = local_13b8[0xe];
          auVar1778._0_12_ = auVar1767;
          auVar1778[0xd] = uStack_139a;
          auVar1808[0xe] = local_13b8[0xf];
          auVar1808._0_14_ = auVar1778;
          auVar1808[0xf] = uStack_1399;
          uStack_16c0 = local_1398[8];
          uStack_16bf = local_1398[9];
          uStack_16be = local_1398[10];
          uStack_16bd = local_1398[0xb];
          uStack_16bc = local_1398[0xc];
          uStack_16bb = local_1398[0xd];
          uStack_16ba = local_1398[0xe];
          uStack_16b9 = local_1398[0xf];
          uVar908 = CONCAT13(uStack_137f,CONCAT12(uStack_16bf,CONCAT11(uStack_1380,uStack_16c0)));
          uVar909 = CONCAT15(uStack_137e,CONCAT14(uStack_16be,uVar908));
          uVar910 = CONCAT17(uStack_137d,CONCAT16(uStack_16bd,uVar909));
          auVar1159._0_10_ = CONCAT19(uStack_137c,CONCAT18(uStack_16bc,uVar910));
          auVar1159[10] = uStack_16bb;
          auVar1159[0xb] = uStack_137b;
          auVar1170[0xc] = uStack_16ba;
          auVar1170._0_12_ = auVar1159;
          auVar1170[0xd] = uStack_137a;
          auVar1292[0xe] = uStack_16b9;
          auVar1292._0_14_ = auVar1170;
          auVar1292[0xf] = uStack_1379;
          uVar740 = CONCAT11(uStack_1360,local_1378[8]);
          uVar1987 = CONCAT13(uStack_135f,CONCAT12(local_1378[9],uVar740));
          uVar1988 = CONCAT15(uStack_135e,CONCAT14(local_1378[10],uVar1987));
          uVar1989 = CONCAT17(uStack_135d,CONCAT16(local_1378[0xb],uVar1988));
          auVar2004._0_10_ = CONCAT19(uStack_135c,CONCAT18(local_1378[0xc],uVar1989));
          auVar2004[10] = local_1378[0xd];
          auVar2004[0xb] = uStack_135b;
          auVar2015[0xc] = local_1378[0xe];
          auVar2015._0_12_ = auVar2004;
          auVar2015[0xd] = uStack_135a;
          auVar2031[0xe] = local_1378[0xf];
          auVar2031._0_14_ = auVar2015;
          auVar2031[0xf] = uStack_1359;
          uStack_16f0 = local_1358[8];
          uStack_16ef = local_1358[9];
          uStack_16ee = local_1358[10];
          uStack_16ed = local_1358[0xb];
          uStack_16ec = local_1358[0xc];
          uStack_16eb = local_1358[0xd];
          uStack_16ea = local_1358[0xe];
          uStack_16e9 = local_1358[0xf];
          uVar1905 = CONCAT13(uStack_133f,CONCAT12(uStack_16ef,CONCAT11(uStack_1340,uStack_16f0)));
          uVar1906 = CONCAT15(uStack_133e,CONCAT14(uStack_16ee,uVar1905));
          uVar1907 = CONCAT17(uStack_133d,CONCAT16(uStack_16ed,uVar1906));
          auVar1915._0_10_ = CONCAT19(uStack_133c,CONCAT18(uStack_16ec,uVar1907));
          auVar1915[10] = uStack_16eb;
          auVar1915[0xb] = uStack_133b;
          auVar1924[0xc] = uStack_16ea;
          auVar1924._0_12_ = auVar1915;
          auVar1924[0xd] = uStack_133a;
          auVar1979[0xe] = uStack_16e9;
          auVar1979._0_14_ = auVar1924;
          auVar1979[0xf] = uStack_1339;
          auVar434._12_2_ = (short)((ulong)uVar1428 >> 0x30);
          auVar434._0_12_ = auVar1445;
          auVar434._14_2_ = (short)((ulong)uVar267 >> 0x30);
          auVar433._12_4_ = auVar434._12_4_;
          auVar433._10_2_ = (short)((uint6)uVar266 >> 0x20);
          auVar433._0_10_ = auVar1445._0_10_;
          auVar432._10_6_ = auVar433._10_6_;
          auVar432._8_2_ = (short)((uint6)uVar1427 >> 0x20);
          auVar432._0_8_ = uVar1428;
          auVar431._8_8_ = auVar432._8_8_;
          auVar431._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
          auVar431._0_6_ = uVar1427;
          auVar430._6_10_ = auVar431._6_10_;
          auVar430._4_2_ = (short)((uint)uVar1426 >> 0x10);
          auVar430._0_4_ = uVar1426;
          auVar429._4_12_ = auVar430._4_12_;
          auVar429._0_4_ = CONCAT22(CONCAT11(uStack_1400,uStack_1640),uVar265);
          auVar702._12_2_ = (short)((ulong)uVar460 >> 0x30);
          auVar702._0_12_ = auVar757;
          auVar702._14_2_ = (short)((ulong)uVar743 >> 0x30);
          auVar701._12_4_ = auVar702._12_4_;
          auVar701._10_2_ = (short)((uint6)uVar742 >> 0x20);
          auVar701._0_10_ = auVar757._0_10_;
          auVar700._10_6_ = auVar701._10_6_;
          auVar700._8_2_ = (short)((uint6)uVar459 >> 0x20);
          auVar700._0_8_ = uVar460;
          auVar699._8_8_ = auVar700._8_8_;
          auVar699._6_2_ = (short)((uint)uVar741 >> 0x10);
          auVar699._0_6_ = uVar459;
          auVar698._6_10_ = auVar699._6_10_;
          auVar698._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
          auVar698._0_4_ = auVar784._12_4_;
          auVar888._12_2_ = (short)((ulong)uVar1752 >> 0x30);
          auVar888._0_12_ = auVar1767;
          auVar888._14_2_ = (short)((ulong)uVar910 >> 0x30);
          auVar887._12_4_ = auVar888._12_4_;
          auVar887._10_2_ = (short)((uint6)uVar909 >> 0x20);
          auVar887._0_10_ = auVar1767._0_10_;
          auVar886._10_6_ = auVar887._10_6_;
          auVar886._8_2_ = (short)((uint6)uVar1751 >> 0x20);
          auVar886._0_8_ = uVar1752;
          auVar885._8_8_ = auVar886._8_8_;
          auVar885._6_2_ = (short)((uint)uVar908 >> 0x10);
          auVar885._0_6_ = uVar1751;
          auVar884._6_10_ = auVar885._6_10_;
          auVar884._4_2_ = (short)((uint)uVar1750 >> 0x10);
          auVar884._0_4_ = uVar1750;
          auVar883._4_12_ = auVar884._4_12_;
          auVar883._0_4_ = CONCAT22(CONCAT11(uStack_1380,uStack_16c0),uVar458);
          auVar1118._12_2_ = (short)((ulong)uVar1989 >> 0x30);
          auVar1118._0_12_ = auVar2004;
          auVar1118._14_2_ = (short)((ulong)uVar1907 >> 0x30);
          auVar1117._12_4_ = auVar1118._12_4_;
          auVar1117._10_2_ = (short)((uint6)uVar1906 >> 0x20);
          auVar1117._0_10_ = auVar2004._0_10_;
          auVar1116._10_6_ = auVar1117._10_6_;
          auVar1116._8_2_ = (short)((uint6)uVar1988 >> 0x20);
          auVar1116._0_8_ = uVar1989;
          auVar1115._8_8_ = auVar1116._8_8_;
          auVar1115._6_2_ = (short)((uint)uVar1905 >> 0x10);
          auVar1115._0_6_ = uVar1988;
          auVar1114._6_10_ = auVar1115._6_10_;
          auVar1114._4_2_ = (short)((uint)uVar1987 >> 0x10);
          auVar1114._0_4_ = uVar1987;
          auVar1293._0_8_ = auVar429._0_8_;
          auVar1293._8_4_ = auVar430._4_4_;
          auVar1293._12_4_ = auVar698._4_4_;
          auVar703._0_8_ = auVar883._0_8_;
          auVar703._8_4_ = auVar884._4_4_;
          auVar703._12_4_ = auVar1114._4_4_;
          local_11b8 = CONCAT44(CONCAT22(CONCAT11(uStack_13c0,uStack_1690),
                                         CONCAT11(uStack_13e0,uStack_1670)),auVar429._0_4_);
          uStack_11b0 = CONCAT44(CONCAT22(CONCAT11(uStack_1340,uStack_16f0),uVar740),auVar883._0_4_)
          ;
          local_11a8 = auVar1293._8_8_;
          uStack_11a0 = auVar703._8_8_;
          local_1198 = auVar432._8_4_;
          uStack_1194 = auVar700._8_4_;
          uStack_1190 = auVar886._8_4_;
          uStack_118c = auVar1116._8_4_;
          uStack_1180 = auVar433._12_4_;
          uStack_117c = auVar701._12_4_;
          auVar784._12_4_ =
               CONCAT22((short)((unkuint10)auVar484._0_10_ >> 0x40),
                        (short)((unkuint10)auVar1445._0_10_ >> 0x40));
          auVar1446._0_8_ = CONCAT26(auVar484._10_2_,CONCAT24(auVar1445._10_2_,auVar784._12_4_));
          auVar1446._8_2_ = auVar1457._12_2_;
          auVar1446._10_2_ = auVar500._12_2_;
          auVar1499._12_2_ = auVar1498._14_2_;
          auVar1499._0_12_ = auVar1446;
          auVar1499._14_2_ = auVar697._14_2_;
          auVar298._12_4_ =
               CONCAT22((short)((unkuint10)auVar931._0_10_ >> 0x40),
                        (short)((unkuint10)auVar757._0_10_ >> 0x40));
          auVar485._0_8_ = CONCAT26(auVar931._10_2_,CONCAT24(auVar757._10_2_,auVar298._12_4_));
          auVar485._8_2_ = auVar770._12_2_;
          auVar485._10_2_ = auVar944._12_2_;
          auVar704._12_2_ = auVar882._14_2_;
          auVar704._0_12_ = auVar485;
          auVar704._14_2_ = auVar1113._14_2_;
          uVar741 = CONCAT22((short)((unkuint10)auVar1159._0_10_ >> 0x40),
                             (short)((unkuint10)auVar1767._0_10_ >> 0x40));
          auVar1768._0_8_ = CONCAT26(auVar1159._10_2_,CONCAT24(auVar1767._10_2_,uVar741));
          auVar1768._8_2_ = auVar1778._12_2_;
          auVar1768._10_2_ = auVar1170._12_2_;
          auVar1809._12_2_ = auVar1808._14_2_;
          auVar1809._0_12_ = auVar1768;
          auVar1809._14_2_ = auVar1292._14_2_;
          uVar908 = CONCAT22((short)((unkuint10)auVar1915._0_10_ >> 0x40),
                             (short)((unkuint10)auVar2004._0_10_ >> 0x40));
          auVar2005._0_8_ = CONCAT26(auVar1915._10_2_,CONCAT24(auVar2004._10_2_,uVar908));
          auVar2005._8_2_ = auVar2015._12_2_;
          auVar2005._10_2_ = auVar1924._12_2_;
          auVar2032._12_2_ = auVar2031._14_2_;
          auVar2032._0_12_ = auVar2005;
          auVar2032._14_2_ = auVar1979._14_2_;
          auVar435._8_4_ = (int)((ulong)auVar1446._0_8_ >> 0x20);
          auVar435._0_8_ = auVar1446._0_8_;
          auVar435._12_4_ = (int)((ulong)auVar485._0_8_ >> 0x20);
          auVar705._8_4_ = (int)((ulong)auVar1768._0_8_ >> 0x20);
          auVar705._0_8_ = auVar1768._0_8_;
          auVar705._12_4_ = (int)((ulong)auVar2005._0_8_ >> 0x20);
          local_1178 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
          uStack_1170 = CONCAT44(uVar908,uVar741);
          local_1168 = auVar435._8_8_;
          uStack_1160 = auVar705._8_8_;
          local_1158 = auVar1446._8_4_;
          uStack_1154 = auVar485._8_4_;
          uStack_1150 = auVar1768._8_4_;
          uStack_114c = auVar2005._8_4_;
          uStack_1140 = auVar1499._12_4_;
          uStack_113c = auVar704._12_4_;
          local_1138 = CONCAT44(auVar2032._12_4_,auVar1809._12_4_);
          lVar252 = 0;
          do {
            uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
            *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar252);
            *(undefined8 *)(dst + 8) = uVar267;
            uVar267 = *(undefined8 *)((long)local_1238 + lVar252 + 8);
            *(undefined8 *)(dst + stride * 0x10) = *(undefined8 *)((long)local_1238 + lVar252);
            *(undefined8 *)(dst + stride * 0x10 + 8) = uVar267;
            dst = dst + stride;
            lVar252 = lVar252 + 0x10;
          } while (lVar252 != 0x100);
          return;
        case 7:
          uStack_1710 = 0x22ab0a;
          dr_prediction_z1_64xN_sse4_1(0x20,local_1038,0x40,left,dy,iVar258);
          iVar258 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            auVar551 = pshufb(ZEXT116(left[0x27]),(undefined1  [16])0x0);
            lVar252 = 0;
            auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
            lVar256 = 0;
            uVar257 = dy;
            do {
              iVar258 = (int)uVar257 >> 6;
              lVar260 = lVar252;
              if (iVar258 < 0x27) {
                uVar259 = -(iVar258 + -0x27);
                auVar338 = ZEXT416(uVar257 >> 1 & 0x1f);
                auVar338 = pshuflw(auVar338,auVar338,0);
                lVar260 = 0;
                do {
                  auVar1239 = auVar551;
                  if (lVar260 < (int)uVar259) {
                    auVar1356 = *(undefined1 (*) [16])(left + lVar260 + iVar258);
                    auVar1517 = *(undefined1 (*) [16])(left + lVar260 + (long)iVar258 + 1);
                    auVar1198 = pmovzxbw(auVar551,auVar1356);
                    auVar1525 = pmovzxbw(in_XMM7,auVar1517);
                    auVar1199 = psllw(auVar1198,5);
                    sVar264 = auVar338._0_2_;
                    in_XMM7._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * sVar264;
                    sVar457 = auVar338._2_2_;
                    in_XMM7._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * sVar457;
                    in_XMM7._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * sVar264;
                    in_XMM7._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * sVar457;
                    in_XMM7._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * sVar264;
                    in_XMM7._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * sVar457;
                    in_XMM7._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * sVar264;
                    in_XMM7._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * sVar457;
                    uVar1143 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM7._0_2_) >> 5;
                    uVar1321 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM7._2_2_) >> 5;
                    uVar1322 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM7._4_2_) >> 5;
                    uVar1323 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM7._6_2_) >> 5;
                    uVar1324 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM7._8_2_) >> 5;
                    uVar1325 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM7._10_2_) >> 5;
                    uVar1326 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM7._12_2_) >> 5;
                    uVar1327 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM7._14_2_) >> 5;
                    auVar1369._0_2_ = CONCAT11(0,auVar1356[8]);
                    auVar1369[2] = auVar1356[9];
                    auVar1369[3] = 0;
                    auVar1369[4] = auVar1356[10];
                    auVar1369[5] = 0;
                    auVar1369[6] = auVar1356[0xb];
                    auVar1369[7] = 0;
                    auVar1369[8] = auVar1356[0xc];
                    auVar1369[9] = 0;
                    auVar1369[10] = auVar1356[0xd];
                    auVar1369[0xb] = 0;
                    auVar1369[0xc] = auVar1356[0xe];
                    auVar1369[0xd] = 0;
                    auVar1369[0xe] = auVar1356[0xf];
                    auVar1369[0xf] = 0;
                    auVar1198 = psllw(auVar1369,5);
                    uVar1328 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                                       (auVar1517[8] - auVar1369._0_2_) * sVar264) >> 5;
                    uVar1419 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                                       ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * sVar457) >> 5
                    ;
                    uVar1420 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                                       ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * sVar264) >>
                               5;
                    uVar1421 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                                       ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * sVar457)
                               >> 5;
                    uVar1422 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                                       ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * sVar264)
                               >> 5;
                    uVar1423 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                                       ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * sVar457)
                               >> 5;
                    uVar1424 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                                       ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * sVar264)
                               >> 5;
                    uVar1425 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                                       ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * sVar457)
                               >> 5;
                    auVar1239[1] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 -
                                   (0xff < uVar1321);
                    auVar1239[0] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 -
                                   (0xff < uVar1143);
                    auVar1239[2] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 -
                                   (0xff < uVar1322);
                    auVar1239[3] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 -
                                   (0xff < uVar1323);
                    auVar1239[4] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 -
                                   (0xff < uVar1324);
                    auVar1239[5] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 -
                                   (0xff < uVar1325);
                    auVar1239[6] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 -
                                   (0xff < uVar1326);
                    auVar1239[7] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 -
                                   (0xff < uVar1327);
                    auVar1239[8] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 -
                                   (0xff < uVar1328);
                    auVar1239[9] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 -
                                   (0xff < uVar1419);
                    auVar1239[10] =
                         (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
                    auVar1239[0xb] =
                         (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
                    auVar1239[0xc] =
                         (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
                    auVar1239[0xd] =
                         (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
                    auVar1239[0xe] =
                         (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
                    auVar1239[0xf] =
                         (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
                  }
                  *(undefined1 (*) [16])((long)local_1638 + lVar260) = auVar1239;
                  lVar260 = lVar260 + 0x10;
                } while (lVar260 == 0x10);
                if (0x1f < (int)uVar259) {
                  uVar259 = 0x20;
                }
                auVar4._8_8_ = local_1638[1];
                auVar4._0_8_ = local_1638[0];
                auVar338 = pblendvb(auVar551,auVar4,(undefined1  [16])Mask[0][uVar259]);
                auVar7[1] = uStack_1627;
                auVar7[0] = local_1628;
                auVar7[2] = uStack_1626;
                auVar7[3] = uStack_1625;
                auVar7[4] = uStack_1624;
                auVar7[5] = uStack_1623;
                auVar7[6] = uStack_1622;
                auVar7[7] = uStack_1621;
                auVar7[8] = uStack_1620;
                auVar7[9] = uStack_161f;
                auVar7[10] = uStack_161e;
                auVar7[0xb] = uStack_161d;
                auVar7[0xc] = uStack_161c;
                auVar7[0xd] = uStack_161b;
                auVar7[0xe] = uStack_161a;
                auVar7[0xf] = uStack_1619;
                auVar1356 = pblendvb(auVar551,auVar7,(undefined1  [16])Mask[1][uVar259]);
                *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar338;
                *(undefined1 (*) [16])(&local_1438 + lVar256 * 4) = auVar1356;
                uVar257 = uVar257 + dy;
              }
              else {
                do {
                  *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
                  *(undefined1 (*) [16])((long)&local_1438 + lVar260) = auVar551;
                  lVar260 = lVar260 + 0x10;
                } while (lVar260 != 0x80);
              }
              if (0x26 < iVar258) break;
              lVar256 = lVar256 + 1;
              lVar252 = lVar252 + 0x10;
            } while (lVar256 != 8);
            local_f48[0] = (undefined1  [16])0x0;
            local_f58 = (undefined1  [16])0x0;
            local_f68 = (undefined1  [16])0x0;
            local_f78 = (undefined1  [16])0x0;
            local_f88 = (undefined1  [16])0x0;
            local_f98 = (undefined1  [16])0x0;
            local_fa8 = (undefined1  [16])0x0;
            local_fb8 = (undefined1  [16])0x0;
            auVar1561._0_14_ = local_1038._0_14_;
            auVar1561[0xe] = local_1038[7];
            auVar1561[0xf] = local_1028[7];
            auVar1560._14_2_ = auVar1561._14_2_;
            auVar1560._0_13_ = local_1038._0_13_;
            auVar1560[0xd] = local_1028[6];
            auVar1559._13_3_ = auVar1560._13_3_;
            auVar1559._0_12_ = local_1038._0_12_;
            auVar1559[0xc] = local_1038[6];
            auVar1558._12_4_ = auVar1559._12_4_;
            auVar1558._0_11_ = local_1038._0_11_;
            auVar1558[0xb] = local_1028[5];
            auVar1557._11_5_ = auVar1558._11_5_;
            auVar1557._0_10_ = local_1038._0_10_;
            auVar1557[10] = local_1038[5];
            auVar1556._10_6_ = auVar1557._10_6_;
            auVar1556._0_9_ = local_1038._0_9_;
            auVar1556[9] = local_1028[4];
            auVar1555._9_7_ = auVar1556._9_7_;
            auVar1555._0_8_ = local_1038._0_8_;
            auVar1555[8] = local_1038[4];
            Var18 = CONCAT91(CONCAT81(auVar1555._8_8_,local_1028[3]),local_1038[3]);
            auVar143._2_10_ = Var18;
            auVar143[1] = local_1028[2];
            auVar143[0] = local_1038[2];
            auVar1554._4_12_ = auVar143;
            auVar1554[3] = local_1028[1];
            auVar1554[2] = local_1038[1];
            auVar1554._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
            auVar1795._0_14_ = local_1018._0_14_;
            auVar1795[0xe] = local_1018[7];
            auVar1795[0xf] = local_1008[7];
            auVar1794._14_2_ = auVar1795._14_2_;
            auVar1794._0_13_ = local_1018._0_13_;
            auVar1794[0xd] = local_1008[6];
            auVar1793._13_3_ = auVar1794._13_3_;
            auVar1793._0_12_ = local_1018._0_12_;
            auVar1793[0xc] = local_1018[6];
            auVar1792._12_4_ = auVar1793._12_4_;
            auVar1792._0_11_ = local_1018._0_11_;
            auVar1792[0xb] = local_1008[5];
            auVar1791._11_5_ = auVar1792._11_5_;
            auVar1791._0_10_ = local_1018._0_10_;
            auVar1791[10] = local_1018[5];
            auVar1790._10_6_ = auVar1791._10_6_;
            auVar1790._0_9_ = local_1018._0_9_;
            auVar1790[9] = local_1008[4];
            auVar1789._9_7_ = auVar1790._9_7_;
            auVar1789._0_8_ = local_1018._0_8_;
            auVar1789[8] = local_1018[4];
            Var21 = CONCAT91(CONCAT81(auVar1789._8_8_,local_1008[3]),local_1018[3]);
            auVar144._2_10_ = Var21;
            auVar144[1] = local_1008[2];
            auVar144[0] = local_1018[2];
            auVar1865._0_14_ = local_ff8._0_14_;
            auVar1865[0xe] = local_ff8[7];
            auVar1865[0xf] = local_fe8[7];
            auVar1864._14_2_ = auVar1865._14_2_;
            auVar1864._0_13_ = local_ff8._0_13_;
            auVar1864[0xd] = local_fe8[6];
            auVar1863._13_3_ = auVar1864._13_3_;
            auVar1863._0_12_ = local_ff8._0_12_;
            auVar1863[0xc] = local_ff8[6];
            auVar1862._12_4_ = auVar1863._12_4_;
            auVar1862._0_11_ = local_ff8._0_11_;
            auVar1862[0xb] = local_fe8[5];
            auVar1861._11_5_ = auVar1862._11_5_;
            auVar1861._0_10_ = local_ff8._0_10_;
            auVar1861[10] = local_ff8[5];
            auVar1860._10_6_ = auVar1861._10_6_;
            auVar1860._0_9_ = local_ff8._0_9_;
            auVar1860[9] = local_fe8[4];
            auVar1859._9_7_ = auVar1860._9_7_;
            auVar1859._0_8_ = local_ff8._0_8_;
            auVar1859[8] = local_ff8[4];
            Var39 = CONCAT91(CONCAT81(auVar1859._8_8_,local_fe8[3]),local_ff8[3]);
            auVar145._2_10_ = Var39;
            auVar145[1] = local_fe8[2];
            auVar145[0] = local_ff8[2];
            auVar1858._4_12_ = auVar145;
            auVar1858[3] = local_fe8[1];
            auVar1858[2] = local_ff8[1];
            auVar1858._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
            auVar1956._0_14_ = local_fd8._0_14_;
            auVar1956[0xe] = local_fd8[7];
            auVar1956[0xf] = local_fc8[7];
            auVar1955._14_2_ = auVar1956._14_2_;
            auVar1955._0_13_ = local_fd8._0_13_;
            auVar1955[0xd] = local_fc8[6];
            auVar1954._13_3_ = auVar1955._13_3_;
            auVar1954._0_12_ = local_fd8._0_12_;
            auVar1954[0xc] = local_fd8[6];
            auVar1953._12_4_ = auVar1954._12_4_;
            auVar1953._0_11_ = local_fd8._0_11_;
            auVar1953[0xb] = local_fc8[5];
            auVar1952._11_5_ = auVar1953._11_5_;
            auVar1952._0_10_ = local_fd8._0_10_;
            auVar1952[10] = local_fd8[5];
            auVar1951._10_6_ = auVar1952._10_6_;
            auVar1951._0_9_ = local_fd8._0_9_;
            auVar1951[9] = local_fc8[4];
            auVar1950._9_7_ = auVar1951._9_7_;
            auVar1950._0_8_ = local_fd8._0_8_;
            auVar1950[8] = local_fd8[4];
            Var42 = CONCAT91(CONCAT81(auVar1950._8_8_,local_fc8[3]),local_fd8[3]);
            auVar146._2_10_ = Var42;
            auVar146[1] = local_fc8[2];
            auVar146[0] = local_fd8[2];
            auVar2025._0_12_ = auVar1554._0_12_;
            auVar2025._12_2_ = (short)Var18;
            auVar2025._14_2_ = (short)Var21;
            auVar2024._12_4_ = auVar2025._12_4_;
            auVar2024._0_10_ = auVar1554._0_10_;
            auVar2024._10_2_ = auVar144._0_2_;
            auVar2023._10_6_ = auVar2024._10_6_;
            auVar2023._0_8_ = auVar1554._0_8_;
            auVar2023._8_2_ = auVar143._0_2_;
            auVar2092._0_12_ = auVar1858._0_12_;
            auVar2092._12_2_ = (short)Var39;
            auVar2092._14_2_ = (short)Var42;
            auVar2091._12_4_ = auVar2092._12_4_;
            auVar2091._0_10_ = auVar1858._0_10_;
            auVar2091._10_2_ = auVar146._0_2_;
            auVar2090._10_6_ = auVar2091._10_6_;
            auVar2090._0_8_ = auVar1858._0_8_;
            auVar2090._8_2_ = auVar145._0_2_;
            local_1608._4_4_ = auVar2091._12_4_;
            local_1608._0_4_ = auVar2024._12_4_;
            local_1638[0] =
                 CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar1858._0_2_),
                          CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar1554._0_2_));
            local_1638[1] = 0;
            local_1628 = local_1038[1];
            uStack_1627 = local_1028[1];
            uStack_1626 = local_1018[1];
            uStack_1625 = local_1008[1];
            uStack_1624 = local_ff8[1];
            uStack_1623 = local_fe8[1];
            uStack_1622 = local_fd8[1];
            uStack_1621 = local_fc8[1];
            uStack_1620 = 0;
            uStack_161f = 0;
            uStack_161e = 0;
            uStack_161d = 0;
            uStack_161c = 0;
            uStack_161b = 0;
            uStack_161a = 0;
            uStack_1619 = 0;
            local_1618 = auVar2023._8_4_;
            uStack_1614 = auVar2090._8_4_;
            uStack_1610 = 0;
            uStack_160c = 0;
            local_1608._8_8_ = 0;
            local_15f8._0_4_ = CONCAT22(auVar1789._8_2_,auVar1555._8_2_);
            auVar1509._0_8_ = CONCAT26(auVar1791._10_2_,CONCAT24(auVar1557._10_2_,local_15f8._0_4_))
            ;
            auVar1509._8_2_ = auVar1559._12_2_;
            auVar1509._10_2_ = auVar1793._12_2_;
            auVar1562._12_2_ = auVar1560._14_2_;
            auVar1562._0_12_ = auVar1509;
            auVar1562._14_2_ = auVar1794._14_2_;
            local_15f8._4_4_ = CONCAT22(auVar1950._8_2_,auVar1859._8_2_);
            auVar1818._0_8_ = CONCAT26(auVar1952._10_2_,CONCAT24(auVar1861._10_2_,local_15f8._4_4_))
            ;
            auVar1818._8_2_ = auVar1863._12_2_;
            auVar1818._10_2_ = auVar1954._12_2_;
            auVar1866._12_2_ = auVar1864._14_2_;
            auVar1866._0_12_ = auVar1818;
            auVar1866._14_2_ = auVar1955._14_2_;
            auVar1796._8_4_ = (int)((ulong)auVar1509._0_8_ >> 0x20);
            auVar1796._0_8_ = auVar1509._0_8_;
            auVar1796._12_4_ = (int)((ulong)auVar1818._0_8_ >> 0x20);
            auVar1563._0_8_ = CONCAT44(auVar1818._8_4_,auVar1509._8_4_);
            auVar1563._8_4_ = auVar1562._12_4_;
            auVar1563._12_4_ = auVar1866._12_4_;
            local_15f8._8_8_ = 0;
            local_15e8._8_8_ = 0;
            local_15e8._0_8_ = auVar1796._8_8_;
            local_15d8._8_8_ = 0;
            local_15d8._0_8_ = auVar1563._0_8_;
            local_15c8 = auVar1563 >> 0x40;
            uVar265 = CONCAT11(local_1028[8],local_1038[8]);
            auVar298._12_4_ = CONCAT13(local_1028[9],CONCAT12(local_1038[9],uVar265));
            uVar266 = CONCAT15(local_1028[10],CONCAT14(local_1038[10],auVar298._12_4_));
            uVar267 = CONCAT17(local_1028[0xb],CONCAT16(local_1038[0xb],uVar266));
            auVar271._0_10_ = CONCAT19(local_1028[0xc],CONCAT18(local_1038[0xc],uVar267));
            auVar271[10] = local_1038[0xd];
            auVar271[0xb] = local_1028[0xd];
            auVar277[0xc] = local_1038[0xe];
            auVar277._0_12_ = auVar271;
            auVar277[0xd] = local_1028[0xe];
            auVar380[0xe] = local_1038[0xf];
            auVar380._0_14_ = auVar277;
            auVar380[0xf] = local_1028[0xf];
            uVar458 = CONCAT11(local_1008[8],local_1018[8]);
            auVar784._12_4_ = CONCAT13(local_1008[9],CONCAT12(local_1018[9],uVar458));
            uVar459 = CONCAT15(local_1008[10],CONCAT14(local_1018[10],auVar784._12_4_));
            uVar460 = CONCAT17(local_1008[0xb],CONCAT16(local_1018[0xb],uVar459));
            auVar475._0_10_ = CONCAT19(local_1008[0xc],CONCAT18(local_1018[0xc],uVar460));
            auVar475[10] = local_1018[0xd];
            auVar475[0xb] = local_1008[0xd];
            auVar496[0xc] = local_1018[0xe];
            auVar496._0_12_ = auVar475;
            auVar496[0xd] = local_1008[0xe];
            auVar626[0xe] = local_1018[0xf];
            auVar626._0_14_ = auVar496;
            auVar626[0xf] = local_1008[0xf];
            uVar740 = CONCAT11(local_fe8[8],local_ff8[8]);
            uVar741 = CONCAT13(local_fe8[9],CONCAT12(local_ff8[9],uVar740));
            uVar742 = CONCAT15(local_fe8[10],CONCAT14(local_ff8[10],uVar741));
            uVar743 = CONCAT17(local_fe8[0xb],CONCAT16(local_ff8[0xb],uVar742));
            auVar750._0_10_ = CONCAT19(local_fe8[0xc],CONCAT18(local_ff8[0xc],uVar743));
            auVar750[10] = local_ff8[0xd];
            auVar750[0xb] = local_fe8[0xd];
            auVar766[0xc] = local_ff8[0xe];
            auVar766._0_12_ = auVar750;
            auVar766[0xd] = local_fe8[0xe];
            auVar846[0xe] = local_ff8[0xf];
            auVar846._0_14_ = auVar766;
            auVar846[0xf] = local_fe8[0xf];
            uVar907 = CONCAT11(local_fc8[8],local_fd8[8]);
            uVar908 = CONCAT13(local_fc8[9],CONCAT12(local_fd8[9],uVar907));
            uVar909 = CONCAT15(local_fc8[10],CONCAT14(local_fd8[10],uVar908));
            uVar910 = CONCAT17(local_fc8[0xb],CONCAT16(local_fd8[0xb],uVar909));
            auVar922._0_10_ = CONCAT19(local_fc8[0xc],CONCAT18(local_fd8[0xc],uVar910));
            auVar922[10] = local_fd8[0xd];
            auVar922[0xb] = local_fc8[0xd];
            auVar940[0xc] = local_fd8[0xe];
            auVar940._0_12_ = auVar922;
            auVar940[0xd] = local_fc8[0xe];
            auVar1045[0xe] = local_fd8[0xf];
            auVar1045._0_14_ = auVar940;
            auVar1045[0xf] = local_fc8[0xf];
            auVar1245._12_2_ = (short)((ulong)uVar267 >> 0x30);
            auVar1245._0_12_ = auVar271;
            auVar1245._14_2_ = (short)((ulong)uVar460 >> 0x30);
            auVar1244._12_4_ = auVar1245._12_4_;
            auVar1244._10_2_ = (short)((uint6)uVar459 >> 0x20);
            auVar1244._0_10_ = auVar271._0_10_;
            auVar1243._10_6_ = auVar1244._10_6_;
            auVar1243._8_2_ = (short)((uint6)uVar266 >> 0x20);
            auVar1243._0_8_ = uVar267;
            auVar1242._8_8_ = auVar1243._8_8_;
            auVar1242._6_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
            auVar1242._0_6_ = uVar266;
            auVar1241._6_10_ = auVar1242._6_10_;
            auVar1241._4_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
            auVar1241._0_4_ = auVar298._12_4_;
            auVar1240._4_12_ = auVar1241._4_12_;
            auVar1240._0_4_ = CONCAT22(uVar458,uVar265);
            auVar1374._12_2_ = (short)((ulong)uVar743 >> 0x30);
            auVar1374._0_12_ = auVar750;
            auVar1374._14_2_ = (short)((ulong)uVar910 >> 0x30);
            auVar1373._12_4_ = auVar1374._12_4_;
            auVar1373._10_2_ = (short)((uint6)uVar909 >> 0x20);
            auVar1373._0_10_ = auVar750._0_10_;
            auVar1372._10_6_ = auVar1373._10_6_;
            auVar1372._8_2_ = (short)((uint6)uVar742 >> 0x20);
            auVar1372._0_8_ = uVar743;
            auVar1371._8_8_ = auVar1372._8_8_;
            auVar1371._6_2_ = (short)((uint)uVar908 >> 0x10);
            auVar1371._0_6_ = uVar742;
            auVar1370._6_10_ = auVar1371._6_10_;
            auVar1370._4_2_ = (short)((uint)uVar741 >> 0x10);
            auVar1370._0_4_ = uVar741;
            auVar1477._0_8_ = auVar1240._0_8_;
            auVar1477._8_4_ = auVar1241._4_4_;
            auVar1477._12_4_ = auVar1370._4_4_;
            auVar1246._0_8_ = CONCAT44(auVar1372._8_4_,auVar1243._8_4_);
            auVar1246._8_4_ = auVar1244._12_4_;
            auVar1246._12_4_ = auVar1373._12_4_;
            local_15b8 = CONCAT44(CONCAT22(uVar907,uVar740),auVar1240._0_4_);
            auStack_15b0[0] = 0;
            auStack_15b0[1] = auVar1477._8_8_;
            auStack_15b0[2] = 0;
            local_1598 = auVar1246._0_8_;
            uStack_1590 = 0;
            local_1588 = auVar1246 >> 0x40;
            auVar298._12_4_ =
                 CONCAT22((short)((unkuint10)auVar475._0_10_ >> 0x40),
                          (short)((unkuint10)auVar271._0_10_ >> 0x40));
            auVar272._0_8_ = CONCAT26(auVar475._10_2_,CONCAT24(auVar271._10_2_,auVar298._12_4_));
            auVar272._8_2_ = auVar277._12_2_;
            auVar272._10_2_ = auVar496._12_2_;
            auVar381._12_2_ = auVar380._14_2_;
            auVar381._0_12_ = auVar272;
            auVar381._14_2_ = auVar626._14_2_;
            auVar784._12_4_ =
                 CONCAT22((short)((unkuint10)auVar922._0_10_ >> 0x40),
                          (short)((unkuint10)auVar750._0_10_ >> 0x40));
            auVar751._0_8_ = CONCAT26(auVar922._10_2_,CONCAT24(auVar750._10_2_,auVar784._12_4_));
            auVar751._8_2_ = auVar766._12_2_;
            auVar751._10_2_ = auVar940._12_2_;
            auVar847._12_2_ = auVar846._14_2_;
            auVar847._0_12_ = auVar751;
            auVar847._14_2_ = auVar1045._14_2_;
            auVar627._8_4_ = (int)((ulong)auVar272._0_8_ >> 0x20);
            auVar627._0_8_ = auVar272._0_8_;
            auVar627._12_4_ = (int)((ulong)auVar751._0_8_ >> 0x20);
            auVar382._0_8_ = CONCAT44(auVar751._8_4_,auVar272._8_4_);
            auVar382._8_4_ = auVar381._12_4_;
            auVar382._12_4_ = auVar847._12_4_;
            local_1578 = CONCAT44(auVar784._12_4_,auVar298._12_4_);
            uStack_1570 = 0;
            local_1568 = auVar627._8_8_;
            uStack_1560 = 0;
            local_1558 = auVar382._0_8_;
            uStack_1550 = 0;
            local_1548 = auVar382 >> 0x40;
            auVar14._8_8_ = uStack_1430;
            auVar14._0_8_ = CONCAT44(uStack_1434,local_1438);
            auVar1053._0_14_ = auVar14._0_14_;
            auVar1053[0xe] = (char)((uint)uStack_1434 >> 0x18);
            auVar1053[0xf] = uStack_1421;
            auVar1052._14_2_ = auVar1053._14_2_;
            auVar1052._0_13_ = auVar14._0_13_;
            auVar1052[0xd] = uStack_1422;
            auVar1051._13_3_ = auVar1052._13_3_;
            auVar1051._0_12_ = auVar14._0_12_;
            auVar1051[0xc] = (char)((uint)uStack_1434 >> 0x10);
            auVar1050._12_4_ = auVar1051._12_4_;
            auVar1050._0_11_ = auVar14._0_11_;
            auVar1050[0xb] = uStack_1423;
            auVar1049._11_5_ = auVar1050._11_5_;
            auVar1049._0_10_ = auVar14._0_10_;
            auVar1049[10] = (char)((uint)uStack_1434 >> 8);
            auVar1048._10_6_ = auVar1049._10_6_;
            auVar1048._0_9_ = auVar14._0_9_;
            auVar1048[9] = uStack_1424;
            auVar1047._9_7_ = auVar1048._9_7_;
            auVar1047[8] = (char)uStack_1434;
            auVar1047._0_8_ = CONCAT44(uStack_1434,local_1438);
            Var18 = CONCAT91(CONCAT81(auVar1047._8_8_,uStack_1425),(char)((uint)local_1438 >> 0x18))
            ;
            auVar148._2_10_ = Var18;
            auVar148[1] = uStack_1426;
            auVar148[0] = (char)((uint)local_1438 >> 0x10);
            auVar147._2_12_ = auVar148;
            auVar147[1] = uStack_1427;
            auVar147[0] = (char)((uint)local_1438 >> 8);
            auVar1046._0_2_ = CONCAT11(local_1428,(char)local_1438);
            auVar1046._2_14_ = auVar147;
            auVar2249._0_14_ = local_1418._0_14_;
            auVar2249[0xe] = local_1418[7];
            auVar2249[0xf] = uStack_1401;
            auVar2248._14_2_ = auVar2249._14_2_;
            auVar2248._0_13_ = local_1418._0_13_;
            auVar2248[0xd] = uStack_1402;
            auVar2247._13_3_ = auVar2248._13_3_;
            auVar2247._0_12_ = local_1418._0_12_;
            auVar2247[0xc] = local_1418[6];
            auVar2246._12_4_ = auVar2247._12_4_;
            auVar2246._0_11_ = local_1418._0_11_;
            auVar2246[0xb] = uStack_1403;
            auVar2245._11_5_ = auVar2246._11_5_;
            auVar2245._0_10_ = local_1418._0_10_;
            auVar2245[10] = local_1418[5];
            auVar2244._10_6_ = auVar2245._10_6_;
            auVar2244._0_9_ = local_1418._0_9_;
            auVar2244[9] = uStack_1404;
            auVar2243._9_7_ = auVar2244._9_7_;
            auVar2243._0_8_ = local_1418._0_8_;
            auVar2243[8] = local_1418[4];
            Var21 = CONCAT91(CONCAT81(auVar2243._8_8_,uStack_1405),local_1418[3]);
            auVar150._2_10_ = Var21;
            auVar150[1] = uStack_1406;
            auVar150[0] = local_1418[2];
            auVar149._2_12_ = auVar150;
            auVar149[1] = uStack_1407;
            auVar149[0] = local_1418[1];
            auVar2100._0_14_ = local_13f8._0_14_;
            auVar2100[0xe] = local_13f8[7];
            auVar2100[0xf] = uStack_13e1;
            auVar2099._14_2_ = auVar2100._14_2_;
            auVar2099._0_13_ = local_13f8._0_13_;
            auVar2099[0xd] = uStack_13e2;
            auVar2098._13_3_ = auVar2099._13_3_;
            auVar2098._0_12_ = local_13f8._0_12_;
            auVar2098[0xc] = local_13f8[6];
            auVar2097._12_4_ = auVar2098._12_4_;
            auVar2097._0_11_ = local_13f8._0_11_;
            auVar2097[0xb] = uStack_13e3;
            auVar2096._11_5_ = auVar2097._11_5_;
            auVar2096._0_10_ = local_13f8._0_10_;
            auVar2096[10] = local_13f8[5];
            auVar2095._10_6_ = auVar2096._10_6_;
            auVar2095._0_9_ = local_13f8._0_9_;
            auVar2095[9] = uStack_13e4;
            auVar2094._9_7_ = auVar2095._9_7_;
            auVar2094._0_8_ = local_13f8._0_8_;
            auVar2094[8] = local_13f8[4];
            Var39 = CONCAT91(CONCAT81(auVar2094._8_8_,uStack_13e5),local_13f8[3]);
            auVar152._2_10_ = Var39;
            auVar152[1] = uStack_13e6;
            auVar152[0] = local_13f8[2];
            auVar151._2_12_ = auVar152;
            auVar151[1] = uStack_13e7;
            auVar151[0] = local_13f8[1];
            auVar2093._0_2_ = CONCAT11(local_13e8,local_13f8[0]);
            auVar2093._2_14_ = auVar151;
            auVar2179._0_14_ = local_13d8._0_14_;
            auVar2179[0xe] = local_13d8[7];
            auVar2179[0xf] = uStack_13c1;
            auVar2178._14_2_ = auVar2179._14_2_;
            auVar2178._0_13_ = local_13d8._0_13_;
            auVar2178[0xd] = uStack_13c2;
            auVar2177._13_3_ = auVar2178._13_3_;
            auVar2177._0_12_ = local_13d8._0_12_;
            auVar2177[0xc] = local_13d8[6];
            auVar2176._12_4_ = auVar2177._12_4_;
            auVar2176._0_11_ = local_13d8._0_11_;
            auVar2176[0xb] = uStack_13c3;
            auVar2175._11_5_ = auVar2176._11_5_;
            auVar2175._0_10_ = local_13d8._0_10_;
            auVar2175[10] = local_13d8[5];
            auVar2174._10_6_ = auVar2175._10_6_;
            auVar2174._0_9_ = local_13d8._0_9_;
            auVar2174[9] = uStack_13c4;
            auVar2173._9_7_ = auVar2174._9_7_;
            auVar2173._0_8_ = local_13d8._0_8_;
            auVar2173[8] = local_13d8[4];
            Var42 = CONCAT91(CONCAT81(auVar2173._8_8_,uStack_13c5),local_13d8[3]);
            auVar154._2_10_ = Var42;
            auVar154[1] = uStack_13c6;
            auVar154[0] = local_13d8[2];
            auVar153._2_12_ = auVar154;
            auVar153[1] = uStack_13c7;
            auVar153[0] = local_13d8[1];
            auVar1960._0_12_ = auVar1046._0_12_;
            auVar1960._12_2_ = (short)Var18;
            auVar1960._14_2_ = (short)Var21;
            auVar1959._12_4_ = auVar1960._12_4_;
            auVar1959._0_10_ = auVar1046._0_10_;
            auVar1959._10_2_ = auVar150._0_2_;
            auVar1958._10_6_ = auVar1959._10_6_;
            auVar1958._0_8_ = auVar1046._0_8_;
            auVar1958._8_2_ = auVar148._0_2_;
            auVar155._4_8_ = auVar1958._8_8_;
            auVar155._2_2_ = auVar149._0_2_;
            auVar155._0_2_ = auVar147._0_2_;
            auVar1957._0_4_ = CONCAT22(CONCAT11(local_1408,local_1418[0]),auVar1046._0_2_);
            auVar1957._4_12_ = auVar155;
            auVar630._0_12_ = auVar2093._0_12_;
            auVar630._12_2_ = (short)Var39;
            auVar630._14_2_ = (short)Var42;
            auVar629._12_4_ = auVar630._12_4_;
            auVar629._0_10_ = auVar2093._0_10_;
            auVar629._10_2_ = auVar154._0_2_;
            auVar628._10_6_ = auVar629._10_6_;
            auVar628._0_8_ = auVar2093._0_8_;
            auVar628._8_2_ = auVar152._0_2_;
            auVar156._4_8_ = auVar628._8_8_;
            auVar156._2_2_ = auVar153._0_2_;
            auVar156._0_2_ = auVar151._0_2_;
            auVar848._0_8_ = auVar1957._0_8_;
            auVar848._8_4_ = auVar155._0_4_;
            auVar848._12_4_ = auVar156._0_4_;
            local_1238[0] =
                 CONCAT44(CONCAT22(CONCAT11(local_13c8,local_13d8[0]),auVar2093._0_2_),
                          auVar1957._0_4_);
            local_1238[1] = 0;
            local_1238[2] = auVar848._8_8_;
            local_1238[3] = 0;
            local_1218 = auVar1958._8_4_;
            uStack_1214 = auVar628._8_4_;
            uStack_1210 = 0;
            uStack_120c = 0;
            uStack_1200 = auVar1959._12_4_;
            uStack_11fc = auVar629._12_4_;
            auVar298._12_4_ = CONCAT22(auVar2243._8_2_,auVar1047._8_2_);
            auVar923._0_8_ = CONCAT26(auVar2245._10_2_,CONCAT24(auVar1049._10_2_,auVar298._12_4_));
            auVar923._8_2_ = auVar1051._12_2_;
            auVar923._10_2_ = auVar2247._12_2_;
            auVar1054._12_2_ = auVar1052._14_2_;
            auVar1054._0_12_ = auVar923;
            auVar1054._14_2_ = auVar2248._14_2_;
            auVar784._12_4_ = CONCAT22(auVar2173._8_2_,auVar2094._8_2_);
            auVar2040._0_8_ = CONCAT26(auVar2175._10_2_,CONCAT24(auVar2096._10_2_,auVar784._12_4_));
            auVar2040._8_2_ = auVar2098._12_2_;
            auVar2040._10_2_ = auVar2177._12_2_;
            auVar2101._12_2_ = auVar2099._14_2_;
            auVar2101._0_12_ = auVar2040;
            auVar2101._14_2_ = auVar2178._14_2_;
            auVar383._8_4_ = (int)((ulong)auVar923._0_8_ >> 0x20);
            auVar383._0_8_ = auVar923._0_8_;
            auVar383._12_4_ = (int)((ulong)auVar2040._0_8_ >> 0x20);
            local_11f8 = CONCAT44(auVar784._12_4_,auVar298._12_4_);
            uStack_11f0 = 0;
            local_11e8 = auVar383._8_8_;
            uStack_11e0 = 0;
            local_11d8 = auVar923._8_4_;
            uStack_11d4 = auVar2040._8_4_;
            uStack_11d0 = 0;
            uStack_11cc = 0;
            uStack_11c0 = auVar1054._12_4_;
            uStack_11bc = auVar2101._12_4_;
            uVar265 = CONCAT11(uStack_1420,(char)uStack_1430);
            uVar908 = CONCAT13(uStack_141f,CONCAT12((char)((ulong)uStack_1430 >> 8),uVar265));
            uVar909 = CONCAT15(uStack_141e,CONCAT14((char)((ulong)uStack_1430 >> 0x10),uVar908));
            uVar910 = CONCAT17(uStack_141d,CONCAT16((char)((ulong)uStack_1430 >> 0x18),uVar909));
            auVar1439._0_10_ =
                 CONCAT19(uStack_141c,CONCAT18((char)((ulong)uStack_1430 >> 0x20),uVar910));
            auVar1439[10] = (char)((ulong)uStack_1430 >> 0x28);
            auVar1439[0xb] = uStack_141b;
            auVar1454[0xc] = (char)((ulong)uStack_1430 >> 0x30);
            auVar1454._0_12_ = auVar1439;
            auVar1454[0xd] = uStack_141a;
            auVar1478[0xe] = (char)((ulong)uStack_1430 >> 0x38);
            auVar1478._0_14_ = auVar1454;
            auVar1478[0xf] = uStack_1419;
            uStack_1640 = local_1418[8];
            uStack_163f = local_1418[9];
            uStack_163e = local_1418[10];
            uStack_163d = local_1418[0xb];
            uStack_163c = local_1418[0xc];
            uStack_163b = local_1418[0xd];
            uStack_163a = local_1418[0xe];
            uStack_1639 = local_1418[0xf];
            auVar298._12_4_ =
                 CONCAT13(uStack_13ff,CONCAT12(uStack_163f,CONCAT11(uStack_1400,uStack_1640)));
            uVar266 = CONCAT15(uStack_13fe,CONCAT14(uStack_163e,auVar298._12_4_));
            uVar267 = CONCAT17(uStack_13fd,CONCAT16(uStack_163d,uVar266));
            auVar476._0_10_ = CONCAT19(uStack_13fc,CONCAT18(uStack_163c,uVar267));
            auVar476[10] = uStack_163b;
            auVar476[0xb] = uStack_13fb;
            auVar497[0xc] = uStack_163a;
            auVar497._0_12_ = auVar476;
            auVar497[0xd] = uStack_13fa;
            auVar631[0xe] = uStack_1639;
            auVar631._0_14_ = auVar497;
            auVar631[0xf] = uStack_13f9;
            uStack_1670 = local_13f8[8];
            uStack_166f = local_13f8[9];
            uStack_166e = local_13f8[10];
            uStack_166d = local_13f8[0xb];
            uStack_166c = local_13f8[0xc];
            uStack_166b = local_13f8[0xd];
            uStack_166a = local_13f8[0xe];
            uStack_1669 = local_13f8[0xf];
            auVar784._12_4_ =
                 CONCAT13(uStack_13df,CONCAT12(uStack_166f,CONCAT11(uStack_13e0,uStack_1670)));
            uVar459 = CONCAT15(uStack_13de,CONCAT14(uStack_166e,auVar784._12_4_));
            uVar460 = CONCAT17(uStack_13dd,CONCAT16(uStack_166d,uVar459));
            auVar752._0_10_ = CONCAT19(uStack_13dc,CONCAT18(uStack_166c,uVar460));
            auVar752[10] = uStack_166b;
            auVar752[0xb] = uStack_13db;
            auVar767[0xc] = uStack_166a;
            auVar767._0_12_ = auVar752;
            auVar767[0xd] = uStack_13da;
            auVar849[0xe] = uStack_1669;
            auVar849._0_14_ = auVar767;
            auVar849[0xf] = uStack_13d9;
            uStack_1690 = local_13d8[8];
            uStack_168f = local_13d8[9];
            uStack_168e = local_13d8[10];
            uStack_168d = local_13d8[0xb];
            uStack_168c = local_13d8[0xc];
            uStack_168b = local_13d8[0xd];
            uStack_168a = local_13d8[0xe];
            uStack_1689 = local_13d8[0xf];
            uVar741 = CONCAT13(uStack_13bf,CONCAT12(uStack_168f,CONCAT11(uStack_13c0,uStack_1690)));
            uVar742 = CONCAT15(uStack_13be,CONCAT14(uStack_168e,uVar741));
            uVar743 = CONCAT17(uStack_13bd,CONCAT16(uStack_168d,uVar742));
            auVar924._0_10_ = CONCAT19(uStack_13bc,CONCAT18(uStack_168c,uVar743));
            auVar924[10] = uStack_168b;
            auVar924[0xb] = uStack_13bb;
            auVar941[0xc] = uStack_168a;
            auVar941._0_12_ = auVar924;
            auVar941[0xd] = uStack_13ba;
            auVar1055[0xe] = uStack_1689;
            auVar1055._0_14_ = auVar941;
            auVar1055[0xf] = uStack_13b9;
            auVar389._12_2_ = (short)((ulong)uVar910 >> 0x30);
            auVar389._0_12_ = auVar1439;
            auVar389._14_2_ = (short)((ulong)uVar267 >> 0x30);
            auVar388._12_4_ = auVar389._12_4_;
            auVar388._10_2_ = (short)((uint6)uVar266 >> 0x20);
            auVar388._0_10_ = auVar1439._0_10_;
            auVar387._10_6_ = auVar388._10_6_;
            auVar387._8_2_ = (short)((uint6)uVar909 >> 0x20);
            auVar387._0_8_ = uVar910;
            auVar386._8_8_ = auVar387._8_8_;
            auVar386._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
            auVar386._0_6_ = uVar909;
            auVar385._6_10_ = auVar386._6_10_;
            auVar385._4_2_ = (short)((uint)uVar908 >> 0x10);
            auVar385._0_4_ = uVar908;
            auVar384._4_12_ = auVar385._4_12_;
            auVar384._0_4_ = CONCAT22(CONCAT11(uStack_1400,uStack_1640),uVar265);
            auVar636._12_2_ = (short)((ulong)uVar460 >> 0x30);
            auVar636._0_12_ = auVar752;
            auVar636._14_2_ = (short)((ulong)uVar743 >> 0x30);
            auVar635._12_4_ = auVar636._12_4_;
            auVar635._10_2_ = (short)((uint6)uVar742 >> 0x20);
            auVar635._0_10_ = auVar752._0_10_;
            auVar634._10_6_ = auVar635._10_6_;
            auVar634._8_2_ = (short)((uint6)uVar459 >> 0x20);
            auVar634._0_8_ = uVar460;
            auVar633._8_8_ = auVar634._8_8_;
            auVar633._6_2_ = (short)((uint)uVar741 >> 0x10);
            auVar633._0_6_ = uVar459;
            auVar632._6_10_ = auVar633._6_10_;
            auVar632._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
            auVar632._0_4_ = auVar784._12_4_;
            auVar1247._0_8_ = auVar384._0_8_;
            auVar1247._8_4_ = auVar385._4_4_;
            auVar1247._12_4_ = auVar632._4_4_;
            local_11b8 = CONCAT44(CONCAT22(CONCAT11(uStack_13c0,uStack_1690),
                                           CONCAT11(uStack_13e0,uStack_1670)),auVar384._0_4_);
            uStack_11b0 = 0;
            local_11a8 = auVar1247._8_8_;
            uStack_11a0 = 0;
            local_1198 = auVar387._8_4_;
            uStack_1194 = auVar634._8_4_;
            uStack_1190 = 0;
            uStack_118c = 0;
            uStack_1180 = auVar388._12_4_;
            uStack_117c = auVar635._12_4_;
            auVar784._12_4_ =
                 CONCAT22((short)((unkuint10)auVar476._0_10_ >> 0x40),
                          (short)((unkuint10)auVar1439._0_10_ >> 0x40));
            auVar1440._0_8_ = CONCAT26(auVar476._10_2_,CONCAT24(auVar1439._10_2_,auVar784._12_4_));
            auVar1440._8_2_ = auVar1454._12_2_;
            auVar1440._10_2_ = auVar497._12_2_;
            auVar1479._12_2_ = auVar1478._14_2_;
            auVar1479._0_12_ = auVar1440;
            auVar1479._14_2_ = auVar631._14_2_;
            auVar298._12_4_ =
                 CONCAT22((short)((unkuint10)auVar924._0_10_ >> 0x40),
                          (short)((unkuint10)auVar752._0_10_ >> 0x40));
            auVar477._0_8_ = CONCAT26(auVar924._10_2_,CONCAT24(auVar752._10_2_,auVar298._12_4_));
            auVar477._8_2_ = auVar767._12_2_;
            auVar477._10_2_ = auVar941._12_2_;
            auVar637._12_2_ = auVar849._14_2_;
            auVar637._0_12_ = auVar477;
            auVar637._14_2_ = auVar1055._14_2_;
            auVar390._8_4_ = (int)((ulong)auVar1440._0_8_ >> 0x20);
            auVar390._0_8_ = auVar1440._0_8_;
            auVar390._12_4_ = (int)((ulong)auVar477._0_8_ >> 0x20);
            local_1178 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
            uStack_1170 = 0;
            local_1168 = auVar390._8_8_;
            uStack_1160 = 0;
            local_1158 = auVar1440._8_4_;
            uStack_1154 = auVar477._8_4_;
            uStack_1150 = 0;
            uStack_114c = 0;
            uStack_1140 = auVar1479._12_4_;
            uStack_113c = auVar637._12_4_;
            local_1138 = 0;
            lVar252 = 0;
            puVar253 = dst;
            do {
              *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1638 + lVar252);
              lVar252 = lVar252 + 0x10;
              puVar253 = puVar253 + stride;
            } while (lVar252 != 0x100);
            puVar253 = dst + stride * 0x10;
            lVar252 = 0;
            do {
              *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1238 + lVar252);
              puVar253 = puVar253 + stride;
              lVar252 = lVar252 + 0x10;
            } while (lVar252 != 0x100);
            return;
          }
          if (bw != 4) {
            return;
          }
          iVar258 = 0x13 << (bVar254 & 0x1f);
          auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
          lVar252 = 0;
          auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          lVar256 = 0;
          uVar257 = dy;
          do {
            iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
            uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
            lVar260 = lVar252;
            if ((int)uVar259 < 1) {
              do {
                *(undefined1 (*) [16])((long)local_1638 + lVar260) = auVar551;
                lVar260 = lVar260 + 0x10;
              } while (lVar260 != 0x40);
            }
            else {
              uVar255 = 0x10;
              if ((int)uVar259 < 0x10) {
                uVar255 = uVar259;
              }
              auVar1356 = *(undefined1 (*) [16])(left + iVar262);
              if (upsample_left == 0) {
                auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
                auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
                auVar1198 = pshuflw(auVar1198,auVar1198,0);
                auVar1640._0_4_ = auVar1198._0_4_;
                auVar1640._4_4_ = auVar1640._0_4_;
                auVar1640._8_4_ = auVar1640._0_4_;
                auVar1640._12_4_ = auVar1640._0_4_;
              }
              else {
                auVar1356 = pshufb(auVar1356,_DAT_004df790);
                auVar1517 = auVar1356 >> 0x40;
                auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
                auVar1638._0_4_ = auVar1198._0_4_;
                auVar1638._4_4_ = auVar1638._0_4_;
                auVar1638._8_4_ = auVar1638._0_4_;
                auVar1638._12_4_ = auVar1638._0_4_;
                auVar1198 = psllw(auVar1638,ZEXT416((uint)upsample_left));
                auVar1639._0_2_ = auVar1198._0_2_ >> 1;
                auVar1639._2_2_ = auVar1198._2_2_ >> 1;
                auVar1639._4_2_ = auVar1198._4_2_ >> 1;
                auVar1639._6_2_ = auVar1198._6_2_ >> 1;
                auVar1639._8_2_ = auVar1198._8_2_ >> 1;
                auVar1639._10_2_ = auVar1198._10_2_ >> 1;
                auVar1639._12_2_ = auVar1198._12_2_ >> 1;
                auVar1639._14_2_ = auVar1198._14_2_ >> 1;
                auVar1640 = auVar1639 & auVar338;
              }
              auVar1198 = pmovzxbw(in_XMM9,auVar1356);
              auVar1525 = pmovzxbw(in_XMM10,auVar1517);
              auVar1199 = psllw(auVar1198,5);
              in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1640._0_2_;
              in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1640._2_2_;
              in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1640._4_2_;
              in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1640._6_2_;
              in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1640._8_2_;
              in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1640._10_2_;
              in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1640._12_2_;
              in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1640._14_2_;
              uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
              uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
              uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
              uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
              uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
              uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
              uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
              uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
              auVar310._0_2_ = CONCAT11(0,auVar1356[8]);
              auVar310[2] = auVar1356[9];
              auVar310[3] = 0;
              auVar310[4] = auVar1356[10];
              auVar310[5] = 0;
              auVar310[6] = auVar1356[0xb];
              auVar310[7] = 0;
              auVar310[8] = auVar1356[0xc];
              auVar310[9] = 0;
              auVar310[10] = auVar1356[0xd];
              auVar310[0xb] = 0;
              auVar310[0xc] = auVar1356[0xe];
              auVar310[0xd] = 0;
              auVar310[0xe] = auVar1356[0xf];
              auVar310[0xf] = 0;
              auVar1198 = psllw(auVar310,5);
              uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                                 (auVar1517[8] - auVar310._0_2_) * auVar1640._0_2_) >> 5;
              uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                                 ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1640._2_2_) >>
                         5;
              uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                                 ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1640._4_2_)
                         >> 5;
              uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                                 ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1640._6_2_
                                 ) >> 5;
              uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                                 ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1640._8_2_
                                 ) >> 5;
              uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                                 ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) *
                                 auVar1640._10_2_) >> 5;
              uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                                 ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) *
                                 auVar1640._12_2_) >> 5;
              uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                                 ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) *
                                 auVar1640._14_2_) >> 5;
              in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419)
              ;
              in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328)
              ;
              in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420)
              ;
              in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421)
              ;
              in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422)
              ;
              in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423)
              ;
              in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424)
              ;
              in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425)
              ;
              in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143)
              ;
              in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321)
              ;
              in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 -
                            (0xff < uVar1322);
              in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 -
                             (0xff < uVar1323);
              in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 -
                             (0xff < uVar1324);
              in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 -
                             (0xff < uVar1325);
              in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 -
                             (0xff < uVar1326);
              in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 -
                             (0xff < uVar1327);
              auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
              *(undefined1 (*) [16])(local_1638 + lVar256 * 2) = auVar1356;
              uVar257 = uVar257 + dy;
            }
            if ((int)uVar259 < 1) break;
            lVar256 = lVar256 + 1;
            lVar252 = lVar252 + 0x10;
          } while (lVar256 != 4);
          auVar2._8_8_ = local_1638[1];
          auVar2._0_8_ = local_1638[0];
          auVar12._8_4_ = uStack_1610;
          auVar12._0_8_ = CONCAT44(uStack_1614,local_1618);
          auVar11._12_4_ = uStack_160c;
          auVar11._0_12_ = auVar12;
          auVar318._0_14_ = auVar2._0_14_;
          auVar318[0xe] = (char)((ulong)local_1638[0] >> 0x38);
          auVar318[0xf] = uStack_1621;
          auVar317._14_2_ = auVar318._14_2_;
          auVar317._0_13_ = auVar2._0_13_;
          auVar317[0xd] = uStack_1622;
          auVar316._13_3_ = auVar317._13_3_;
          auVar316._0_12_ = auVar2._0_12_;
          auVar316[0xc] = (char)((ulong)local_1638[0] >> 0x30);
          auVar315._12_4_ = auVar316._12_4_;
          auVar315._0_11_ = auVar2._0_11_;
          auVar315[0xb] = uStack_1623;
          auVar314._11_5_ = auVar315._11_5_;
          auVar314._0_10_ = auVar2._0_10_;
          auVar314[10] = (char)((ulong)local_1638[0] >> 0x28);
          auVar313._10_6_ = auVar314._10_6_;
          auVar313._0_9_ = auVar2._0_9_;
          auVar313[9] = uStack_1624;
          auVar312._9_7_ = auVar313._9_7_;
          auVar312[8] = (char)((ulong)local_1638[0] >> 0x20);
          auVar312._0_8_ = local_1638[0];
          Var18 = CONCAT91(CONCAT81(auVar312._8_8_,uStack_1625),(char)((ulong)local_1638[0] >> 0x18)
                          );
          auVar46._2_10_ = Var18;
          auVar46[1] = uStack_1626;
          auVar46[0] = (char)((ulong)local_1638[0] >> 0x10);
          auVar45._2_12_ = auVar46;
          auVar45[1] = uStack_1627;
          auVar45[0] = (char)((ulong)local_1638[0] >> 8);
          auVar311._0_2_ = CONCAT11(local_1628,(char)local_1638[0]);
          auVar311._2_14_ = auVar45;
          auVar1341._0_14_ = auVar11._0_14_;
          auVar1341[0xe] = (char)((uint)uStack_1614 >> 0x18);
          auVar1341[0xf] = local_1608[7];
          auVar1340._14_2_ = auVar1341._14_2_;
          auVar1340._0_13_ = auVar11._0_13_;
          auVar1340[0xd] = local_1608[6];
          auVar1339._13_3_ = auVar1340._13_3_;
          auVar1339[0xc] = (char)((uint)uStack_1614 >> 0x10);
          auVar1339._0_12_ = auVar12;
          auVar1338._12_4_ = auVar1339._12_4_;
          auVar1338._0_11_ = auVar12._0_11_;
          auVar1338[0xb] = local_1608[5];
          auVar1337._11_5_ = auVar1338._11_5_;
          auVar1337._0_10_ = auVar12._0_10_;
          auVar1337[10] = (char)((uint)uStack_1614 >> 8);
          auVar1336._10_6_ = auVar1337._10_6_;
          auVar1336._0_9_ = auVar12._0_9_;
          auVar1336[9] = local_1608[4];
          auVar1335._9_7_ = auVar1336._9_7_;
          auVar1335[8] = (char)uStack_1614;
          auVar1335._0_8_ = CONCAT44(uStack_1614,local_1618);
          Var21 = CONCAT91(CONCAT81(auVar1335._8_8_,local_1608[3]),(char)((uint)local_1618 >> 0x18))
          ;
          auVar48._2_10_ = Var21;
          auVar48[1] = local_1608[2];
          auVar48[0] = (char)((uint)local_1618 >> 0x10);
          auVar47._2_12_ = auVar48;
          auVar47[1] = local_1608[1];
          auVar47[0] = (char)((uint)local_1618 >> 8);
          local_1038._4_2_ = CONCAT11(uStack_1620,(char)local_1638[1]);
          auVar298._12_4_ =
               CONCAT13(uStack_161f,CONCAT12((char)((ulong)local_1638[1] >> 8),local_1038._4_2_));
          uVar266 = CONCAT15(uStack_161e,
                             CONCAT14((char)((ulong)local_1638[1] >> 0x10),auVar298._12_4_));
          uVar267 = CONCAT17(uStack_161d,CONCAT16((char)((ulong)local_1638[1] >> 0x18),uVar266));
          auVar462._0_10_ =
               CONCAT19(uStack_161c,CONCAT18((char)((ulong)local_1638[1] >> 0x20),uVar267));
          auVar462[10] = (char)((ulong)local_1638[1] >> 0x28);
          auVar462[0xb] = uStack_161b;
          auVar490[0xc] = (char)((ulong)local_1638[1] >> 0x30);
          auVar490._0_12_ = auVar462;
          auVar490[0xd] = uStack_161a;
          local_1038._6_2_ = CONCAT11(local_1608[8],(char)uStack_1610);
          auVar784._12_4_ =
               CONCAT13(local_1608[9],CONCAT12((char)((uint)uStack_1610 >> 8),local_1038._6_2_));
          uVar459 = CONCAT15(local_1608[10],
                             CONCAT14((char)((uint)uStack_1610 >> 0x10),auVar784._12_4_));
          uVar460 = CONCAT17(local_1608[0xb],CONCAT16((char)((uint)uStack_1610 >> 0x18),uVar459));
          auVar911._0_10_ = CONCAT19(local_1608[0xc],CONCAT18((char)uStack_160c,uVar460));
          auVar911[10] = (char)((uint)uStack_160c >> 8);
          auVar911[0xb] = local_1608[0xd];
          auVar934[0xc] = (char)((uint)uStack_160c >> 0x10);
          auVar934._0_12_ = auVar911;
          auVar934[0xd] = local_1608[0xe];
          auVar797._0_12_ = auVar311._0_12_;
          auVar797._12_2_ = (short)Var18;
          auVar797._14_2_ = (short)Var21;
          auVar796._12_4_ = auVar797._12_4_;
          auVar796._0_10_ = auVar311._0_10_;
          auVar796._10_2_ = auVar48._0_2_;
          auVar795._10_6_ = auVar796._10_6_;
          auVar795._0_8_ = auVar311._0_8_;
          auVar795._8_2_ = auVar46._0_2_;
          auVar49._4_8_ = auVar795._8_8_;
          auVar49._2_2_ = auVar47._0_2_;
          auVar49._0_2_ = auVar45._0_2_;
          auVar794._0_4_ = CONCAT22(CONCAT11(local_1608[0],(char)local_1618),auVar311._0_2_);
          auVar794._4_12_ = auVar49;
          auVar1180._12_2_ = (short)((ulong)uVar267 >> 0x30);
          auVar1180._0_12_ = auVar462;
          auVar1180._14_2_ = (short)((ulong)uVar460 >> 0x30);
          auVar1179._12_4_ = auVar1180._12_4_;
          auVar1179._10_2_ = (short)((uint6)uVar459 >> 0x20);
          auVar1179._0_10_ = auVar462._0_10_;
          auVar1178._10_6_ = auVar1179._10_6_;
          auVar1178._8_2_ = (short)((uint6)uVar266 >> 0x20);
          auVar1178._0_8_ = uVar267;
          auVar1177._8_8_ = auVar1178._8_8_;
          auVar1177._6_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
          auVar1177._0_6_ = uVar266;
          auVar1176._6_10_ = auVar1177._6_10_;
          auVar1176._4_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
          auVar1176._0_4_ = auVar298._12_4_;
          auVar298._12_4_ = CONCAT22(auVar1335._8_2_,auVar312._8_2_);
          auVar269._0_8_ = CONCAT26(auVar1337._10_2_,CONCAT24(auVar314._10_2_,auVar298._12_4_));
          auVar269._8_2_ = auVar316._12_2_;
          auVar269._10_2_ = auVar1339._12_2_;
          uVar257 = CONCAT22((short)((unkuint10)auVar911._0_10_ >> 0x40),
                             (short)((unkuint10)auVar462._0_10_ >> 0x40));
          auVar463._0_8_ = CONCAT26(auVar911._10_2_,CONCAT24(auVar462._10_2_,uVar257));
          auVar463._8_2_ = auVar490._12_2_;
          auVar463._10_2_ = auVar934._12_2_;
          auVar960._0_8_ = auVar794._0_8_;
          auVar960._8_4_ = auVar49._0_4_;
          auVar960._12_4_ = auVar1176._4_4_;
          local_1038._0_4_ = auVar794._0_4_;
          auVar1342._8_4_ = (int)((ulong)auVar269._0_8_ >> 0x20);
          auVar1342._0_8_ = auVar269._0_8_;
          auVar1342._12_4_ = (int)((ulong)auVar463._0_8_ >> 0x20);
          local_1028._8_8_ = auVar1342._8_8_;
          local_1038._8_8_ = CONCAT44(uVar257,auVar298._12_4_);
          local_1028._0_8_ = auVar960._8_8_;
          local_1018._4_4_ = auVar1178._8_4_;
          local_1018._0_4_ = auVar795._8_4_;
          local_1018._8_4_ = auVar269._8_4_;
          local_1018._12_4_ = auVar463._8_4_;
          local_1008._8_4_ = auVar796._12_4_;
          local_1008._12_4_ = auVar1179._12_4_;
          local_ff8._8_8_ = 0;
          local_ff8._0_8_ = local_1038._8_8_;
          local_fe8._8_8_ = 0;
          local_fe8._0_8_ = local_1028._8_8_;
          local_fd8 = local_1018 >> 0x40;
          local_fc8 = local_1008 >> 0x40;
          local_fb8 = local_1038 >> 0x20;
          local_fa8 = local_1028 >> 0x20;
          local_f98 = local_1018 >> 0x20;
          local_f88 = local_1008 >> 0x20;
          local_f78 = ZEXT416(uVar257);
          local_f68._8_8_ = 0;
          local_f68._0_8_ = (ulong)local_1028._8_8_ >> 0x20;
          local_f58 = ZEXT416(auVar463._8_4_);
          local_f48[0] = ZEXT416(auVar1179._12_4_);
          lVar252 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)(local_1038 + lVar252);
            lVar252 = lVar252 + 0x10;
            dst = dst + stride;
          } while (lVar252 != 0x100);
          return;
        }
        uStack_1710 = 0x229195;
        dr_prediction_z1_64xN_sse4_1(0x10,local_1038,0x40,left,dy,iVar258);
        iVar258 = 0x10;
      }
      goto LAB_0022ab1e;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        iVar258 = 0x4f << (bVar254 & 0x1f);
        auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
        lVar252 = 0;
        auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        lVar256 = 0;
        uVar257 = dy;
        do {
          iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
          uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
          lVar260 = lVar252;
          if ((int)uVar259 < 1) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
              lVar260 = lVar260 + 0x10;
            } while (lVar260 != 0x400);
          }
          else {
            uVar255 = 0x10;
            if ((int)uVar259 < 0x10) {
              uVar255 = uVar259;
            }
            auVar1356 = *(undefined1 (*) [16])(left + iVar262);
            if (upsample_left == 0) {
              auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
              auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
              auVar1198 = pshuflw(auVar1198,auVar1198,0);
              auVar1702._0_4_ = auVar1198._0_4_;
              auVar1702._4_4_ = auVar1702._0_4_;
              auVar1702._8_4_ = auVar1702._0_4_;
              auVar1702._12_4_ = auVar1702._0_4_;
            }
            else {
              auVar1356 = pshufb(auVar1356,_DAT_004df790);
              auVar1517 = auVar1356 >> 0x40;
              auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
              auVar1700._0_4_ = auVar1198._0_4_;
              auVar1700._4_4_ = auVar1700._0_4_;
              auVar1700._8_4_ = auVar1700._0_4_;
              auVar1700._12_4_ = auVar1700._0_4_;
              auVar1198 = psllw(auVar1700,ZEXT416((uint)upsample_left));
              auVar1701._0_2_ = auVar1198._0_2_ >> 1;
              auVar1701._2_2_ = auVar1198._2_2_ >> 1;
              auVar1701._4_2_ = auVar1198._4_2_ >> 1;
              auVar1701._6_2_ = auVar1198._6_2_ >> 1;
              auVar1701._8_2_ = auVar1198._8_2_ >> 1;
              auVar1701._10_2_ = auVar1198._10_2_ >> 1;
              auVar1701._12_2_ = auVar1198._12_2_ >> 1;
              auVar1701._14_2_ = auVar1198._14_2_ >> 1;
              auVar1702 = auVar1701 & auVar338;
            }
            auVar1198 = pmovzxbw(in_XMM9,auVar1356);
            auVar1525 = pmovzxbw(in_XMM10,auVar1517);
            auVar1199 = psllw(auVar1198,5);
            in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1702._0_2_;
            in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1702._2_2_;
            in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1702._4_2_;
            in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1702._6_2_;
            in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1702._8_2_;
            in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1702._10_2_;
            in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1702._12_2_;
            in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1702._14_2_;
            uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
            uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
            uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
            uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
            uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
            uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
            uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
            uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
            auVar410._0_2_ = CONCAT11(0,auVar1356[8]);
            auVar410[2] = auVar1356[9];
            auVar410[3] = 0;
            auVar410[4] = auVar1356[10];
            auVar410[5] = 0;
            auVar410[6] = auVar1356[0xb];
            auVar410[7] = 0;
            auVar410[8] = auVar1356[0xc];
            auVar410[9] = 0;
            auVar410[10] = auVar1356[0xd];
            auVar410[0xb] = 0;
            auVar410[0xc] = auVar1356[0xe];
            auVar410[0xd] = 0;
            auVar410[0xe] = auVar1356[0xf];
            auVar410[0xf] = 0;
            auVar1198 = psllw(auVar410,5);
            uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                               (auVar1517[8] - auVar410._0_2_) * auVar1702._0_2_) >> 5;
            uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                               ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1702._2_2_) >> 5
            ;
            uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                               ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1702._4_2_) >>
                       5;
            uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                               ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1702._6_2_)
                       >> 5;
            uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                               ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1702._8_2_)
                       >> 5;
            uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                               ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1702._10_2_)
                       >> 5;
            uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                               ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1702._12_2_)
                       >> 5;
            uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                               ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1702._14_2_)
                       >> 5;
            in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
            in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
            in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
            in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
            in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
            in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
            in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
            in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
            in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
            in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
            in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323)
            ;
            in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324)
            ;
            in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325)
            ;
            in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326)
            ;
            in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327)
            ;
            auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
            *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
            uVar257 = uVar257 + dy;
          }
          if ((int)uVar259 < 1) break;
          lVar256 = lVar256 + 1;
          lVar252 = lVar252 + 0x10;
        } while (lVar256 != 0x40);
        uVar261 = 0;
        do {
          lVar252 = uVar261 * 0x10;
          auVar551 = *(undefined1 (*) [16])(local_1038 + lVar252);
          auVar984 = *(undefined1 (*) [16])(local_1018 + lVar252);
          auVar1081._0_14_ = auVar551._0_14_;
          auVar1081[0xe] = auVar551[7];
          auVar1081[0xf] = local_1028[lVar252 + 7];
          auVar1080._14_2_ = auVar1081._14_2_;
          auVar1080._0_13_ = auVar551._0_13_;
          auVar1080[0xd] = local_1028[lVar252 + 6];
          auVar1079._13_3_ = auVar1080._13_3_;
          auVar1079._0_12_ = auVar551._0_12_;
          auVar1079[0xc] = auVar551[6];
          auVar1078._12_4_ = auVar1079._12_4_;
          auVar1078._0_11_ = auVar551._0_11_;
          auVar1078[0xb] = local_1028[lVar252 + 5];
          auVar1077._11_5_ = auVar1078._11_5_;
          auVar1077._0_10_ = auVar551._0_10_;
          auVar1077[10] = auVar551[5];
          auVar1076._10_6_ = auVar1077._10_6_;
          auVar1076._0_9_ = auVar551._0_9_;
          auVar1076[9] = local_1028[lVar252 + 4];
          auVar1075._9_7_ = auVar1076._9_7_;
          auVar1075._0_8_ = auVar551._0_8_;
          auVar1075[8] = auVar551[4];
          Var18 = CONCAT91(CONCAT81(auVar1075._8_8_,local_1028[lVar252 + 3]),auVar551[3]);
          auVar185._2_10_ = Var18;
          auVar185[1] = local_1028[lVar252 + 2];
          auVar185[0] = auVar551[2];
          auVar1074._4_12_ = auVar185;
          auVar1074[3] = local_1028[lVar252 + 1];
          auVar1074[2] = auVar551[1];
          auVar1074._0_2_ = CONCAT11(local_1028[lVar252],auVar551[0]);
          auVar2256._0_14_ = auVar984._0_14_;
          auVar2256[0xe] = auVar984[7];
          auVar2256[0xf] = local_1008[lVar252 + 7];
          auVar2255._14_2_ = auVar2256._14_2_;
          auVar2255._0_13_ = auVar984._0_13_;
          auVar2255[0xd] = local_1008[lVar252 + 6];
          auVar2254._13_3_ = auVar2255._13_3_;
          auVar2254._0_12_ = auVar984._0_12_;
          auVar2254[0xc] = auVar984[6];
          auVar2253._12_4_ = auVar2254._12_4_;
          auVar2253._0_11_ = auVar984._0_11_;
          auVar2253[0xb] = local_1008[lVar252 + 5];
          auVar2252._11_5_ = auVar2253._11_5_;
          auVar2252._0_10_ = auVar984._0_10_;
          auVar2252[10] = auVar984[5];
          auVar2251._10_6_ = auVar2252._10_6_;
          auVar2251._0_9_ = auVar984._0_9_;
          auVar2251[9] = local_1008[lVar252 + 4];
          auVar2250._9_7_ = auVar2251._9_7_;
          auVar2250._0_8_ = auVar984._0_8_;
          auVar2250[8] = auVar984[4];
          Var21 = CONCAT91(CONCAT81(auVar2250._8_8_,local_1008[lVar252 + 3]),auVar984[3]);
          auVar186._2_10_ = Var21;
          auVar186[1] = local_1008[lVar252 + 2];
          auVar186[0] = auVar984[2];
          auVar338 = *(undefined1 (*) [16])(local_ff8 + lVar252);
          auVar2109._0_14_ = auVar338._0_14_;
          auVar2109[0xe] = auVar338[7];
          auVar2109[0xf] = local_fe8[lVar252 + 7];
          auVar2108._14_2_ = auVar2109._14_2_;
          auVar2108._0_13_ = auVar338._0_13_;
          auVar2108[0xd] = local_fe8[lVar252 + 6];
          auVar2107._13_3_ = auVar2108._13_3_;
          auVar2107._0_12_ = auVar338._0_12_;
          auVar2107[0xc] = auVar338[6];
          auVar2106._12_4_ = auVar2107._12_4_;
          auVar2106._0_11_ = auVar338._0_11_;
          auVar2106[0xb] = local_fe8[lVar252 + 5];
          auVar2105._11_5_ = auVar2106._11_5_;
          auVar2105._0_10_ = auVar338._0_10_;
          auVar2105[10] = auVar338[5];
          auVar2104._10_6_ = auVar2105._10_6_;
          auVar2104._0_9_ = auVar338._0_9_;
          auVar2104[9] = local_fe8[lVar252 + 4];
          auVar2103._9_7_ = auVar2104._9_7_;
          auVar2103._0_8_ = auVar338._0_8_;
          auVar2103[8] = auVar338[4];
          Var39 = CONCAT91(CONCAT81(auVar2103._8_8_,local_fe8[lVar252 + 3]),auVar338[3]);
          auVar187._2_10_ = Var39;
          auVar187[1] = local_fe8[lVar252 + 2];
          auVar187[0] = auVar338[2];
          auVar2102._4_12_ = auVar187;
          auVar2102[3] = local_fe8[lVar252 + 1];
          auVar2102[2] = auVar338[1];
          auVar2102._0_2_ = CONCAT11(local_fe8[lVar252],auVar338[0]);
          auVar1356 = *(undefined1 (*) [16])(local_fd8 + lVar252);
          auVar2186._0_14_ = auVar1356._0_14_;
          auVar2186[0xe] = auVar1356[7];
          auVar2186[0xf] = local_fc8[lVar252 + 7];
          auVar2185._14_2_ = auVar2186._14_2_;
          auVar2185._0_13_ = auVar1356._0_13_;
          auVar2185[0xd] = local_fc8[lVar252 + 6];
          auVar2184._13_3_ = auVar2185._13_3_;
          auVar2184._0_12_ = auVar1356._0_12_;
          auVar2184[0xc] = auVar1356[6];
          auVar2183._12_4_ = auVar2184._12_4_;
          auVar2183._0_11_ = auVar1356._0_11_;
          auVar2183[0xb] = local_fc8[lVar252 + 5];
          auVar2182._11_5_ = auVar2183._11_5_;
          auVar2182._0_10_ = auVar1356._0_10_;
          auVar2182[10] = auVar1356[5];
          auVar2181._10_6_ = auVar2182._10_6_;
          auVar2181._0_9_ = auVar1356._0_9_;
          auVar2181[9] = local_fc8[lVar252 + 4];
          auVar2180._9_7_ = auVar2181._9_7_;
          auVar2180._0_8_ = auVar1356._0_8_;
          auVar2180[8] = auVar1356[4];
          Var42 = CONCAT91(CONCAT81(auVar2180._8_8_,local_fc8[lVar252 + 3]),auVar1356[3]);
          auVar188._2_10_ = Var42;
          auVar188[1] = local_fc8[lVar252 + 2];
          auVar188[0] = auVar1356[2];
          auVar1517 = *(undefined1 (*) [16])(local_fb8 + lVar252);
          auVar1969._0_12_ = auVar1074._0_12_;
          auVar1969._12_2_ = (short)Var18;
          auVar1969._14_2_ = (short)Var21;
          auVar1968._12_4_ = auVar1969._12_4_;
          auVar1968._0_10_ = auVar1074._0_10_;
          auVar1968._10_2_ = auVar186._0_2_;
          auVar1967._10_6_ = auVar1968._10_6_;
          auVar1967._0_8_ = auVar1074._0_8_;
          auVar1967._8_2_ = auVar185._0_2_;
          auVar659._0_12_ = auVar2102._0_12_;
          auVar659._12_2_ = (short)Var39;
          auVar659._14_2_ = (short)Var42;
          auVar658._12_4_ = auVar659._12_4_;
          auVar658._0_10_ = auVar2102._0_10_;
          auVar658._10_2_ = auVar188._0_2_;
          auVar657._10_6_ = auVar658._10_6_;
          auVar657._0_8_ = auVar2102._0_8_;
          auVar657._8_2_ = auVar187._0_2_;
          auVar1270._0_14_ = auVar1517._0_14_;
          auVar1270[0xe] = auVar1517[7];
          auVar1270[0xf] = local_fa8[lVar252 + 7];
          auVar1269._14_2_ = auVar1270._14_2_;
          auVar1269._0_13_ = auVar1517._0_13_;
          auVar1269[0xd] = local_fa8[lVar252 + 6];
          auVar1268._13_3_ = auVar1269._13_3_;
          auVar1268._0_12_ = auVar1517._0_12_;
          auVar1268[0xc] = auVar1517[6];
          auVar1267._12_4_ = auVar1268._12_4_;
          auVar1267._0_11_ = auVar1517._0_11_;
          auVar1267[0xb] = local_fa8[lVar252 + 5];
          auVar1266._11_5_ = auVar1267._11_5_;
          auVar1266._0_10_ = auVar1517._0_10_;
          auVar1266[10] = auVar1517[5];
          auVar1265._10_6_ = auVar1266._10_6_;
          auVar1265._0_9_ = auVar1517._0_9_;
          auVar1265[9] = local_fa8[lVar252 + 4];
          auVar1264._9_7_ = auVar1265._9_7_;
          auVar1264._0_8_ = auVar1517._0_8_;
          auVar1264[8] = auVar1517[4];
          Var18 = CONCAT91(CONCAT81(auVar1264._8_8_,local_fa8[lVar252 + 3]),auVar1517[3]);
          auVar189._2_10_ = Var18;
          auVar189[1] = local_fa8[lVar252 + 2];
          auVar189[0] = auVar1517[2];
          auVar1263._4_12_ = auVar189;
          auVar1263[3] = local_fa8[lVar252 + 1];
          auVar1263[2] = auVar1517[1];
          auVar1263._0_2_ = CONCAT11(local_fa8[lVar252],auVar1517[0]);
          auVar1198 = *(undefined1 (*) [16])(local_f98 + lVar252);
          auVar1584._0_14_ = auVar1198._0_14_;
          auVar1584[0xe] = auVar1198[7];
          auVar1584[0xf] = local_f88[lVar252 + 7];
          auVar1583._14_2_ = auVar1584._14_2_;
          auVar1583._0_13_ = auVar1198._0_13_;
          auVar1583[0xd] = local_f88[lVar252 + 6];
          auVar1582._13_3_ = auVar1583._13_3_;
          auVar1582._0_12_ = auVar1198._0_12_;
          auVar1582[0xc] = auVar1198[6];
          auVar1581._12_4_ = auVar1582._12_4_;
          auVar1581._0_11_ = auVar1198._0_11_;
          auVar1581[0xb] = local_f88[lVar252 + 5];
          auVar1580._11_5_ = auVar1581._11_5_;
          auVar1580._0_10_ = auVar1198._0_10_;
          auVar1580[10] = auVar1198[5];
          auVar1579._10_6_ = auVar1580._10_6_;
          auVar1579._0_9_ = auVar1198._0_9_;
          auVar1579[9] = local_f88[lVar252 + 4];
          auVar1578._9_7_ = auVar1579._9_7_;
          auVar1578._0_8_ = auVar1198._0_8_;
          auVar1578[8] = auVar1198[4];
          Var21 = CONCAT91(CONCAT81(auVar1578._8_8_,local_f88[lVar252 + 3]),auVar1198[3]);
          auVar190._2_10_ = Var21;
          auVar190[1] = local_f88[lVar252 + 2];
          auVar190[0] = auVar1198[2];
          auVar1199 = *(undefined1 (*) [16])(local_f78 + lVar252);
          auVar1710._0_14_ = auVar1199._0_14_;
          auVar1710[0xe] = auVar1199[7];
          auVar1710[0xf] = local_f68[lVar252 + 7];
          auVar1709._14_2_ = auVar1710._14_2_;
          auVar1709._0_13_ = auVar1199._0_13_;
          auVar1709[0xd] = local_f68[lVar252 + 6];
          auVar1708._13_3_ = auVar1709._13_3_;
          auVar1708._0_12_ = auVar1199._0_12_;
          auVar1708[0xc] = auVar1199[6];
          auVar1707._12_4_ = auVar1708._12_4_;
          auVar1707._0_11_ = auVar1199._0_11_;
          auVar1707[0xb] = local_f68[lVar252 + 5];
          auVar1706._11_5_ = auVar1707._11_5_;
          auVar1706._0_10_ = auVar1199._0_10_;
          auVar1706[10] = auVar1199[5];
          auVar1705._10_6_ = auVar1706._10_6_;
          auVar1705._0_9_ = auVar1199._0_9_;
          auVar1705[9] = local_f68[lVar252 + 4];
          auVar1704._9_7_ = auVar1705._9_7_;
          auVar1704._0_8_ = auVar1199._0_8_;
          auVar1704[8] = auVar1199[4];
          Var39 = CONCAT91(CONCAT81(auVar1704._8_8_,local_f68[lVar252 + 3]),auVar1199[3]);
          auVar191._2_10_ = Var39;
          auVar191[1] = local_f68[lVar252 + 2];
          auVar191[0] = auVar1199[2];
          auVar1703._4_12_ = auVar191;
          auVar1703[3] = local_f68[lVar252 + 1];
          auVar1703[2] = auVar1199[1];
          auVar1703._0_2_ = CONCAT11(local_f68[lVar252],auVar1199[0]);
          auVar1525 = local_f48[uVar261 - 1];
          auVar1880._0_14_ = auVar1525._0_14_;
          auVar1880[0xe] = auVar1525[7];
          auVar1880[0xf] = local_f48[uVar261][7];
          auVar1879._14_2_ = auVar1880._14_2_;
          auVar1879._0_13_ = auVar1525._0_13_;
          auVar1879[0xd] = local_f48[uVar261][6];
          auVar1878._13_3_ = auVar1879._13_3_;
          auVar1878._0_12_ = auVar1525._0_12_;
          auVar1878[0xc] = auVar1525[6];
          auVar1877._12_4_ = auVar1878._12_4_;
          auVar1877._0_11_ = auVar1525._0_11_;
          auVar1877[0xb] = local_f48[uVar261][5];
          auVar1876._11_5_ = auVar1877._11_5_;
          auVar1876._0_10_ = auVar1525._0_10_;
          auVar1876[10] = auVar1525[5];
          auVar1875._10_6_ = auVar1876._10_6_;
          auVar1875._0_9_ = auVar1525._0_9_;
          auVar1875[9] = local_f48[uVar261][4];
          auVar1874._9_7_ = auVar1875._9_7_;
          auVar1874._0_8_ = auVar1525._0_8_;
          auVar1874[8] = auVar1525[4];
          Var42 = CONCAT91(CONCAT81(auVar1874._8_8_,local_f48[uVar261][3]),auVar1525[3]);
          auVar192._2_10_ = Var42;
          auVar192[1] = local_f48[uVar261][2];
          auVar192[0] = auVar1525[2];
          auVar662._0_12_ = auVar1263._0_12_;
          auVar662._12_2_ = (short)Var18;
          auVar662._14_2_ = (short)Var21;
          auVar661._12_4_ = auVar662._12_4_;
          auVar661._0_10_ = auVar1263._0_10_;
          auVar661._10_2_ = auVar190._0_2_;
          auVar660._10_6_ = auVar661._10_6_;
          auVar660._0_8_ = auVar1263._0_8_;
          auVar660._8_2_ = auVar189._0_2_;
          auVar1392._0_12_ = auVar1703._0_12_;
          auVar1392._12_2_ = (short)Var39;
          auVar1392._14_2_ = (short)Var42;
          auVar1391._12_4_ = auVar1392._12_4_;
          auVar1391._0_10_ = auVar1703._0_10_;
          auVar1391._10_2_ = auVar192._0_2_;
          auVar1390._10_6_ = auVar1391._10_6_;
          auVar1390._0_8_ = auVar1703._0_8_;
          auVar1390._8_2_ = auVar191._0_2_;
          local_1638[0] =
               CONCAT44(CONCAT22(CONCAT11(local_fc8[lVar252],auVar1356[0]),auVar2102._0_2_),
                        CONCAT22(CONCAT11(local_1008[lVar252],auVar984[0]),auVar1074._0_2_));
          local_1638[1] =
               CONCAT44(CONCAT22(CONCAT11(local_f48[uVar261][0],auVar1525[0]),auVar1703._0_2_),
                        CONCAT22(CONCAT11(local_f88[lVar252],auVar1198[0]),auVar1263._0_2_));
          local_1628 = auVar551[1];
          uStack_1627 = local_1028[lVar252 + 1];
          uStack_1626 = auVar984[1];
          uStack_1625 = local_1008[lVar252 + 1];
          uStack_1624 = auVar338[1];
          uStack_1623 = local_fe8[lVar252 + 1];
          uStack_1622 = auVar1356[1];
          uStack_1621 = local_fc8[lVar252 + 1];
          uStack_1620 = auVar1517[1];
          uStack_161f = local_fa8[lVar252 + 1];
          uStack_161e = auVar1198[1];
          uStack_161d = local_f88[lVar252 + 1];
          uStack_161c = auVar1199[1];
          uStack_161b = local_f68[lVar252 + 1];
          uStack_161a = auVar1525[1];
          uStack_1619 = local_f48[uVar261][1];
          local_1618 = auVar1967._8_4_;
          uStack_1614 = auVar657._8_4_;
          uStack_1610 = auVar660._8_4_;
          uStack_160c = auVar1390._8_4_;
          local_1608._8_4_ = auVar1968._12_4_;
          local_1608._12_4_ = auVar658._12_4_;
          local_15f8._0_4_ = CONCAT22(auVar2250._8_2_,auVar1075._8_2_);
          auVar926._0_8_ = CONCAT26(auVar2252._10_2_,CONCAT24(auVar1077._10_2_,local_15f8._0_4_));
          auVar926._8_2_ = auVar1079._12_2_;
          auVar926._10_2_ = auVar2254._12_2_;
          auVar1082._12_2_ = auVar1080._14_2_;
          auVar1082._0_12_ = auVar926;
          auVar1082._14_2_ = auVar2255._14_2_;
          local_15f8._4_4_ = CONCAT22(auVar2180._8_2_,auVar2103._8_2_);
          auVar2041._0_8_ = CONCAT26(auVar2182._10_2_,CONCAT24(auVar2105._10_2_,local_15f8._4_4_));
          auVar2041._8_2_ = auVar2107._12_2_;
          auVar2041._10_2_ = auVar2184._12_2_;
          auVar2110._12_2_ = auVar2108._14_2_;
          auVar2110._0_12_ = auVar2041;
          auVar2110._14_2_ = auVar2185._14_2_;
          local_15f8._8_4_ = CONCAT22(auVar1578._8_2_,auVar1264._8_2_);
          auVar1154._0_8_ = CONCAT26(auVar1580._10_2_,CONCAT24(auVar1266._10_2_,local_15f8._8_4_));
          auVar1154._8_2_ = auVar1268._12_2_;
          auVar1154._10_2_ = auVar1582._12_2_;
          local_15f8._12_4_ = CONCAT22(auVar1874._8_2_,auVar1704._8_2_);
          auVar1625._0_8_ = CONCAT26(auVar1876._10_2_,CONCAT24(auVar1706._10_2_,local_15f8._12_4_));
          auVar1625._8_2_ = auVar1708._12_2_;
          auVar1625._10_2_ = auVar1878._12_2_;
          auVar411._8_4_ = (int)((ulong)auVar926._0_8_ >> 0x20);
          auVar411._0_8_ = auVar926._0_8_;
          auVar411._12_4_ = (int)((ulong)auVar2041._0_8_ >> 0x20);
          auVar663._8_4_ = (int)((ulong)auVar1154._0_8_ >> 0x20);
          auVar663._0_8_ = auVar1154._0_8_;
          auVar663._12_4_ = (int)((ulong)auVar1625._0_8_ >> 0x20);
          local_15e8._8_8_ = auVar663._8_8_;
          local_15e8._0_8_ = auVar411._8_8_;
          local_15d8._4_4_ = auVar2041._8_4_;
          local_15d8._0_4_ = auVar926._8_4_;
          local_15d8._8_4_ = auVar1154._8_4_;
          local_15d8._12_4_ = auVar1625._8_4_;
          local_15c8._8_4_ = auVar1082._12_4_;
          local_15c8._12_4_ = auVar2110._12_4_;
          uVar265 = CONCAT11(local_1028[lVar252 + 8],auVar551[8]);
          uVar1426 = CONCAT13(local_1018[lVar252 + -7],CONCAT12(auVar551[9],uVar265));
          uVar1427 = CONCAT15(local_1018[lVar252 + -6],CONCAT14(auVar551[10],uVar1426));
          uVar1428 = CONCAT17(local_1018[lVar252 + -5],CONCAT16(auVar551[0xb],uVar1427));
          auVar1441._0_10_ = CONCAT19(local_1018[lVar252 + -4],CONCAT18(auVar551[0xc],uVar1428));
          auVar1441[10] = auVar551[0xd];
          auVar1441[0xb] = local_1018[lVar252 + -3];
          auVar1455[0xc] = auVar551[0xe];
          auVar1455._0_12_ = auVar1441;
          auVar1455[0xd] = local_1018[lVar252 + -2];
          auVar1494[0xe] = auVar551[0xf];
          auVar1494._0_14_ = auVar1455;
          auVar1494[0xf] = local_1018[lVar252 + -1];
          uStack_1640 = auVar984[8];
          uStack_163f = auVar984[9];
          uStack_163e = auVar984[10];
          uStack_163d = auVar984[0xb];
          uStack_163c = auVar984[0xc];
          uStack_163b = auVar984[0xd];
          uStack_163a = auVar984[0xe];
          uStack_1639 = auVar984[0xf];
          auVar298._12_4_ =
               CONCAT13(local_ff8[lVar252 + -7],
                        CONCAT12(uStack_163f,CONCAT11(local_1008[lVar252 + 8],uStack_1640)));
          uVar266 = CONCAT15(local_ff8[lVar252 + -6],CONCAT14(uStack_163e,auVar298._12_4_));
          uVar267 = CONCAT17(local_ff8[lVar252 + -5],CONCAT16(uStack_163d,uVar266));
          auVar480._0_10_ = CONCAT19(local_ff8[lVar252 + -4],CONCAT18(uStack_163c,uVar267));
          auVar480[10] = uStack_163b;
          auVar480[0xb] = local_ff8[lVar252 + -3];
          auVar498[0xc] = uStack_163a;
          auVar498._0_12_ = auVar480;
          auVar498[0xd] = local_ff8[lVar252 + -2];
          auVar664[0xe] = uStack_1639;
          auVar664._0_14_ = auVar498;
          auVar664[0xf] = local_ff8[lVar252 + -1];
          uStack_1670 = auVar338[8];
          uStack_166f = auVar338[9];
          uStack_166e = auVar338[10];
          uStack_166d = auVar338[0xb];
          uStack_166c = auVar338[0xc];
          uStack_166b = auVar338[0xd];
          uStack_166a = auVar338[0xe];
          uStack_1669 = auVar338[0xf];
          auVar784._12_4_ =
               CONCAT13(local_fd8[lVar252 + -7],
                        CONCAT12(uStack_166f,CONCAT11(local_fe8[lVar252 + 8],uStack_1670)));
          uVar459 = CONCAT15(local_fd8[lVar252 + -6],CONCAT14(uStack_166e,auVar784._12_4_));
          uVar460 = CONCAT17(local_fd8[lVar252 + -5],CONCAT16(uStack_166d,uVar459));
          auVar755._0_10_ = CONCAT19(local_fd8[lVar252 + -4],CONCAT18(uStack_166c,uVar460));
          auVar755[10] = uStack_166b;
          auVar755[0xb] = local_fd8[lVar252 + -3];
          auVar768[0xc] = uStack_166a;
          auVar768._0_12_ = auVar755;
          auVar768[0xd] = local_fd8[lVar252 + -2];
          auVar867[0xe] = uStack_1669;
          auVar867._0_14_ = auVar768;
          auVar867[0xf] = local_fd8[lVar252 + -1];
          uStack_1690 = auVar1356[8];
          uStack_168f = auVar1356[9];
          uStack_168e = auVar1356[10];
          uStack_168d = auVar1356[0xb];
          uStack_168c = auVar1356[0xc];
          uStack_168b = auVar1356[0xd];
          uStack_168a = auVar1356[0xe];
          uStack_1689 = auVar1356[0xf];
          uVar741 = CONCAT13(local_fb8[lVar252 + -7],
                             CONCAT12(uStack_168f,CONCAT11(local_fc8[lVar252 + 8],uStack_1690)));
          uVar742 = CONCAT15(local_fb8[lVar252 + -6],CONCAT14(uStack_168e,uVar741));
          uVar743 = CONCAT17(local_fb8[lVar252 + -5],CONCAT16(uStack_168d,uVar742));
          auVar927._0_10_ = CONCAT19(local_fb8[lVar252 + -4],CONCAT18(uStack_168c,uVar743));
          auVar927[10] = uStack_168b;
          auVar927[0xb] = local_fb8[lVar252 + -3];
          auVar942[0xc] = uStack_168a;
          auVar942._0_12_ = auVar927;
          auVar942[0xd] = local_fb8[lVar252 + -2];
          auVar1083[0xe] = uStack_1689;
          auVar1083._0_14_ = auVar942;
          auVar1083[0xf] = local_fb8[lVar252 + -1];
          uVar458 = CONCAT11(local_fa8[lVar252 + 8],auVar1517[8]);
          uVar1750 = CONCAT13(local_f98[lVar252 + -7],CONCAT12(auVar1517[9],uVar458));
          uVar1751 = CONCAT15(local_f98[lVar252 + -6],CONCAT14(auVar1517[10],uVar1750));
          uVar1752 = CONCAT17(local_f98[lVar252 + -5],CONCAT16(auVar1517[0xb],uVar1751));
          auVar1763._0_10_ = CONCAT19(local_f98[lVar252 + -4],CONCAT18(auVar1517[0xc],uVar1752));
          auVar1763[10] = auVar1517[0xd];
          auVar1763[0xb] = local_f98[lVar252 + -3];
          auVar1776[0xc] = auVar1517[0xe];
          auVar1776._0_12_ = auVar1763;
          auVar1776[0xd] = local_f98[lVar252 + -2];
          auVar1804[0xe] = auVar1517[0xf];
          auVar1804._0_14_ = auVar1776;
          auVar1804[0xf] = local_f98[lVar252 + -1];
          uStack_16c0 = auVar1198[8];
          uStack_16bf = auVar1198[9];
          uStack_16be = auVar1198[10];
          uStack_16bd = auVar1198[0xb];
          uStack_16bc = auVar1198[0xc];
          uStack_16bb = auVar1198[0xd];
          uStack_16ba = auVar1198[0xe];
          uStack_16b9 = auVar1198[0xf];
          uVar908 = CONCAT13(local_f78[lVar252 + -7],
                             CONCAT12(uStack_16bf,CONCAT11(local_f88[lVar252 + 8],uStack_16c0)));
          uVar909 = CONCAT15(local_f78[lVar252 + -6],CONCAT14(uStack_16be,uVar908));
          uVar910 = CONCAT17(local_f78[lVar252 + -5],CONCAT16(uStack_16bd,uVar909));
          auVar1155._0_10_ = CONCAT19(local_f78[lVar252 + -4],CONCAT18(uStack_16bc,uVar910));
          auVar1155[10] = uStack_16bb;
          auVar1155[0xb] = local_f78[lVar252 + -3];
          auVar1168[0xc] = uStack_16ba;
          auVar1168._0_12_ = auVar1155;
          auVar1168[0xd] = local_f78[lVar252 + -2];
          auVar1271[0xe] = uStack_16b9;
          auVar1271._0_14_ = auVar1168;
          auVar1271[0xf] = local_f78[lVar252 + -1];
          uVar907 = CONCAT11(local_f68[lVar252 + 8],auVar1199[8]);
          uVar1987 = CONCAT13(local_f58[lVar252 + -7],CONCAT12(auVar1199[9],uVar907));
          uVar1988 = CONCAT15(local_f58[lVar252 + -6],CONCAT14(auVar1199[10],uVar1987));
          uVar1989 = CONCAT17(local_f58[lVar252 + -5],CONCAT16(auVar1199[0xb],uVar1988));
          auVar2000._0_10_ = CONCAT19(local_f58[lVar252 + -4],CONCAT18(auVar1199[0xc],uVar1989));
          auVar2000[10] = auVar1199[0xd];
          auVar2000[0xb] = local_f58[lVar252 + -3];
          auVar2013[0xc] = auVar1199[0xe];
          auVar2013._0_12_ = auVar2000;
          auVar2013[0xd] = local_f58[lVar252 + -2];
          auVar2027[0xe] = auVar1199[0xf];
          auVar2027._0_14_ = auVar2013;
          auVar2027[0xf] = local_f58[lVar252 + -1];
          uStack_16f0 = auVar1525[8];
          uStack_16ef = auVar1525[9];
          uStack_16ee = auVar1525[10];
          uStack_16ed = auVar1525[0xb];
          uStack_16ec = auVar1525[0xc];
          uStack_16eb = auVar1525[0xd];
          uStack_16ea = auVar1525[0xe];
          uStack_16e9 = auVar1525[0xf];
          uVar740 = CONCAT11(local_f48[uVar261][8],uStack_16f0);
          uVar1905 = CONCAT13(local_f48[uVar261][9],CONCAT12(uStack_16ef,uVar740));
          uVar1906 = CONCAT15(local_f48[uVar261][10],CONCAT14(uStack_16ee,uVar1905));
          uVar1907 = CONCAT17(local_f48[uVar261][0xb],CONCAT16(uStack_16ed,uVar1906));
          auVar1913._0_10_ = CONCAT19(local_f48[uVar261][0xc],CONCAT18(uStack_16ec,uVar1907));
          auVar1913[10] = uStack_16eb;
          auVar1913[0xb] = local_f48[uVar261][0xd];
          auVar1922[0xc] = uStack_16ea;
          auVar1922._0_12_ = auVar1913;
          auVar1922[0xd] = local_f48[uVar261][0xe];
          auVar1970[0xe] = uStack_16e9;
          auVar1970._0_14_ = auVar1922;
          auVar1970[0xf] = local_f48[uVar261][0xf];
          auVar417._12_2_ = (short)((ulong)uVar1428 >> 0x30);
          auVar417._0_12_ = auVar1441;
          auVar417._14_2_ = (short)((ulong)uVar267 >> 0x30);
          auVar416._12_4_ = auVar417._12_4_;
          auVar416._10_2_ = (short)((uint6)uVar266 >> 0x20);
          auVar416._0_10_ = auVar1441._0_10_;
          auVar415._10_6_ = auVar416._10_6_;
          auVar415._8_2_ = (short)((uint6)uVar1427 >> 0x20);
          auVar415._0_8_ = uVar1428;
          auVar414._8_8_ = auVar415._8_8_;
          auVar414._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
          auVar414._0_6_ = uVar1427;
          auVar413._6_10_ = auVar414._6_10_;
          auVar413._4_2_ = (short)((uint)uVar1426 >> 0x10);
          auVar413._0_4_ = uVar1426;
          auVar412._4_12_ = auVar413._4_12_;
          auVar412._0_4_ = CONCAT22(CONCAT11(local_1008[lVar252 + 8],uStack_1640),uVar265);
          auVar669._12_2_ = (short)((ulong)uVar460 >> 0x30);
          auVar669._0_12_ = auVar755;
          auVar669._14_2_ = (short)((ulong)uVar743 >> 0x30);
          auVar668._12_4_ = auVar669._12_4_;
          auVar668._10_2_ = (short)((uint6)uVar742 >> 0x20);
          auVar668._0_10_ = auVar755._0_10_;
          auVar667._10_6_ = auVar668._10_6_;
          auVar667._8_2_ = (short)((uint6)uVar459 >> 0x20);
          auVar667._0_8_ = uVar460;
          auVar666._8_8_ = auVar667._8_8_;
          auVar666._6_2_ = (short)((uint)uVar741 >> 0x10);
          auVar666._0_6_ = uVar459;
          auVar665._6_10_ = auVar666._6_10_;
          auVar665._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
          auVar665._0_4_ = auVar784._12_4_;
          auVar873._12_2_ = (short)((ulong)uVar1752 >> 0x30);
          auVar873._0_12_ = auVar1763;
          auVar873._14_2_ = (short)((ulong)uVar910 >> 0x30);
          auVar872._12_4_ = auVar873._12_4_;
          auVar872._10_2_ = (short)((uint6)uVar909 >> 0x20);
          auVar872._0_10_ = auVar1763._0_10_;
          auVar871._10_6_ = auVar872._10_6_;
          auVar871._8_2_ = (short)((uint6)uVar1751 >> 0x20);
          auVar871._0_8_ = uVar1752;
          auVar870._8_8_ = auVar871._8_8_;
          auVar870._6_2_ = (short)((uint)uVar908 >> 0x10);
          auVar870._0_6_ = uVar1751;
          auVar869._6_10_ = auVar870._6_10_;
          auVar869._4_2_ = (short)((uint)uVar1750 >> 0x10);
          auVar869._0_4_ = uVar1750;
          auVar868._4_12_ = auVar869._4_12_;
          auVar868._0_4_ = CONCAT22(CONCAT11(local_f88[lVar252 + 8],uStack_16c0),uVar458);
          auVar1088._12_2_ = (short)((ulong)uVar1989 >> 0x30);
          auVar1088._0_12_ = auVar2000;
          auVar1088._14_2_ = (short)((ulong)uVar1907 >> 0x30);
          auVar1087._12_4_ = auVar1088._12_4_;
          auVar1087._10_2_ = (short)((uint6)uVar1906 >> 0x20);
          auVar1087._0_10_ = auVar2000._0_10_;
          auVar1086._10_6_ = auVar1087._10_6_;
          auVar1086._8_2_ = (short)((uint6)uVar1988 >> 0x20);
          auVar1086._0_8_ = uVar1989;
          auVar1085._8_8_ = auVar1086._8_8_;
          auVar1085._6_2_ = (short)((uint)uVar1905 >> 0x10);
          auVar1085._0_6_ = uVar1988;
          auVar1084._6_10_ = auVar1085._6_10_;
          auVar1084._4_2_ = (short)((uint)uVar1987 >> 0x10);
          auVar1084._0_4_ = uVar1987;
          auVar1272._0_8_ = auVar412._0_8_;
          auVar1272._8_4_ = auVar413._4_4_;
          auVar1272._12_4_ = auVar665._4_4_;
          auVar670._0_8_ = auVar868._0_8_;
          auVar670._8_4_ = auVar869._4_4_;
          auVar670._12_4_ = auVar1084._4_4_;
          local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_fc8[lVar252 + 8],uStack_1690),
                                         CONCAT11(local_fe8[lVar252 + 8],uStack_1670)),
                                auVar412._0_4_);
          auStack_15b0[0] = CONCAT44(CONCAT22(uVar740,uVar907),auVar868._0_4_);
          auStack_15b0[1] = auVar1272._8_8_;
          auStack_15b0[2] = auVar670._8_8_;
          local_1598 = CONCAT44(auVar667._8_4_,auVar415._8_4_);
          uStack_1590 = CONCAT44(auVar1086._8_4_,auVar871._8_4_);
          local_1588._8_4_ = auVar416._12_4_;
          local_1588._12_4_ = auVar668._12_4_;
          auVar784._12_4_ =
               CONCAT22((short)((unkuint10)auVar480._0_10_ >> 0x40),
                        (short)((unkuint10)auVar1441._0_10_ >> 0x40));
          auVar1442._0_8_ = CONCAT26(auVar480._10_2_,CONCAT24(auVar1441._10_2_,auVar784._12_4_));
          auVar1442._8_2_ = auVar1455._12_2_;
          auVar1442._10_2_ = auVar498._12_2_;
          auVar1495._12_2_ = auVar1494._14_2_;
          auVar1495._0_12_ = auVar1442;
          auVar1495._14_2_ = auVar664._14_2_;
          auVar298._12_4_ =
               CONCAT22((short)((unkuint10)auVar927._0_10_ >> 0x40),
                        (short)((unkuint10)auVar755._0_10_ >> 0x40));
          auVar481._0_8_ = CONCAT26(auVar927._10_2_,CONCAT24(auVar755._10_2_,auVar298._12_4_));
          auVar481._8_2_ = auVar768._12_2_;
          auVar481._10_2_ = auVar942._12_2_;
          auVar671._12_2_ = auVar867._14_2_;
          auVar671._0_12_ = auVar481;
          auVar671._14_2_ = auVar1083._14_2_;
          uVar741 = CONCAT22((short)((unkuint10)auVar1155._0_10_ >> 0x40),
                             (short)((unkuint10)auVar1763._0_10_ >> 0x40));
          auVar1764._0_8_ = CONCAT26(auVar1155._10_2_,CONCAT24(auVar1763._10_2_,uVar741));
          auVar1764._8_2_ = auVar1776._12_2_;
          auVar1764._10_2_ = auVar1168._12_2_;
          auVar1805._12_2_ = auVar1804._14_2_;
          auVar1805._0_12_ = auVar1764;
          auVar1805._14_2_ = auVar1271._14_2_;
          uVar908 = CONCAT22((short)((unkuint10)auVar1913._0_10_ >> 0x40),
                             (short)((unkuint10)auVar2000._0_10_ >> 0x40));
          auVar2001._0_8_ = CONCAT26(auVar1913._10_2_,CONCAT24(auVar2000._10_2_,uVar908));
          auVar2001._8_2_ = auVar2013._12_2_;
          auVar2001._10_2_ = auVar1922._12_2_;
          auVar2028._12_2_ = auVar2027._14_2_;
          auVar2028._0_12_ = auVar2001;
          auVar2028._14_2_ = auVar1970._14_2_;
          auVar418._8_4_ = (int)((ulong)auVar1442._0_8_ >> 0x20);
          auVar418._0_8_ = auVar1442._0_8_;
          auVar418._12_4_ = (int)((ulong)auVar481._0_8_ >> 0x20);
          auVar672._8_4_ = (int)((ulong)auVar1764._0_8_ >> 0x20);
          auVar672._0_8_ = auVar1764._0_8_;
          auVar672._12_4_ = (int)((ulong)auVar2001._0_8_ >> 0x20);
          local_1578 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
          uStack_1570 = CONCAT44(uVar908,uVar741);
          local_1568 = auVar418._8_8_;
          uStack_1560 = auVar672._8_8_;
          local_1558 = CONCAT44(auVar481._8_4_,auVar1442._8_4_);
          uStack_1550 = CONCAT44(auVar2001._8_4_,auVar1764._8_4_);
          local_1548._8_4_ = auVar1495._12_4_;
          local_1548._12_4_ = auVar671._12_4_;
          local_1538 = CONCAT44(auVar2028._12_4_,auVar1805._12_4_);
          lVar252 = 0;
          puVar253 = dst;
          do {
            uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
            *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1638 + lVar252);
            *(undefined8 *)(puVar253 + 8) = uVar267;
            lVar252 = lVar252 + 0x10;
            puVar253 = puVar253 + stride;
          } while (lVar252 != 0x100);
          dst = dst + 0x10;
          bVar263 = uVar261 < 0x30;
          uVar261 = uVar261 + 0x10;
        } while (bVar263);
        return;
      }
      if (bh == 8) {
        iVar258 = 0x27 << (bVar254 & 0x1f);
        auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
        lVar252 = 0;
        auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        lVar256 = 0;
        uVar257 = dy;
        do {
          iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
          uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
          lVar260 = lVar252;
          if ((int)uVar259 < 1) {
            do {
              *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
              lVar260 = lVar260 + 0x10;
            } while (lVar260 != 0x200);
          }
          else {
            uVar255 = 8;
            if ((int)uVar259 < 8) {
              uVar255 = uVar259;
            }
            auVar1356 = *(undefined1 (*) [16])(left + iVar262);
            if (upsample_left == 0) {
              auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
              auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
              auVar1198 = pshuflw(auVar1198,auVar1198,0);
              auVar1692._0_4_ = auVar1198._0_4_;
              auVar1692._4_4_ = auVar1692._0_4_;
              auVar1692._8_4_ = auVar1692._0_4_;
              auVar1692._12_4_ = auVar1692._0_4_;
            }
            else {
              auVar1356 = pshufb(auVar1356,_DAT_004df790);
              auVar1517 = auVar1356 >> 0x40;
              auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
              auVar1690._0_4_ = auVar1198._0_4_;
              auVar1690._4_4_ = auVar1690._0_4_;
              auVar1690._8_4_ = auVar1690._0_4_;
              auVar1690._12_4_ = auVar1690._0_4_;
              auVar1198 = psllw(auVar1690,ZEXT416((uint)upsample_left));
              auVar1691._0_2_ = auVar1198._0_2_ >> 1;
              auVar1691._2_2_ = auVar1198._2_2_ >> 1;
              auVar1691._4_2_ = auVar1198._4_2_ >> 1;
              auVar1691._6_2_ = auVar1198._6_2_ >> 1;
              auVar1691._8_2_ = auVar1198._8_2_ >> 1;
              auVar1691._10_2_ = auVar1198._10_2_ >> 1;
              auVar1691._12_2_ = auVar1198._12_2_ >> 1;
              auVar1691._14_2_ = auVar1198._14_2_ >> 1;
              auVar1692 = auVar1691 & auVar338;
            }
            auVar1198 = pmovzxbw(in_XMM9,auVar1356);
            auVar1525 = pmovzxbw(in_XMM10,auVar1517);
            auVar1199 = psllw(auVar1198,5);
            in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1692._0_2_;
            in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1692._2_2_;
            in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1692._4_2_;
            in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1692._6_2_;
            in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1692._8_2_;
            in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1692._10_2_;
            in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1692._12_2_;
            in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1692._14_2_;
            uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
            uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
            uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
            uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
            uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
            uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
            uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
            uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
            auVar391._0_2_ = CONCAT11(0,auVar1356[8]);
            auVar391[2] = auVar1356[9];
            auVar391[3] = 0;
            auVar391[4] = auVar1356[10];
            auVar391[5] = 0;
            auVar391[6] = auVar1356[0xb];
            auVar391[7] = 0;
            auVar391[8] = auVar1356[0xc];
            auVar391[9] = 0;
            auVar391[10] = auVar1356[0xd];
            auVar391[0xb] = 0;
            auVar391[0xc] = auVar1356[0xe];
            auVar391[0xd] = 0;
            auVar391[0xe] = auVar1356[0xf];
            auVar391[0xf] = 0;
            auVar1198 = psllw(auVar391,5);
            uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                               (auVar1517[8] - auVar391._0_2_) * auVar1692._0_2_) >> 5;
            uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                               ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1692._2_2_) >> 5
            ;
            uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                               ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1692._4_2_) >>
                       5;
            uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                               ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1692._6_2_)
                       >> 5;
            uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                               ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1692._8_2_)
                       >> 5;
            uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                               ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1692._10_2_)
                       >> 5;
            uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                               ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1692._12_2_)
                       >> 5;
            uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                               ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1692._14_2_)
                       >> 5;
            in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
            in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
            in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
            in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
            in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
            in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
            in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
            in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
            in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
            in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
            in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
            in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323)
            ;
            in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324)
            ;
            in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325)
            ;
            in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326)
            ;
            in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327)
            ;
            auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
            *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
            uVar257 = uVar257 + dy;
          }
          if ((int)uVar259 < 1) break;
          lVar256 = lVar256 + 1;
          lVar252 = lVar252 + 0x10;
        } while (lVar256 != 0x20);
        auVar399._0_14_ = local_1038._0_14_;
        auVar399[0xe] = local_1038[7];
        auVar399[0xf] = local_1028[7];
        auVar398._14_2_ = auVar399._14_2_;
        auVar398._0_13_ = local_1038._0_13_;
        auVar398[0xd] = local_1028[6];
        auVar397._13_3_ = auVar398._13_3_;
        auVar397._0_12_ = local_1038._0_12_;
        auVar397[0xc] = local_1038[6];
        auVar396._12_4_ = auVar397._12_4_;
        auVar396._0_11_ = local_1038._0_11_;
        auVar396[0xb] = local_1028[5];
        auVar395._11_5_ = auVar396._11_5_;
        auVar395._0_10_ = local_1038._0_10_;
        auVar395[10] = local_1038[5];
        auVar394._10_6_ = auVar395._10_6_;
        auVar394._0_9_ = local_1038._0_9_;
        auVar394[9] = local_1028[4];
        auVar393._9_7_ = auVar394._9_7_;
        auVar393._0_8_ = local_1038._0_8_;
        auVar393[8] = local_1038[4];
        Var18 = CONCAT91(CONCAT81(auVar393._8_8_,local_1028[3]),local_1038[3]);
        auVar157._2_10_ = Var18;
        auVar157[1] = local_1028[2];
        auVar157[0] = local_1038[2];
        auVar392._4_12_ = auVar157;
        auVar392[3] = local_1028[1];
        auVar392[2] = local_1038[1];
        auVar392._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
        auVar1062._0_14_ = local_1018._0_14_;
        auVar1062[0xe] = local_1018[7];
        auVar1062[0xf] = local_1008[7];
        auVar1061._14_2_ = auVar1062._14_2_;
        auVar1061._0_13_ = local_1018._0_13_;
        auVar1061[0xd] = local_1008[6];
        auVar1060._13_3_ = auVar1061._13_3_;
        auVar1060._0_12_ = local_1018._0_12_;
        auVar1060[0xc] = local_1018[6];
        auVar1059._12_4_ = auVar1060._12_4_;
        auVar1059._0_11_ = local_1018._0_11_;
        auVar1059[0xb] = local_1008[5];
        auVar1058._11_5_ = auVar1059._11_5_;
        auVar1058._0_10_ = local_1018._0_10_;
        auVar1058[10] = local_1018[5];
        auVar1057._10_6_ = auVar1058._10_6_;
        auVar1057._0_9_ = local_1018._0_9_;
        auVar1057[9] = local_1008[4];
        auVar1056._9_7_ = auVar1057._9_7_;
        auVar1056._0_8_ = local_1018._0_8_;
        auVar1056[8] = local_1018[4];
        Var21 = CONCAT91(CONCAT81(auVar1056._8_8_,local_1008[3]),local_1018[3]);
        auVar158._2_10_ = Var21;
        auVar158[1] = local_1008[2];
        auVar158[0] = local_1018[2];
        auVar645._0_14_ = local_ff8._0_14_;
        auVar645[0xe] = local_ff8[7];
        auVar645[0xf] = local_fe8[7];
        auVar644._14_2_ = auVar645._14_2_;
        auVar644._0_13_ = local_ff8._0_13_;
        auVar644[0xd] = local_fe8[6];
        auVar643._13_3_ = auVar644._13_3_;
        auVar643._0_12_ = local_ff8._0_12_;
        auVar643[0xc] = local_ff8[6];
        auVar642._12_4_ = auVar643._12_4_;
        auVar642._0_11_ = local_ff8._0_11_;
        auVar642[0xb] = local_fe8[5];
        auVar641._11_5_ = auVar642._11_5_;
        auVar641._0_10_ = local_ff8._0_10_;
        auVar641[10] = local_ff8[5];
        auVar640._10_6_ = auVar641._10_6_;
        auVar640._0_9_ = local_ff8._0_9_;
        auVar640[9] = local_fe8[4];
        auVar639._9_7_ = auVar640._9_7_;
        auVar639._0_8_ = local_ff8._0_8_;
        auVar639[8] = local_ff8[4];
        Var39 = CONCAT91(CONCAT81(auVar639._8_8_,local_fe8[3]),local_ff8[3]);
        auVar159._2_10_ = Var39;
        auVar159[1] = local_fe8[2];
        auVar159[0] = local_ff8[2];
        auVar638._4_12_ = auVar159;
        auVar638[3] = local_fe8[1];
        auVar638[2] = local_ff8[1];
        auVar638._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
        auVar1254._0_14_ = local_fd8._0_14_;
        auVar1254[0xe] = local_fd8[7];
        auVar1254[0xf] = local_fc8[7];
        auVar1253._14_2_ = auVar1254._14_2_;
        auVar1253._0_13_ = local_fd8._0_13_;
        auVar1253[0xd] = local_fc8[6];
        auVar1252._13_3_ = auVar1253._13_3_;
        auVar1252._0_12_ = local_fd8._0_12_;
        auVar1252[0xc] = local_fd8[6];
        auVar1251._12_4_ = auVar1252._12_4_;
        auVar1251._0_11_ = local_fd8._0_11_;
        auVar1251[0xb] = local_fc8[5];
        auVar1250._11_5_ = auVar1251._11_5_;
        auVar1250._0_10_ = local_fd8._0_10_;
        auVar1250[10] = local_fd8[5];
        auVar1249._10_6_ = auVar1250._10_6_;
        auVar1249._0_9_ = local_fd8._0_9_;
        auVar1249[9] = local_fc8[4];
        auVar1248._9_7_ = auVar1249._9_7_;
        auVar1248._0_8_ = local_fd8._0_8_;
        auVar1248[8] = local_fd8[4];
        Var42 = CONCAT91(CONCAT81(auVar1248._8_8_,local_fc8[3]),local_fd8[3]);
        auVar160._2_10_ = Var42;
        auVar160[1] = local_fc8[2];
        auVar160[0] = local_fd8[2];
        auVar857._0_14_ = local_fb8._0_14_;
        auVar857[0xe] = local_fb8[7];
        auVar857[0xf] = local_fa8[7];
        auVar856._14_2_ = auVar857._14_2_;
        auVar856._0_13_ = local_fb8._0_13_;
        auVar856[0xd] = local_fa8[6];
        auVar855._13_3_ = auVar856._13_3_;
        auVar855._0_12_ = local_fb8._0_12_;
        auVar855[0xc] = local_fb8[6];
        auVar854._12_4_ = auVar855._12_4_;
        auVar854._0_11_ = local_fb8._0_11_;
        auVar854[0xb] = local_fa8[5];
        auVar853._11_5_ = auVar854._11_5_;
        auVar853._0_10_ = local_fb8._0_10_;
        auVar853[10] = local_fb8[5];
        auVar852._10_6_ = auVar853._10_6_;
        auVar852._0_9_ = local_fb8._0_9_;
        auVar852[9] = local_fa8[4];
        auVar851._9_7_ = auVar852._9_7_;
        auVar851._0_8_ = local_fb8._0_8_;
        auVar851[8] = local_fb8[4];
        Var55 = CONCAT91(CONCAT81(auVar851._8_8_,local_fa8[3]),local_fb8[3]);
        auVar161._2_10_ = Var55;
        auVar161[1] = local_fa8[2];
        auVar161[0] = local_fb8[2];
        auVar850._4_12_ = auVar161;
        auVar850[3] = local_fa8[1];
        auVar850[2] = local_fb8[1];
        auVar850._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
        auVar1486._0_14_ = local_f98._0_14_;
        auVar1486[0xe] = local_f98[7];
        auVar1486[0xf] = local_f88[7];
        auVar1485._14_2_ = auVar1486._14_2_;
        auVar1485._0_13_ = local_f98._0_13_;
        auVar1485[0xd] = local_f88[6];
        auVar1484._13_3_ = auVar1485._13_3_;
        auVar1484._0_12_ = local_f98._0_12_;
        auVar1484[0xc] = local_f98[6];
        auVar1483._12_4_ = auVar1484._12_4_;
        auVar1483._0_11_ = local_f98._0_11_;
        auVar1483[0xb] = local_f88[5];
        auVar1482._11_5_ = auVar1483._11_5_;
        auVar1482._0_10_ = local_f98._0_10_;
        auVar1482[10] = local_f98[5];
        auVar1481._10_6_ = auVar1482._10_6_;
        auVar1481._0_9_ = local_f98._0_9_;
        auVar1481[9] = local_f88[4];
        auVar1480._9_7_ = auVar1481._9_7_;
        auVar1480._0_8_ = local_f98._0_8_;
        auVar1480[8] = local_f98[4];
        Var57 = CONCAT91(CONCAT81(auVar1480._8_8_,local_f88[3]),local_f98[3]);
        auVar162._2_10_ = Var57;
        auVar162[1] = local_f88[2];
        auVar162[0] = local_f98[2];
        auVar1382._0_14_ = local_f78._0_14_;
        auVar1382[0xe] = local_f78[7];
        auVar1382[0xf] = local_f68[7];
        auVar1381._14_2_ = auVar1382._14_2_;
        auVar1381._0_13_ = local_f78._0_13_;
        auVar1381[0xd] = local_f68[6];
        auVar1380._13_3_ = auVar1381._13_3_;
        auVar1380._0_12_ = local_f78._0_12_;
        auVar1380[0xc] = local_f78[6];
        auVar1379._12_4_ = auVar1380._12_4_;
        auVar1379._0_11_ = local_f78._0_11_;
        auVar1379[0xb] = local_f68[5];
        auVar1378._11_5_ = auVar1379._11_5_;
        auVar1378._0_10_ = local_f78._0_10_;
        auVar1378[10] = local_f78[5];
        auVar1377._10_6_ = auVar1378._10_6_;
        auVar1377._0_9_ = local_f78._0_9_;
        auVar1377[9] = local_f68[4];
        auVar1376._9_7_ = auVar1377._9_7_;
        auVar1376._0_8_ = local_f78._0_8_;
        auVar1376[8] = local_f78[4];
        Var59 = CONCAT91(CONCAT81(auVar1376._8_8_,local_f68[3]),local_f78[3]);
        auVar163._2_10_ = Var59;
        auVar163[1] = local_f68[2];
        auVar163[0] = local_f78[2];
        auVar1375._4_12_ = auVar163;
        auVar1375[3] = local_f68[1];
        auVar1375[2] = local_f78[1];
        auVar1375._0_2_ = CONCAT11(local_f68[0],local_f78[0]);
        auVar1570._0_14_ = local_f58._0_14_;
        auVar1570[0xe] = local_f58[7];
        auVar1570[0xf] = local_f48[0][7];
        auVar1569._14_2_ = auVar1570._14_2_;
        auVar1569._0_13_ = local_f58._0_13_;
        auVar1569[0xd] = local_f48[0][6];
        auVar1568._13_3_ = auVar1569._13_3_;
        auVar1568._0_12_ = local_f58._0_12_;
        auVar1568[0xc] = local_f58[6];
        auVar1567._12_4_ = auVar1568._12_4_;
        auVar1567._0_11_ = local_f58._0_11_;
        auVar1567[0xb] = local_f48[0][5];
        auVar1566._11_5_ = auVar1567._11_5_;
        auVar1566._0_10_ = local_f58._0_10_;
        auVar1566[10] = local_f58[5];
        auVar1565._10_6_ = auVar1566._10_6_;
        auVar1565._0_9_ = local_f58._0_9_;
        auVar1565[9] = local_f48[0][4];
        auVar1564._9_7_ = auVar1565._9_7_;
        auVar1564._0_8_ = local_f58._0_8_;
        auVar1564[8] = local_f58[4];
        Var61 = CONCAT91(CONCAT81(auVar1564._8_8_,local_f48[0][3]),local_f58[3]);
        auVar164._2_10_ = Var61;
        auVar164[1] = local_f48[0][2];
        auVar164[0] = local_f58[2];
        auVar1695._0_12_ = auVar392._0_12_;
        auVar1695._12_2_ = (short)Var18;
        auVar1695._14_2_ = (short)Var21;
        auVar1694._12_4_ = auVar1695._12_4_;
        auVar1694._0_10_ = auVar392._0_10_;
        auVar1694._10_2_ = auVar158._0_2_;
        auVar1693._10_6_ = auVar1694._10_6_;
        auVar1693._0_8_ = auVar392._0_8_;
        auVar1693._8_2_ = auVar157._0_2_;
        auVar1799._0_12_ = auVar638._0_12_;
        auVar1799._12_2_ = (short)Var39;
        auVar1799._14_2_ = (short)Var42;
        auVar1798._12_4_ = auVar1799._12_4_;
        auVar1798._0_10_ = auVar638._0_10_;
        auVar1798._10_2_ = auVar160._0_2_;
        auVar1797._10_6_ = auVar1798._10_6_;
        auVar1797._0_8_ = auVar638._0_8_;
        auVar1797._8_2_ = auVar159._0_2_;
        auVar1869._0_12_ = auVar850._0_12_;
        auVar1869._12_2_ = (short)Var55;
        auVar1869._14_2_ = (short)Var57;
        auVar1868._12_4_ = auVar1869._12_4_;
        auVar1868._0_10_ = auVar850._0_10_;
        auVar1868._10_2_ = auVar162._0_2_;
        auVar1867._10_6_ = auVar1868._10_6_;
        auVar1867._0_8_ = auVar850._0_8_;
        auVar1867._8_2_ = auVar161._0_2_;
        auVar1963._0_12_ = auVar1375._0_12_;
        auVar1963._12_2_ = (short)Var59;
        auVar1963._14_2_ = (short)Var61;
        auVar1962._12_4_ = auVar1963._12_4_;
        auVar1962._0_10_ = auVar1375._0_10_;
        auVar1962._10_2_ = auVar164._0_2_;
        auVar1961._10_6_ = auVar1962._10_6_;
        auVar1961._0_8_ = auVar1375._0_8_;
        auVar1961._8_2_ = auVar163._0_2_;
        local_1638[0] =
             CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar638._0_2_),
                      CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar392._0_2_));
        local_1638[1] =
             CONCAT44(CONCAT22(CONCAT11(local_f48[0][0],local_f58[0]),auVar1375._0_2_),
                      CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar850._0_2_));
        local_1628 = local_1038[1];
        uStack_1627 = local_1028[1];
        uStack_1626 = local_1018[1];
        uStack_1625 = local_1008[1];
        uStack_1624 = local_ff8[1];
        uStack_1623 = local_fe8[1];
        uStack_1622 = local_fd8[1];
        uStack_1621 = local_fc8[1];
        uStack_1620 = local_fb8[1];
        uStack_161f = local_fa8[1];
        uStack_161e = local_f98[1];
        uStack_161d = local_f88[1];
        uStack_161c = local_f78[1];
        uStack_161b = local_f68[1];
        uStack_161a = local_f58[1];
        uStack_1619 = local_f48[0][1];
        local_1618 = auVar1693._8_4_;
        uStack_1614 = auVar1797._8_4_;
        uStack_1610 = auVar1867._8_4_;
        uStack_160c = auVar1961._8_4_;
        local_1608._8_4_ = auVar1694._12_4_;
        local_1608._12_4_ = auVar1798._12_4_;
        local_15f8._0_4_ = CONCAT22(auVar1056._8_2_,auVar393._8_2_);
        auVar273._0_8_ = CONCAT26(auVar1058._10_2_,CONCAT24(auVar395._10_2_,local_15f8._0_4_));
        auVar273._8_2_ = auVar397._12_2_;
        auVar273._10_2_ = auVar1060._12_2_;
        auVar400._12_2_ = auVar398._14_2_;
        auVar400._0_12_ = auVar273;
        auVar400._14_2_ = auVar1061._14_2_;
        local_15f8._4_4_ = CONCAT22(auVar1248._8_2_,auVar639._8_2_);
        auVar478._0_8_ = CONCAT26(auVar1250._10_2_,CONCAT24(auVar641._10_2_,local_15f8._4_4_));
        auVar478._8_2_ = auVar643._12_2_;
        auVar478._10_2_ = auVar1252._12_2_;
        auVar646._12_2_ = auVar644._14_2_;
        auVar646._0_12_ = auVar478;
        auVar646._14_2_ = auVar1253._14_2_;
        local_15f8._8_4_ = CONCAT22(auVar1480._8_2_,auVar851._8_2_);
        auVar753._0_8_ = CONCAT26(auVar1482._10_2_,CONCAT24(auVar853._10_2_,local_15f8._8_4_));
        auVar753._8_2_ = auVar855._12_2_;
        auVar753._10_2_ = auVar1484._12_2_;
        local_15f8._12_4_ = CONCAT22(auVar1564._8_2_,auVar1376._8_2_);
        auVar1330._0_8_ = CONCAT26(auVar1566._10_2_,CONCAT24(auVar1378._10_2_,local_15f8._12_4_));
        auVar1330._8_2_ = auVar1380._12_2_;
        auVar1330._10_2_ = auVar1568._12_2_;
        auVar1063._8_4_ = (int)((ulong)auVar273._0_8_ >> 0x20);
        auVar1063._0_8_ = auVar273._0_8_;
        auVar1063._12_4_ = (int)((ulong)auVar478._0_8_ >> 0x20);
        auVar647._8_4_ = (int)((ulong)auVar753._0_8_ >> 0x20);
        auVar647._0_8_ = auVar753._0_8_;
        auVar647._12_4_ = (int)((ulong)auVar1330._0_8_ >> 0x20);
        local_15e8._8_8_ = auVar647._8_8_;
        local_15e8._0_8_ = auVar1063._8_8_;
        local_15d8._4_4_ = auVar478._8_4_;
        local_15d8._0_4_ = auVar273._8_4_;
        local_15d8._8_4_ = auVar753._8_4_;
        local_15d8._12_4_ = auVar1330._8_4_;
        auVar655._0_14_ = local_f48[1]._0_14_;
        auVar655[0xe] = local_f48[1][7];
        auVar655[0xf] = uStack_f21;
        auVar654._14_2_ = auVar655._14_2_;
        auVar654._0_13_ = local_f48[1]._0_13_;
        auVar654[0xd] = uStack_f22;
        auVar653._13_3_ = auVar654._13_3_;
        auVar653._0_12_ = local_f48[1]._0_12_;
        auVar653[0xc] = local_f48[1][6];
        auVar652._12_4_ = auVar653._12_4_;
        auVar652._0_11_ = local_f48[1]._0_11_;
        auVar652[0xb] = uStack_f23;
        auVar651._11_5_ = auVar652._11_5_;
        auVar651._0_10_ = local_f48[1]._0_10_;
        auVar651[10] = local_f48[1][5];
        auVar650._10_6_ = auVar651._10_6_;
        auVar650._0_9_ = local_f48[1]._0_9_;
        auVar650[9] = uStack_f24;
        auVar649._9_7_ = auVar650._9_7_;
        auVar649._0_8_ = local_f48[1]._0_8_;
        auVar649[8] = local_f48[1][4];
        Var18 = CONCAT91(CONCAT81(auVar649._8_8_,uStack_f25),local_f48[1][3]);
        auVar166._2_10_ = Var18;
        auVar166[1] = uStack_f26;
        auVar166[0] = local_f48[1][2];
        auVar165._2_12_ = auVar166;
        auVar165[1] = uStack_f27;
        auVar165[0] = local_f48[1][1];
        auVar648._0_2_ = CONCAT11(local_f28,local_f48[1][0]);
        auVar648._2_14_ = auVar165;
        auVar1261._0_14_ = local_f18._0_14_;
        auVar1261[0xe] = local_f18[7];
        auVar1261[0xf] = uStack_f01;
        auVar1260._14_2_ = auVar1261._14_2_;
        auVar1260._0_13_ = local_f18._0_13_;
        auVar1260[0xd] = uStack_f02;
        auVar1259._13_3_ = auVar1260._13_3_;
        auVar1259._0_12_ = local_f18._0_12_;
        auVar1259[0xc] = local_f18[6];
        auVar1258._12_4_ = auVar1259._12_4_;
        auVar1258._0_11_ = local_f18._0_11_;
        auVar1258[0xb] = uStack_f03;
        auVar1257._11_5_ = auVar1258._11_5_;
        auVar1257._0_10_ = local_f18._0_10_;
        auVar1257[10] = local_f18[5];
        auVar1256._10_6_ = auVar1257._10_6_;
        auVar1256._0_9_ = local_f18._0_9_;
        auVar1256[9] = uStack_f04;
        auVar1255._9_7_ = auVar1256._9_7_;
        auVar1255._0_8_ = local_f18._0_8_;
        auVar1255[8] = local_f18[4];
        Var21 = CONCAT91(CONCAT81(auVar1255._8_8_,uStack_f05),local_f18[3]);
        auVar168._2_10_ = Var21;
        auVar168[1] = uStack_f06;
        auVar168[0] = local_f18[2];
        auVar167._2_12_ = auVar168;
        auVar167[1] = uStack_f07;
        auVar167[0] = local_f18[1];
        auVar1071._0_14_ = local_ef8._0_14_;
        auVar1071[0xe] = local_ef8[7];
        auVar1071[0xf] = uStack_ee1;
        auVar1070._14_2_ = auVar1071._14_2_;
        auVar1070._0_13_ = local_ef8._0_13_;
        auVar1070[0xd] = uStack_ee2;
        auVar1069._13_3_ = auVar1070._13_3_;
        auVar1069._0_12_ = local_ef8._0_12_;
        auVar1069[0xc] = local_ef8[6];
        auVar1068._12_4_ = auVar1069._12_4_;
        auVar1068._0_11_ = local_ef8._0_11_;
        auVar1068[0xb] = uStack_ee3;
        auVar1067._11_5_ = auVar1068._11_5_;
        auVar1067._0_10_ = local_ef8._0_10_;
        auVar1067[10] = local_ef8[5];
        auVar1066._10_6_ = auVar1067._10_6_;
        auVar1066._0_9_ = local_ef8._0_9_;
        auVar1066[9] = uStack_ee4;
        auVar1065._9_7_ = auVar1066._9_7_;
        auVar1065._0_8_ = local_ef8._0_8_;
        auVar1065[8] = local_ef8[4];
        Var39 = CONCAT91(CONCAT81(auVar1065._8_8_,uStack_ee5),local_ef8[3]);
        auVar170._2_10_ = Var39;
        auVar170[1] = uStack_ee6;
        auVar170[0] = local_ef8[2];
        auVar169._2_12_ = auVar170;
        auVar169[1] = uStack_ee7;
        auVar169[0] = local_ef8[1];
        auVar1064._0_2_ = CONCAT11(local_ee8,local_ef8[0]);
        auVar1064._2_14_ = auVar169;
        auVar1389._0_14_ = local_ed8._0_14_;
        auVar1389[0xe] = local_ed8[7];
        auVar1389[0xf] = uStack_ec1;
        auVar1388._14_2_ = auVar1389._14_2_;
        auVar1388._0_13_ = local_ed8._0_13_;
        auVar1388[0xd] = uStack_ec2;
        auVar1387._13_3_ = auVar1388._13_3_;
        auVar1387._0_12_ = local_ed8._0_12_;
        auVar1387[0xc] = local_ed8[6];
        auVar1386._12_4_ = auVar1387._12_4_;
        auVar1386._0_11_ = local_ed8._0_11_;
        auVar1386[0xb] = uStack_ec3;
        auVar1385._11_5_ = auVar1386._11_5_;
        auVar1385._0_10_ = local_ed8._0_10_;
        auVar1385[10] = local_ed8[5];
        auVar1384._10_6_ = auVar1385._10_6_;
        auVar1384._0_9_ = local_ed8._0_9_;
        auVar1384[9] = uStack_ec4;
        auVar1383._9_7_ = auVar1384._9_7_;
        auVar1383._0_8_ = local_ed8._0_8_;
        auVar1383[8] = local_ed8[4];
        Var42 = CONCAT91(CONCAT81(auVar1383._8_8_,uStack_ec5),local_ed8[3]);
        auVar172._2_10_ = Var42;
        auVar172[1] = uStack_ec6;
        auVar172[0] = local_ed8[2];
        auVar171._2_12_ = auVar172;
        auVar171[1] = uStack_ec7;
        auVar171[0] = local_ed8[1];
        auVar865._0_14_ = local_eb8._0_14_;
        auVar865[0xe] = local_eb8[7];
        auVar865[0xf] = uStack_ea1;
        auVar864._14_2_ = auVar865._14_2_;
        auVar864._0_13_ = local_eb8._0_13_;
        auVar864[0xd] = uStack_ea2;
        auVar863._13_3_ = auVar864._13_3_;
        auVar863._0_12_ = local_eb8._0_12_;
        auVar863[0xc] = local_eb8[6];
        auVar862._12_4_ = auVar863._12_4_;
        auVar862._0_11_ = local_eb8._0_11_;
        auVar862[0xb] = uStack_ea3;
        auVar861._11_5_ = auVar862._11_5_;
        auVar861._0_10_ = local_eb8._0_10_;
        auVar861[10] = local_eb8[5];
        auVar860._10_6_ = auVar861._10_6_;
        auVar860._0_9_ = local_eb8._0_9_;
        auVar860[9] = uStack_ea4;
        auVar859._9_7_ = auVar860._9_7_;
        auVar859._0_8_ = local_eb8._0_8_;
        auVar859[8] = local_eb8[4];
        Var55 = CONCAT91(CONCAT81(auVar859._8_8_,uStack_ea5),local_eb8[3]);
        auVar174._2_10_ = Var55;
        auVar174[1] = uStack_ea6;
        auVar174[0] = local_eb8[2];
        auVar173._2_12_ = auVar174;
        auVar173[1] = uStack_ea7;
        auVar173[0] = local_eb8[1];
        auVar858._0_2_ = CONCAT11(local_ea8,local_eb8[0]);
        auVar858._2_14_ = auVar173;
        local_15c8._8_4_ = auVar400._12_4_;
        local_15c8._12_4_ = auVar646._12_4_;
        auVar1493._0_14_ = local_e98._0_14_;
        auVar1493[0xe] = local_e98[7];
        auVar1493[0xf] = uStack_e81;
        auVar1492._14_2_ = auVar1493._14_2_;
        auVar1492._0_13_ = local_e98._0_13_;
        auVar1492[0xd] = uStack_e82;
        auVar1491._13_3_ = auVar1492._13_3_;
        auVar1491._0_12_ = local_e98._0_12_;
        auVar1491[0xc] = local_e98[6];
        auVar1490._12_4_ = auVar1491._12_4_;
        auVar1490._0_11_ = local_e98._0_11_;
        auVar1490[0xb] = uStack_e83;
        auVar1489._11_5_ = auVar1490._11_5_;
        auVar1489._0_10_ = local_e98._0_10_;
        auVar1489[10] = local_e98[5];
        auVar1488._10_6_ = auVar1489._10_6_;
        auVar1488._0_9_ = local_e98._0_9_;
        auVar1488[9] = uStack_e84;
        auVar1487._9_7_ = auVar1488._9_7_;
        auVar1487._0_8_ = local_e98._0_8_;
        auVar1487[8] = local_e98[4];
        Var57 = CONCAT91(CONCAT81(auVar1487._8_8_,uStack_e85),local_e98[3]);
        auVar176._2_10_ = Var57;
        auVar176[1] = uStack_e86;
        auVar176[0] = local_e98[2];
        auVar175._2_12_ = auVar176;
        auVar175[1] = uStack_e87;
        auVar175[0] = local_e98[1];
        auVar408._0_14_ = local_e78._0_14_;
        auVar408[0xe] = local_e78[7];
        auVar408[0xf] = uStack_e61;
        auVar407._14_2_ = auVar408._14_2_;
        auVar407._0_13_ = local_e78._0_13_;
        auVar407[0xd] = uStack_e62;
        auVar406._13_3_ = auVar407._13_3_;
        auVar406._0_12_ = local_e78._0_12_;
        auVar406[0xc] = local_e78[6];
        auVar405._12_4_ = auVar406._12_4_;
        auVar405._0_11_ = local_e78._0_11_;
        auVar405[0xb] = uStack_e63;
        auVar404._11_5_ = auVar405._11_5_;
        auVar404._0_10_ = local_e78._0_10_;
        auVar404[10] = local_e78[5];
        auVar403._10_6_ = auVar404._10_6_;
        auVar403._0_9_ = local_e78._0_9_;
        auVar403[9] = uStack_e64;
        auVar402._9_7_ = auVar403._9_7_;
        auVar402._0_8_ = local_e78._0_8_;
        auVar402[8] = local_e78[4];
        Var59 = CONCAT91(CONCAT81(auVar402._8_8_,uStack_e65),local_e78[3]);
        auVar178._2_10_ = Var59;
        auVar178[1] = uStack_e66;
        auVar178[0] = local_e78[2];
        auVar177._2_12_ = auVar178;
        auVar177[1] = uStack_e67;
        auVar177[0] = local_e78[1];
        auVar401._0_2_ = CONCAT11(local_e68,local_e78[0]);
        auVar401._2_14_ = auVar177;
        auVar1577._0_14_ = local_e58._0_14_;
        auVar1577[0xe] = local_e58[7];
        auVar1577[0xf] = uStack_e41;
        auVar1576._14_2_ = auVar1577._14_2_;
        auVar1576._0_13_ = local_e58._0_13_;
        auVar1576[0xd] = uStack_e42;
        auVar1575._13_3_ = auVar1576._13_3_;
        auVar1575._0_12_ = local_e58._0_12_;
        auVar1575[0xc] = local_e58[6];
        auVar1574._12_4_ = auVar1575._12_4_;
        auVar1574._0_11_ = local_e58._0_11_;
        auVar1574[0xb] = uStack_e43;
        auVar1573._11_5_ = auVar1574._11_5_;
        auVar1573._0_10_ = local_e58._0_10_;
        auVar1573[10] = local_e58[5];
        auVar1572._10_6_ = auVar1573._10_6_;
        auVar1572._0_9_ = local_e58._0_9_;
        auVar1572[9] = uStack_e44;
        auVar1571._9_7_ = auVar1572._9_7_;
        auVar1571._0_8_ = local_e58._0_8_;
        auVar1571[8] = local_e58[4];
        Var61 = CONCAT91(CONCAT81(auVar1571._8_8_,uStack_e45),local_e58[3]);
        auVar180._2_10_ = Var61;
        auVar180[1] = uStack_e46;
        auVar180[0] = local_e58[2];
        auVar179._2_12_ = auVar180;
        auVar179[1] = uStack_e47;
        auVar179[0] = local_e58[1];
        auVar1699._0_12_ = auVar648._0_12_;
        auVar1699._12_2_ = (short)Var18;
        auVar1699._14_2_ = (short)Var21;
        auVar1698._12_4_ = auVar1699._12_4_;
        auVar1698._0_10_ = auVar648._0_10_;
        auVar1698._10_2_ = auVar168._0_2_;
        auVar1697._10_6_ = auVar1698._10_6_;
        auVar1697._0_8_ = auVar648._0_8_;
        auVar1697._8_2_ = auVar166._0_2_;
        auVar181._4_8_ = auVar1697._8_8_;
        auVar181._2_2_ = auVar167._0_2_;
        auVar181._0_2_ = auVar165._0_2_;
        auVar1696._0_4_ = CONCAT22(CONCAT11(local_f08,local_f18[0]),auVar648._0_2_);
        auVar1696._4_12_ = auVar181;
        auVar1802._0_12_ = auVar1064._0_12_;
        auVar1802._12_2_ = (short)Var39;
        auVar1802._14_2_ = (short)Var42;
        auVar1801._12_4_ = auVar1802._12_4_;
        auVar1801._0_10_ = auVar1064._0_10_;
        auVar1801._10_2_ = auVar172._0_2_;
        auVar1800._10_6_ = auVar1801._10_6_;
        auVar1800._0_8_ = auVar1064._0_8_;
        auVar1800._8_2_ = auVar170._0_2_;
        auVar182._4_8_ = auVar1800._8_8_;
        auVar182._2_2_ = auVar171._0_2_;
        auVar182._0_2_ = auVar169._0_2_;
        auVar1873._0_12_ = auVar858._0_12_;
        auVar1873._12_2_ = (short)Var55;
        auVar1873._14_2_ = (short)Var57;
        auVar1872._12_4_ = auVar1873._12_4_;
        auVar1872._0_10_ = auVar858._0_10_;
        auVar1872._10_2_ = auVar176._0_2_;
        auVar1871._10_6_ = auVar1872._10_6_;
        auVar1871._0_8_ = auVar858._0_8_;
        auVar1871._8_2_ = auVar174._0_2_;
        auVar183._4_8_ = auVar1871._8_8_;
        auVar183._2_2_ = auVar175._0_2_;
        auVar183._0_2_ = auVar173._0_2_;
        auVar1870._0_4_ = CONCAT22(CONCAT11(local_e88,local_e98[0]),auVar858._0_2_);
        auVar1870._4_12_ = auVar183;
        auVar1966._0_12_ = auVar401._0_12_;
        auVar1966._12_2_ = (short)Var59;
        auVar1966._14_2_ = (short)Var61;
        auVar1965._12_4_ = auVar1966._12_4_;
        auVar1965._0_10_ = auVar401._0_10_;
        auVar1965._10_2_ = auVar180._0_2_;
        auVar1964._10_6_ = auVar1965._10_6_;
        auVar1964._0_8_ = auVar401._0_8_;
        auVar1964._8_2_ = auVar178._0_2_;
        auVar184._4_8_ = auVar1964._8_8_;
        auVar184._2_2_ = auVar179._0_2_;
        auVar184._0_2_ = auVar177._0_2_;
        auVar2026._0_8_ = auVar1696._0_8_;
        auVar2026._8_4_ = auVar181._0_4_;
        auVar2026._12_4_ = auVar182._0_4_;
        auVar1803._0_8_ = auVar1870._0_8_;
        auVar1803._8_4_ = auVar183._0_4_;
        auVar1803._12_4_ = auVar184._0_4_;
        local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_ec8,local_ed8[0]),auVar1064._0_2_),
                              auVar1696._0_4_);
        auStack_15b0[0] =
             CONCAT44(CONCAT22(CONCAT11(local_e48,local_e58[0]),auVar401._0_2_),auVar1870._0_4_);
        auStack_15b0[1] = auVar2026._8_8_;
        auStack_15b0[2] = auVar1803._8_8_;
        local_1598 = CONCAT44(auVar1800._8_4_,auVar1697._8_4_);
        uStack_1590 = CONCAT44(auVar1964._8_4_,auVar1871._8_4_);
        local_1588._8_4_ = auVar1698._12_4_;
        local_1588._12_4_ = auVar1801._12_4_;
        auVar784._12_4_ = CONCAT22(auVar1255._8_2_,auVar649._8_2_);
        auVar479._0_8_ = CONCAT26(auVar1257._10_2_,CONCAT24(auVar651._10_2_,auVar784._12_4_));
        auVar479._8_2_ = auVar653._12_2_;
        auVar479._10_2_ = auVar1259._12_2_;
        auVar656._12_2_ = auVar654._14_2_;
        auVar656._0_12_ = auVar479;
        auVar656._14_2_ = auVar1260._14_2_;
        uVar908 = CONCAT22(auVar1383._8_2_,auVar1065._8_2_);
        auVar925._0_8_ = CONCAT26(auVar1385._10_2_,CONCAT24(auVar1067._10_2_,uVar908));
        auVar925._8_2_ = auVar1069._12_2_;
        auVar925._10_2_ = auVar1387._12_2_;
        auVar1072._12_2_ = auVar1070._14_2_;
        auVar1072._0_12_ = auVar925;
        auVar1072._14_2_ = auVar1388._14_2_;
        uVar741 = CONCAT22(auVar1487._8_2_,auVar859._8_2_);
        auVar754._0_8_ = CONCAT26(auVar1489._10_2_,CONCAT24(auVar861._10_2_,uVar741));
        auVar754._8_2_ = auVar863._12_2_;
        auVar754._10_2_ = auVar1491._12_2_;
        auVar866._12_2_ = auVar864._14_2_;
        auVar866._0_12_ = auVar754;
        auVar866._14_2_ = auVar1492._14_2_;
        auVar298._12_4_ = CONCAT22(auVar1571._8_2_,auVar402._8_2_);
        auVar274._0_8_ = CONCAT26(auVar1573._10_2_,CONCAT24(auVar404._10_2_,auVar298._12_4_));
        auVar274._8_2_ = auVar406._12_2_;
        auVar274._10_2_ = auVar1575._12_2_;
        auVar409._12_2_ = auVar407._14_2_;
        auVar409._0_12_ = auVar274;
        auVar409._14_2_ = auVar1576._14_2_;
        auVar1262._8_4_ = (int)((ulong)auVar479._0_8_ >> 0x20);
        auVar1262._0_8_ = auVar479._0_8_;
        auVar1262._12_4_ = (int)((ulong)auVar925._0_8_ >> 0x20);
        auVar1073._8_4_ = (int)((ulong)auVar754._0_8_ >> 0x20);
        auVar1073._0_8_ = auVar754._0_8_;
        auVar1073._12_4_ = (int)((ulong)auVar274._0_8_ >> 0x20);
        local_1578 = CONCAT44(uVar908,auVar784._12_4_);
        uStack_1570 = CONCAT44(auVar298._12_4_,uVar741);
        local_1568 = auVar1262._8_8_;
        uStack_1560 = auVar1073._8_8_;
        local_1558 = CONCAT44(auVar925._8_4_,auVar479._8_4_);
        uStack_1550 = CONCAT44(auVar274._8_4_,auVar754._8_4_);
        local_1548._8_4_ = auVar656._12_4_;
        local_1548._12_4_ = auVar1072._12_4_;
        local_1538 = CONCAT44(auVar409._12_4_,auVar866._12_4_);
        puVar253 = dst + 0x10;
        lVar252 = 0x80;
        do {
          uVar267 = *(undefined8 *)((long)local_16b8 + lVar252 + 8);
          *(undefined8 *)(puVar253 + -0x10) = *(undefined8 *)((long)local_16b8 + lVar252);
          *(undefined8 *)(puVar253 + -8) = uVar267;
          uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
          *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1638 + lVar252);
          *(undefined8 *)(puVar253 + 8) = uVar267;
          lVar252 = lVar252 + 0x10;
          puVar253 = puVar253 + stride;
        } while (lVar252 != 0x100);
        return;
      }
      if (bh != 4) {
        return;
      }
      iVar258 = 0x13 << (bVar254 & 0x1f);
      auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
        uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
        lVar260 = lVar252;
        if ((int)uVar259 < 1) {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x100);
        }
        else {
          uVar255 = 4;
          if ((int)uVar259 < 4) {
            uVar255 = uVar259;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar262);
          if (upsample_left == 0) {
            auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
            auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1643._0_4_ = auVar1198._0_4_;
            auVar1643._4_4_ = auVar1643._0_4_;
            auVar1643._8_4_ = auVar1643._0_4_;
            auVar1643._12_4_ = auVar1643._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_004df790);
            auVar1517 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
            auVar1641._0_4_ = auVar1198._0_4_;
            auVar1641._4_4_ = auVar1641._0_4_;
            auVar1641._8_4_ = auVar1641._0_4_;
            auVar1641._12_4_ = auVar1641._0_4_;
            auVar1198 = psllw(auVar1641,ZEXT416((uint)upsample_left));
            auVar1642._0_2_ = auVar1198._0_2_ >> 1;
            auVar1642._2_2_ = auVar1198._2_2_ >> 1;
            auVar1642._4_2_ = auVar1198._4_2_ >> 1;
            auVar1642._6_2_ = auVar1198._6_2_ >> 1;
            auVar1642._8_2_ = auVar1198._8_2_ >> 1;
            auVar1642._10_2_ = auVar1198._10_2_ >> 1;
            auVar1642._12_2_ = auVar1198._12_2_ >> 1;
            auVar1642._14_2_ = auVar1198._14_2_ >> 1;
            auVar1643 = auVar1642 & auVar338;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1525 = pmovzxbw(in_XMM10,auVar1517);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1643._0_2_;
          in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1643._2_2_;
          in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1643._4_2_;
          in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1643._6_2_;
          in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1643._8_2_;
          in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1643._10_2_;
          in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1643._12_2_;
          in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1643._14_2_;
          uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
          auVar319._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar319[2] = auVar1356[9];
          auVar319[3] = 0;
          auVar319[4] = auVar1356[10];
          auVar319[5] = 0;
          auVar319[6] = auVar1356[0xb];
          auVar319[7] = 0;
          auVar319[8] = auVar1356[0xc];
          auVar319[9] = 0;
          auVar319[10] = auVar1356[0xd];
          auVar319[0xb] = 0;
          auVar319[0xc] = auVar1356[0xe];
          auVar319[0xd] = 0;
          auVar319[0xe] = auVar1356[0xf];
          auVar319[0xf] = 0;
          auVar1198 = psllw(auVar319,5);
          uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                             (auVar1517[8] - auVar319._0_2_) * auVar1643._0_2_) >> 5;
          uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                             ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1643._2_2_) >> 5;
          uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                             ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1643._4_2_) >> 5
          ;
          uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                             ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1643._6_2_) >>
                     5;
          uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                             ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1643._8_2_) >>
                     5;
          uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                             ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1643._10_2_)
                     >> 5;
          uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                             ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1643._12_2_)
                     >> 5;
          uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                             ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1643._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
          in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
          in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
          in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
          in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
          in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
          in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
          in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
          in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323);
          in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324);
          in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325);
          in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326);
          in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327);
          auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        if ((int)uVar259 < 1) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 0x10);
      auVar327._0_14_ = local_1038._0_14_;
      auVar327[0xe] = local_1038[7];
      auVar327[0xf] = local_1028[7];
      auVar326._14_2_ = auVar327._14_2_;
      auVar326._0_13_ = local_1038._0_13_;
      auVar326[0xd] = local_1028[6];
      auVar325._13_3_ = auVar326._13_3_;
      auVar325._0_12_ = local_1038._0_12_;
      auVar325[0xc] = local_1038[6];
      auVar324._12_4_ = auVar325._12_4_;
      auVar324._0_11_ = local_1038._0_11_;
      auVar324[0xb] = local_1028[5];
      auVar323._11_5_ = auVar324._11_5_;
      auVar323._0_10_ = local_1038._0_10_;
      auVar323[10] = local_1038[5];
      auVar322._10_6_ = auVar323._10_6_;
      auVar322._0_9_ = local_1038._0_9_;
      auVar322[9] = local_1028[4];
      auVar321._9_7_ = auVar322._9_7_;
      auVar321._0_8_ = local_1038._0_8_;
      auVar321[8] = local_1038[4];
      Var18 = CONCAT91(CONCAT81(auVar321._8_8_,local_1028[3]),local_1038[3]);
      auVar50._2_10_ = Var18;
      auVar50[1] = local_1028[2];
      auVar50[0] = local_1038[2];
      auVar320._4_12_ = auVar50;
      auVar320[3] = local_1028[1];
      auVar320[2] = local_1038[1];
      auVar320._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar967._0_14_ = local_1018._0_14_;
      auVar967[0xe] = local_1018[7];
      auVar967[0xf] = local_1008[7];
      auVar966._14_2_ = auVar967._14_2_;
      auVar966._0_13_ = local_1018._0_13_;
      auVar966[0xd] = local_1008[6];
      auVar965._13_3_ = auVar966._13_3_;
      auVar965._0_12_ = local_1018._0_12_;
      auVar965[0xc] = local_1018[6];
      auVar964._12_4_ = auVar965._12_4_;
      auVar964._0_11_ = local_1018._0_11_;
      auVar964[0xb] = local_1008[5];
      auVar963._11_5_ = auVar964._11_5_;
      auVar963._0_10_ = local_1018._0_10_;
      auVar963[10] = local_1018[5];
      auVar962._10_6_ = auVar963._10_6_;
      auVar962._0_9_ = local_1018._0_9_;
      auVar962[9] = local_1008[4];
      auVar961._9_7_ = auVar962._9_7_;
      auVar961._0_8_ = local_1018._0_8_;
      auVar961[8] = local_1018[4];
      Var21 = CONCAT91(CONCAT81(auVar961._8_8_,local_1008[3]),local_1018[3]);
      auVar51._2_10_ = Var21;
      auVar51[1] = local_1008[2];
      auVar51[0] = local_1018[2];
      auVar805._0_14_ = local_ff8._0_14_;
      auVar805[0xe] = local_ff8[7];
      auVar805[0xf] = local_fe8[7];
      auVar804._14_2_ = auVar805._14_2_;
      auVar804._0_13_ = local_ff8._0_13_;
      auVar804[0xd] = local_fe8[6];
      auVar803._13_3_ = auVar804._13_3_;
      auVar803._0_12_ = local_ff8._0_12_;
      auVar803[0xc] = local_ff8[6];
      auVar802._12_4_ = auVar803._12_4_;
      auVar802._0_11_ = local_ff8._0_11_;
      auVar802[0xb] = local_fe8[5];
      auVar801._11_5_ = auVar802._11_5_;
      auVar801._0_10_ = local_ff8._0_10_;
      auVar801[10] = local_ff8[5];
      auVar800._10_6_ = auVar801._10_6_;
      auVar800._0_9_ = local_ff8._0_9_;
      auVar800[9] = local_fe8[4];
      auVar799._9_7_ = auVar800._9_7_;
      auVar799._0_8_ = local_ff8._0_8_;
      auVar799[8] = local_ff8[4];
      Var39 = CONCAT91(CONCAT81(auVar799._8_8_,local_fe8[3]),local_ff8[3]);
      auVar52._2_10_ = Var39;
      auVar52[1] = local_fe8[2];
      auVar52[0] = local_ff8[2];
      auVar798._4_12_ = auVar52;
      auVar798[3] = local_fe8[1];
      auVar798[2] = local_ff8[1];
      auVar798._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
      auVar1187._0_14_ = local_fd8._0_14_;
      auVar1187[0xe] = local_fd8[7];
      auVar1187[0xf] = local_fc8[7];
      auVar1186._14_2_ = auVar1187._14_2_;
      auVar1186._0_13_ = local_fd8._0_13_;
      auVar1186[0xd] = local_fc8[6];
      auVar1185._13_3_ = auVar1186._13_3_;
      auVar1185._0_12_ = local_fd8._0_12_;
      auVar1185[0xc] = local_fd8[6];
      auVar1184._12_4_ = auVar1185._12_4_;
      auVar1184._0_11_ = local_fd8._0_11_;
      auVar1184[0xb] = local_fc8[5];
      auVar1183._11_5_ = auVar1184._11_5_;
      auVar1183._0_10_ = local_fd8._0_10_;
      auVar1183[10] = local_fd8[5];
      auVar1182._10_6_ = auVar1183._10_6_;
      auVar1182._0_9_ = local_fd8._0_9_;
      auVar1182[9] = local_fc8[4];
      auVar1181._9_7_ = auVar1182._9_7_;
      auVar1181._0_8_ = local_fd8._0_8_;
      auVar1181[8] = local_fd8[4];
      Var42 = CONCAT91(CONCAT81(auVar1181._8_8_,local_fc8[3]),local_fd8[3]);
      auVar53._2_10_ = Var42;
      auVar53[1] = local_fc8[2];
      auVar53[0] = local_fd8[2];
      auVar533._0_14_ = local_fb8._0_14_;
      auVar533[0xe] = local_fb8[7];
      auVar533[0xf] = local_fa8[7];
      auVar532._14_2_ = auVar533._14_2_;
      auVar532._0_13_ = local_fb8._0_13_;
      auVar532[0xd] = local_fa8[6];
      auVar531._13_3_ = auVar532._13_3_;
      auVar531._0_12_ = local_fb8._0_12_;
      auVar531[0xc] = local_fb8[6];
      auVar530._12_4_ = auVar531._12_4_;
      auVar530._0_11_ = local_fb8._0_11_;
      auVar530[0xb] = local_fa8[5];
      auVar529._11_5_ = auVar530._11_5_;
      auVar529._0_10_ = local_fb8._0_10_;
      auVar529[10] = local_fb8[5];
      auVar528._10_6_ = auVar529._10_6_;
      auVar528._0_9_ = local_fb8._0_9_;
      auVar528[9] = local_fa8[4];
      auVar527._9_7_ = auVar528._9_7_;
      auVar527._0_8_ = local_fb8._0_8_;
      auVar527[8] = local_fb8[4];
      Var55 = CONCAT91(CONCAT81(auVar527._8_8_,local_fa8[3]),local_fb8[3]);
      auVar54._2_10_ = Var55;
      auVar54[1] = local_fa8[2];
      auVar54[0] = local_fb8[2];
      auVar526._4_12_ = auVar54;
      auVar526[3] = local_fa8[1];
      auVar526[2] = local_fb8[1];
      auVar526._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1466._0_14_ = local_f98._0_14_;
      auVar1466[0xe] = local_f98[7];
      auVar1466[0xf] = local_f88[7];
      auVar1465._14_2_ = auVar1466._14_2_;
      auVar1465._0_13_ = local_f98._0_13_;
      auVar1465[0xd] = local_f88[6];
      auVar1464._13_3_ = auVar1465._13_3_;
      auVar1464._0_12_ = local_f98._0_12_;
      auVar1464[0xc] = local_f98[6];
      auVar1463._12_4_ = auVar1464._12_4_;
      auVar1463._0_11_ = local_f98._0_11_;
      auVar1463[0xb] = local_f88[5];
      auVar1462._11_5_ = auVar1463._11_5_;
      auVar1462._0_10_ = local_f98._0_10_;
      auVar1462[10] = local_f98[5];
      auVar1461._10_6_ = auVar1462._10_6_;
      auVar1461._0_9_ = local_f98._0_9_;
      auVar1461[9] = local_f88[4];
      auVar1460._9_7_ = auVar1461._9_7_;
      auVar1460._0_8_ = local_f98._0_8_;
      auVar1460[8] = local_f98[4];
      Var57 = CONCAT91(CONCAT81(auVar1460._8_8_,local_f88[3]),local_f98[3]);
      auVar56._2_10_ = Var57;
      auVar56[1] = local_f88[2];
      auVar56[0] = local_f98[2];
      auVar1350._0_14_ = local_f78._0_14_;
      auVar1350[0xe] = local_f78[7];
      auVar1350[0xf] = local_f68[7];
      auVar1349._14_2_ = auVar1350._14_2_;
      auVar1349._0_13_ = local_f78._0_13_;
      auVar1349[0xd] = local_f68[6];
      auVar1348._13_3_ = auVar1349._13_3_;
      auVar1348._0_12_ = local_f78._0_12_;
      auVar1348[0xc] = local_f78[6];
      auVar1347._12_4_ = auVar1348._12_4_;
      auVar1347._0_11_ = local_f78._0_11_;
      auVar1347[0xb] = local_f68[5];
      auVar1346._11_5_ = auVar1347._11_5_;
      auVar1346._0_10_ = local_f78._0_10_;
      auVar1346[10] = local_f78[5];
      auVar1345._10_6_ = auVar1346._10_6_;
      auVar1345._0_9_ = local_f78._0_9_;
      auVar1345[9] = local_f68[4];
      auVar1344._9_7_ = auVar1345._9_7_;
      auVar1344._0_8_ = local_f78._0_8_;
      auVar1344[8] = local_f78[4];
      Var59 = CONCAT91(CONCAT81(auVar1344._8_8_,local_f68[3]),local_f78[3]);
      auVar58._2_10_ = Var59;
      auVar58[1] = local_f68[2];
      auVar58[0] = local_f78[2];
      auVar1343._4_12_ = auVar58;
      auVar1343[3] = local_f68[1];
      auVar1343[2] = local_f78[1];
      auVar1343._0_2_ = CONCAT11(local_f68[0],local_f78[0]);
      auVar1516._0_14_ = local_f58._0_14_;
      auVar1516[0xe] = local_f58[7];
      auVar1516[0xf] = local_f48[0][7];
      auVar1515._14_2_ = auVar1516._14_2_;
      auVar1515._0_13_ = local_f58._0_13_;
      auVar1515[0xd] = local_f48[0][6];
      auVar1514._13_3_ = auVar1515._13_3_;
      auVar1514._0_12_ = local_f58._0_12_;
      auVar1514[0xc] = local_f58[6];
      auVar1513._12_4_ = auVar1514._12_4_;
      auVar1513._0_11_ = local_f58._0_11_;
      auVar1513[0xb] = local_f48[0][5];
      auVar1512._11_5_ = auVar1513._11_5_;
      auVar1512._0_10_ = local_f58._0_10_;
      auVar1512[10] = local_f58[5];
      auVar1511._10_6_ = auVar1512._10_6_;
      auVar1511._0_9_ = local_f58._0_9_;
      auVar1511[9] = local_f48[0][4];
      auVar1510._9_7_ = auVar1511._9_7_;
      auVar1510._0_8_ = local_f58._0_8_;
      auVar1510[8] = local_f58[4];
      Var61 = CONCAT91(CONCAT81(auVar1510._8_8_,local_f48[0][3]),local_f58[3]);
      auVar60._2_10_ = Var61;
      auVar60[1] = local_f48[0][2];
      auVar60[0] = local_f58[2];
      auVar1646._0_12_ = auVar320._0_12_;
      auVar1646._12_2_ = (short)Var18;
      auVar1646._14_2_ = (short)Var21;
      auVar1645._12_4_ = auVar1646._12_4_;
      auVar1645._0_10_ = auVar320._0_10_;
      auVar1645._10_2_ = auVar51._0_2_;
      auVar1644._10_6_ = auVar1645._10_6_;
      auVar1644._0_8_ = auVar320._0_8_;
      auVar1644._8_2_ = auVar50._0_2_;
      auVar1782._0_12_ = auVar798._0_12_;
      auVar1782._12_2_ = (short)Var39;
      auVar1782._14_2_ = (short)Var42;
      auVar1781._12_4_ = auVar1782._12_4_;
      auVar1781._0_10_ = auVar798._0_10_;
      auVar1781._10_2_ = auVar53._0_2_;
      auVar1780._10_6_ = auVar1781._10_6_;
      auVar1780._0_8_ = auVar798._0_8_;
      auVar1780._8_2_ = auVar52._0_2_;
      auVar1821._0_12_ = auVar526._0_12_;
      auVar1821._12_2_ = (short)Var55;
      auVar1821._14_2_ = (short)Var57;
      auVar1820._12_4_ = auVar1821._12_4_;
      auVar1820._0_10_ = auVar526._0_10_;
      auVar1820._10_2_ = auVar56._0_2_;
      auVar1819._10_6_ = auVar1820._10_6_;
      auVar1819._0_8_ = auVar526._0_8_;
      auVar1819._8_2_ = auVar54._0_2_;
      auVar1928._0_12_ = auVar1343._0_12_;
      auVar1928._12_2_ = (short)Var59;
      auVar1928._14_2_ = (short)Var61;
      auVar1927._12_4_ = auVar1928._12_4_;
      auVar1927._0_10_ = auVar1343._0_10_;
      auVar1927._10_2_ = auVar60._0_2_;
      auVar1926._10_6_ = auVar1927._10_6_;
      auVar1926._0_8_ = auVar1343._0_8_;
      auVar1926._8_2_ = auVar58._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar798._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar320._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11(local_f48[0][0],local_f58[0]),auVar1343._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar526._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1624 = local_ff8[1];
      uStack_1623 = local_fe8[1];
      uStack_1622 = local_fd8[1];
      uStack_1621 = local_fc8[1];
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68[1];
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48[0][1];
      local_1618 = auVar1644._8_4_;
      uStack_1614 = auVar1780._8_4_;
      uStack_1610 = auVar1819._8_4_;
      uStack_160c = auVar1926._8_4_;
      local_1608._8_4_ = auVar1645._12_4_;
      local_1608._12_4_ = auVar1781._12_4_;
      local_15f8._0_4_ = CONCAT22(auVar961._8_2_,auVar321._8_2_);
      auVar270._0_8_ = CONCAT26(auVar963._10_2_,CONCAT24(auVar323._10_2_,local_15f8._0_4_));
      auVar270._8_2_ = auVar325._12_2_;
      auVar270._10_2_ = auVar965._12_2_;
      auVar328._12_2_ = auVar326._14_2_;
      auVar328._0_12_ = auVar270;
      auVar328._14_2_ = auVar966._14_2_;
      local_15f8._4_4_ = CONCAT22(auVar1181._8_2_,auVar799._8_2_);
      auVar744._0_8_ = CONCAT26(auVar1183._10_2_,CONCAT24(auVar801._10_2_,local_15f8._4_4_));
      auVar744._8_2_ = auVar803._12_2_;
      auVar744._10_2_ = auVar1185._12_2_;
      auVar806._12_2_ = auVar804._14_2_;
      auVar806._0_12_ = auVar744;
      auVar806._14_2_ = auVar1186._14_2_;
      local_15f8._8_4_ = CONCAT22(auVar1460._8_2_,auVar527._8_2_);
      auVar464._0_8_ = CONCAT26(auVar1462._10_2_,CONCAT24(auVar529._10_2_,local_15f8._8_4_));
      auVar464._8_2_ = auVar531._12_2_;
      auVar464._10_2_ = auVar1464._12_2_;
      auVar534._12_2_ = auVar532._14_2_;
      auVar534._0_12_ = auVar464;
      auVar534._14_2_ = auVar1465._14_2_;
      local_15f8._12_4_ = CONCAT22(auVar1510._8_2_,auVar1344._8_2_);
      auVar1329._0_8_ = CONCAT26(auVar1512._10_2_,CONCAT24(auVar1346._10_2_,local_15f8._12_4_));
      auVar1329._8_2_ = auVar1348._12_2_;
      auVar1329._10_2_ = auVar1514._12_2_;
      auVar1351._12_2_ = auVar1349._14_2_;
      auVar1351._0_12_ = auVar1329;
      auVar1351._14_2_ = auVar1515._14_2_;
      auVar968._8_4_ = (int)((ulong)auVar270._0_8_ >> 0x20);
      auVar968._0_8_ = auVar270._0_8_;
      auVar968._12_4_ = (int)((ulong)auVar744._0_8_ >> 0x20);
      auVar807._8_4_ = (int)((ulong)auVar464._0_8_ >> 0x20);
      auVar807._0_8_ = auVar464._0_8_;
      auVar807._12_4_ = (int)((ulong)auVar1329._0_8_ >> 0x20);
      local_15e8._8_8_ = auVar807._8_8_;
      local_15e8._0_8_ = auVar968._8_8_;
      local_15d8._4_4_ = auVar744._8_4_;
      local_15d8._0_4_ = auVar270._8_4_;
      local_15d8._8_4_ = auVar464._8_4_;
      local_15d8._12_4_ = auVar1329._8_4_;
      auVar241._4_4_ = auVar806._12_4_;
      auVar241._0_4_ = auVar328._12_4_;
      auVar241._8_8_ = 0;
      local_15c8 = auVar241 << 0x40;
      local_15b8 = CONCAT44(auVar1351._12_4_,auVar534._12_4_);
      lVar252 = 0;
      do {
        uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar252);
        *(undefined8 *)(dst + 8) = uVar267;
        lVar252 = lVar252 + 0x10;
        dst = dst + stride;
      } while (lVar252 != 0x40);
      return;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar258 = 0xb << (bVar254 & 0x1f);
      auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
        uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
        lVar260 = lVar252;
        if ((int)uVar259 < 1) {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x80);
        }
        else {
          uVar255 = 4;
          if ((int)uVar259 < 4) {
            uVar255 = uVar259;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar262);
          if (upsample_left == 0) {
            auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
            auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1634._0_4_ = auVar1198._0_4_;
            auVar1634._4_4_ = auVar1634._0_4_;
            auVar1634._8_4_ = auVar1634._0_4_;
            auVar1634._12_4_ = auVar1634._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_004df790);
            auVar1517 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
            auVar1632._0_4_ = auVar1198._0_4_;
            auVar1632._4_4_ = auVar1632._0_4_;
            auVar1632._8_4_ = auVar1632._0_4_;
            auVar1632._12_4_ = auVar1632._0_4_;
            auVar1198 = psllw(auVar1632,ZEXT416((uint)upsample_left));
            auVar1633._0_2_ = auVar1198._0_2_ >> 1;
            auVar1633._2_2_ = auVar1198._2_2_ >> 1;
            auVar1633._4_2_ = auVar1198._4_2_ >> 1;
            auVar1633._6_2_ = auVar1198._6_2_ >> 1;
            auVar1633._8_2_ = auVar1198._8_2_ >> 1;
            auVar1633._10_2_ = auVar1198._10_2_ >> 1;
            auVar1633._12_2_ = auVar1198._12_2_ >> 1;
            auVar1633._14_2_ = auVar1198._14_2_ >> 1;
            auVar1634 = auVar1633 & auVar338;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1525 = pmovzxbw(in_XMM10,auVar1517);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1634._0_2_;
          in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1634._2_2_;
          in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1634._4_2_;
          in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1634._6_2_;
          in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1634._8_2_;
          in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1634._10_2_;
          in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1634._12_2_;
          in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1634._14_2_;
          uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
          auVar287._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar287[2] = auVar1356[9];
          auVar287[3] = 0;
          auVar287[4] = auVar1356[10];
          auVar287[5] = 0;
          auVar287[6] = auVar1356[0xb];
          auVar287[7] = 0;
          auVar287[8] = auVar1356[0xc];
          auVar287[9] = 0;
          auVar287[10] = auVar1356[0xd];
          auVar287[0xb] = 0;
          auVar287[0xc] = auVar1356[0xe];
          auVar287[0xd] = 0;
          auVar287[0xe] = auVar1356[0xf];
          auVar287[0xf] = 0;
          auVar1198 = psllw(auVar287,5);
          uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                             (auVar1517[8] - auVar287._0_2_) * auVar1634._0_2_) >> 5;
          uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                             ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1634._2_2_) >> 5;
          uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                             ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1634._4_2_) >> 5
          ;
          uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                             ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1634._6_2_) >>
                     5;
          uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                             ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1634._8_2_) >>
                     5;
          uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                             ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1634._10_2_)
                     >> 5;
          uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                             ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1634._12_2_)
                     >> 5;
          uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                             ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1634._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
          in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
          in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
          in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
          in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
          in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
          in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
          in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
          in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323);
          in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324);
          in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325);
          in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326);
          in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327);
          auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        if ((int)uVar259 < 1) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 8);
      auVar295._0_14_ = local_1038._0_14_;
      auVar295[0xe] = local_1038[7];
      auVar295[0xf] = local_1028[7];
      auVar294._14_2_ = auVar295._14_2_;
      auVar294._0_13_ = local_1038._0_13_;
      auVar294[0xd] = local_1028[6];
      auVar293._13_3_ = auVar294._13_3_;
      auVar293._0_12_ = local_1038._0_12_;
      auVar293[0xc] = local_1038[6];
      auVar292._12_4_ = auVar293._12_4_;
      auVar292._0_11_ = local_1038._0_11_;
      auVar292[0xb] = local_1028[5];
      auVar291._11_5_ = auVar292._11_5_;
      auVar291._0_10_ = local_1038._0_10_;
      auVar291[10] = local_1038[5];
      auVar290._10_6_ = auVar291._10_6_;
      auVar290._0_9_ = local_1038._0_9_;
      auVar290[9] = local_1028[4];
      auVar289._9_7_ = auVar290._9_7_;
      auVar289._0_8_ = local_1038._0_8_;
      auVar289[8] = local_1038[4];
      Var18 = CONCAT91(CONCAT81(auVar289._8_8_,local_1028[3]),local_1038[3]);
      auVar24._2_10_ = Var18;
      auVar24[1] = local_1028[2];
      auVar24[0] = local_1038[2];
      auVar23._2_12_ = auVar24;
      auVar23[1] = local_1028[1];
      auVar23[0] = local_1038[1];
      uVar2278 = CONCAT11(local_1028[0],local_1038[0]);
      auVar288._2_14_ = auVar23;
      auVar515._0_14_ = local_1018._0_14_;
      auVar515[0xe] = local_1018[7];
      auVar515[0xf] = local_1008[7];
      auVar514._14_2_ = auVar515._14_2_;
      auVar514._0_13_ = local_1018._0_13_;
      auVar514[0xd] = local_1008[6];
      auVar513._13_3_ = auVar514._13_3_;
      auVar513._0_12_ = local_1018._0_12_;
      auVar513[0xc] = local_1018[6];
      auVar512._12_4_ = auVar513._12_4_;
      auVar512._0_11_ = local_1018._0_11_;
      auVar512[0xb] = local_1008[5];
      auVar511._11_5_ = auVar512._11_5_;
      auVar511._0_10_ = local_1018._0_10_;
      auVar511[10] = local_1018[5];
      auVar510._10_6_ = auVar511._10_6_;
      auVar510._0_9_ = local_1018._0_9_;
      auVar510[9] = local_1008[4];
      auVar509._9_7_ = auVar510._9_7_;
      auVar509._0_8_ = local_1018._0_8_;
      auVar509[8] = local_1018[4];
      Var21 = CONCAT91(CONCAT81(auVar509._8_8_,local_1008[3]),local_1018[3]);
      auVar26._2_10_ = Var21;
      auVar26[1] = local_1008[2];
      auVar26[0] = local_1018[2];
      auVar25._2_12_ = auVar26;
      auVar25[1] = local_1008[1];
      auVar25[0] = local_1018[1];
      auVar299._0_12_ = auVar288._0_12_;
      auVar299._12_2_ = (short)Var18;
      auVar299._14_2_ = (short)Var21;
      auVar298._12_4_ = auVar299._12_4_;
      auVar298._0_10_ = auVar288._0_10_;
      auVar298._10_2_ = auVar26._0_2_;
      auVar297._10_6_ = auVar298._10_6_;
      auVar297._0_8_ = auVar288._0_8_;
      auVar297._8_2_ = auVar24._0_2_;
      auVar27._4_8_ = auVar297._8_8_;
      auVar27._2_2_ = auVar25._0_2_;
      auVar27._0_2_ = auVar23._0_2_;
      auVar296._0_4_ = CONCAT22(CONCAT11(local_1008[0],local_1018[0]),uVar2278);
      auVar296._4_12_ = auVar27;
      auVar782._0_14_ = local_ff8._0_14_;
      auVar782[0xe] = local_ff8[7];
      auVar782[0xf] = local_fe8[7];
      auVar781._14_2_ = auVar782._14_2_;
      auVar781._0_13_ = local_ff8._0_13_;
      auVar781[0xd] = local_fe8[6];
      auVar780._13_3_ = auVar781._13_3_;
      auVar780._0_12_ = local_ff8._0_12_;
      auVar780[0xc] = local_ff8[6];
      auVar779._12_4_ = auVar780._12_4_;
      auVar779._0_11_ = local_ff8._0_11_;
      auVar779[0xb] = local_fe8[5];
      auVar778._11_5_ = auVar779._11_5_;
      auVar778._0_10_ = local_ff8._0_10_;
      auVar778[10] = local_ff8[5];
      auVar777._10_6_ = auVar778._10_6_;
      auVar777._0_9_ = local_ff8._0_9_;
      auVar777[9] = local_fe8[4];
      auVar776._9_7_ = auVar777._9_7_;
      auVar776._0_8_ = local_ff8._0_8_;
      auVar776[8] = local_ff8[4];
      Var18 = CONCAT91(CONCAT81(auVar776._8_8_,local_fe8[3]),local_ff8[3]);
      auVar29._2_10_ = Var18;
      auVar29[1] = local_fe8[2];
      auVar29[0] = local_ff8[2];
      auVar28._2_12_ = auVar29;
      auVar28[1] = local_fe8[1];
      auVar28[0] = local_ff8[1];
      uVar2280 = CONCAT11(local_fe8[0],local_ff8[0]);
      auVar775._2_14_ = auVar28;
      auVar952._0_14_ = local_fd8._0_14_;
      auVar952[0xe] = local_fd8[7];
      auVar952[0xf] = local_fc8[7];
      auVar951._14_2_ = auVar952._14_2_;
      auVar951._0_13_ = local_fd8._0_13_;
      auVar951[0xd] = local_fc8[6];
      auVar950._13_3_ = auVar951._13_3_;
      auVar950._0_12_ = local_fd8._0_12_;
      auVar950[0xc] = local_fd8[6];
      auVar949._12_4_ = auVar950._12_4_;
      auVar949._0_11_ = local_fd8._0_11_;
      auVar949[0xb] = local_fc8[5];
      auVar948._11_5_ = auVar949._11_5_;
      auVar948._0_10_ = local_fd8._0_10_;
      auVar948[10] = local_fd8[5];
      auVar947._10_6_ = auVar948._10_6_;
      auVar947._0_9_ = local_fd8._0_9_;
      auVar947[9] = local_fc8[4];
      auVar946._9_7_ = auVar947._9_7_;
      auVar946._0_8_ = local_fd8._0_8_;
      auVar946[8] = local_fd8[4];
      Var21 = CONCAT91(CONCAT81(auVar946._8_8_,local_fc8[3]),local_fd8[3]);
      auVar31._2_10_ = Var21;
      auVar31[1] = local_fc8[2];
      auVar31[0] = local_fd8[2];
      auVar30._2_12_ = auVar31;
      auVar30[1] = local_fc8[1];
      auVar30[0] = local_fd8[1];
      auVar785._0_12_ = auVar775._0_12_;
      auVar785._12_2_ = (short)Var18;
      auVar785._14_2_ = (short)Var21;
      auVar784._12_4_ = auVar785._12_4_;
      auVar784._0_10_ = auVar775._0_10_;
      auVar784._10_2_ = auVar31._0_2_;
      auVar783._10_6_ = auVar784._10_6_;
      auVar783._0_8_ = auVar775._0_8_;
      auVar783._8_2_ = auVar29._0_2_;
      auVar32._4_8_ = auVar783._8_8_;
      auVar32._2_2_ = auVar30._0_2_;
      auVar32._0_2_ = auVar28._0_2_;
      auVar516._0_8_ = auVar296._0_8_;
      auVar516._8_4_ = auVar27._0_4_;
      auVar516._12_4_ = auVar32._0_4_;
      *(ulong *)dst =
           CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),uVar2280),auVar296._0_4_);
      *(long *)(dst + stride) = auVar516._8_8_;
      *(int *)(dst + stride * 2) = auVar297._8_4_;
      *(int *)(dst + stride * 2 + 4) = auVar783._8_4_;
      lVar252 = stride * 3;
      goto LAB_002267ef;
    case 1:
      iVar258 = 0x17 << (bVar254 & 0x1f);
      auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
        uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
        lVar260 = lVar252;
        if ((int)uVar259 < 1) {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x100);
        }
        else {
          uVar255 = 8;
          if ((int)uVar259 < 8) {
            uVar255 = uVar259;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar262);
          if (upsample_left == 0) {
            auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
            auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1746._0_4_ = auVar1198._0_4_;
            auVar1746._4_4_ = auVar1746._0_4_;
            auVar1746._8_4_ = auVar1746._0_4_;
            auVar1746._12_4_ = auVar1746._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_004df790);
            auVar1517 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
            auVar1744._0_4_ = auVar1198._0_4_;
            auVar1744._4_4_ = auVar1744._0_4_;
            auVar1744._8_4_ = auVar1744._0_4_;
            auVar1744._12_4_ = auVar1744._0_4_;
            auVar1198 = psllw(auVar1744,ZEXT416((uint)upsample_left));
            auVar1745._0_2_ = auVar1198._0_2_ >> 1;
            auVar1745._2_2_ = auVar1198._2_2_ >> 1;
            auVar1745._4_2_ = auVar1198._4_2_ >> 1;
            auVar1745._6_2_ = auVar1198._6_2_ >> 1;
            auVar1745._8_2_ = auVar1198._8_2_ >> 1;
            auVar1745._10_2_ = auVar1198._10_2_ >> 1;
            auVar1745._12_2_ = auVar1198._12_2_ >> 1;
            auVar1745._14_2_ = auVar1198._14_2_ >> 1;
            auVar1746 = auVar1745 & auVar338;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1525 = pmovzxbw(in_XMM10,auVar1517);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1746._0_2_;
          in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1746._2_2_;
          in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1746._4_2_;
          in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1746._6_2_;
          in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1746._8_2_;
          in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1746._10_2_;
          in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1746._12_2_;
          in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1746._14_2_;
          uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
          auVar447._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar447[2] = auVar1356[9];
          auVar447[3] = 0;
          auVar447[4] = auVar1356[10];
          auVar447[5] = 0;
          auVar447[6] = auVar1356[0xb];
          auVar447[7] = 0;
          auVar447[8] = auVar1356[0xc];
          auVar447[9] = 0;
          auVar447[10] = auVar1356[0xd];
          auVar447[0xb] = 0;
          auVar447[0xc] = auVar1356[0xe];
          auVar447[0xd] = 0;
          auVar447[0xe] = auVar1356[0xf];
          auVar447[0xf] = 0;
          auVar1198 = psllw(auVar447,5);
          uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                             (auVar1517[8] - auVar447._0_2_) * auVar1746._0_2_) >> 5;
          uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                             ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1746._2_2_) >> 5;
          uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                             ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1746._4_2_) >> 5
          ;
          uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                             ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1746._6_2_) >>
                     5;
          uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                             ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1746._8_2_) >>
                     5;
          uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                             ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1746._10_2_)
                     >> 5;
          uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                             ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1746._12_2_)
                     >> 5;
          uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                             ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1746._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
          in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
          in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
          in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
          in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
          in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
          in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
          in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
          in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323);
          in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324);
          in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325);
          in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326);
          in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327);
          auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        if ((int)uVar259 < 1) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 0x10);
      auVar455._0_14_ = local_1038._0_14_;
      auVar455[0xe] = local_1038[7];
      auVar455[0xf] = local_1028[7];
      auVar454._14_2_ = auVar455._14_2_;
      auVar454._0_13_ = local_1038._0_13_;
      auVar454[0xd] = local_1028[6];
      auVar453._13_3_ = auVar454._13_3_;
      auVar453._0_12_ = local_1038._0_12_;
      auVar453[0xc] = local_1038[6];
      auVar452._12_4_ = auVar453._12_4_;
      auVar452._0_11_ = local_1038._0_11_;
      auVar452[0xb] = local_1028[5];
      auVar451._11_5_ = auVar452._11_5_;
      auVar451._0_10_ = local_1038._0_10_;
      auVar451[10] = local_1038[5];
      auVar450._10_6_ = auVar451._10_6_;
      auVar450._0_9_ = local_1038._0_9_;
      auVar450[9] = local_1028[4];
      auVar449._9_7_ = auVar450._9_7_;
      auVar449._0_8_ = local_1038._0_8_;
      auVar449[8] = local_1038[4];
      Var18 = CONCAT91(CONCAT81(auVar449._8_8_,local_1028[3]),local_1038[3]);
      auVar233._2_10_ = Var18;
      auVar233[1] = local_1028[2];
      auVar233[0] = local_1038[2];
      auVar448._4_12_ = auVar233;
      auVar448[3] = local_1028[1];
      auVar448[2] = local_1038[1];
      auVar448._0_2_ = CONCAT11(local_1028[0],local_1038[0]);
      auVar1141._0_14_ = local_1018._0_14_;
      auVar1141[0xe] = local_1018[7];
      auVar1141[0xf] = local_1008[7];
      auVar1140._14_2_ = auVar1141._14_2_;
      auVar1140._0_13_ = local_1018._0_13_;
      auVar1140[0xd] = local_1008[6];
      auVar1139._13_3_ = auVar1140._13_3_;
      auVar1139._0_12_ = local_1018._0_12_;
      auVar1139[0xc] = local_1018[6];
      auVar1138._12_4_ = auVar1139._12_4_;
      auVar1138._0_11_ = local_1018._0_11_;
      auVar1138[0xb] = local_1008[5];
      auVar1137._11_5_ = auVar1138._11_5_;
      auVar1137._0_10_ = local_1018._0_10_;
      auVar1137[10] = local_1018[5];
      auVar1136._10_6_ = auVar1137._10_6_;
      auVar1136._0_9_ = local_1018._0_9_;
      auVar1136[9] = local_1008[4];
      auVar1135._9_7_ = auVar1136._9_7_;
      auVar1135._0_8_ = local_1018._0_8_;
      auVar1135[8] = local_1018[4];
      Var21 = CONCAT91(CONCAT81(auVar1135._8_8_,local_1008[3]),local_1018[3]);
      auVar234._2_10_ = Var21;
      auVar234[1] = local_1008[2];
      auVar234[0] = local_1018[2];
      auVar904._0_14_ = local_ff8._0_14_;
      auVar904[0xe] = local_ff8[7];
      auVar904[0xf] = local_fe8[7];
      auVar903._14_2_ = auVar904._14_2_;
      auVar903._0_13_ = local_ff8._0_13_;
      auVar903[0xd] = local_fe8[6];
      auVar902._13_3_ = auVar903._13_3_;
      auVar902._0_12_ = local_ff8._0_12_;
      auVar902[0xc] = local_ff8[6];
      auVar901._12_4_ = auVar902._12_4_;
      auVar901._0_11_ = local_ff8._0_11_;
      auVar901[0xb] = local_fe8[5];
      auVar900._11_5_ = auVar901._11_5_;
      auVar900._0_10_ = local_ff8._0_10_;
      auVar900[10] = local_ff8[5];
      auVar899._10_6_ = auVar900._10_6_;
      auVar899._0_9_ = local_ff8._0_9_;
      auVar899[9] = local_fe8[4];
      auVar898._9_7_ = auVar899._9_7_;
      auVar898._0_8_ = local_ff8._0_8_;
      auVar898[8] = local_ff8[4];
      Var39 = CONCAT91(CONCAT81(auVar898._8_8_,local_fe8[3]),local_ff8[3]);
      auVar235._2_10_ = Var39;
      auVar235[1] = local_fe8[2];
      auVar235[0] = local_ff8[2];
      auVar897._4_12_ = auVar235;
      auVar897[3] = local_fe8[1];
      auVar897[2] = local_ff8[1];
      auVar897._0_2_ = CONCAT11(local_fe8[0],local_ff8[0]);
      auVar1320._0_14_ = local_fd8._0_14_;
      auVar1320[0xe] = local_fd8[7];
      auVar1320[0xf] = local_fc8[7];
      auVar1319._14_2_ = auVar1320._14_2_;
      auVar1319._0_13_ = local_fd8._0_13_;
      auVar1319[0xd] = local_fc8[6];
      auVar1318._13_3_ = auVar1319._13_3_;
      auVar1318._0_12_ = local_fd8._0_12_;
      auVar1318[0xc] = local_fd8[6];
      auVar1317._12_4_ = auVar1318._12_4_;
      auVar1317._0_11_ = local_fd8._0_11_;
      auVar1317[0xb] = local_fc8[5];
      auVar1316._11_5_ = auVar1317._11_5_;
      auVar1316._0_10_ = local_fd8._0_10_;
      auVar1316[10] = local_fd8[5];
      auVar1315._10_6_ = auVar1316._10_6_;
      auVar1315._0_9_ = local_fd8._0_9_;
      auVar1315[9] = local_fc8[4];
      auVar1314._9_7_ = auVar1315._9_7_;
      auVar1314._0_8_ = local_fd8._0_8_;
      auVar1314[8] = local_fd8[4];
      Var42 = CONCAT91(CONCAT81(auVar1314._8_8_,local_fc8[3]),local_fd8[3]);
      auVar236._2_10_ = Var42;
      auVar236[1] = local_fc8[2];
      auVar236[0] = local_fd8[2];
      auVar738._0_14_ = local_fb8._0_14_;
      auVar738[0xe] = local_fb8[7];
      auVar738[0xf] = local_fa8[7];
      auVar737._14_2_ = auVar738._14_2_;
      auVar737._0_13_ = local_fb8._0_13_;
      auVar737[0xd] = local_fa8[6];
      auVar736._13_3_ = auVar737._13_3_;
      auVar736._0_12_ = local_fb8._0_12_;
      auVar736[0xc] = local_fb8[6];
      auVar735._12_4_ = auVar736._12_4_;
      auVar735._0_11_ = local_fb8._0_11_;
      auVar735[0xb] = local_fa8[5];
      auVar734._11_5_ = auVar735._11_5_;
      auVar734._0_10_ = local_fb8._0_10_;
      auVar734[10] = local_fb8[5];
      auVar733._10_6_ = auVar734._10_6_;
      auVar733._0_9_ = local_fb8._0_9_;
      auVar733[9] = local_fa8[4];
      auVar732._9_7_ = auVar733._9_7_;
      auVar732._0_8_ = local_fb8._0_8_;
      auVar732[8] = local_fb8[4];
      Var55 = CONCAT91(CONCAT81(auVar732._8_8_,local_fa8[3]),local_fb8[3]);
      auVar237._2_10_ = Var55;
      auVar237[1] = local_fa8[2];
      auVar237[0] = local_fb8[2];
      auVar731._4_12_ = auVar237;
      auVar731[3] = local_fa8[1];
      auVar731[2] = local_fb8[1];
      auVar731._0_2_ = CONCAT11(local_fa8[0],local_fb8[0]);
      auVar1508._0_14_ = local_f98._0_14_;
      auVar1508[0xe] = local_f98[7];
      auVar1508[0xf] = local_f88[7];
      auVar1507._14_2_ = auVar1508._14_2_;
      auVar1507._0_13_ = local_f98._0_13_;
      auVar1507[0xd] = local_f88[6];
      auVar1506._13_3_ = auVar1507._13_3_;
      auVar1506._0_12_ = local_f98._0_12_;
      auVar1506[0xc] = local_f98[6];
      auVar1505._12_4_ = auVar1506._12_4_;
      auVar1505._0_11_ = local_f98._0_11_;
      auVar1505[0xb] = local_f88[5];
      auVar1504._11_5_ = auVar1505._11_5_;
      auVar1504._0_10_ = local_f98._0_10_;
      auVar1504[10] = local_f98[5];
      auVar1503._10_6_ = auVar1504._10_6_;
      auVar1503._0_9_ = local_f98._0_9_;
      auVar1503[9] = local_f88[4];
      auVar1502._9_7_ = auVar1503._9_7_;
      auVar1502._0_8_ = local_f98._0_8_;
      auVar1502[8] = local_f98[4];
      Var57 = CONCAT91(CONCAT81(auVar1502._8_8_,local_f88[3]),local_f98[3]);
      auVar238._2_10_ = Var57;
      auVar238[1] = local_f88[2];
      auVar238[0] = local_f98[2];
      auVar1417._0_14_ = local_f78._0_14_;
      auVar1417[0xe] = local_f78[7];
      auVar1417[0xf] = local_f68[7];
      auVar1416._14_2_ = auVar1417._14_2_;
      auVar1416._0_13_ = local_f78._0_13_;
      auVar1416[0xd] = local_f68[6];
      auVar1415._13_3_ = auVar1416._13_3_;
      auVar1415._0_12_ = local_f78._0_12_;
      auVar1415[0xc] = local_f78[6];
      auVar1414._12_4_ = auVar1415._12_4_;
      auVar1414._0_11_ = local_f78._0_11_;
      auVar1414[0xb] = local_f68[5];
      auVar1413._11_5_ = auVar1414._11_5_;
      auVar1413._0_10_ = local_f78._0_10_;
      auVar1413[10] = local_f78[5];
      auVar1412._10_6_ = auVar1413._10_6_;
      auVar1412._0_9_ = local_f78._0_9_;
      auVar1412[9] = local_f68[4];
      auVar1411._9_7_ = auVar1412._9_7_;
      auVar1411._0_8_ = local_f78._0_8_;
      auVar1411[8] = local_f78[4];
      Var59 = CONCAT91(CONCAT81(auVar1411._8_8_,local_f68[3]),local_f78[3]);
      auVar239._2_10_ = Var59;
      auVar239[1] = local_f68[2];
      auVar239[0] = local_f78[2];
      auVar1410._4_12_ = auVar239;
      auVar1410[3] = local_f68[1];
      auVar1410[2] = local_f78[1];
      auVar1410._0_2_ = CONCAT11(local_f68[0],local_f78[0]);
      auVar1619._0_14_ = local_f58._0_14_;
      auVar1619[0xe] = local_f58[7];
      auVar1619[0xf] = local_f48[0][7];
      auVar1618._14_2_ = auVar1619._14_2_;
      auVar1618._0_13_ = local_f58._0_13_;
      auVar1618[0xd] = local_f48[0][6];
      auVar1617._13_3_ = auVar1618._13_3_;
      auVar1617._0_12_ = local_f58._0_12_;
      auVar1617[0xc] = local_f58[6];
      auVar1616._12_4_ = auVar1617._12_4_;
      auVar1616._0_11_ = local_f58._0_11_;
      auVar1616[0xb] = local_f48[0][5];
      auVar1615._11_5_ = auVar1616._11_5_;
      auVar1615._0_10_ = local_f58._0_10_;
      auVar1615[10] = local_f58[5];
      auVar1614._10_6_ = auVar1615._10_6_;
      auVar1614._0_9_ = local_f58._0_9_;
      auVar1614[9] = local_f48[0][4];
      auVar1613._9_7_ = auVar1614._9_7_;
      auVar1613._0_8_ = local_f58._0_8_;
      auVar1613[8] = local_f58[4];
      Var61 = CONCAT91(CONCAT81(auVar1613._8_8_,local_f48[0][3]),local_f58[3]);
      auVar240._2_10_ = Var61;
      auVar240[1] = local_f48[0][2];
      auVar240[0] = local_f58[2];
      auVar1749._0_12_ = auVar448._0_12_;
      auVar1749._12_2_ = (short)Var18;
      auVar1749._14_2_ = (short)Var21;
      auVar1748._12_4_ = auVar1749._12_4_;
      auVar1748._0_10_ = auVar448._0_10_;
      auVar1748._10_2_ = auVar234._0_2_;
      auVar1747._10_6_ = auVar1748._10_6_;
      auVar1747._0_8_ = auVar448._0_8_;
      auVar1747._8_2_ = auVar233._0_2_;
      auVar1817._0_12_ = auVar897._0_12_;
      auVar1817._12_2_ = (short)Var39;
      auVar1817._14_2_ = (short)Var42;
      auVar1816._12_4_ = auVar1817._12_4_;
      auVar1816._0_10_ = auVar897._0_10_;
      auVar1816._10_2_ = auVar236._0_2_;
      auVar1815._10_6_ = auVar1816._10_6_;
      auVar1815._0_8_ = auVar897._0_8_;
      auVar1815._8_2_ = auVar235._0_2_;
      auVar1904._0_12_ = auVar731._0_12_;
      auVar1904._12_2_ = (short)Var55;
      auVar1904._14_2_ = (short)Var57;
      auVar1903._12_4_ = auVar1904._12_4_;
      auVar1903._0_10_ = auVar731._0_10_;
      auVar1903._10_2_ = auVar238._0_2_;
      auVar1902._10_6_ = auVar1903._10_6_;
      auVar1902._0_8_ = auVar731._0_8_;
      auVar1902._8_2_ = auVar237._0_2_;
      auVar1986._0_12_ = auVar1410._0_12_;
      auVar1986._12_2_ = (short)Var59;
      auVar1986._14_2_ = (short)Var61;
      auVar1985._12_4_ = auVar1986._12_4_;
      auVar1985._0_10_ = auVar1410._0_10_;
      auVar1985._10_2_ = auVar240._0_2_;
      auVar1984._10_6_ = auVar1985._10_6_;
      auVar1984._0_8_ = auVar1410._0_8_;
      auVar1984._8_2_ = auVar239._0_2_;
      local_1638[0] =
           CONCAT44(CONCAT22(CONCAT11(local_fc8[0],local_fd8[0]),auVar897._0_2_),
                    CONCAT22(CONCAT11(local_1008[0],local_1018[0]),auVar448._0_2_));
      local_1638[1] =
           CONCAT44(CONCAT22(CONCAT11(local_f48[0][0],local_f58[0]),auVar1410._0_2_),
                    CONCAT22(CONCAT11(local_f88[0],local_f98[0]),auVar731._0_2_));
      local_1628 = local_1038[1];
      uStack_1627 = local_1028[1];
      uStack_1626 = local_1018[1];
      uStack_1625 = local_1008[1];
      uStack_1624 = local_ff8[1];
      uStack_1623 = local_fe8[1];
      uStack_1622 = local_fd8[1];
      uStack_1621 = local_fc8[1];
      uStack_1620 = local_fb8[1];
      uStack_161f = local_fa8[1];
      uStack_161e = local_f98[1];
      uStack_161d = local_f88[1];
      uStack_161c = local_f78[1];
      uStack_161b = local_f68[1];
      uStack_161a = local_f58[1];
      uStack_1619 = local_f48[0][1];
      local_1618 = auVar1747._8_4_;
      uStack_1614 = auVar1815._8_4_;
      uStack_1610 = auVar1902._8_4_;
      uStack_160c = auVar1984._8_4_;
      local_1608._8_4_ = auVar1748._12_4_;
      local_1608._12_4_ = auVar1816._12_4_;
      local_15f8._0_4_ = CONCAT22(auVar1135._8_2_,auVar449._8_2_);
      auVar276._0_8_ = CONCAT26(auVar1137._10_2_,CONCAT24(auVar451._10_2_,local_15f8._0_4_));
      auVar276._8_2_ = auVar453._12_2_;
      auVar276._10_2_ = auVar1139._12_2_;
      auVar456._12_2_ = auVar454._14_2_;
      auVar456._0_12_ = auVar276;
      auVar456._14_2_ = auVar1140._14_2_;
      local_15f8._4_4_ = CONCAT22(auVar1314._8_2_,auVar898._8_2_);
      auVar760._0_8_ = CONCAT26(auVar1316._10_2_,CONCAT24(auVar900._10_2_,local_15f8._4_4_));
      auVar760._8_2_ = auVar902._12_2_;
      auVar760._10_2_ = auVar1318._12_2_;
      auVar905._12_2_ = auVar903._14_2_;
      auVar905._0_12_ = auVar760;
      auVar905._14_2_ = auVar1319._14_2_;
      local_15f8._8_4_ = CONCAT22(auVar1502._8_2_,auVar732._8_2_);
      auVar489._0_8_ = CONCAT26(auVar1504._10_2_,CONCAT24(auVar734._10_2_,local_15f8._8_4_));
      auVar489._8_2_ = auVar736._12_2_;
      auVar489._10_2_ = auVar1506._12_2_;
      auVar739._12_2_ = auVar737._14_2_;
      auVar739._0_12_ = auVar489;
      auVar739._14_2_ = auVar1507._14_2_;
      local_15f8._12_4_ = CONCAT22(auVar1613._8_2_,auVar1411._8_2_);
      auVar1331._0_8_ = CONCAT26(auVar1615._10_2_,CONCAT24(auVar1413._10_2_,local_15f8._12_4_));
      auVar1331._8_2_ = auVar1415._12_2_;
      auVar1331._10_2_ = auVar1617._12_2_;
      auVar1418._12_2_ = auVar1416._14_2_;
      auVar1418._0_12_ = auVar1331;
      auVar1418._14_2_ = auVar1618._14_2_;
      auVar1142._8_4_ = (int)((ulong)auVar276._0_8_ >> 0x20);
      auVar1142._0_8_ = auVar276._0_8_;
      auVar1142._12_4_ = (int)((ulong)auVar760._0_8_ >> 0x20);
      auVar906._8_4_ = (int)((ulong)auVar489._0_8_ >> 0x20);
      auVar906._0_8_ = auVar489._0_8_;
      auVar906._12_4_ = (int)((ulong)auVar1331._0_8_ >> 0x20);
      local_15e8._8_8_ = auVar906._8_8_;
      local_15e8._0_8_ = auVar1142._8_8_;
      local_15d8._4_4_ = auVar760._8_4_;
      local_15d8._0_4_ = auVar276._8_4_;
      local_15d8._8_4_ = auVar489._8_4_;
      local_15d8._12_4_ = auVar1331._8_4_;
      local_15c8._8_4_ = auVar456._12_4_;
      local_15c8._12_4_ = auVar905._12_4_;
      local_15b8 = CONCAT44(auVar1418._12_4_,auVar739._12_4_);
      lVar252 = 0;
      do {
        uVar267 = *(undefined8 *)((long)local_1638 + lVar252 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)local_1638 + lVar252);
        *(undefined8 *)(dst + 8) = uVar267;
        lVar252 = lVar252 + 0x10;
        dst = dst + stride;
      } while (lVar252 != 0x80);
      break;
    case 3:
      iVar258 = 0x2f << (bVar254 & 0x1f);
      auVar551 = pshufb(ZEXT116(left[iVar258]),(undefined1  [16])0x0);
      lVar252 = 0;
      auVar984 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar338 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      lVar256 = 0;
      uVar257 = dy;
      do {
        iVar262 = (int)uVar257 >> (6 - bVar254 & 0x1f);
        uVar259 = iVar258 - iVar262 >> (bVar254 & 0x1f);
        lVar260 = lVar252;
        if ((int)uVar259 < 1) {
          do {
            *(undefined1 (*) [16])(local_1038 + lVar260) = auVar551;
            lVar260 = lVar260 + 0x10;
          } while (lVar260 != 0x200);
        }
        else {
          uVar255 = 0x10;
          if ((int)uVar259 < 0x10) {
            uVar255 = uVar259;
          }
          auVar1356 = *(undefined1 (*) [16])(left + iVar262);
          if (upsample_left == 0) {
            auVar1517 = *(undefined1 (*) [16])(left + (long)iVar262 + 1);
            auVar1198 = ZEXT416(uVar257 >> 1 & 0x1f);
            auVar1198 = pshuflw(auVar1198,auVar1198,0);
            auVar1729._0_4_ = auVar1198._0_4_;
            auVar1729._4_4_ = auVar1729._0_4_;
            auVar1729._8_4_ = auVar1729._0_4_;
            auVar1729._12_4_ = auVar1729._0_4_;
          }
          else {
            auVar1356 = pshufb(auVar1356,_DAT_004df790);
            auVar1517 = auVar1356 >> 0x40;
            auVar1198 = pshuflw(ZEXT416(uVar257),ZEXT416(uVar257),0);
            auVar1727._0_4_ = auVar1198._0_4_;
            auVar1727._4_4_ = auVar1727._0_4_;
            auVar1727._8_4_ = auVar1727._0_4_;
            auVar1727._12_4_ = auVar1727._0_4_;
            auVar1198 = psllw(auVar1727,ZEXT416((uint)upsample_left));
            auVar1728._0_2_ = auVar1198._0_2_ >> 1;
            auVar1728._2_2_ = auVar1198._2_2_ >> 1;
            auVar1728._4_2_ = auVar1198._4_2_ >> 1;
            auVar1728._6_2_ = auVar1198._6_2_ >> 1;
            auVar1728._8_2_ = auVar1198._8_2_ >> 1;
            auVar1728._10_2_ = auVar1198._10_2_ >> 1;
            auVar1728._12_2_ = auVar1198._12_2_ >> 1;
            auVar1728._14_2_ = auVar1198._14_2_ >> 1;
            auVar1729 = auVar1728 & auVar338;
          }
          auVar1198 = pmovzxbw(in_XMM9,auVar1356);
          auVar1525 = pmovzxbw(in_XMM10,auVar1517);
          auVar1199 = psllw(auVar1198,5);
          in_XMM10._0_2_ = (auVar1525._0_2_ - auVar1198._0_2_) * auVar1729._0_2_;
          in_XMM10._2_2_ = (auVar1525._2_2_ - auVar1198._2_2_) * auVar1729._2_2_;
          in_XMM10._4_2_ = (auVar1525._4_2_ - auVar1198._4_2_) * auVar1729._4_2_;
          in_XMM10._6_2_ = (auVar1525._6_2_ - auVar1198._6_2_) * auVar1729._6_2_;
          in_XMM10._8_2_ = (auVar1525._8_2_ - auVar1198._8_2_) * auVar1729._8_2_;
          in_XMM10._10_2_ = (auVar1525._10_2_ - auVar1198._10_2_) * auVar1729._10_2_;
          in_XMM10._12_2_ = (auVar1525._12_2_ - auVar1198._12_2_) * auVar1729._12_2_;
          in_XMM10._14_2_ = (auVar1525._14_2_ - auVar1198._14_2_) * auVar1729._14_2_;
          uVar1328 = (ushort)(auVar1199._0_2_ + auVar984._0_2_ + in_XMM10._0_2_) >> 5;
          uVar1419 = (ushort)(auVar1199._2_2_ + auVar984._2_2_ + in_XMM10._2_2_) >> 5;
          uVar1420 = (ushort)(auVar1199._4_2_ + auVar984._4_2_ + in_XMM10._4_2_) >> 5;
          uVar1421 = (ushort)(auVar1199._6_2_ + auVar984._6_2_ + in_XMM10._6_2_) >> 5;
          uVar1422 = (ushort)(auVar1199._8_2_ + auVar984._8_2_ + in_XMM10._8_2_) >> 5;
          uVar1423 = (ushort)(auVar1199._10_2_ + auVar984._10_2_ + in_XMM10._10_2_) >> 5;
          uVar1424 = (ushort)(auVar1199._12_2_ + auVar984._12_2_ + in_XMM10._12_2_) >> 5;
          uVar1425 = (ushort)(auVar1199._14_2_ + auVar984._14_2_ + in_XMM10._14_2_) >> 5;
          auVar436._0_2_ = CONCAT11(0,auVar1356[8]);
          auVar436[2] = auVar1356[9];
          auVar436[3] = 0;
          auVar436[4] = auVar1356[10];
          auVar436[5] = 0;
          auVar436[6] = auVar1356[0xb];
          auVar436[7] = 0;
          auVar436[8] = auVar1356[0xc];
          auVar436[9] = 0;
          auVar436[10] = auVar1356[0xd];
          auVar436[0xb] = 0;
          auVar436[0xc] = auVar1356[0xe];
          auVar436[0xd] = 0;
          auVar436[0xe] = auVar1356[0xf];
          auVar436[0xf] = 0;
          auVar1198 = psllw(auVar436,5);
          uVar1143 = (ushort)(auVar1198._0_2_ + auVar984._0_2_ +
                             (auVar1517[8] - auVar436._0_2_) * auVar1729._0_2_) >> 5;
          uVar1321 = (ushort)(auVar1198._2_2_ + auVar984._2_2_ +
                             ((ushort)auVar1517[9] - (ushort)auVar1356[9]) * auVar1729._2_2_) >> 5;
          uVar1322 = (ushort)(auVar1198._4_2_ + auVar984._4_2_ +
                             ((ushort)auVar1517[10] - (ushort)auVar1356[10]) * auVar1729._4_2_) >> 5
          ;
          uVar1323 = (ushort)(auVar1198._6_2_ + auVar984._6_2_ +
                             ((ushort)auVar1517[0xb] - (ushort)auVar1356[0xb]) * auVar1729._6_2_) >>
                     5;
          uVar1324 = (ushort)(auVar1198._8_2_ + auVar984._8_2_ +
                             ((ushort)auVar1517[0xc] - (ushort)auVar1356[0xc]) * auVar1729._8_2_) >>
                     5;
          uVar1325 = (ushort)(auVar1198._10_2_ + auVar984._10_2_ +
                             ((ushort)auVar1517[0xd] - (ushort)auVar1356[0xd]) * auVar1729._10_2_)
                     >> 5;
          uVar1326 = (ushort)(auVar1198._12_2_ + auVar984._12_2_ +
                             ((ushort)auVar1517[0xe] - (ushort)auVar1356[0xe]) * auVar1729._12_2_)
                     >> 5;
          uVar1327 = (ushort)(auVar1198._14_2_ + auVar984._14_2_ +
                             ((ushort)auVar1517[0xf] - (ushort)auVar1356[0xf]) * auVar1729._14_2_)
                     >> 5;
          in_XMM9[1] = (uVar1419 != 0) * (uVar1419 < 0x100) * (char)uVar1419 - (0xff < uVar1419);
          in_XMM9[0] = (uVar1328 != 0) * (uVar1328 < 0x100) * (char)uVar1328 - (0xff < uVar1328);
          in_XMM9[2] = (uVar1420 != 0) * (uVar1420 < 0x100) * (char)uVar1420 - (0xff < uVar1420);
          in_XMM9[3] = (uVar1421 != 0) * (uVar1421 < 0x100) * (char)uVar1421 - (0xff < uVar1421);
          in_XMM9[4] = (uVar1422 != 0) * (uVar1422 < 0x100) * (char)uVar1422 - (0xff < uVar1422);
          in_XMM9[5] = (uVar1423 != 0) * (uVar1423 < 0x100) * (char)uVar1423 - (0xff < uVar1423);
          in_XMM9[6] = (uVar1424 != 0) * (uVar1424 < 0x100) * (char)uVar1424 - (0xff < uVar1424);
          in_XMM9[7] = (uVar1425 != 0) * (uVar1425 < 0x100) * (char)uVar1425 - (0xff < uVar1425);
          in_XMM9[8] = (uVar1143 != 0) * (uVar1143 < 0x100) * (char)uVar1143 - (0xff < uVar1143);
          in_XMM9[9] = (uVar1321 != 0) * (uVar1321 < 0x100) * (char)uVar1321 - (0xff < uVar1321);
          in_XMM9[10] = (uVar1322 != 0) * (uVar1322 < 0x100) * (char)uVar1322 - (0xff < uVar1322);
          in_XMM9[0xb] = (uVar1323 != 0) * (uVar1323 < 0x100) * (char)uVar1323 - (0xff < uVar1323);
          in_XMM9[0xc] = (uVar1324 != 0) * (uVar1324 < 0x100) * (char)uVar1324 - (0xff < uVar1324);
          in_XMM9[0xd] = (uVar1325 != 0) * (uVar1325 < 0x100) * (char)uVar1325 - (0xff < uVar1325);
          in_XMM9[0xe] = (uVar1326 != 0) * (uVar1326 < 0x100) * (char)uVar1326 - (0xff < uVar1326);
          in_XMM9[0xf] = (uVar1327 != 0) * (uVar1327 < 0x100) * (char)uVar1327 - (0xff < uVar1327);
          auVar1356 = pblendvb(auVar551,in_XMM9,(undefined1  [16])Mask[0][uVar255]);
          *(undefined1 (*) [16])(local_1038 + lVar256 * 0x10) = auVar1356;
          uVar257 = uVar257 + dy;
        }
        if ((int)uVar259 < 1) break;
        lVar256 = lVar256 + 1;
        lVar252 = lVar252 + 0x10;
      } while (lVar256 != 0x20);
      lVar252 = 0;
      do {
        lVar256 = lVar252 * 0x10;
        auVar551 = *(undefined1 (*) [16])(local_1038 + lVar256);
        auVar984 = *(undefined1 (*) [16])(local_1018 + lVar256);
        auVar1126._0_14_ = auVar551._0_14_;
        auVar1126[0xe] = auVar551[7];
        auVar1126[0xf] = local_1028[lVar256 + 7];
        auVar1125._14_2_ = auVar1126._14_2_;
        auVar1125._0_13_ = auVar551._0_13_;
        auVar1125[0xd] = local_1028[lVar256 + 6];
        auVar1124._13_3_ = auVar1125._13_3_;
        auVar1124._0_12_ = auVar551._0_12_;
        auVar1124[0xc] = auVar551[6];
        auVar1123._12_4_ = auVar1124._12_4_;
        auVar1123._0_11_ = auVar551._0_11_;
        auVar1123[0xb] = local_1028[lVar256 + 5];
        auVar1122._11_5_ = auVar1123._11_5_;
        auVar1122._0_10_ = auVar551._0_10_;
        auVar1122[10] = auVar551[5];
        auVar1121._10_6_ = auVar1122._10_6_;
        auVar1121._0_9_ = auVar551._0_9_;
        auVar1121[9] = local_1028[lVar256 + 4];
        auVar1120._9_7_ = auVar1121._9_7_;
        auVar1120._0_8_ = auVar551._0_8_;
        auVar1120[8] = auVar551[4];
        Var18 = CONCAT91(CONCAT81(auVar1120._8_8_,local_1028[lVar256 + 3]),auVar551[3]);
        auVar221._2_10_ = Var18;
        auVar221[1] = local_1028[lVar256 + 2];
        auVar221[0] = auVar551[2];
        auVar1119._4_12_ = auVar221;
        auVar1119[3] = local_1028[lVar256 + 1];
        auVar1119[2] = auVar551[1];
        auVar1119._0_2_ = CONCAT11(local_1028[lVar256],auVar551[0]);
        auVar2277._0_14_ = auVar984._0_14_;
        auVar2277[0xe] = auVar984[7];
        auVar2277[0xf] = local_1008[lVar256 + 7];
        auVar2276._14_2_ = auVar2277._14_2_;
        auVar2276._0_13_ = auVar984._0_13_;
        auVar2276[0xd] = local_1008[lVar256 + 6];
        auVar2275._13_3_ = auVar2276._13_3_;
        auVar2275._0_12_ = auVar984._0_12_;
        auVar2275[0xc] = auVar984[6];
        auVar2274._12_4_ = auVar2275._12_4_;
        auVar2274._0_11_ = auVar984._0_11_;
        auVar2274[0xb] = local_1008[lVar256 + 5];
        auVar2273._11_5_ = auVar2274._11_5_;
        auVar2273._0_10_ = auVar984._0_10_;
        auVar2273[10] = auVar984[5];
        auVar2272._10_6_ = auVar2273._10_6_;
        auVar2272._0_9_ = auVar984._0_9_;
        auVar2272[9] = local_1008[lVar256 + 4];
        auVar2271._9_7_ = auVar2272._9_7_;
        auVar2271._0_8_ = auVar984._0_8_;
        auVar2271[8] = auVar984[4];
        Var21 = CONCAT91(CONCAT81(auVar2271._8_8_,local_1008[lVar256 + 3]),auVar984[3]);
        auVar222._2_10_ = Var21;
        auVar222[1] = local_1008[lVar256 + 2];
        auVar222[0] = auVar984[2];
        auVar338 = *(undefined1 (*) [16])(local_ff8 + lVar256);
        auVar2136._0_14_ = auVar338._0_14_;
        auVar2136[0xe] = auVar338[7];
        auVar2136[0xf] = local_fe8[lVar256 + 7];
        auVar2135._14_2_ = auVar2136._14_2_;
        auVar2135._0_13_ = auVar338._0_13_;
        auVar2135[0xd] = local_fe8[lVar256 + 6];
        auVar2134._13_3_ = auVar2135._13_3_;
        auVar2134._0_12_ = auVar338._0_12_;
        auVar2134[0xc] = auVar338[6];
        auVar2133._12_4_ = auVar2134._12_4_;
        auVar2133._0_11_ = auVar338._0_11_;
        auVar2133[0xb] = local_fe8[lVar256 + 5];
        auVar2132._11_5_ = auVar2133._11_5_;
        auVar2132._0_10_ = auVar338._0_10_;
        auVar2132[10] = auVar338[5];
        auVar2131._10_6_ = auVar2132._10_6_;
        auVar2131._0_9_ = auVar338._0_9_;
        auVar2131[9] = local_fe8[lVar256 + 4];
        auVar2130._9_7_ = auVar2131._9_7_;
        auVar2130._0_8_ = auVar338._0_8_;
        auVar2130[8] = auVar338[4];
        Var39 = CONCAT91(CONCAT81(auVar2130._8_8_,local_fe8[lVar256 + 3]),auVar338[3]);
        auVar223._2_10_ = Var39;
        auVar223[1] = local_fe8[lVar256 + 2];
        auVar223[0] = auVar338[2];
        auVar2129._4_12_ = auVar223;
        auVar2129[3] = local_fe8[lVar256 + 1];
        auVar2129[2] = auVar338[1];
        auVar2129._0_2_ = CONCAT11(local_fe8[lVar256],auVar338[0]);
        auVar1356 = *(undefined1 (*) [16])(local_fd8 + lVar256);
        auVar2207._0_14_ = auVar1356._0_14_;
        auVar2207[0xe] = auVar1356[7];
        auVar2207[0xf] = local_fc8[lVar256 + 7];
        auVar2206._14_2_ = auVar2207._14_2_;
        auVar2206._0_13_ = auVar1356._0_13_;
        auVar2206[0xd] = local_fc8[lVar256 + 6];
        auVar2205._13_3_ = auVar2206._13_3_;
        auVar2205._0_12_ = auVar1356._0_12_;
        auVar2205[0xc] = auVar1356[6];
        auVar2204._12_4_ = auVar2205._12_4_;
        auVar2204._0_11_ = auVar1356._0_11_;
        auVar2204[0xb] = local_fc8[lVar256 + 5];
        auVar2203._11_5_ = auVar2204._11_5_;
        auVar2203._0_10_ = auVar1356._0_10_;
        auVar2203[10] = auVar1356[5];
        auVar2202._10_6_ = auVar2203._10_6_;
        auVar2202._0_9_ = auVar1356._0_9_;
        auVar2202[9] = local_fc8[lVar256 + 4];
        auVar2201._9_7_ = auVar2202._9_7_;
        auVar2201._0_8_ = auVar1356._0_8_;
        auVar2201[8] = auVar1356[4];
        Var42 = CONCAT91(CONCAT81(auVar2201._8_8_,local_fc8[lVar256 + 3]),auVar1356[3]);
        auVar224._2_10_ = Var42;
        auVar224[1] = local_fc8[lVar256 + 2];
        auVar224[0] = auVar1356[2];
        auVar1517 = *(undefined1 (*) [16])(local_fb8 + lVar256);
        auVar1982._0_12_ = auVar1119._0_12_;
        auVar1982._12_2_ = (short)Var18;
        auVar1982._14_2_ = (short)Var21;
        auVar1981._12_4_ = auVar1982._12_4_;
        auVar1981._0_10_ = auVar1119._0_10_;
        auVar1981._10_2_ = auVar222._0_2_;
        auVar1980._10_6_ = auVar1981._10_6_;
        auVar1980._0_8_ = auVar1119._0_8_;
        auVar1980._8_2_ = auVar221._0_2_;
        auVar708._0_12_ = auVar2129._0_12_;
        auVar708._12_2_ = (short)Var39;
        auVar708._14_2_ = (short)Var42;
        auVar707._12_4_ = auVar708._12_4_;
        auVar707._0_10_ = auVar2129._0_10_;
        auVar707._10_2_ = auVar224._0_2_;
        auVar706._10_6_ = auVar707._10_6_;
        auVar706._0_8_ = auVar2129._0_8_;
        auVar706._8_2_ = auVar223._0_2_;
        auVar1301._0_14_ = auVar1517._0_14_;
        auVar1301[0xe] = auVar1517[7];
        auVar1301[0xf] = local_fa8[lVar256 + 7];
        auVar1300._14_2_ = auVar1301._14_2_;
        auVar1300._0_13_ = auVar1517._0_13_;
        auVar1300[0xd] = local_fa8[lVar256 + 6];
        auVar1299._13_3_ = auVar1300._13_3_;
        auVar1299._0_12_ = auVar1517._0_12_;
        auVar1299[0xc] = auVar1517[6];
        auVar1298._12_4_ = auVar1299._12_4_;
        auVar1298._0_11_ = auVar1517._0_11_;
        auVar1298[0xb] = local_fa8[lVar256 + 5];
        auVar1297._11_5_ = auVar1298._11_5_;
        auVar1297._0_10_ = auVar1517._0_10_;
        auVar1297[10] = auVar1517[5];
        auVar1296._10_6_ = auVar1297._10_6_;
        auVar1296._0_9_ = auVar1517._0_9_;
        auVar1296[9] = local_fa8[lVar256 + 4];
        auVar1295._9_7_ = auVar1296._9_7_;
        auVar1295._0_8_ = auVar1517._0_8_;
        auVar1295[8] = auVar1517[4];
        Var18 = CONCAT91(CONCAT81(auVar1295._8_8_,local_fa8[lVar256 + 3]),auVar1517[3]);
        auVar225._2_10_ = Var18;
        auVar225[1] = local_fa8[lVar256 + 2];
        auVar225[0] = auVar1517[2];
        auVar1294._4_12_ = auVar225;
        auVar1294[3] = local_fa8[lVar256 + 1];
        auVar1294[2] = auVar1517[1];
        auVar1294._0_2_ = CONCAT11(local_fa8[lVar256],auVar1517[0]);
        auVar1198 = *(undefined1 (*) [16])(local_f98 + lVar256);
        auVar1605._0_14_ = auVar1198._0_14_;
        auVar1605[0xe] = auVar1198[7];
        auVar1605[0xf] = local_f88[lVar256 + 7];
        auVar1604._14_2_ = auVar1605._14_2_;
        auVar1604._0_13_ = auVar1198._0_13_;
        auVar1604[0xd] = local_f88[lVar256 + 6];
        auVar1603._13_3_ = auVar1604._13_3_;
        auVar1603._0_12_ = auVar1198._0_12_;
        auVar1603[0xc] = auVar1198[6];
        auVar1602._12_4_ = auVar1603._12_4_;
        auVar1602._0_11_ = auVar1198._0_11_;
        auVar1602[0xb] = local_f88[lVar256 + 5];
        auVar1601._11_5_ = auVar1602._11_5_;
        auVar1601._0_10_ = auVar1198._0_10_;
        auVar1601[10] = auVar1198[5];
        auVar1600._10_6_ = auVar1601._10_6_;
        auVar1600._0_9_ = auVar1198._0_9_;
        auVar1600[9] = local_f88[lVar256 + 4];
        auVar1599._9_7_ = auVar1600._9_7_;
        auVar1599._0_8_ = auVar1198._0_8_;
        auVar1599[8] = auVar1198[4];
        Var21 = CONCAT91(CONCAT81(auVar1599._8_8_,local_f88[lVar256 + 3]),auVar1198[3]);
        auVar226._2_10_ = Var21;
        auVar226[1] = local_f88[lVar256 + 2];
        auVar226[0] = auVar1198[2];
        auVar1199 = *(undefined1 (*) [16])(local_f78 + lVar256);
        auVar1737._0_14_ = auVar1199._0_14_;
        auVar1737[0xe] = auVar1199[7];
        auVar1737[0xf] = local_f68[lVar256 + 7];
        auVar1736._14_2_ = auVar1737._14_2_;
        auVar1736._0_13_ = auVar1199._0_13_;
        auVar1736[0xd] = local_f68[lVar256 + 6];
        auVar1735._13_3_ = auVar1736._13_3_;
        auVar1735._0_12_ = auVar1199._0_12_;
        auVar1735[0xc] = auVar1199[6];
        auVar1734._12_4_ = auVar1735._12_4_;
        auVar1734._0_11_ = auVar1199._0_11_;
        auVar1734[0xb] = local_f68[lVar256 + 5];
        auVar1733._11_5_ = auVar1734._11_5_;
        auVar1733._0_10_ = auVar1199._0_10_;
        auVar1733[10] = auVar1199[5];
        auVar1732._10_6_ = auVar1733._10_6_;
        auVar1732._0_9_ = auVar1199._0_9_;
        auVar1732[9] = local_f68[lVar256 + 4];
        auVar1731._9_7_ = auVar1732._9_7_;
        auVar1731._0_8_ = auVar1199._0_8_;
        auVar1731[8] = auVar1199[4];
        Var39 = CONCAT91(CONCAT81(auVar1731._8_8_,local_f68[lVar256 + 3]),auVar1199[3]);
        auVar227._2_10_ = Var39;
        auVar227[1] = local_f68[lVar256 + 2];
        auVar227[0] = auVar1199[2];
        auVar1730._4_12_ = auVar227;
        auVar1730[3] = local_f68[lVar256 + 1];
        auVar1730[2] = auVar1199[1];
        auVar1730._0_2_ = CONCAT11(local_f68[lVar256],auVar1199[0]);
        auVar1525 = local_f48[lVar252 + -1];
        auVar1901._0_14_ = auVar1525._0_14_;
        auVar1901[0xe] = auVar1525[7];
        auVar1901[0xf] = local_f48[lVar252][7];
        auVar1900._14_2_ = auVar1901._14_2_;
        auVar1900._0_13_ = auVar1525._0_13_;
        auVar1900[0xd] = local_f48[lVar252][6];
        auVar1899._13_3_ = auVar1900._13_3_;
        auVar1899._0_12_ = auVar1525._0_12_;
        auVar1899[0xc] = auVar1525[6];
        auVar1898._12_4_ = auVar1899._12_4_;
        auVar1898._0_11_ = auVar1525._0_11_;
        auVar1898[0xb] = local_f48[lVar252][5];
        auVar1897._11_5_ = auVar1898._11_5_;
        auVar1897._0_10_ = auVar1525._0_10_;
        auVar1897[10] = auVar1525[5];
        auVar1896._10_6_ = auVar1897._10_6_;
        auVar1896._0_9_ = auVar1525._0_9_;
        auVar1896[9] = local_f48[lVar252][4];
        auVar1895._9_7_ = auVar1896._9_7_;
        auVar1895._0_8_ = auVar1525._0_8_;
        auVar1895[8] = auVar1525[4];
        Var42 = CONCAT91(CONCAT81(auVar1895._8_8_,local_f48[lVar252][3]),auVar1525[3]);
        auVar228._2_10_ = Var42;
        auVar228[1] = local_f48[lVar252][2];
        auVar228[0] = auVar1525[2];
        auVar711._0_12_ = auVar1294._0_12_;
        auVar711._12_2_ = (short)Var18;
        auVar711._14_2_ = (short)Var21;
        auVar710._12_4_ = auVar711._12_4_;
        auVar710._0_10_ = auVar1294._0_10_;
        auVar710._10_2_ = auVar226._0_2_;
        auVar709._10_6_ = auVar710._10_6_;
        auVar709._0_8_ = auVar1294._0_8_;
        auVar709._8_2_ = auVar225._0_2_;
        auVar1402._0_12_ = auVar1730._0_12_;
        auVar1402._12_2_ = (short)Var39;
        auVar1402._14_2_ = (short)Var42;
        auVar1401._12_4_ = auVar1402._12_4_;
        auVar1401._0_10_ = auVar1730._0_10_;
        auVar1401._10_2_ = auVar228._0_2_;
        auVar1400._10_6_ = auVar1401._10_6_;
        auVar1400._0_8_ = auVar1730._0_8_;
        auVar1400._8_2_ = auVar227._0_2_;
        local_1638[0] =
             CONCAT44(CONCAT22(CONCAT11(local_fc8[lVar256],auVar1356[0]),auVar2129._0_2_),
                      CONCAT22(CONCAT11(local_1008[lVar256],auVar984[0]),auVar1119._0_2_));
        local_1638[1] =
             CONCAT44(CONCAT22(CONCAT11(local_f48[lVar252][0],auVar1525[0]),auVar1730._0_2_),
                      CONCAT22(CONCAT11(local_f88[lVar256],auVar1198[0]),auVar1294._0_2_));
        local_1628 = auVar551[1];
        uStack_1627 = local_1028[lVar256 + 1];
        uStack_1626 = auVar984[1];
        uStack_1625 = local_1008[lVar256 + 1];
        uStack_1624 = auVar338[1];
        uStack_1623 = local_fe8[lVar256 + 1];
        uStack_1622 = auVar1356[1];
        uStack_1621 = local_fc8[lVar256 + 1];
        uStack_1620 = auVar1517[1];
        uStack_161f = local_fa8[lVar256 + 1];
        uStack_161e = auVar1198[1];
        uStack_161d = local_f88[lVar256 + 1];
        uStack_161c = auVar1199[1];
        uStack_161b = local_f68[lVar256 + 1];
        uStack_161a = auVar1525[1];
        uStack_1619 = local_f48[lVar252][1];
        local_1618 = auVar1980._8_4_;
        uStack_1614 = auVar706._8_4_;
        uStack_1610 = auVar709._8_4_;
        uStack_160c = auVar1400._8_4_;
        local_1608._8_4_ = auVar1981._12_4_;
        local_1608._12_4_ = auVar707._12_4_;
        local_15f8._0_4_ = CONCAT22(auVar2271._8_2_,auVar1120._8_2_);
        auVar932._0_8_ = CONCAT26(auVar2273._10_2_,CONCAT24(auVar1122._10_2_,local_15f8._0_4_));
        auVar932._8_2_ = auVar1124._12_2_;
        auVar932._10_2_ = auVar2275._12_2_;
        auVar1127._12_2_ = auVar1125._14_2_;
        auVar1127._0_12_ = auVar932;
        auVar1127._14_2_ = auVar2276._14_2_;
        local_15f8._4_4_ = CONCAT22(auVar2201._8_2_,auVar2130._8_2_);
        auVar2044._0_8_ = CONCAT26(auVar2203._10_2_,CONCAT24(auVar2132._10_2_,local_15f8._4_4_));
        auVar2044._8_2_ = auVar2134._12_2_;
        auVar2044._10_2_ = auVar2205._12_2_;
        auVar2137._12_2_ = auVar2135._14_2_;
        auVar2137._0_12_ = auVar2044;
        auVar2137._14_2_ = auVar2206._14_2_;
        local_15f8._8_4_ = CONCAT22(auVar1599._8_2_,auVar1295._8_2_);
        auVar1160._0_8_ = CONCAT26(auVar1601._10_2_,CONCAT24(auVar1297._10_2_,local_15f8._8_4_));
        auVar1160._8_2_ = auVar1299._12_2_;
        auVar1160._10_2_ = auVar1603._12_2_;
        local_15f8._12_4_ = CONCAT22(auVar1895._8_2_,auVar1731._8_2_);
        auVar1628._0_8_ = CONCAT26(auVar1897._10_2_,CONCAT24(auVar1733._10_2_,local_15f8._12_4_));
        auVar1628._8_2_ = auVar1735._12_2_;
        auVar1628._10_2_ = auVar1899._12_2_;
        auVar437._8_4_ = (int)((ulong)auVar932._0_8_ >> 0x20);
        auVar437._0_8_ = auVar932._0_8_;
        auVar437._12_4_ = (int)((ulong)auVar2044._0_8_ >> 0x20);
        auVar712._8_4_ = (int)((ulong)auVar1160._0_8_ >> 0x20);
        auVar712._0_8_ = auVar1160._0_8_;
        auVar712._12_4_ = (int)((ulong)auVar1628._0_8_ >> 0x20);
        local_15e8._8_8_ = auVar712._8_8_;
        local_15e8._0_8_ = auVar437._8_8_;
        local_15d8._4_4_ = auVar2044._8_4_;
        local_15d8._0_4_ = auVar932._8_4_;
        local_15d8._8_4_ = auVar1160._8_4_;
        local_15d8._12_4_ = auVar1628._8_4_;
        local_15c8._8_4_ = auVar1127._12_4_;
        local_15c8._12_4_ = auVar2137._12_4_;
        uVar265 = CONCAT11(local_1028[lVar256 + 8],auVar551[8]);
        uVar1426 = CONCAT13(local_1018[lVar256 + -7],CONCAT12(auVar551[9],uVar265));
        uVar1427 = CONCAT15(local_1018[lVar256 + -6],CONCAT14(auVar551[10],uVar1426));
        uVar1428 = CONCAT17(local_1018[lVar256 + -5],CONCAT16(auVar551[0xb],uVar1427));
        auVar1447._0_10_ = CONCAT19(local_1018[lVar256 + -4],CONCAT18(auVar551[0xc],uVar1428));
        auVar1447[10] = auVar551[0xd];
        auVar1447[0xb] = local_1018[lVar256 + -3];
        auVar1458[0xc] = auVar551[0xe];
        auVar1458._0_12_ = auVar1447;
        auVar1458[0xd] = local_1018[lVar256 + -2];
        auVar1500[0xe] = auVar551[0xf];
        auVar1500._0_14_ = auVar1458;
        auVar1500[0xf] = local_1018[lVar256 + -1];
        uStack_1640 = auVar984[8];
        uStack_163f = auVar984[9];
        uStack_163e = auVar984[10];
        uStack_163d = auVar984[0xb];
        uStack_163c = auVar984[0xc];
        uStack_163b = auVar984[0xd];
        uStack_163a = auVar984[0xe];
        uStack_1639 = auVar984[0xf];
        auVar298._12_4_ =
             CONCAT13(local_ff8[lVar256 + -7],
                      CONCAT12(uStack_163f,CONCAT11(local_1008[lVar256 + 8],uStack_1640)));
        uVar266 = CONCAT15(local_ff8[lVar256 + -6],CONCAT14(uStack_163e,auVar298._12_4_));
        uVar267 = CONCAT17(local_ff8[lVar256 + -5],CONCAT16(uStack_163d,uVar266));
        auVar486._0_10_ = CONCAT19(local_ff8[lVar256 + -4],CONCAT18(uStack_163c,uVar267));
        auVar486[10] = uStack_163b;
        auVar486[0xb] = local_ff8[lVar256 + -3];
        auVar501[0xc] = uStack_163a;
        auVar501._0_12_ = auVar486;
        auVar501[0xd] = local_ff8[lVar256 + -2];
        auVar713[0xe] = uStack_1639;
        auVar713._0_14_ = auVar501;
        auVar713[0xf] = local_ff8[lVar256 + -1];
        uStack_1670 = auVar338[8];
        uStack_166f = auVar338[9];
        uStack_166e = auVar338[10];
        uStack_166d = auVar338[0xb];
        uStack_166c = auVar338[0xc];
        uStack_166b = auVar338[0xd];
        uStack_166a = auVar338[0xe];
        uStack_1669 = auVar338[0xf];
        auVar784._12_4_ =
             CONCAT13(local_fd8[lVar256 + -7],
                      CONCAT12(uStack_166f,CONCAT11(local_fe8[lVar256 + 8],uStack_1670)));
        uVar459 = CONCAT15(local_fd8[lVar256 + -6],CONCAT14(uStack_166e,auVar784._12_4_));
        uVar460 = CONCAT17(local_fd8[lVar256 + -5],CONCAT16(uStack_166d,uVar459));
        auVar758._0_10_ = CONCAT19(local_fd8[lVar256 + -4],CONCAT18(uStack_166c,uVar460));
        auVar758[10] = uStack_166b;
        auVar758[0xb] = local_fd8[lVar256 + -3];
        auVar771[0xc] = uStack_166a;
        auVar771._0_12_ = auVar758;
        auVar771[0xd] = local_fd8[lVar256 + -2];
        auVar889[0xe] = uStack_1669;
        auVar889._0_14_ = auVar771;
        auVar889[0xf] = local_fd8[lVar256 + -1];
        uStack_1690 = auVar1356[8];
        uStack_168f = auVar1356[9];
        uStack_168e = auVar1356[10];
        uStack_168d = auVar1356[0xb];
        uStack_168c = auVar1356[0xc];
        uStack_168b = auVar1356[0xd];
        uStack_168a = auVar1356[0xe];
        uStack_1689 = auVar1356[0xf];
        uVar741 = CONCAT13(local_fb8[lVar256 + -7],
                           CONCAT12(uStack_168f,CONCAT11(local_fc8[lVar256 + 8],uStack_1690)));
        uVar742 = CONCAT15(local_fb8[lVar256 + -6],CONCAT14(uStack_168e,uVar741));
        uVar743 = CONCAT17(local_fb8[lVar256 + -5],CONCAT16(uStack_168d,uVar742));
        auVar933._0_10_ = CONCAT19(local_fb8[lVar256 + -4],CONCAT18(uStack_168c,uVar743));
        auVar933[10] = uStack_168b;
        auVar933[0xb] = local_fb8[lVar256 + -3];
        auVar945[0xc] = uStack_168a;
        auVar945._0_12_ = auVar933;
        auVar945[0xd] = local_fb8[lVar256 + -2];
        auVar1128[0xe] = uStack_1689;
        auVar1128._0_14_ = auVar945;
        auVar1128[0xf] = local_fb8[lVar256 + -1];
        uVar458 = CONCAT11(local_fa8[lVar256 + 8],auVar1517[8]);
        uVar1750 = CONCAT13(local_f98[lVar256 + -7],CONCAT12(auVar1517[9],uVar458));
        uVar1751 = CONCAT15(local_f98[lVar256 + -6],CONCAT14(auVar1517[10],uVar1750));
        uVar1752 = CONCAT17(local_f98[lVar256 + -5],CONCAT16(auVar1517[0xb],uVar1751));
        auVar1769._0_10_ = CONCAT19(local_f98[lVar256 + -4],CONCAT18(auVar1517[0xc],uVar1752));
        auVar1769[10] = auVar1517[0xd];
        auVar1769[0xb] = local_f98[lVar256 + -3];
        auVar1779[0xc] = auVar1517[0xe];
        auVar1779._0_12_ = auVar1769;
        auVar1779[0xd] = local_f98[lVar256 + -2];
        auVar1810[0xe] = auVar1517[0xf];
        auVar1810._0_14_ = auVar1779;
        auVar1810[0xf] = local_f98[lVar256 + -1];
        uStack_16c0 = auVar1198[8];
        uStack_16bf = auVar1198[9];
        uStack_16be = auVar1198[10];
        uStack_16bd = auVar1198[0xb];
        uStack_16bc = auVar1198[0xc];
        uStack_16bb = auVar1198[0xd];
        uStack_16ba = auVar1198[0xe];
        uStack_16b9 = auVar1198[0xf];
        uVar908 = CONCAT13(local_f78[lVar256 + -7],
                           CONCAT12(uStack_16bf,CONCAT11(local_f88[lVar256 + 8],uStack_16c0)));
        uVar909 = CONCAT15(local_f78[lVar256 + -6],CONCAT14(uStack_16be,uVar908));
        uVar910 = CONCAT17(local_f78[lVar256 + -5],CONCAT16(uStack_16bd,uVar909));
        auVar1161._0_10_ = CONCAT19(local_f78[lVar256 + -4],CONCAT18(uStack_16bc,uVar910));
        auVar1161[10] = uStack_16bb;
        auVar1161[0xb] = local_f78[lVar256 + -3];
        auVar1171[0xc] = uStack_16ba;
        auVar1171._0_12_ = auVar1161;
        auVar1171[0xd] = local_f78[lVar256 + -2];
        auVar1302[0xe] = uStack_16b9;
        auVar1302._0_14_ = auVar1171;
        auVar1302[0xf] = local_f78[lVar256 + -1];
        uVar907 = CONCAT11(local_f68[lVar256 + 8],auVar1199[8]);
        uVar1987 = CONCAT13(local_f58[lVar256 + -7],CONCAT12(auVar1199[9],uVar907));
        uVar1988 = CONCAT15(local_f58[lVar256 + -6],CONCAT14(auVar1199[10],uVar1987));
        uVar1989 = CONCAT17(local_f58[lVar256 + -5],CONCAT16(auVar1199[0xb],uVar1988));
        auVar2006._0_10_ = CONCAT19(local_f58[lVar256 + -4],CONCAT18(auVar1199[0xc],uVar1989));
        auVar2006[10] = auVar1199[0xd];
        auVar2006[0xb] = local_f58[lVar256 + -3];
        auVar2016[0xc] = auVar1199[0xe];
        auVar2016._0_12_ = auVar2006;
        auVar2016[0xd] = local_f58[lVar256 + -2];
        auVar2033[0xe] = auVar1199[0xf];
        auVar2033._0_14_ = auVar2016;
        auVar2033[0xf] = local_f58[lVar256 + -1];
        uStack_16f0 = auVar1525[8];
        uStack_16ef = auVar1525[9];
        uStack_16ee = auVar1525[10];
        uStack_16ed = auVar1525[0xb];
        uStack_16ec = auVar1525[0xc];
        uStack_16eb = auVar1525[0xd];
        uStack_16ea = auVar1525[0xe];
        uStack_16e9 = auVar1525[0xf];
        uVar740 = CONCAT11(local_f48[lVar252][8],uStack_16f0);
        uVar1905 = CONCAT13(local_f48[lVar252][9],CONCAT12(uStack_16ef,uVar740));
        uVar1906 = CONCAT15(local_f48[lVar252][10],CONCAT14(uStack_16ee,uVar1905));
        uVar1907 = CONCAT17(local_f48[lVar252][0xb],CONCAT16(uStack_16ed,uVar1906));
        auVar1916._0_10_ = CONCAT19(local_f48[lVar252][0xc],CONCAT18(uStack_16ec,uVar1907));
        auVar1916[10] = uStack_16eb;
        auVar1916[0xb] = local_f48[lVar252][0xd];
        auVar1925[0xc] = uStack_16ea;
        auVar1925._0_12_ = auVar1916;
        auVar1925[0xd] = local_f48[lVar252][0xe];
        auVar1983[0xe] = uStack_16e9;
        auVar1983._0_14_ = auVar1925;
        auVar1983[0xf] = local_f48[lVar252][0xf];
        auVar443._12_2_ = (short)((ulong)uVar1428 >> 0x30);
        auVar443._0_12_ = auVar1447;
        auVar443._14_2_ = (short)((ulong)uVar267 >> 0x30);
        auVar442._12_4_ = auVar443._12_4_;
        auVar442._10_2_ = (short)((uint6)uVar266 >> 0x20);
        auVar442._0_10_ = auVar1447._0_10_;
        auVar441._10_6_ = auVar442._10_6_;
        auVar441._8_2_ = (short)((uint6)uVar1427 >> 0x20);
        auVar441._0_8_ = uVar1428;
        auVar440._8_8_ = auVar441._8_8_;
        auVar440._6_2_ = (short)((uint)auVar298._12_4_ >> 0x10);
        auVar440._0_6_ = uVar1427;
        auVar439._6_10_ = auVar440._6_10_;
        auVar439._4_2_ = (short)((uint)uVar1426 >> 0x10);
        auVar439._0_4_ = uVar1426;
        auVar438._4_12_ = auVar439._4_12_;
        auVar438._0_4_ = CONCAT22(CONCAT11(local_1008[lVar256 + 8],uStack_1640),uVar265);
        auVar718._12_2_ = (short)((ulong)uVar460 >> 0x30);
        auVar718._0_12_ = auVar758;
        auVar718._14_2_ = (short)((ulong)uVar743 >> 0x30);
        auVar717._12_4_ = auVar718._12_4_;
        auVar717._10_2_ = (short)((uint6)uVar742 >> 0x20);
        auVar717._0_10_ = auVar758._0_10_;
        auVar716._10_6_ = auVar717._10_6_;
        auVar716._8_2_ = (short)((uint6)uVar459 >> 0x20);
        auVar716._0_8_ = uVar460;
        auVar715._8_8_ = auVar716._8_8_;
        auVar715._6_2_ = (short)((uint)uVar741 >> 0x10);
        auVar715._0_6_ = uVar459;
        auVar714._6_10_ = auVar715._6_10_;
        auVar714._4_2_ = (short)((uint)auVar784._12_4_ >> 0x10);
        auVar714._0_4_ = auVar784._12_4_;
        auVar895._12_2_ = (short)((ulong)uVar1752 >> 0x30);
        auVar895._0_12_ = auVar1769;
        auVar895._14_2_ = (short)((ulong)uVar910 >> 0x30);
        auVar894._12_4_ = auVar895._12_4_;
        auVar894._10_2_ = (short)((uint6)uVar909 >> 0x20);
        auVar894._0_10_ = auVar1769._0_10_;
        auVar893._10_6_ = auVar894._10_6_;
        auVar893._8_2_ = (short)((uint6)uVar1751 >> 0x20);
        auVar893._0_8_ = uVar1752;
        auVar892._8_8_ = auVar893._8_8_;
        auVar892._6_2_ = (short)((uint)uVar908 >> 0x10);
        auVar892._0_6_ = uVar1751;
        auVar891._6_10_ = auVar892._6_10_;
        auVar891._4_2_ = (short)((uint)uVar1750 >> 0x10);
        auVar891._0_4_ = uVar1750;
        auVar890._4_12_ = auVar891._4_12_;
        auVar890._0_4_ = CONCAT22(CONCAT11(local_f88[lVar256 + 8],uStack_16c0),uVar458);
        auVar1133._12_2_ = (short)((ulong)uVar1989 >> 0x30);
        auVar1133._0_12_ = auVar2006;
        auVar1133._14_2_ = (short)((ulong)uVar1907 >> 0x30);
        auVar1132._12_4_ = auVar1133._12_4_;
        auVar1132._10_2_ = (short)((uint6)uVar1906 >> 0x20);
        auVar1132._0_10_ = auVar2006._0_10_;
        auVar1131._10_6_ = auVar1132._10_6_;
        auVar1131._8_2_ = (short)((uint6)uVar1988 >> 0x20);
        auVar1131._0_8_ = uVar1989;
        auVar1130._8_8_ = auVar1131._8_8_;
        auVar1130._6_2_ = (short)((uint)uVar1905 >> 0x10);
        auVar1130._0_6_ = uVar1988;
        auVar1129._6_10_ = auVar1130._6_10_;
        auVar1129._4_2_ = (short)((uint)uVar1987 >> 0x10);
        auVar1129._0_4_ = uVar1987;
        auVar1303._0_8_ = auVar438._0_8_;
        auVar1303._8_4_ = auVar439._4_4_;
        auVar1303._12_4_ = auVar714._4_4_;
        auVar719._0_8_ = auVar890._0_8_;
        auVar719._8_4_ = auVar891._4_4_;
        auVar719._12_4_ = auVar1129._4_4_;
        local_15b8 = CONCAT44(CONCAT22(CONCAT11(local_fc8[lVar256 + 8],uStack_1690),
                                       CONCAT11(local_fe8[lVar256 + 8],uStack_1670)),auVar438._0_4_)
        ;
        auStack_15b0[0] = CONCAT44(CONCAT22(uVar740,uVar907),auVar890._0_4_);
        auStack_15b0[1] = auVar1303._8_8_;
        auStack_15b0[2] = auVar719._8_8_;
        local_1598 = CONCAT44(auVar716._8_4_,auVar441._8_4_);
        uStack_1590 = CONCAT44(auVar1131._8_4_,auVar893._8_4_);
        local_1588._8_4_ = auVar442._12_4_;
        local_1588._12_4_ = auVar717._12_4_;
        auVar784._12_4_ =
             CONCAT22((short)((unkuint10)auVar486._0_10_ >> 0x40),
                      (short)((unkuint10)auVar1447._0_10_ >> 0x40));
        auVar1448._0_8_ = CONCAT26(auVar486._10_2_,CONCAT24(auVar1447._10_2_,auVar784._12_4_));
        auVar1448._8_2_ = auVar1458._12_2_;
        auVar1448._10_2_ = auVar501._12_2_;
        auVar1501._12_2_ = auVar1500._14_2_;
        auVar1501._0_12_ = auVar1448;
        auVar1501._14_2_ = auVar713._14_2_;
        auVar298._12_4_ =
             CONCAT22((short)((unkuint10)auVar933._0_10_ >> 0x40),
                      (short)((unkuint10)auVar758._0_10_ >> 0x40));
        auVar487._0_8_ = CONCAT26(auVar933._10_2_,CONCAT24(auVar758._10_2_,auVar298._12_4_));
        auVar487._8_2_ = auVar771._12_2_;
        auVar487._10_2_ = auVar945._12_2_;
        auVar720._12_2_ = auVar889._14_2_;
        auVar720._0_12_ = auVar487;
        auVar720._14_2_ = auVar1128._14_2_;
        uVar741 = CONCAT22((short)((unkuint10)auVar1161._0_10_ >> 0x40),
                           (short)((unkuint10)auVar1769._0_10_ >> 0x40));
        auVar1770._0_8_ = CONCAT26(auVar1161._10_2_,CONCAT24(auVar1769._10_2_,uVar741));
        auVar1770._8_2_ = auVar1779._12_2_;
        auVar1770._10_2_ = auVar1171._12_2_;
        auVar1811._12_2_ = auVar1810._14_2_;
        auVar1811._0_12_ = auVar1770;
        auVar1811._14_2_ = auVar1302._14_2_;
        uVar908 = CONCAT22((short)((unkuint10)auVar1916._0_10_ >> 0x40),
                           (short)((unkuint10)auVar2006._0_10_ >> 0x40));
        auVar2007._0_8_ = CONCAT26(auVar1916._10_2_,CONCAT24(auVar2006._10_2_,uVar908));
        auVar2007._8_2_ = auVar2016._12_2_;
        auVar2007._10_2_ = auVar1925._12_2_;
        auVar2034._12_2_ = auVar2033._14_2_;
        auVar2034._0_12_ = auVar2007;
        auVar2034._14_2_ = auVar1983._14_2_;
        auVar444._8_4_ = (int)((ulong)auVar1448._0_8_ >> 0x20);
        auVar444._0_8_ = auVar1448._0_8_;
        auVar444._12_4_ = (int)((ulong)auVar487._0_8_ >> 0x20);
        auVar721._8_4_ = (int)((ulong)auVar1770._0_8_ >> 0x20);
        auVar721._0_8_ = auVar1770._0_8_;
        auVar721._12_4_ = (int)((ulong)auVar2007._0_8_ >> 0x20);
        local_1578 = CONCAT44(auVar298._12_4_,auVar784._12_4_);
        uStack_1570 = CONCAT44(uVar908,uVar741);
        local_1568 = auVar444._8_8_;
        uStack_1560 = auVar721._8_8_;
        local_1558 = CONCAT44(auVar487._8_4_,auVar1448._8_4_);
        uStack_1550 = CONCAT44(auVar2007._8_4_,auVar1770._8_4_);
        local_1548._8_4_ = auVar1501._12_4_;
        local_1548._12_4_ = auVar720._12_4_;
        local_1538 = CONCAT44(auVar2034._12_4_,auVar1811._12_4_);
        lVar256 = 0;
        puVar253 = dst;
        do {
          uVar267 = *(undefined8 *)((long)local_1638 + lVar256 + 8);
          *(undefined8 *)puVar253 = *(undefined8 *)((long)local_1638 + lVar256);
          *(undefined8 *)(puVar253 + 8) = uVar267;
          lVar256 = lVar256 + 0x10;
          puVar253 = puVar253 + stride;
        } while (lVar256 != 0x100);
        dst = dst + 0x10;
        bVar263 = lVar252 == 0;
        lVar252 = lVar252 + 0x10;
      } while (bVar263);
      break;
    case 7:
      uStack_1710 = 0x22ab58;
      dr_prediction_z1_32xN_sse4_1(0x40,local_1038,0x20,left,dy,iVar258);
      pitchSrc = 0x20;
      iVar258 = 0x40;
      iVar262 = 0x20;
      goto LAB_0022ab24;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z3_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      default: assert(0 && "Invalid block size");
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}